

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int ncnn::binary_op_broadcast_inner(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int size_2;
  int iVar93;
  uint uVar94;
  int iVar95;
  uint uVar96;
  int *extraout_RAX;
  ulong uVar97;
  void *pvVar98;
  uint uVar99;
  uint uVar100;
  uint uVar101;
  void *pvVar102;
  long lVar103;
  int iVar104;
  uint uVar105;
  long lVar106;
  int size;
  uint uVar107;
  ulong uVar108;
  undefined1 (*pauVar109) [64];
  uint *puVar110;
  undefined1 (*pauVar111) [64];
  ulong uVar112;
  undefined1 (*pauVar113) [32];
  int iVar114;
  long lVar115;
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  float fVar179;
  undefined8 uVar190;
  undefined8 uVar191;
  undefined8 uVar193;
  undefined1 auVar180 [32];
  undefined8 uVar194;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar192 [56];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar250 [28];
  undefined1 auVar240 [16];
  undefined1 auVar251 [28];
  undefined1 auVar241 [16];
  undefined1 auVar252 [28];
  undefined1 auVar242 [16];
  undefined1 auVar253 [28];
  undefined1 auVar243 [16];
  undefined1 auVar254 [28];
  undefined1 auVar244 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  undefined1 auVar288 [64];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  __m128 afVar310;
  binary_op_rpow op_1;
  binary_op_ratan2 op;
  __m128 _b_128;
  __m256 _b_256;
  __m256 _p;
  binary_op_rpow local_229;
  void *local_228;
  Mat *local_220;
  void *local_218;
  void *local_210;
  Allocator *local_208;
  int *local_200;
  Mat *local_1f8;
  int local_1ec;
  void *local_1e8;
  undefined1 local_1e0 [16];
  size_t local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  undefined8 local_1b0;
  void *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  void *local_190;
  undefined8 local_188;
  __m128 local_180;
  float local_16c;
  long local_168;
  __m256 local_160;
  Mat local_140;
  undefined1 local_c0 [32];
  undefined1 auStack_a0 [32];
  
  local_228 = b->data;
  local_200 = b->refcount;
  local_1e8 = (void *)b->elemsize;
  local_208 = b->allocator;
  uVar191._0_4_ = b->dims;
  uVar191._4_4_ = b->w;
  local_1d0 = b->cstep;
  uStack_198 = 0;
  uVar190 = uVar191;
  if (local_200 != (int *)0x0) {
    LOCK();
    *local_200 = *local_200 + 1;
    UNLOCK();
    uVar190._0_4_ = b->dims;
    uVar190._4_4_ = b->w;
  }
  uVar96 = (uint)uVar190;
  uVar105 = (uint)((ulong)uVar190 >> 0x20) ^ 1;
  local_220 = a;
  local_1f8 = c;
  local_1a0._0_4_ = (undefined4)uVar191;
  local_1a0._4_4_ = uVar191._4_4_;
  if (uVar96 == 2 && uVar105 == 0) {
    Mat::reshape(&local_140,b,b->h,(Allocator *)0x0);
    if (local_140.refcount != (int *)0x0) {
      LOCK();
      *local_140.refcount = *local_140.refcount + 1;
      UNLOCK();
    }
    if (local_200 != (int *)0x0) {
      LOCK();
      *local_200 = *local_200 + -1;
      UNLOCK();
      if (*local_200 == 0) {
        if (local_208 == (Allocator *)0x0) {
          if (local_228 != (void *)0x0) {
            free(local_228);
          }
        }
        else {
          (*local_208->_vptr_Allocator[3])(local_208,local_228);
        }
      }
    }
    local_228 = local_140.data;
    local_1e8 = (void *)local_140.elemsize;
    local_208 = local_140.allocator;
    local_1a0._0_4_ = local_140.dims;
    local_1a0._4_4_ = local_140.w;
    uStack_198 = 0;
    local_1d0 = local_140.cstep;
    local_200 = local_140.refcount;
    if (local_140.refcount != (int *)0x0) {
      LOCK();
      *local_140.refcount = *local_140.refcount + -1;
      UNLOCK();
      if (*local_140.refcount == 0) {
        if (local_140.allocator == (Allocator *)0x0) {
LAB_0039774a:
          uStack_198 = 0;
          if (local_228 != (void *)0x0) {
            free(local_228);
          }
        }
        else {
          (*(local_140.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    uVar94 = b->h;
    if ((uVar96 ^ 3) == 0 && (uVar94 ^ 1) == 0) {
      Mat::reshape(&local_140,b,b->c,(Allocator *)0x0);
      if (local_140.refcount != (int *)0x0) {
        LOCK();
        *local_140.refcount = *local_140.refcount + 1;
        UNLOCK();
      }
      if (local_200 != (int *)0x0) {
        LOCK();
        *local_200 = *local_200 + -1;
        UNLOCK();
        if (*local_200 == 0) {
          if (local_208 == (Allocator *)0x0) {
            if (local_228 != (void *)0x0) {
              free(local_228);
            }
          }
          else {
            (*local_208->_vptr_Allocator[3])(local_208,local_228);
          }
        }
      }
      local_228 = local_140.data;
      local_1e8 = (void *)local_140.elemsize;
      local_208 = local_140.allocator;
      local_1a0._0_4_ = local_140.dims;
      local_1a0._4_4_ = local_140.w;
      uStack_198 = 0;
      local_1d0 = local_140.cstep;
      local_200 = local_140.refcount;
      if (local_140.refcount != (int *)0x0) {
        LOCK();
        *local_140.refcount = *local_140.refcount + -1;
        UNLOCK();
        if (*local_140.refcount == 0) {
          if (local_140.allocator == (Allocator *)0x0) goto LAB_0039774a;
          (*(local_140.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else if ((uVar96 ^ 3) == 0 && uVar105 == 0) {
      Mat::reshape(&local_140,b,uVar94,b->c,(Allocator *)0x0);
      if (local_140.refcount != (int *)0x0) {
        LOCK();
        *local_140.refcount = *local_140.refcount + 1;
        UNLOCK();
      }
      if (local_200 != (int *)0x0) {
        LOCK();
        *local_200 = *local_200 + -1;
        UNLOCK();
        if (*local_200 == 0) {
          if (local_208 == (Allocator *)0x0) {
            if (local_228 != (void *)0x0) {
              free(local_228);
            }
          }
          else {
            (*local_208->_vptr_Allocator[3])(local_208,local_228);
          }
        }
      }
      local_228 = local_140.data;
      local_1e8 = (void *)local_140.elemsize;
      local_208 = local_140.allocator;
      local_1a0._0_4_ = local_140.dims;
      local_1a0._4_4_ = local_140.w;
      uStack_198 = 0;
      local_1d0 = local_140.cstep;
      local_200 = local_140.refcount;
      if (local_140.refcount != (int *)0x0) {
        LOCK();
        *local_140.refcount = *local_140.refcount + -1;
        UNLOCK();
        if (*local_140.refcount == 0) {
          if (local_140.allocator == (Allocator *)0x0) goto LAB_0039774a;
          (*(local_140.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      uVar96 = uVar96 ^ 4;
      iVar93 = b->d;
      if (iVar93 == 1 && uVar96 == 0) {
        Mat::reshape(&local_140,b,b->c,(Allocator *)0x0);
        if (local_140.refcount != (int *)0x0) {
          LOCK();
          *local_140.refcount = *local_140.refcount + 1;
          UNLOCK();
        }
        if (local_200 != (int *)0x0) {
          LOCK();
          *local_200 = *local_200 + -1;
          UNLOCK();
          if (*local_200 == 0) {
            if (local_208 == (Allocator *)0x0) {
              if (local_228 != (void *)0x0) {
                free(local_228);
              }
            }
            else {
              (*local_208->_vptr_Allocator[3])(local_208,local_228);
            }
          }
        }
        local_228 = local_140.data;
        local_1e8 = (void *)local_140.elemsize;
        local_208 = local_140.allocator;
        local_1a0._0_4_ = local_140.dims;
        local_1a0._4_4_ = local_140.w;
        uStack_198 = 0;
        local_1d0 = local_140.cstep;
        local_200 = local_140.refcount;
        if (local_140.refcount != (int *)0x0) {
          LOCK();
          *local_140.refcount = *local_140.refcount + -1;
          UNLOCK();
          if (*local_140.refcount == 0) {
            if (local_140.allocator == (Allocator *)0x0) goto LAB_0039774a;
            (*(local_140.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      else if ((uVar94 ^ 1) == 0 && uVar96 == 0) {
        Mat::reshape(&local_140,b,iVar93,b->c,(Allocator *)0x0);
        if (local_140.refcount != (int *)0x0) {
          LOCK();
          *local_140.refcount = *local_140.refcount + 1;
          UNLOCK();
        }
        if (local_200 != (int *)0x0) {
          LOCK();
          *local_200 = *local_200 + -1;
          UNLOCK();
          if (*local_200 == 0) {
            if (local_208 == (Allocator *)0x0) {
              if (local_228 != (void *)0x0) {
                free(local_228);
              }
            }
            else {
              (*local_208->_vptr_Allocator[3])(local_208,local_228);
            }
          }
        }
        local_228 = local_140.data;
        local_1e8 = (void *)local_140.elemsize;
        local_208 = local_140.allocator;
        local_1a0._0_4_ = local_140.dims;
        local_1a0._4_4_ = local_140.w;
        uStack_198 = 0;
        local_1d0 = local_140.cstep;
        local_200 = local_140.refcount;
        if (local_140.refcount != (int *)0x0) {
          LOCK();
          *local_140.refcount = *local_140.refcount + -1;
          UNLOCK();
          if (*local_140.refcount == 0) {
            if (local_140.allocator == (Allocator *)0x0) goto LAB_0039774a;
            (*(local_140.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      else if (uVar96 == 0 && uVar105 == 0) {
        Mat::reshape(&local_140,b,uVar94,iVar93,b->c,(Allocator *)0x0);
        if (local_140.refcount != (int *)0x0) {
          LOCK();
          *local_140.refcount = *local_140.refcount + 1;
          UNLOCK();
        }
        if (local_200 != (int *)0x0) {
          LOCK();
          *local_200 = *local_200 + -1;
          UNLOCK();
          if (*local_200 == 0) {
            if (local_208 == (Allocator *)0x0) {
              if (local_228 != (void *)0x0) {
                free(local_228);
              }
            }
            else {
              (*local_208->_vptr_Allocator[3])(local_208,local_228);
            }
          }
        }
        local_228 = local_140.data;
        local_1e8 = (void *)local_140.elemsize;
        local_208 = local_140.allocator;
        local_1a0._0_4_ = local_140.dims;
        local_1a0._4_4_ = local_140.w;
        uStack_198 = 0;
        local_1d0 = local_140.cstep;
        local_200 = local_140.refcount;
        if (local_140.refcount != (int *)0x0) {
          LOCK();
          *local_140.refcount = *local_140.refcount + -1;
          UNLOCK();
          if (*local_140.refcount == 0) {
            if (local_140.allocator == (Allocator *)0x0) goto LAB_0039774a;
            (*(local_140.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
  switch(op_type) {
  case 0:
    iVar93 = local_220->w;
    uVar96 = local_220->h;
    uVar97 = (ulong)uVar96;
    uVar105 = local_220->d;
    local_1e0._0_8_ = CONCAT44(0,uVar105);
    uVar94 = local_220->c;
    local_218 = (void *)(ulong)uVar94;
    iVar114 = local_220->elempack;
    iVar95 = local_220->dims;
    if (0 < (int)uVar96 && ((int)local_1a0 == 1 && iVar95 == 2)) {
      uVar107 = iVar114 * iVar93;
      uVar108 = 0;
      do {
        fVar179 = *(float *)((long)local_228 + uVar108 * 4);
        if (iVar114 == 4) {
          auVar195 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar195,auVar195));
LAB_00397832:
          auVar255 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar255,1);
        }
        else {
          auVar195._4_4_ = fVar179;
          auVar195._0_4_ = fVar179;
          auVar195._8_4_ = fVar179;
          auVar195._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + uVar108 * 0x20));
            goto LAB_00397832;
          }
          auVar255._4_4_ = fVar179;
          auVar255._0_4_ = fVar179;
          auVar255._8_4_ = fVar179;
          auVar255._12_4_ = fVar179;
          auVar255._16_4_ = fVar179;
          auVar255._20_4_ = fVar179;
          auVar255._24_4_ = fVar179;
          auVar255._28_4_ = fVar179;
          auVar116 = ZEXT3264(auVar255);
          if (iVar114 != 0x10) goto LAB_00397832;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_228 + uVar108 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * uVar108 * local_220->elemsize + (long)local_220->data);
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_1f8->w * uVar108 * local_1f8->elemsize + (long)local_1f8->data);
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vaddps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          fVar58 = *(float *)(*pauVar109 + 4);
          fVar59 = *(float *)(*pauVar109 + 8);
          fVar60 = *(float *)(*pauVar109 + 0xc);
          fVar61 = *(float *)(*pauVar109 + 0x10);
          fVar62 = *(float *)(*pauVar109 + 0x14);
          fVar63 = *(float *)(*pauVar109 + 0x18);
          fVar64 = *(float *)(*pauVar109 + 0x1c);
          *(float *)*pauVar111 = auVar255._0_4_ + *(float *)*pauVar109;
          *(float *)((long)*pauVar111 + 4) = auVar255._4_4_ + fVar58;
          *(float *)((long)*pauVar111 + 8) = auVar255._8_4_ + fVar59;
          *(float *)((long)*pauVar111 + 0xc) = auVar255._12_4_ + fVar60;
          *(float *)((long)*pauVar111 + 0x10) = auVar255._16_4_ + fVar61;
          *(float *)((long)*pauVar111 + 0x14) = auVar255._20_4_ + fVar62;
          *(float *)((long)*pauVar111 + 0x18) = auVar255._24_4_ + fVar63;
          *(float *)((long)*pauVar111 + 0x1c) = auVar255._28_4_ + fVar64;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar235._0_4_ = auVar195._0_4_ + *(float *)*pauVar109;
          auVar235._4_4_ = auVar195._4_4_ + *(float *)(*pauVar109 + 4);
          auVar235._8_4_ = auVar195._8_4_ + *(float *)(*pauVar109 + 8);
          auVar235._12_4_ = auVar195._12_4_ + *(float *)(*pauVar109 + 0xc);
          *(undefined1 (*) [16])*pauVar111 = auVar235;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 fVar179 + *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        uVar108 = uVar108 + 1;
      } while (uVar108 != uVar97);
      iVar95 = local_220->dims;
    }
    if ((iVar95 - 3U < 2) && ((int)local_1a0 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      uVar107 = uVar96 * uVar105 * iVar114 * iVar93;
      pvVar98 = (void *)0x0;
      do {
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        if (iVar114 == 4) {
          auVar196 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar196,auVar196));
LAB_003979ad:
          auVar256 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar256,1);
        }
        else {
          auVar196._4_4_ = fVar179;
          auVar196._0_4_ = fVar179;
          auVar196._8_4_ = fVar179;
          auVar196._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20));
            goto LAB_003979ad;
          }
          auVar256._4_4_ = fVar179;
          auVar256._0_4_ = fVar179;
          auVar256._8_4_ = fVar179;
          auVar256._12_4_ = fVar179;
          auVar256._16_4_ = fVar179;
          auVar256._20_4_ = fVar179;
          auVar256._24_4_ = fVar179;
          auVar256._28_4_ = fVar179;
          auVar116 = ZEXT3264(auVar256);
          if (iVar114 != 0x10) goto LAB_003979ad;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar111 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vaddps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          fVar58 = *(float *)(*pauVar109 + 4);
          fVar59 = *(float *)(*pauVar109 + 8);
          fVar60 = *(float *)(*pauVar109 + 0xc);
          fVar61 = *(float *)(*pauVar109 + 0x10);
          fVar62 = *(float *)(*pauVar109 + 0x14);
          fVar63 = *(float *)(*pauVar109 + 0x18);
          fVar64 = *(float *)(*pauVar109 + 0x1c);
          *(float *)*pauVar111 = auVar256._0_4_ + *(float *)*pauVar109;
          *(float *)((long)*pauVar111 + 4) = auVar256._4_4_ + fVar58;
          *(float *)((long)*pauVar111 + 8) = auVar256._8_4_ + fVar59;
          *(float *)((long)*pauVar111 + 0xc) = auVar256._12_4_ + fVar60;
          *(float *)((long)*pauVar111 + 0x10) = auVar256._16_4_ + fVar61;
          *(float *)((long)*pauVar111 + 0x14) = auVar256._20_4_ + fVar62;
          *(float *)((long)*pauVar111 + 0x18) = auVar256._24_4_ + fVar63;
          *(float *)((long)*pauVar111 + 0x1c) = auVar256._28_4_ + fVar64;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar236._0_4_ = auVar196._0_4_ + *(float *)*pauVar109;
          auVar236._4_4_ = auVar196._4_4_ + *(float *)(*pauVar109 + 4);
          auVar236._8_4_ = auVar196._8_4_ + *(float *)(*pauVar109 + 8);
          auVar236._12_4_ = auVar196._12_4_ + *(float *)(*pauVar109 + 0xc);
          *(undefined1 (*) [16])*pauVar111 = auVar236;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 fVar179 + *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if (0 < (int)uVar94 && ((int)local_1a0 == 2 && iVar95 == 3)) {
      local_210 = (void *)CONCAT44(local_210._4_4_,(int)local_1a0);
      uVar107 = iVar114 * iVar93;
      auVar65._4_4_ = local_1a0._4_4_;
      auVar65._0_4_ = (int)local_1a0;
      auVar65._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar65,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar96) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar197 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar197,auVar197));
LAB_00397b7c:
              auVar257 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar257,1);
            }
            else {
              auVar197._4_4_ = fVar179;
              auVar197._0_4_ = fVar179;
              auVar197._8_4_ = fVar179;
              auVar197._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_00397b7c;
              }
              auVar257._4_4_ = fVar179;
              auVar257._0_4_ = fVar179;
              auVar257._8_4_ = fVar179;
              auVar257._12_4_ = fVar179;
              auVar257._16_4_ = fVar179;
              auVar257._20_4_ = fVar179;
              auVar257._24_4_ = fVar179;
              auVar257._28_4_ = fVar179;
              auVar116 = ZEXT3264(auVar257);
              if (iVar114 != 0x10) goto LAB_00397b7c;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vaddps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              fVar58 = *(float *)(*pauVar109 + 4);
              fVar59 = *(float *)(*pauVar109 + 8);
              fVar60 = *(float *)(*pauVar109 + 0xc);
              fVar61 = *(float *)(*pauVar109 + 0x10);
              fVar62 = *(float *)(*pauVar109 + 0x14);
              fVar63 = *(float *)(*pauVar109 + 0x18);
              fVar64 = *(float *)(*pauVar109 + 0x1c);
              *(float *)*pauVar111 = auVar257._0_4_ + *(float *)*pauVar109;
              *(float *)((long)*pauVar111 + 4) = auVar257._4_4_ + fVar58;
              *(float *)((long)*pauVar111 + 8) = auVar257._8_4_ + fVar59;
              *(float *)((long)*pauVar111 + 0xc) = auVar257._12_4_ + fVar60;
              *(float *)((long)*pauVar111 + 0x10) = auVar257._16_4_ + fVar61;
              *(float *)((long)*pauVar111 + 0x14) = auVar257._20_4_ + fVar62;
              *(float *)((long)*pauVar111 + 0x18) = auVar257._24_4_ + fVar63;
              *(float *)((long)*pauVar111 + 0x1c) = auVar257._28_4_ + fVar64;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar237._0_4_ = auVar197._0_4_ + *(float *)*pauVar109;
              auVar237._4_4_ = auVar197._4_4_ + *(float *)(*pauVar109 + 4);
              auVar237._8_4_ = auVar197._8_4_ + *(float *)(*pauVar109 + 8);
              auVar237._12_4_ = auVar197._12_4_ + *(float *)(*pauVar109 + 0xc);
              *(undefined1 (*) [16])*pauVar111 = auVar237;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar106 = 0;
              lVar115 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     fVar179 + *(float *)(*pauVar109 + lVar106 * 4);
                lVar115 = lVar115 + -4;
                lVar106 = lVar106 + 1;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != uVar97);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if ((iVar95 == 4) && ((int)local_1a0 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      local_210 = (void *)CONCAT44(local_210._4_4_,2);
      uVar107 = iVar114 * iVar93 * uVar96;
      auVar66._4_4_ = local_1a0._4_4_;
      auVar66._0_4_ = 2;
      auVar66._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar66,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar198 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar198,auVar198));
LAB_00397d45:
              auVar258 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar258,1);
            }
            else {
              auVar198._4_4_ = fVar179;
              auVar198._0_4_ = fVar179;
              auVar198._8_4_ = fVar179;
              auVar198._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_00397d45;
              }
              auVar258._4_4_ = fVar179;
              auVar258._0_4_ = fVar179;
              auVar258._8_4_ = fVar179;
              auVar258._12_4_ = fVar179;
              auVar258._16_4_ = fVar179;
              auVar258._20_4_ = fVar179;
              auVar258._24_4_ = fVar179;
              auVar258._28_4_ = fVar179;
              auVar116 = ZEXT3264(auVar258);
              if (iVar114 != 0x10) goto LAB_00397d45;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vaddps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              fVar58 = *(float *)(*pauVar109 + 4);
              fVar59 = *(float *)(*pauVar109 + 8);
              fVar60 = *(float *)(*pauVar109 + 0xc);
              fVar61 = *(float *)(*pauVar109 + 0x10);
              fVar62 = *(float *)(*pauVar109 + 0x14);
              fVar63 = *(float *)(*pauVar109 + 0x18);
              fVar64 = *(float *)(*pauVar109 + 0x1c);
              *(float *)*pauVar111 = auVar258._0_4_ + *(float *)*pauVar109;
              *(float *)((long)*pauVar111 + 4) = auVar258._4_4_ + fVar58;
              *(float *)((long)*pauVar111 + 8) = auVar258._8_4_ + fVar59;
              *(float *)((long)*pauVar111 + 0xc) = auVar258._12_4_ + fVar60;
              *(float *)((long)*pauVar111 + 0x10) = auVar258._16_4_ + fVar61;
              *(float *)((long)*pauVar111 + 0x14) = auVar258._20_4_ + fVar62;
              *(float *)((long)*pauVar111 + 0x18) = auVar258._24_4_ + fVar63;
              *(float *)((long)*pauVar111 + 0x1c) = auVar258._28_4_ + fVar64;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar238._0_4_ = auVar198._0_4_ + *(float *)*pauVar109;
              auVar238._4_4_ = auVar198._4_4_ + *(float *)(*pauVar109 + 4);
              auVar238._8_4_ = auVar198._8_4_ + *(float *)(*pauVar109 + 8);
              auVar238._12_4_ = auVar198._12_4_ + *(float *)(*pauVar109 + 0xc);
              *(undefined1 (*) [16])*pauVar111 = auVar238;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar115 = 0;
              lVar106 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     fVar179 + *(float *)(*pauVar109 + lVar106 * 4);
                lVar106 = lVar106 + 1;
                lVar115 = lVar115 + -4;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_1a0 == 3 && iVar95 == 4) && 0 < (int)uVar94) {
      uVar94 = iVar93 * iVar114;
      auVar67._4_4_ = local_1a0._4_4_;
      auVar67._0_4_ = (int)local_1a0;
      auVar67._8_8_ = uStack_198;
      iVar93 = vextractps_avx(auVar67,1);
      local_1d0 = local_1d0 * (long)local_1e8;
      local_210 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_210 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_210 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            if (0 < (int)uVar96) {
              lVar103 = (long)iVar93 * (long)local_1e8 * uVar108 + local_1d0 * (long)local_210;
              uVar112 = 0;
              do {
                fVar179 = *(float *)((long)local_228 + uVar112 * 4 + lVar103);
                if (iVar114 == 4) {
                  auVar199 = *(undefined1 (*) [16])((long)local_228 + uVar112 * 0x10 + lVar103);
                  auVar116 = ZEXT3264(CONCAT1616(auVar199,auVar199));
LAB_00397f3c:
                  auVar259 = auVar116._0_32_;
                  auVar116 = vinserti64x4_avx512f(auVar116,auVar259,1);
                }
                else {
                  auVar199._4_4_ = fVar179;
                  auVar199._0_4_ = fVar179;
                  auVar199._8_4_ = fVar179;
                  auVar199._12_4_ = fVar179;
                  if (iVar114 == 8) {
                    auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)local_228 + uVar112 * 0x20 + lVar103));
                    goto LAB_00397f3c;
                  }
                  auVar259._4_4_ = fVar179;
                  auVar259._0_4_ = fVar179;
                  auVar259._8_4_ = fVar179;
                  auVar259._12_4_ = fVar179;
                  auVar259._16_4_ = fVar179;
                  auVar259._20_4_ = fVar179;
                  auVar259._24_4_ = fVar179;
                  auVar259._28_4_ = fVar179;
                  auVar116 = ZEXT3264(auVar259);
                  if (iVar114 != 0x10) goto LAB_00397f3c;
                  auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_228 + uVar112 * 0x40 + lVar103));
                }
                uVar107 = 0;
                if (0xf < (int)uVar94) {
                  iVar95 = 0xf;
                  do {
                    auVar117 = vaddps_avx512f(auVar116,*pauVar109);
                    *pauVar111 = auVar117;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    iVar95 = iVar95 + 0x10;
                    uVar107 = uVar94 & 0xfffffff0;
                  } while (iVar95 < (int)uVar94);
                }
                uVar101 = uVar107 | 7;
                while ((int)uVar101 < (int)uVar94) {
                  fVar58 = *(float *)(*pauVar109 + 4);
                  fVar59 = *(float *)(*pauVar109 + 8);
                  fVar60 = *(float *)(*pauVar109 + 0xc);
                  fVar61 = *(float *)(*pauVar109 + 0x10);
                  fVar62 = *(float *)(*pauVar109 + 0x14);
                  fVar63 = *(float *)(*pauVar109 + 0x18);
                  fVar64 = *(float *)(*pauVar109 + 0x1c);
                  *(float *)*pauVar111 = auVar259._0_4_ + *(float *)*pauVar109;
                  *(float *)((long)*pauVar111 + 4) = auVar259._4_4_ + fVar58;
                  *(float *)((long)*pauVar111 + 8) = auVar259._8_4_ + fVar59;
                  *(float *)((long)*pauVar111 + 0xc) = auVar259._12_4_ + fVar60;
                  *(float *)((long)*pauVar111 + 0x10) = auVar259._16_4_ + fVar61;
                  *(float *)((long)*pauVar111 + 0x14) = auVar259._20_4_ + fVar62;
                  *(float *)((long)*pauVar111 + 0x18) = auVar259._24_4_ + fVar63;
                  *(float *)((long)*pauVar111 + 0x1c) = auVar259._28_4_ + fVar64;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                  uVar101 = uVar107 + 0xf;
                  uVar107 = uVar107 + 8;
                }
                uVar101 = uVar107 | 3;
                while ((int)uVar101 < (int)uVar94) {
                  auVar239._0_4_ = auVar199._0_4_ + *(float *)*pauVar109;
                  auVar239._4_4_ = auVar199._4_4_ + *(float *)(*pauVar109 + 4);
                  auVar239._8_4_ = auVar199._8_4_ + *(float *)(*pauVar109 + 8);
                  auVar239._12_4_ = auVar199._12_4_ + *(float *)(*pauVar109 + 0xc);
                  *(undefined1 (*) [16])*pauVar111 = auVar239;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                  uVar101 = uVar107 + 7;
                  uVar107 = uVar107 + 4;
                }
                if (uVar94 - uVar107 != 0 && (int)uVar107 <= (int)uVar94) {
                  lVar115 = 0;
                  lVar106 = 0;
                  do {
                    *(float *)((long)*pauVar111 + lVar106 * 4) =
                         fVar179 + *(float *)(*pauVar109 + lVar106 * 4);
                    lVar106 = lVar106 + 1;
                    lVar115 = lVar115 + -4;
                  } while (uVar94 - uVar107 != (int)lVar106);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                }
                uVar112 = uVar112 + 1;
              } while (uVar112 != uVar97);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        local_210 = (void *)((long)local_210 + 1);
        local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      } while (local_210 != local_218);
    }
    break;
  case 1:
    iVar93 = local_220->w;
    uVar96 = local_220->h;
    uVar97 = (ulong)uVar96;
    uVar105 = local_220->d;
    local_1e0._0_8_ = CONCAT44(0,uVar105);
    uVar94 = local_220->c;
    local_218 = (void *)(ulong)uVar94;
    iVar114 = local_220->elempack;
    iVar95 = local_220->dims;
    if (0 < (int)uVar96 && ((int)local_1a0 == 1 && iVar95 == 2)) {
      uVar107 = iVar114 * iVar93;
      uVar108 = 0;
      do {
        fVar179 = *(float *)((long)local_228 + uVar108 * 4);
        if (iVar114 == 4) {
          auVar215 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar215,auVar215));
LAB_0039ac4b:
          auVar270 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar270,1);
        }
        else {
          auVar215._4_4_ = fVar179;
          auVar215._0_4_ = fVar179;
          auVar215._8_4_ = fVar179;
          auVar215._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + uVar108 * 0x20));
            goto LAB_0039ac4b;
          }
          auVar270._4_4_ = fVar179;
          auVar270._0_4_ = fVar179;
          auVar270._8_4_ = fVar179;
          auVar270._12_4_ = fVar179;
          auVar270._16_4_ = fVar179;
          auVar270._20_4_ = fVar179;
          auVar270._24_4_ = fVar179;
          auVar270._28_4_ = fVar179;
          auVar116 = ZEXT3264(auVar270);
          if (iVar114 != 0x10) goto LAB_0039ac4b;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_228 + uVar108 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * uVar108 * local_220->elemsize + (long)local_220->data);
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_1f8->w * uVar108 * local_1f8->elemsize + (long)local_1f8->data);
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vsubps_avx512f(*pauVar109,auVar116);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          auVar180 = vsubps_avx(*(undefined1 (*) [32])*pauVar109,auVar270);
          *(undefined1 (*) [32])*pauVar111 = auVar180;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar1 = vsubps_avx(*(undefined1 (*) [16])*pauVar109,auVar215);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 *(float *)(*pauVar109 + lVar103 * 4) - fVar179;
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        uVar108 = uVar108 + 1;
      } while (uVar108 != uVar97);
      iVar95 = local_220->dims;
    }
    if ((iVar95 - 3U < 2) && ((int)local_1a0 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      uVar107 = uVar96 * uVar105 * iVar114 * iVar93;
      pvVar98 = (void *)0x0;
      do {
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        if (iVar114 == 4) {
          auVar216 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar216,auVar216));
LAB_0039add8:
          auVar271 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar271,1);
        }
        else {
          auVar216._4_4_ = fVar179;
          auVar216._0_4_ = fVar179;
          auVar216._8_4_ = fVar179;
          auVar216._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20));
            goto LAB_0039add8;
          }
          auVar271._4_4_ = fVar179;
          auVar271._0_4_ = fVar179;
          auVar271._8_4_ = fVar179;
          auVar271._12_4_ = fVar179;
          auVar271._16_4_ = fVar179;
          auVar271._20_4_ = fVar179;
          auVar271._24_4_ = fVar179;
          auVar271._28_4_ = fVar179;
          auVar116 = ZEXT3264(auVar271);
          if (iVar114 != 0x10) goto LAB_0039add8;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar111 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vsubps_avx512f(*pauVar109,auVar116);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          auVar180 = vsubps_avx(*(undefined1 (*) [32])*pauVar109,auVar271);
          *(undefined1 (*) [32])*pauVar111 = auVar180;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar1 = vsubps_avx(*(undefined1 (*) [16])*pauVar109,auVar216);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 *(float *)(*pauVar109 + lVar103 * 4) - fVar179;
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if (0 < (int)uVar94 && ((int)local_1a0 == 2 && iVar95 == 3)) {
      local_210 = (void *)CONCAT44(local_210._4_4_,(int)local_1a0);
      uVar107 = iVar114 * iVar93;
      auVar80._4_4_ = local_1a0._4_4_;
      auVar80._0_4_ = (int)local_1a0;
      auVar80._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar80,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar96) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar217 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar217,auVar217));
LAB_0039afb9:
              auVar272 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar272,1);
            }
            else {
              auVar217._4_4_ = fVar179;
              auVar217._0_4_ = fVar179;
              auVar217._8_4_ = fVar179;
              auVar217._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_0039afb9;
              }
              auVar272._4_4_ = fVar179;
              auVar272._0_4_ = fVar179;
              auVar272._8_4_ = fVar179;
              auVar272._12_4_ = fVar179;
              auVar272._16_4_ = fVar179;
              auVar272._20_4_ = fVar179;
              auVar272._24_4_ = fVar179;
              auVar272._28_4_ = fVar179;
              auVar116 = ZEXT3264(auVar272);
              if (iVar114 != 0x10) goto LAB_0039afb9;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vsubps_avx512f(*pauVar109,auVar116);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              auVar180 = vsubps_avx(*(undefined1 (*) [32])*pauVar109,auVar272);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar1 = vsubps_avx(*(undefined1 (*) [16])*pauVar109,auVar217);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar106 = 0;
              lVar115 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     *(float *)(*pauVar109 + lVar106 * 4) - fVar179;
                lVar115 = lVar115 + -4;
                lVar106 = lVar106 + 1;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != uVar97);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if ((iVar95 == 4) && ((int)local_1a0 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      local_210 = (void *)CONCAT44(local_210._4_4_,2);
      uVar107 = iVar114 * iVar93 * uVar96;
      auVar81._4_4_ = local_1a0._4_4_;
      auVar81._0_4_ = 2;
      auVar81._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar81,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar218 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar218,auVar218));
LAB_0039b194:
              auVar273 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar273,1);
            }
            else {
              auVar218._4_4_ = fVar179;
              auVar218._0_4_ = fVar179;
              auVar218._8_4_ = fVar179;
              auVar218._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_0039b194;
              }
              auVar273._4_4_ = fVar179;
              auVar273._0_4_ = fVar179;
              auVar273._8_4_ = fVar179;
              auVar273._12_4_ = fVar179;
              auVar273._16_4_ = fVar179;
              auVar273._20_4_ = fVar179;
              auVar273._24_4_ = fVar179;
              auVar273._28_4_ = fVar179;
              auVar116 = ZEXT3264(auVar273);
              if (iVar114 != 0x10) goto LAB_0039b194;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vsubps_avx512f(*pauVar109,auVar116);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              auVar180 = vsubps_avx(*(undefined1 (*) [32])*pauVar109,auVar273);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar1 = vsubps_avx(*(undefined1 (*) [16])*pauVar109,auVar218);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar115 = 0;
              lVar106 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     *(float *)(*pauVar109 + lVar106 * 4) - fVar179;
                lVar106 = lVar106 + 1;
                lVar115 = lVar115 + -4;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_1a0 == 3 && iVar95 == 4) && 0 < (int)uVar94) {
      uVar94 = iVar93 * iVar114;
      auVar82._4_4_ = local_1a0._4_4_;
      auVar82._0_4_ = (int)local_1a0;
      auVar82._8_8_ = uStack_198;
      iVar93 = vextractps_avx(auVar82,1);
      local_1d0 = local_1d0 * (long)local_1e8;
      local_210 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_210 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_210 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            if (0 < (int)uVar96) {
              lVar103 = (long)iVar93 * (long)local_1e8 * uVar108 + local_1d0 * (long)local_210;
              uVar112 = 0;
              do {
                fVar179 = *(float *)((long)local_228 + uVar112 * 4 + lVar103);
                if (iVar114 == 4) {
                  auVar219 = *(undefined1 (*) [16])((long)local_228 + uVar112 * 0x10 + lVar103);
                  auVar116 = ZEXT3264(CONCAT1616(auVar219,auVar219));
LAB_0039b39d:
                  auVar274 = auVar116._0_32_;
                  auVar116 = vinserti64x4_avx512f(auVar116,auVar274,1);
                }
                else {
                  auVar219._4_4_ = fVar179;
                  auVar219._0_4_ = fVar179;
                  auVar219._8_4_ = fVar179;
                  auVar219._12_4_ = fVar179;
                  if (iVar114 == 8) {
                    auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)local_228 + uVar112 * 0x20 + lVar103));
                    goto LAB_0039b39d;
                  }
                  auVar274._4_4_ = fVar179;
                  auVar274._0_4_ = fVar179;
                  auVar274._8_4_ = fVar179;
                  auVar274._12_4_ = fVar179;
                  auVar274._16_4_ = fVar179;
                  auVar274._20_4_ = fVar179;
                  auVar274._24_4_ = fVar179;
                  auVar274._28_4_ = fVar179;
                  auVar116 = ZEXT3264(auVar274);
                  if (iVar114 != 0x10) goto LAB_0039b39d;
                  auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_228 + uVar112 * 0x40 + lVar103));
                }
                uVar107 = 0;
                if (0xf < (int)uVar94) {
                  iVar95 = 0xf;
                  do {
                    auVar117 = vsubps_avx512f(*pauVar109,auVar116);
                    *pauVar111 = auVar117;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    iVar95 = iVar95 + 0x10;
                    uVar107 = uVar94 & 0xfffffff0;
                  } while (iVar95 < (int)uVar94);
                }
                uVar101 = uVar107 | 7;
                while ((int)uVar101 < (int)uVar94) {
                  auVar180 = vsubps_avx(*(undefined1 (*) [32])*pauVar109,auVar274);
                  *(undefined1 (*) [32])*pauVar111 = auVar180;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                  uVar101 = uVar107 + 0xf;
                  uVar107 = uVar107 + 8;
                }
                uVar101 = uVar107 | 3;
                while ((int)uVar101 < (int)uVar94) {
                  auVar1 = vsubps_avx(*(undefined1 (*) [16])*pauVar109,auVar219);
                  *(undefined1 (*) [16])*pauVar111 = auVar1;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                  uVar101 = uVar107 + 7;
                  uVar107 = uVar107 + 4;
                }
                if (uVar94 - uVar107 != 0 && (int)uVar107 <= (int)uVar94) {
                  lVar115 = 0;
                  lVar106 = 0;
                  do {
                    *(float *)((long)*pauVar111 + lVar106 * 4) =
                         *(float *)(*pauVar109 + lVar106 * 4) - fVar179;
                    lVar106 = lVar106 + 1;
                    lVar115 = lVar115 + -4;
                  } while (uVar94 - uVar107 != (int)lVar106);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                }
                uVar112 = uVar112 + 1;
              } while (uVar112 != uVar97);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        local_210 = (void *)((long)local_210 + 1);
        local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      } while (local_210 != local_218);
    }
    break;
  case 2:
    iVar93 = local_220->w;
    uVar96 = local_220->h;
    uVar97 = (ulong)uVar96;
    uVar105 = local_220->d;
    local_1e0._0_8_ = CONCAT44(0,uVar105);
    uVar94 = local_220->c;
    local_218 = (void *)(ulong)uVar94;
    iVar114 = local_220->elempack;
    iVar95 = local_220->dims;
    if (0 < (int)uVar96 && ((int)local_1a0 == 1 && iVar95 == 2)) {
      uVar107 = iVar114 * iVar93;
      uVar108 = 0;
      do {
        fVar179 = *(float *)((long)local_228 + uVar108 * 4);
        if (iVar114 == 4) {
          auVar205 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar205,auVar205));
LAB_00399096:
          auVar250 = auVar116._0_28_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar116._0_32_,1);
        }
        else {
          auVar205._4_4_ = fVar179;
          auVar205._0_4_ = fVar179;
          auVar205._8_4_ = fVar179;
          auVar205._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + uVar108 * 0x20));
            goto LAB_00399096;
          }
          auVar250._4_4_ = fVar179;
          auVar250._0_4_ = fVar179;
          auVar250._8_4_ = fVar179;
          auVar250._12_4_ = fVar179;
          auVar250._16_4_ = fVar179;
          auVar250._20_4_ = fVar179;
          auVar250._24_4_ = fVar179;
          auVar116 = ZEXT3264(CONCAT428(fVar179,auVar250));
          if (iVar114 != 0x10) goto LAB_00399096;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_228 + uVar108 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * uVar108 * local_220->elemsize + (long)local_220->data);
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_1f8->w * uVar108 * local_1f8->elemsize + (long)local_1f8->data);
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vmulps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          auVar129._0_4_ = auVar250._0_4_ * *(float *)*pauVar109;
          auVar129._4_4_ = auVar250._4_4_ * *(float *)(*pauVar109 + 4);
          auVar129._8_4_ = auVar250._8_4_ * *(float *)(*pauVar109 + 8);
          auVar129._12_4_ = auVar250._12_4_ * *(float *)(*pauVar109 + 0xc);
          auVar129._16_4_ = auVar250._16_4_ * *(float *)(*pauVar109 + 0x10);
          auVar129._20_4_ = auVar250._20_4_ * *(float *)(*pauVar109 + 0x14);
          auVar129._28_36_ = auVar116._28_36_;
          auVar129._24_4_ = auVar250._24_4_ * *(float *)(*pauVar109 + 0x18);
          auVar116 = ZEXT3264(auVar129._0_32_);
          *(undefined1 (*) [32])*pauVar111 = auVar129._0_32_;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar240._0_4_ = auVar205._0_4_ * *(float *)*pauVar109;
          auVar240._4_4_ = auVar205._4_4_ * *(float *)(*pauVar109 + 4);
          auVar240._8_4_ = auVar205._8_4_ * *(float *)(*pauVar109 + 8);
          auVar240._12_4_ = auVar205._12_4_ * *(float *)(*pauVar109 + 0xc);
          *(undefined1 (*) [16])*pauVar111 = auVar240;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 fVar179 * *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        uVar108 = uVar108 + 1;
      } while (uVar108 != uVar97);
      iVar95 = local_220->dims;
    }
    if ((iVar95 - 3U < 2) && ((int)local_1a0 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      uVar107 = uVar96 * uVar105 * iVar114 * iVar93;
      pvVar98 = (void *)0x0;
      do {
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        if (iVar114 == 4) {
          auVar206 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar206,auVar206));
LAB_00399211:
          auVar251 = auVar116._0_28_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar116._0_32_,1);
        }
        else {
          auVar206._4_4_ = fVar179;
          auVar206._0_4_ = fVar179;
          auVar206._8_4_ = fVar179;
          auVar206._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20));
            goto LAB_00399211;
          }
          auVar251._4_4_ = fVar179;
          auVar251._0_4_ = fVar179;
          auVar251._8_4_ = fVar179;
          auVar251._12_4_ = fVar179;
          auVar251._16_4_ = fVar179;
          auVar251._20_4_ = fVar179;
          auVar251._24_4_ = fVar179;
          auVar116 = ZEXT3264(CONCAT428(fVar179,auVar251));
          if (iVar114 != 0x10) goto LAB_00399211;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar111 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vmulps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          auVar285._0_4_ = auVar251._0_4_ * *(float *)*pauVar109;
          auVar285._4_4_ = auVar251._4_4_ * *(float *)(*pauVar109 + 4);
          auVar285._8_4_ = auVar251._8_4_ * *(float *)(*pauVar109 + 8);
          auVar285._12_4_ = auVar251._12_4_ * *(float *)(*pauVar109 + 0xc);
          auVar285._16_4_ = auVar251._16_4_ * *(float *)(*pauVar109 + 0x10);
          auVar285._20_4_ = auVar251._20_4_ * *(float *)(*pauVar109 + 0x14);
          auVar285._28_36_ = auVar116._28_36_;
          auVar285._24_4_ = auVar251._24_4_ * *(float *)(*pauVar109 + 0x18);
          auVar116 = ZEXT3264(auVar285._0_32_);
          *(undefined1 (*) [32])*pauVar111 = auVar285._0_32_;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar241._0_4_ = auVar206._0_4_ * *(float *)*pauVar109;
          auVar241._4_4_ = auVar206._4_4_ * *(float *)(*pauVar109 + 4);
          auVar241._8_4_ = auVar206._8_4_ * *(float *)(*pauVar109 + 8);
          auVar241._12_4_ = auVar206._12_4_ * *(float *)(*pauVar109 + 0xc);
          *(undefined1 (*) [16])*pauVar111 = auVar241;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 fVar179 * *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if (0 < (int)uVar94 && ((int)local_1a0 == 2 && iVar95 == 3)) {
      local_210 = (void *)CONCAT44(local_210._4_4_,(int)local_1a0);
      uVar107 = iVar114 * iVar93;
      auVar71._4_4_ = local_1a0._4_4_;
      auVar71._0_4_ = (int)local_1a0;
      auVar71._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar71,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar96) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar207 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar207,auVar207));
LAB_003993e0:
              auVar252 = auVar116._0_28_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar116._0_32_,1);
            }
            else {
              auVar207._4_4_ = fVar179;
              auVar207._0_4_ = fVar179;
              auVar207._8_4_ = fVar179;
              auVar207._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_003993e0;
              }
              auVar252._4_4_ = fVar179;
              auVar252._0_4_ = fVar179;
              auVar252._8_4_ = fVar179;
              auVar252._12_4_ = fVar179;
              auVar252._16_4_ = fVar179;
              auVar252._20_4_ = fVar179;
              auVar252._24_4_ = fVar179;
              auVar116 = ZEXT3264(CONCAT428(fVar179,auVar252));
              if (iVar114 != 0x10) goto LAB_003993e0;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vmulps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              auVar286._0_4_ = auVar252._0_4_ * *(float *)*pauVar109;
              auVar286._4_4_ = auVar252._4_4_ * *(float *)(*pauVar109 + 4);
              auVar286._8_4_ = auVar252._8_4_ * *(float *)(*pauVar109 + 8);
              auVar286._12_4_ = auVar252._12_4_ * *(float *)(*pauVar109 + 0xc);
              auVar286._16_4_ = auVar252._16_4_ * *(float *)(*pauVar109 + 0x10);
              auVar286._20_4_ = auVar252._20_4_ * *(float *)(*pauVar109 + 0x14);
              auVar286._28_36_ = auVar116._28_36_;
              auVar286._24_4_ = auVar252._24_4_ * *(float *)(*pauVar109 + 0x18);
              auVar116 = ZEXT3264(auVar286._0_32_);
              *(undefined1 (*) [32])*pauVar111 = auVar286._0_32_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar242._0_4_ = auVar207._0_4_ * *(float *)*pauVar109;
              auVar242._4_4_ = auVar207._4_4_ * *(float *)(*pauVar109 + 4);
              auVar242._8_4_ = auVar207._8_4_ * *(float *)(*pauVar109 + 8);
              auVar242._12_4_ = auVar207._12_4_ * *(float *)(*pauVar109 + 0xc);
              *(undefined1 (*) [16])*pauVar111 = auVar242;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar106 = 0;
              lVar115 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     fVar179 * *(float *)(*pauVar109 + lVar106 * 4);
                lVar115 = lVar115 + -4;
                lVar106 = lVar106 + 1;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != uVar97);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if ((iVar95 == 4) && ((int)local_1a0 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      local_210 = (void *)CONCAT44(local_210._4_4_,2);
      uVar107 = iVar114 * iVar93 * uVar96;
      auVar72._4_4_ = local_1a0._4_4_;
      auVar72._0_4_ = 2;
      auVar72._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar72,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar208 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar208,auVar208));
LAB_003995a9:
              auVar253 = auVar116._0_28_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar116._0_32_,1);
            }
            else {
              auVar208._4_4_ = fVar179;
              auVar208._0_4_ = fVar179;
              auVar208._8_4_ = fVar179;
              auVar208._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_003995a9;
              }
              auVar253._4_4_ = fVar179;
              auVar253._0_4_ = fVar179;
              auVar253._8_4_ = fVar179;
              auVar253._12_4_ = fVar179;
              auVar253._16_4_ = fVar179;
              auVar253._20_4_ = fVar179;
              auVar253._24_4_ = fVar179;
              auVar116 = ZEXT3264(CONCAT428(fVar179,auVar253));
              if (iVar114 != 0x10) goto LAB_003995a9;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vmulps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              auVar287._0_4_ = auVar253._0_4_ * *(float *)*pauVar109;
              auVar287._4_4_ = auVar253._4_4_ * *(float *)(*pauVar109 + 4);
              auVar287._8_4_ = auVar253._8_4_ * *(float *)(*pauVar109 + 8);
              auVar287._12_4_ = auVar253._12_4_ * *(float *)(*pauVar109 + 0xc);
              auVar287._16_4_ = auVar253._16_4_ * *(float *)(*pauVar109 + 0x10);
              auVar287._20_4_ = auVar253._20_4_ * *(float *)(*pauVar109 + 0x14);
              auVar287._28_36_ = auVar116._28_36_;
              auVar287._24_4_ = auVar253._24_4_ * *(float *)(*pauVar109 + 0x18);
              auVar116 = ZEXT3264(auVar287._0_32_);
              *(undefined1 (*) [32])*pauVar111 = auVar287._0_32_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar243._0_4_ = auVar208._0_4_ * *(float *)*pauVar109;
              auVar243._4_4_ = auVar208._4_4_ * *(float *)(*pauVar109 + 4);
              auVar243._8_4_ = auVar208._8_4_ * *(float *)(*pauVar109 + 8);
              auVar243._12_4_ = auVar208._12_4_ * *(float *)(*pauVar109 + 0xc);
              *(undefined1 (*) [16])*pauVar111 = auVar243;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar115 = 0;
              lVar106 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     fVar179 * *(float *)(*pauVar109 + lVar106 * 4);
                lVar106 = lVar106 + 1;
                lVar115 = lVar115 + -4;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_1a0 == 3 && iVar95 == 4) && 0 < (int)uVar94) {
      uVar94 = iVar93 * iVar114;
      auVar73._4_4_ = local_1a0._4_4_;
      auVar73._0_4_ = (int)local_1a0;
      auVar73._8_8_ = uStack_198;
      iVar93 = vextractps_avx(auVar73,1);
      local_1d0 = local_1d0 * (long)local_1e8;
      local_210 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_210 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_210 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            if (0 < (int)uVar96) {
              lVar103 = (long)iVar93 * (long)local_1e8 * uVar108 + local_1d0 * (long)local_210;
              uVar112 = 0;
              do {
                fVar179 = *(float *)((long)local_228 + uVar112 * 4 + lVar103);
                if (iVar114 == 4) {
                  auVar209 = *(undefined1 (*) [16])((long)local_228 + uVar112 * 0x10 + lVar103);
                  auVar116 = ZEXT3264(CONCAT1616(auVar209,auVar209));
LAB_003997a0:
                  auVar254 = auVar116._0_28_;
                  auVar116 = vinserti64x4_avx512f(auVar116,auVar116._0_32_,1);
                }
                else {
                  auVar209._4_4_ = fVar179;
                  auVar209._0_4_ = fVar179;
                  auVar209._8_4_ = fVar179;
                  auVar209._12_4_ = fVar179;
                  if (iVar114 == 8) {
                    auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)local_228 + uVar112 * 0x20 + lVar103));
                    goto LAB_003997a0;
                  }
                  auVar254._4_4_ = fVar179;
                  auVar254._0_4_ = fVar179;
                  auVar254._8_4_ = fVar179;
                  auVar254._12_4_ = fVar179;
                  auVar254._16_4_ = fVar179;
                  auVar254._20_4_ = fVar179;
                  auVar254._24_4_ = fVar179;
                  auVar116 = ZEXT3264(CONCAT428(fVar179,auVar254));
                  if (iVar114 != 0x10) goto LAB_003997a0;
                  auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_228 + uVar112 * 0x40 + lVar103));
                }
                uVar107 = 0;
                if (0xf < (int)uVar94) {
                  iVar95 = 0xf;
                  do {
                    auVar117 = vmulps_avx512f(auVar116,*pauVar109);
                    *pauVar111 = auVar117;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    iVar95 = iVar95 + 0x10;
                    uVar107 = uVar94 & 0xfffffff0;
                  } while (iVar95 < (int)uVar94);
                }
                uVar101 = uVar107 | 7;
                while ((int)uVar101 < (int)uVar94) {
                  auVar288._0_4_ = auVar254._0_4_ * *(float *)*pauVar109;
                  auVar288._4_4_ = auVar254._4_4_ * *(float *)(*pauVar109 + 4);
                  auVar288._8_4_ = auVar254._8_4_ * *(float *)(*pauVar109 + 8);
                  auVar288._12_4_ = auVar254._12_4_ * *(float *)(*pauVar109 + 0xc);
                  auVar288._16_4_ = auVar254._16_4_ * *(float *)(*pauVar109 + 0x10);
                  auVar288._20_4_ = auVar254._20_4_ * *(float *)(*pauVar109 + 0x14);
                  auVar288._28_36_ = auVar116._28_36_;
                  auVar288._24_4_ = auVar254._24_4_ * *(float *)(*pauVar109 + 0x18);
                  auVar116 = ZEXT3264(auVar288._0_32_);
                  *(undefined1 (*) [32])*pauVar111 = auVar288._0_32_;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                  uVar101 = uVar107 + 0xf;
                  uVar107 = uVar107 + 8;
                }
                uVar101 = uVar107 | 3;
                while ((int)uVar101 < (int)uVar94) {
                  auVar244._0_4_ = auVar209._0_4_ * *(float *)*pauVar109;
                  auVar244._4_4_ = auVar209._4_4_ * *(float *)(*pauVar109 + 4);
                  auVar244._8_4_ = auVar209._8_4_ * *(float *)(*pauVar109 + 8);
                  auVar244._12_4_ = auVar209._12_4_ * *(float *)(*pauVar109 + 0xc);
                  *(undefined1 (*) [16])*pauVar111 = auVar244;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                  uVar101 = uVar107 + 7;
                  uVar107 = uVar107 + 4;
                }
                if (uVar94 - uVar107 != 0 && (int)uVar107 <= (int)uVar94) {
                  lVar115 = 0;
                  lVar106 = 0;
                  do {
                    *(float *)((long)*pauVar111 + lVar106 * 4) =
                         fVar179 * *(float *)(*pauVar109 + lVar106 * 4);
                    lVar106 = lVar106 + 1;
                    lVar115 = lVar115 + -4;
                  } while (uVar94 - uVar107 != (int)lVar106);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                }
                uVar112 = uVar112 + 1;
              } while (uVar112 != uVar97);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        local_210 = (void *)((long)local_210 + 1);
        local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      } while (local_210 != local_218);
    }
    break;
  case 3:
    iVar93 = local_220->w;
    uVar96 = local_220->h;
    uVar97 = (ulong)uVar96;
    uVar105 = local_220->d;
    local_1e0._0_8_ = CONCAT44(0,uVar105);
    uVar94 = local_220->c;
    local_218 = (void *)(ulong)uVar94;
    iVar114 = local_220->elempack;
    iVar95 = local_220->dims;
    if (0 < (int)uVar96 && ((int)local_1a0 == 1 && iVar95 == 2)) {
      uVar107 = iVar114 * iVar93;
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar230._8_4_ = 0x3f800000;
      auVar230._0_8_ = 0x3f8000003f800000;
      auVar230._12_4_ = 0x3f800000;
      auVar230._16_4_ = 0x3f800000;
      auVar230._20_4_ = 0x3f800000;
      auVar230._24_4_ = 0x3f800000;
      auVar230._28_4_ = 0x3f800000;
      uVar108 = 0;
      auVar245._8_4_ = 0x3f800000;
      auVar245._0_8_ = 0x3f8000003f800000;
      auVar245._12_4_ = 0x3f800000;
      do {
        fVar179 = *(float *)((long)local_228 + uVar108 * 4);
        if (iVar114 == 4) {
          auVar294 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10);
          auVar117 = ZEXT3264(CONCAT1616(auVar294,auVar294));
LAB_0039995f:
          auVar304 = auVar117._0_32_;
          auVar117 = vinserti64x4_avx512f(auVar117,auVar304,1);
        }
        else {
          auVar294._4_4_ = fVar179;
          auVar294._0_4_ = fVar179;
          auVar294._8_4_ = fVar179;
          auVar294._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar117 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + uVar108 * 0x20));
            goto LAB_0039995f;
          }
          auVar304._4_4_ = fVar179;
          auVar304._0_4_ = fVar179;
          auVar304._8_4_ = fVar179;
          auVar304._12_4_ = fVar179;
          auVar304._16_4_ = fVar179;
          auVar304._20_4_ = fVar179;
          auVar304._24_4_ = fVar179;
          auVar304._28_4_ = fVar179;
          auVar117 = ZEXT3264(auVar304);
          if (iVar114 != 0x10) goto LAB_0039995f;
          auVar117 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_228 + uVar108 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * uVar108 * local_220->elemsize + (long)local_220->data);
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_1f8->w * uVar108 * local_1f8->elemsize + (long)local_1f8->data);
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          auVar118 = vrcp14ps_avx512f(auVar117);
          auVar117 = vfmsub213ps_avx512f(auVar117,auVar118,auVar116);
          auVar117 = vfnmadd132ps_avx512vl(auVar117,auVar118,auVar118);
          iVar95 = 0xf;
          do {
            auVar118 = vmulps_avx512f(auVar117,*pauVar109);
            *pauVar111 = auVar118;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        if ((int)(uVar101 | 7) < (int)uVar107) {
          auVar180 = vrcpps_avx(auVar304);
          auVar1 = vfmsub213ps_fma(auVar304,auVar180,auVar230);
          auVar1 = vfnmadd132ps_fma(ZEXT1632(auVar1),auVar180,auVar180);
          uVar100 = uVar101;
          do {
            auVar53._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
            auVar53._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
            auVar53._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
            auVar53._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
            auVar53._16_4_ = *(float *)(*pauVar109 + 0x10) * 0.0;
            auVar53._20_4_ = *(float *)(*pauVar109 + 0x14) * 0.0;
            auVar53._24_4_ = *(float *)(*pauVar109 + 0x18) * 0.0;
            auVar53._28_4_ = auVar180._28_4_;
            *(undefined1 (*) [32])*pauVar111 = auVar53;
            pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
            pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
            uVar101 = uVar100 + 8;
            iVar95 = uVar100 + 0xf;
            uVar100 = uVar101;
            auVar180 = auVar53;
          } while (iVar95 < (int)uVar107);
        }
        if ((int)(uVar101 | 3) < (int)uVar107) {
          auVar1 = vrcpps_avx(auVar294);
          auVar36 = vfmsub213ps_fma(auVar294,auVar1,auVar245);
          auVar1 = vfnmadd132ps_fma(auVar36,auVar1,auVar1);
          uVar100 = uVar101;
          do {
            auVar299._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
            auVar299._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
            auVar299._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
            auVar299._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
            *(undefined1 (*) [16])*pauVar111 = auVar299;
            pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
            pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
            uVar101 = uVar100 + 4;
            iVar95 = uVar100 + 7;
            uVar100 = uVar101;
          } while (iVar95 < (int)uVar107);
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 (1.0 / fVar179) * *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        uVar108 = uVar108 + 1;
      } while (uVar108 != uVar97);
      iVar95 = local_220->dims;
    }
    if ((iVar95 - 3U < 2) && ((int)local_1a0 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      uVar107 = uVar96 * uVar105 * iVar114 * iVar93;
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar231._8_4_ = 0x3f800000;
      auVar231._0_8_ = 0x3f8000003f800000;
      auVar231._12_4_ = 0x3f800000;
      auVar231._16_4_ = 0x3f800000;
      auVar231._20_4_ = 0x3f800000;
      auVar231._24_4_ = 0x3f800000;
      auVar231._28_4_ = 0x3f800000;
      pvVar98 = (void *)0x0;
      auVar246._8_4_ = 0x3f800000;
      auVar246._0_8_ = 0x3f8000003f800000;
      auVar246._12_4_ = 0x3f800000;
      do {
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        if (iVar114 == 4) {
          auVar295 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar117 = ZEXT3264(CONCAT1616(auVar295,auVar295));
LAB_00399b32:
          auVar305 = auVar117._0_32_;
          auVar117 = vinserti64x4_avx512f(auVar117,auVar305,1);
        }
        else {
          auVar295._4_4_ = fVar179;
          auVar295._0_4_ = fVar179;
          auVar295._8_4_ = fVar179;
          auVar295._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar117 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20));
            goto LAB_00399b32;
          }
          auVar305._4_4_ = fVar179;
          auVar305._0_4_ = fVar179;
          auVar305._8_4_ = fVar179;
          auVar305._12_4_ = fVar179;
          auVar305._16_4_ = fVar179;
          auVar305._20_4_ = fVar179;
          auVar305._24_4_ = fVar179;
          auVar305._28_4_ = fVar179;
          auVar117 = ZEXT3264(auVar305);
          if (iVar114 != 0x10) goto LAB_00399b32;
          auVar117 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar111 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          auVar118 = vrcp14ps_avx512f(auVar117);
          auVar117 = vfmsub213ps_avx512f(auVar117,auVar118,auVar116);
          auVar117 = vfnmadd132ps_avx512vl(auVar117,auVar118,auVar118);
          iVar95 = 0xf;
          do {
            auVar118 = vmulps_avx512f(auVar117,*pauVar109);
            *pauVar111 = auVar118;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        if ((int)(uVar101 | 7) < (int)uVar107) {
          auVar180 = vrcpps_avx(auVar305);
          auVar1 = vfmsub213ps_fma(auVar305,auVar180,auVar231);
          auVar1 = vfnmadd132ps_fma(ZEXT1632(auVar1),auVar180,auVar180);
          uVar100 = uVar101;
          do {
            auVar54._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
            auVar54._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
            auVar54._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
            auVar54._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
            auVar54._16_4_ = *(float *)(*pauVar109 + 0x10) * 0.0;
            auVar54._20_4_ = *(float *)(*pauVar109 + 0x14) * 0.0;
            auVar54._24_4_ = *(float *)(*pauVar109 + 0x18) * 0.0;
            auVar54._28_4_ = auVar180._28_4_;
            *(undefined1 (*) [32])*pauVar111 = auVar54;
            pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
            pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
            uVar101 = uVar100 + 8;
            iVar95 = uVar100 + 0xf;
            uVar100 = uVar101;
            auVar180 = auVar54;
          } while (iVar95 < (int)uVar107);
        }
        if ((int)(uVar101 | 3) < (int)uVar107) {
          auVar1 = vrcpps_avx(auVar295);
          auVar36 = vfmsub213ps_fma(auVar295,auVar1,auVar246);
          auVar1 = vfnmadd132ps_fma(auVar36,auVar1,auVar1);
          uVar100 = uVar101;
          do {
            auVar300._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
            auVar300._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
            auVar300._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
            auVar300._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
            *(undefined1 (*) [16])*pauVar111 = auVar300;
            pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
            pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
            uVar101 = uVar100 + 4;
            iVar95 = uVar100 + 7;
            uVar100 = uVar101;
          } while (iVar95 < (int)uVar107);
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 (1.0 / fVar179) * *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if (0 < (int)uVar94 && ((int)local_1a0 == 2 && iVar95 == 3)) {
      local_210 = (void *)CONCAT44(local_210._4_4_,(int)local_1a0);
      uVar107 = iVar114 * iVar93;
      auVar74._4_4_ = local_1a0._4_4_;
      auVar74._0_4_ = (int)local_1a0;
      auVar74._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar74,1);
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar232._8_4_ = 0x3f800000;
      auVar232._0_8_ = 0x3f8000003f800000;
      auVar232._12_4_ = 0x3f800000;
      auVar232._16_4_ = 0x3f800000;
      auVar232._20_4_ = 0x3f800000;
      auVar232._24_4_ = 0x3f800000;
      auVar232._28_4_ = 0x3f800000;
      pvVar98 = (void *)0x0;
      auVar247._8_4_ = 0x3f800000;
      auVar247._0_8_ = 0x3f8000003f800000;
      auVar247._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar96) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar296 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar117 = ZEXT3264(CONCAT1616(auVar296,auVar296));
LAB_00399d59:
              auVar306 = auVar117._0_32_;
              auVar117 = vinserti64x4_avx512f(auVar117,auVar306,1);
            }
            else {
              auVar296._4_4_ = fVar179;
              auVar296._0_4_ = fVar179;
              auVar296._8_4_ = fVar179;
              auVar296._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar117 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_00399d59;
              }
              auVar306._4_4_ = fVar179;
              auVar306._0_4_ = fVar179;
              auVar306._8_4_ = fVar179;
              auVar306._12_4_ = fVar179;
              auVar306._16_4_ = fVar179;
              auVar306._20_4_ = fVar179;
              auVar306._24_4_ = fVar179;
              auVar306._28_4_ = fVar179;
              auVar117 = ZEXT3264(auVar306);
              if (iVar114 != 0x10) goto LAB_00399d59;
              auVar117 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              auVar118 = vrcp14ps_avx512f(auVar117);
              auVar117 = vfmsub213ps_avx512f(auVar117,auVar118,auVar116);
              auVar117 = vfnmadd132ps_avx512vl(auVar117,auVar118,auVar118);
              iVar104 = 0xf;
              do {
                auVar118 = vmulps_avx512f(auVar117,*pauVar109);
                *pauVar111 = auVar118;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            if ((int)(uVar101 | 7) < (int)uVar107) {
              auVar180 = vrcpps_avx(auVar306);
              auVar1 = vfmsub213ps_fma(auVar306,auVar180,auVar232);
              auVar1 = vfnmadd132ps_fma(ZEXT1632(auVar1),auVar180,auVar180);
              uVar100 = uVar101;
              do {
                auVar55._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
                auVar55._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
                auVar55._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
                auVar55._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
                auVar55._16_4_ = *(float *)(*pauVar109 + 0x10) * 0.0;
                auVar55._20_4_ = *(float *)(*pauVar109 + 0x14) * 0.0;
                auVar55._24_4_ = *(float *)(*pauVar109 + 0x18) * 0.0;
                auVar55._28_4_ = auVar180._28_4_;
                *(undefined1 (*) [32])*pauVar111 = auVar55;
                pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                uVar101 = uVar100 + 8;
                iVar104 = uVar100 + 0xf;
                uVar100 = uVar101;
                auVar180 = auVar55;
              } while (iVar104 < (int)uVar107);
            }
            if ((int)(uVar101 | 3) < (int)uVar107) {
              auVar1 = vrcpps_avx(auVar296);
              auVar36 = vfmsub213ps_fma(auVar296,auVar1,auVar247);
              auVar1 = vfnmadd132ps_fma(auVar36,auVar1,auVar1);
              uVar100 = uVar101;
              do {
                auVar301._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
                auVar301._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
                auVar301._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
                auVar301._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
                *(undefined1 (*) [16])*pauVar111 = auVar301;
                pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                uVar101 = uVar100 + 4;
                iVar104 = uVar100 + 7;
                uVar100 = uVar101;
              } while (iVar104 < (int)uVar107);
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar106 = 0;
              lVar115 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     (1.0 / fVar179) * *(float *)(*pauVar109 + lVar106 * 4);
                lVar115 = lVar115 + -4;
                lVar106 = lVar106 + 1;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != uVar97);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if ((iVar95 == 4) && ((int)local_1a0 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      local_210 = (void *)CONCAT44(local_210._4_4_,2);
      uVar107 = iVar114 * iVar93 * uVar96;
      auVar75._4_4_ = local_1a0._4_4_;
      auVar75._0_4_ = 2;
      auVar75._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar75,1);
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar233._8_4_ = 0x3f800000;
      auVar233._0_8_ = 0x3f8000003f800000;
      auVar233._12_4_ = 0x3f800000;
      auVar233._16_4_ = 0x3f800000;
      auVar233._20_4_ = 0x3f800000;
      auVar233._24_4_ = 0x3f800000;
      auVar233._28_4_ = 0x3f800000;
      pvVar98 = (void *)0x0;
      auVar248._8_4_ = 0x3f800000;
      auVar248._0_8_ = 0x3f8000003f800000;
      auVar248._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar105) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar297 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar117 = ZEXT3264(CONCAT1616(auVar297,auVar297));
LAB_00399f7a:
              auVar307 = auVar117._0_32_;
              auVar117 = vinserti64x4_avx512f(auVar117,auVar307,1);
            }
            else {
              auVar297._4_4_ = fVar179;
              auVar297._0_4_ = fVar179;
              auVar297._8_4_ = fVar179;
              auVar297._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar117 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_00399f7a;
              }
              auVar307._4_4_ = fVar179;
              auVar307._0_4_ = fVar179;
              auVar307._8_4_ = fVar179;
              auVar307._12_4_ = fVar179;
              auVar307._16_4_ = fVar179;
              auVar307._20_4_ = fVar179;
              auVar307._24_4_ = fVar179;
              auVar307._28_4_ = fVar179;
              auVar117 = ZEXT3264(auVar307);
              if (iVar114 != 0x10) goto LAB_00399f7a;
              auVar117 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              auVar118 = vrcp14ps_avx512f(auVar117);
              auVar117 = vfmsub213ps_avx512f(auVar117,auVar118,auVar116);
              auVar117 = vfnmadd132ps_avx512vl(auVar117,auVar118,auVar118);
              iVar104 = 0xf;
              do {
                auVar118 = vmulps_avx512f(auVar117,*pauVar109);
                *pauVar111 = auVar118;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            if ((int)(uVar101 | 7) < (int)uVar107) {
              auVar180 = vrcpps_avx(auVar307);
              auVar1 = vfmsub213ps_fma(auVar307,auVar180,auVar233);
              auVar1 = vfnmadd132ps_fma(ZEXT1632(auVar1),auVar180,auVar180);
              uVar100 = uVar101;
              do {
                auVar56._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
                auVar56._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
                auVar56._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
                auVar56._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
                auVar56._16_4_ = *(float *)(*pauVar109 + 0x10) * 0.0;
                auVar56._20_4_ = *(float *)(*pauVar109 + 0x14) * 0.0;
                auVar56._24_4_ = *(float *)(*pauVar109 + 0x18) * 0.0;
                auVar56._28_4_ = auVar180._28_4_;
                *(undefined1 (*) [32])*pauVar111 = auVar56;
                pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                uVar101 = uVar100 + 8;
                iVar104 = uVar100 + 0xf;
                uVar100 = uVar101;
                auVar180 = auVar56;
              } while (iVar104 < (int)uVar107);
            }
            if ((int)(uVar101 | 3) < (int)uVar107) {
              auVar1 = vrcpps_avx(auVar297);
              auVar36 = vfmsub213ps_fma(auVar297,auVar1,auVar248);
              auVar1 = vfnmadd132ps_fma(auVar36,auVar1,auVar1);
              uVar100 = uVar101;
              do {
                auVar302._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
                auVar302._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
                auVar302._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
                auVar302._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
                *(undefined1 (*) [16])*pauVar111 = auVar302;
                pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                uVar101 = uVar100 + 4;
                iVar104 = uVar100 + 7;
                uVar100 = uVar101;
              } while (iVar104 < (int)uVar107);
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar115 = 0;
              lVar106 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     (1.0 / fVar179) * *(float *)(*pauVar109 + lVar106 * 4);
                lVar106 = lVar106 + 1;
                lVar115 = lVar115 + -4;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_1a0 == 3 && iVar95 == 4) && 0 < (int)uVar94) {
      uVar94 = iVar93 * iVar114;
      local_1d0 = local_1d0 * (long)local_1e8;
      auVar76._4_4_ = local_1a0._4_4_;
      auVar76._0_4_ = (int)local_1a0;
      auVar76._8_8_ = uStack_198;
      iVar93 = vextractps_avx(auVar76,1);
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar234._8_4_ = 0x3f800000;
      auVar234._0_8_ = 0x3f8000003f800000;
      auVar234._12_4_ = 0x3f800000;
      auVar234._16_4_ = 0x3f800000;
      auVar234._20_4_ = 0x3f800000;
      auVar234._24_4_ = 0x3f800000;
      auVar234._28_4_ = 0x3f800000;
      local_210 = (void *)0x0;
      auVar249._8_4_ = 0x3f800000;
      auVar249._0_8_ = 0x3f8000003f800000;
      auVar249._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar105) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_210 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_210 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            if (0 < (int)uVar96) {
              lVar103 = (long)iVar93 * (long)local_1e8 * uVar108 + local_1d0 * (long)local_210;
              uVar112 = 0;
              do {
                fVar179 = *(float *)((long)local_228 + uVar112 * 4 + lVar103);
                if (iVar114 == 4) {
                  auVar298 = *(undefined1 (*) [16])((long)local_228 + uVar112 * 0x10 + lVar103);
                  auVar117 = ZEXT3264(CONCAT1616(auVar298,auVar298));
LAB_0039a1cd:
                  auVar308 = auVar117._0_32_;
                  auVar117 = vinserti64x4_avx512f(auVar117,auVar308,1);
                }
                else {
                  auVar298._4_4_ = fVar179;
                  auVar298._0_4_ = fVar179;
                  auVar298._8_4_ = fVar179;
                  auVar298._12_4_ = fVar179;
                  if (iVar114 == 8) {
                    auVar117 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)local_228 + uVar112 * 0x20 + lVar103));
                    goto LAB_0039a1cd;
                  }
                  auVar308._4_4_ = fVar179;
                  auVar308._0_4_ = fVar179;
                  auVar308._8_4_ = fVar179;
                  auVar308._12_4_ = fVar179;
                  auVar308._16_4_ = fVar179;
                  auVar308._20_4_ = fVar179;
                  auVar308._24_4_ = fVar179;
                  auVar308._28_4_ = fVar179;
                  auVar117 = ZEXT3264(auVar308);
                  if (iVar114 != 0x10) goto LAB_0039a1cd;
                  auVar117 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_228 + uVar112 * 0x40 + lVar103));
                }
                uVar107 = 0;
                if (0xf < (int)uVar94) {
                  auVar118 = vrcp14ps_avx512f(auVar117);
                  auVar117 = vfmsub213ps_avx512f(auVar117,auVar118,auVar116);
                  auVar117 = vfnmadd132ps_avx512vl(auVar117,auVar118,auVar118);
                  iVar95 = 0xf;
                  do {
                    auVar118 = vmulps_avx512f(auVar117,*pauVar109);
                    *pauVar111 = auVar118;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    iVar95 = iVar95 + 0x10;
                    uVar107 = uVar94 & 0xfffffff0;
                  } while (iVar95 < (int)uVar94);
                }
                if ((int)(uVar107 | 7) < (int)uVar94) {
                  auVar180 = vrcpps_avx(auVar308);
                  auVar1 = vfmsub213ps_fma(auVar308,auVar180,auVar234);
                  auVar1 = vfnmadd132ps_fma(ZEXT1632(auVar1),auVar180,auVar180);
                  uVar101 = uVar107;
                  do {
                    auVar57._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
                    auVar57._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
                    auVar57._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
                    auVar57._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
                    auVar57._16_4_ = *(float *)(*pauVar109 + 0x10) * 0.0;
                    auVar57._20_4_ = *(float *)(*pauVar109 + 0x14) * 0.0;
                    auVar57._24_4_ = *(float *)(*pauVar109 + 0x18) * 0.0;
                    auVar57._28_4_ = auVar180._28_4_;
                    *(undefined1 (*) [32])*pauVar111 = auVar57;
                    pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                    pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                    uVar107 = uVar101 + 8;
                    iVar95 = uVar101 + 0xf;
                    uVar101 = uVar107;
                    auVar180 = auVar57;
                  } while (iVar95 < (int)uVar94);
                }
                if ((int)(uVar107 | 3) < (int)uVar94) {
                  auVar1 = vrcpps_avx(auVar298);
                  auVar36 = vfmsub213ps_fma(auVar298,auVar1,auVar249);
                  auVar1 = vfnmadd132ps_fma(auVar36,auVar1,auVar1);
                  uVar101 = uVar107;
                  do {
                    auVar303._0_4_ = auVar1._0_4_ * *(float *)*pauVar109;
                    auVar303._4_4_ = auVar1._4_4_ * *(float *)(*pauVar109 + 4);
                    auVar303._8_4_ = auVar1._8_4_ * *(float *)(*pauVar109 + 8);
                    auVar303._12_4_ = auVar1._12_4_ * *(float *)(*pauVar109 + 0xc);
                    *(undefined1 (*) [16])*pauVar111 = auVar303;
                    pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                    pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                    uVar107 = uVar101 + 4;
                    iVar95 = uVar101 + 7;
                    uVar101 = uVar107;
                  } while (iVar95 < (int)uVar94);
                }
                if (uVar94 - uVar107 != 0 && (int)uVar107 <= (int)uVar94) {
                  lVar115 = 0;
                  lVar106 = 0;
                  do {
                    *(float *)((long)*pauVar111 + lVar106 * 4) =
                         (1.0 / fVar179) * *(float *)(*pauVar109 + lVar106 * 4);
                    lVar106 = lVar106 + 1;
                    lVar115 = lVar115 + -4;
                  } while (uVar94 - uVar107 != (int)lVar106);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                }
                uVar112 = uVar112 + 1;
              } while (uVar112 != uVar97);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        local_210 = (void *)((long)local_210 + 1);
        local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      } while (local_210 != local_218);
    }
    break;
  case 4:
    iVar93 = local_220->w;
    uVar96 = local_220->h;
    uVar97 = (ulong)uVar96;
    uVar105 = local_220->d;
    local_1e0._0_8_ = CONCAT44(0,uVar105);
    uVar94 = local_220->c;
    local_218 = (void *)(ulong)uVar94;
    iVar114 = local_220->elempack;
    iVar95 = local_220->dims;
    if (0 < (int)uVar96 && ((int)local_1a0 == 1 && iVar95 == 2)) {
      uVar107 = iVar114 * iVar93;
      uVar108 = 0;
      do {
        uVar101 = *(uint *)((long)local_228 + uVar108 * 4);
        if (iVar114 == 4) {
          auVar200 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar200,auVar200));
LAB_00398570:
          auVar260 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar260,1);
        }
        else {
          auVar200._4_4_ = uVar101;
          auVar200._0_4_ = uVar101;
          auVar200._8_4_ = uVar101;
          auVar200._12_4_ = uVar101;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + uVar108 * 0x20));
            goto LAB_00398570;
          }
          auVar260._4_4_ = uVar101;
          auVar260._0_4_ = uVar101;
          auVar260._8_4_ = uVar101;
          auVar260._12_4_ = uVar101;
          auVar260._16_4_ = uVar101;
          auVar260._20_4_ = uVar101;
          auVar260._24_4_ = uVar101;
          auVar260._28_4_ = uVar101;
          auVar116 = ZEXT3264(auVar260);
          if (iVar114 != 0x10) goto LAB_00398570;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_228 + uVar108 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * uVar108 * local_220->elemsize + (long)local_220->data);
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_1f8->w * uVar108 * local_1f8->elemsize + (long)local_1f8->data);
        uVar100 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vmaxps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar100 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar99 = uVar100 | 7;
        while ((int)uVar99 < (int)uVar107) {
          auVar180 = vmaxps_avx(auVar260,*(undefined1 (*) [32])*pauVar109);
          *(undefined1 (*) [32])*pauVar111 = auVar180;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar99 = uVar100 + 0xf;
          uVar100 = uVar100 + 8;
        }
        uVar99 = uVar100 | 3;
        while ((int)uVar99 < (int)uVar107) {
          auVar1 = vmaxps_avx(auVar200,*(undefined1 (*) [16])*pauVar109);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar99 = uVar100 + 7;
          uVar100 = uVar100 + 4;
        }
        if (uVar107 - uVar100 != 0 && (int)uVar100 <= (int)uVar107) {
          lVar103 = 0;
          do {
            auVar1 = vmaxss_avx(ZEXT416(uVar101),ZEXT416(*(uint *)(*pauVar109 + lVar103 * 4)));
            *(int *)((long)*pauVar111 + lVar103 * 4) = auVar1._0_4_;
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar100 != (int)lVar103);
        }
        uVar108 = uVar108 + 1;
      } while (uVar108 != uVar97);
      iVar95 = local_220->dims;
    }
    if ((iVar95 - 3U < 2) && ((int)local_1a0 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      uVar107 = uVar96 * uVar105 * iVar114 * iVar93;
      pvVar98 = (void *)0x0;
      do {
        uVar101 = *(uint *)((long)local_228 + (long)pvVar98 * 4);
        if (iVar114 == 4) {
          auVar201 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar201,auVar201));
LAB_003986eb:
          auVar261 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar261,1);
        }
        else {
          auVar201._4_4_ = uVar101;
          auVar201._0_4_ = uVar101;
          auVar201._8_4_ = uVar101;
          auVar201._12_4_ = uVar101;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20));
            goto LAB_003986eb;
          }
          auVar261._4_4_ = uVar101;
          auVar261._0_4_ = uVar101;
          auVar261._8_4_ = uVar101;
          auVar261._12_4_ = uVar101;
          auVar261._16_4_ = uVar101;
          auVar261._20_4_ = uVar101;
          auVar261._24_4_ = uVar101;
          auVar261._28_4_ = uVar101;
          auVar116 = ZEXT3264(auVar261);
          if (iVar114 != 0x10) goto LAB_003986eb;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar111 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar100 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vmaxps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar100 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar99 = uVar100 | 7;
        while ((int)uVar99 < (int)uVar107) {
          auVar180 = vmaxps_avx(auVar261,*(undefined1 (*) [32])*pauVar109);
          *(undefined1 (*) [32])*pauVar111 = auVar180;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar99 = uVar100 + 0xf;
          uVar100 = uVar100 + 8;
        }
        uVar99 = uVar100 | 3;
        while ((int)uVar99 < (int)uVar107) {
          auVar1 = vmaxps_avx(auVar201,*(undefined1 (*) [16])*pauVar109);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar99 = uVar100 + 7;
          uVar100 = uVar100 + 4;
        }
        if (uVar107 - uVar100 != 0 && (int)uVar100 <= (int)uVar107) {
          lVar103 = 0;
          do {
            auVar1 = vmaxss_avx(ZEXT416(uVar101),ZEXT416(*(uint *)(*pauVar109 + lVar103 * 4)));
            *(int *)((long)*pauVar111 + lVar103 * 4) = auVar1._0_4_;
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar100 != (int)lVar103);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if (0 < (int)uVar94 && ((int)local_1a0 == 2 && iVar95 == 3)) {
      local_210 = (void *)CONCAT44(local_210._4_4_,(int)local_1a0);
      uVar107 = iVar114 * iVar93;
      auVar68._4_4_ = local_1a0._4_4_;
      auVar68._0_4_ = (int)local_1a0;
      auVar68._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar68,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar96) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            uVar101 = *(uint *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar202 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar202,auVar202));
LAB_003988ba:
              auVar262 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar262,1);
            }
            else {
              auVar202._4_4_ = uVar101;
              auVar202._0_4_ = uVar101;
              auVar202._8_4_ = uVar101;
              auVar202._12_4_ = uVar101;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_003988ba;
              }
              auVar262._4_4_ = uVar101;
              auVar262._0_4_ = uVar101;
              auVar262._8_4_ = uVar101;
              auVar262._12_4_ = uVar101;
              auVar262._16_4_ = uVar101;
              auVar262._20_4_ = uVar101;
              auVar262._24_4_ = uVar101;
              auVar262._28_4_ = uVar101;
              auVar116 = ZEXT3264(auVar262);
              if (iVar114 != 0x10) goto LAB_003988ba;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar100 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vmaxps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar100 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar99 = uVar100 | 7;
            while ((int)uVar99 < (int)uVar107) {
              auVar180 = vmaxps_avx(auVar262,*(undefined1 (*) [32])*pauVar109);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar99 = uVar100 + 0xf;
              uVar100 = uVar100 + 8;
            }
            uVar99 = uVar100 | 3;
            while ((int)uVar99 < (int)uVar107) {
              auVar1 = vmaxps_avx(auVar202,*(undefined1 (*) [16])*pauVar109);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar99 = uVar100 + 7;
              uVar100 = uVar100 + 4;
            }
            if (uVar107 - uVar100 != 0 && (int)uVar100 <= (int)uVar107) {
              lVar106 = 0;
              lVar115 = 0;
              do {
                auVar1 = vmaxss_avx(ZEXT416(uVar101),ZEXT416(*(uint *)(*pauVar109 + lVar106 * 4)));
                *(int *)((long)*pauVar111 + lVar106 * 4) = auVar1._0_4_;
                lVar115 = lVar115 + -4;
                lVar106 = lVar106 + 1;
              } while (uVar107 - uVar100 != (int)lVar106);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != uVar97);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if ((iVar95 == 4) && ((int)local_1a0 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      local_210 = (void *)CONCAT44(local_210._4_4_,2);
      uVar107 = iVar114 * iVar93 * uVar96;
      auVar69._4_4_ = local_1a0._4_4_;
      auVar69._0_4_ = 2;
      auVar69._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar69,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            uVar101 = *(uint *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar203 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar203,auVar203));
LAB_00398a83:
              auVar263 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar263,1);
            }
            else {
              auVar203._4_4_ = uVar101;
              auVar203._0_4_ = uVar101;
              auVar203._8_4_ = uVar101;
              auVar203._12_4_ = uVar101;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_00398a83;
              }
              auVar263._4_4_ = uVar101;
              auVar263._0_4_ = uVar101;
              auVar263._8_4_ = uVar101;
              auVar263._12_4_ = uVar101;
              auVar263._16_4_ = uVar101;
              auVar263._20_4_ = uVar101;
              auVar263._24_4_ = uVar101;
              auVar263._28_4_ = uVar101;
              auVar116 = ZEXT3264(auVar263);
              if (iVar114 != 0x10) goto LAB_00398a83;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar100 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vmaxps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar100 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar99 = uVar100 | 7;
            while ((int)uVar99 < (int)uVar107) {
              auVar180 = vmaxps_avx(auVar263,*(undefined1 (*) [32])*pauVar109);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar99 = uVar100 + 0xf;
              uVar100 = uVar100 + 8;
            }
            uVar99 = uVar100 | 3;
            while ((int)uVar99 < (int)uVar107) {
              auVar1 = vmaxps_avx(auVar203,*(undefined1 (*) [16])*pauVar109);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar99 = uVar100 + 7;
              uVar100 = uVar100 + 4;
            }
            if (uVar107 - uVar100 != 0 && (int)uVar100 <= (int)uVar107) {
              lVar115 = 0;
              lVar106 = 0;
              do {
                auVar1 = vmaxss_avx(ZEXT416(uVar101),ZEXT416(*(uint *)(*pauVar109 + lVar106 * 4)));
                *(int *)((long)*pauVar111 + lVar106 * 4) = auVar1._0_4_;
                lVar106 = lVar106 + 1;
                lVar115 = lVar115 + -4;
              } while (uVar107 - uVar100 != (int)lVar106);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_1a0 == 3 && iVar95 == 4) && 0 < (int)uVar94) {
      uVar94 = iVar93 * iVar114;
      auVar70._4_4_ = local_1a0._4_4_;
      auVar70._0_4_ = (int)local_1a0;
      auVar70._8_8_ = uStack_198;
      iVar93 = vextractps_avx(auVar70,1);
      local_1d0 = local_1d0 * (long)local_1e8;
      local_210 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_210 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_210 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            if (0 < (int)uVar96) {
              lVar103 = (long)iVar93 * (long)local_1e8 * uVar108 + local_1d0 * (long)local_210;
              uVar112 = 0;
              do {
                uVar107 = *(uint *)((long)local_228 + uVar112 * 4 + lVar103);
                if (iVar114 == 4) {
                  auVar204 = *(undefined1 (*) [16])((long)local_228 + uVar112 * 0x10 + lVar103);
                  auVar116 = ZEXT3264(CONCAT1616(auVar204,auVar204));
LAB_00398c7a:
                  auVar264 = auVar116._0_32_;
                  auVar116 = vinserti64x4_avx512f(auVar116,auVar264,1);
                }
                else {
                  auVar204._4_4_ = uVar107;
                  auVar204._0_4_ = uVar107;
                  auVar204._8_4_ = uVar107;
                  auVar204._12_4_ = uVar107;
                  if (iVar114 == 8) {
                    auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)local_228 + uVar112 * 0x20 + lVar103));
                    goto LAB_00398c7a;
                  }
                  auVar264._4_4_ = uVar107;
                  auVar264._0_4_ = uVar107;
                  auVar264._8_4_ = uVar107;
                  auVar264._12_4_ = uVar107;
                  auVar264._16_4_ = uVar107;
                  auVar264._20_4_ = uVar107;
                  auVar264._24_4_ = uVar107;
                  auVar264._28_4_ = uVar107;
                  auVar116 = ZEXT3264(auVar264);
                  if (iVar114 != 0x10) goto LAB_00398c7a;
                  auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_228 + uVar112 * 0x40 + lVar103));
                }
                uVar101 = 0;
                if (0xf < (int)uVar94) {
                  iVar95 = 0xf;
                  do {
                    auVar117 = vmaxps_avx512f(auVar116,*pauVar109);
                    *pauVar111 = auVar117;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    iVar95 = iVar95 + 0x10;
                    uVar101 = uVar94 & 0xfffffff0;
                  } while (iVar95 < (int)uVar94);
                }
                uVar100 = uVar101 | 7;
                while ((int)uVar100 < (int)uVar94) {
                  auVar180 = vmaxps_avx(auVar264,*(undefined1 (*) [32])*pauVar109);
                  *(undefined1 (*) [32])*pauVar111 = auVar180;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                  uVar100 = uVar101 + 0xf;
                  uVar101 = uVar101 + 8;
                }
                uVar100 = uVar101 | 3;
                while ((int)uVar100 < (int)uVar94) {
                  auVar1 = vmaxps_avx(auVar204,*(undefined1 (*) [16])*pauVar109);
                  *(undefined1 (*) [16])*pauVar111 = auVar1;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                  uVar100 = uVar101 + 7;
                  uVar101 = uVar101 + 4;
                }
                if (uVar94 - uVar101 != 0 && (int)uVar101 <= (int)uVar94) {
                  lVar115 = 0;
                  lVar106 = 0;
                  do {
                    auVar1 = vmaxss_avx(ZEXT416(uVar107),
                                        ZEXT416(*(uint *)(*pauVar109 + lVar106 * 4)));
                    *(int *)((long)*pauVar111 + lVar106 * 4) = auVar1._0_4_;
                    lVar106 = lVar106 + 1;
                    lVar115 = lVar115 + -4;
                  } while (uVar94 - uVar101 != (int)lVar106);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                }
                uVar112 = uVar112 + 1;
              } while (uVar112 != uVar97);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        local_210 = (void *)((long)local_210 + 1);
        local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      } while (local_210 != local_218);
    }
    break;
  case 5:
    iVar93 = local_220->w;
    uVar96 = local_220->h;
    uVar97 = (ulong)uVar96;
    uVar105 = local_220->d;
    local_1e0._0_8_ = CONCAT44(0,uVar105);
    uVar94 = local_220->c;
    local_218 = (void *)(ulong)uVar94;
    iVar114 = local_220->elempack;
    iVar95 = local_220->dims;
    if (0 < (int)uVar96 && ((int)local_1a0 == 1 && iVar95 == 2)) {
      uVar107 = iVar114 * iVar93;
      uVar108 = 0;
      do {
        uVar101 = *(uint *)((long)local_228 + uVar108 * 4);
        if (iVar114 == 4) {
          auVar220 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar220,auVar220));
LAB_0039b54a:
          auVar275 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar275,1);
        }
        else {
          auVar220._4_4_ = uVar101;
          auVar220._0_4_ = uVar101;
          auVar220._8_4_ = uVar101;
          auVar220._12_4_ = uVar101;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + uVar108 * 0x20));
            goto LAB_0039b54a;
          }
          auVar275._4_4_ = uVar101;
          auVar275._0_4_ = uVar101;
          auVar275._8_4_ = uVar101;
          auVar275._12_4_ = uVar101;
          auVar275._16_4_ = uVar101;
          auVar275._20_4_ = uVar101;
          auVar275._24_4_ = uVar101;
          auVar275._28_4_ = uVar101;
          auVar116 = ZEXT3264(auVar275);
          if (iVar114 != 0x10) goto LAB_0039b54a;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_228 + uVar108 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * uVar108 * local_220->elemsize + (long)local_220->data);
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_1f8->w * uVar108 * local_1f8->elemsize + (long)local_1f8->data);
        uVar100 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vminps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar100 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar99 = uVar100 | 7;
        while ((int)uVar99 < (int)uVar107) {
          auVar180 = vminps_avx(auVar275,*(undefined1 (*) [32])*pauVar109);
          *(undefined1 (*) [32])*pauVar111 = auVar180;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar99 = uVar100 + 0xf;
          uVar100 = uVar100 + 8;
        }
        uVar99 = uVar100 | 3;
        while ((int)uVar99 < (int)uVar107) {
          auVar1 = vminps_avx(auVar220,*(undefined1 (*) [16])*pauVar109);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar99 = uVar100 + 7;
          uVar100 = uVar100 + 4;
        }
        if (uVar107 - uVar100 != 0 && (int)uVar100 <= (int)uVar107) {
          lVar103 = 0;
          do {
            auVar1 = vminss_avx(ZEXT416(uVar101),ZEXT416(*(uint *)(*pauVar109 + lVar103 * 4)));
            *(int *)((long)*pauVar111 + lVar103 * 4) = auVar1._0_4_;
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar100 != (int)lVar103);
        }
        uVar108 = uVar108 + 1;
      } while (uVar108 != uVar97);
      iVar95 = local_220->dims;
    }
    if ((iVar95 - 3U < 2) && ((int)local_1a0 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      uVar107 = uVar96 * uVar105 * iVar114 * iVar93;
      pvVar98 = (void *)0x0;
      do {
        uVar101 = *(uint *)((long)local_228 + (long)pvVar98 * 4);
        if (iVar114 == 4) {
          auVar221 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar221,auVar221));
LAB_0039b6c5:
          auVar276 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar276,1);
        }
        else {
          auVar221._4_4_ = uVar101;
          auVar221._0_4_ = uVar101;
          auVar221._8_4_ = uVar101;
          auVar221._12_4_ = uVar101;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20));
            goto LAB_0039b6c5;
          }
          auVar276._4_4_ = uVar101;
          auVar276._0_4_ = uVar101;
          auVar276._8_4_ = uVar101;
          auVar276._12_4_ = uVar101;
          auVar276._16_4_ = uVar101;
          auVar276._20_4_ = uVar101;
          auVar276._24_4_ = uVar101;
          auVar276._28_4_ = uVar101;
          auVar116 = ZEXT3264(auVar276);
          if (iVar114 != 0x10) goto LAB_0039b6c5;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar111 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar100 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vminps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar100 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar99 = uVar100 | 7;
        while ((int)uVar99 < (int)uVar107) {
          auVar180 = vminps_avx(auVar276,*(undefined1 (*) [32])*pauVar109);
          *(undefined1 (*) [32])*pauVar111 = auVar180;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar99 = uVar100 + 0xf;
          uVar100 = uVar100 + 8;
        }
        uVar99 = uVar100 | 3;
        while ((int)uVar99 < (int)uVar107) {
          auVar1 = vminps_avx(auVar221,*(undefined1 (*) [16])*pauVar109);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar99 = uVar100 + 7;
          uVar100 = uVar100 + 4;
        }
        if (uVar107 - uVar100 != 0 && (int)uVar100 <= (int)uVar107) {
          lVar103 = 0;
          do {
            auVar1 = vminss_avx(ZEXT416(uVar101),ZEXT416(*(uint *)(*pauVar109 + lVar103 * 4)));
            *(int *)((long)*pauVar111 + lVar103 * 4) = auVar1._0_4_;
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar100 != (int)lVar103);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if (0 < (int)uVar94 && ((int)local_1a0 == 2 && iVar95 == 3)) {
      local_210 = (void *)CONCAT44(local_210._4_4_,(int)local_1a0);
      uVar107 = iVar114 * iVar93;
      auVar83._4_4_ = local_1a0._4_4_;
      auVar83._0_4_ = (int)local_1a0;
      auVar83._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar83,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar96) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            uVar101 = *(uint *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar222 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar222,auVar222));
LAB_0039b894:
              auVar277 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar277,1);
            }
            else {
              auVar222._4_4_ = uVar101;
              auVar222._0_4_ = uVar101;
              auVar222._8_4_ = uVar101;
              auVar222._12_4_ = uVar101;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_0039b894;
              }
              auVar277._4_4_ = uVar101;
              auVar277._0_4_ = uVar101;
              auVar277._8_4_ = uVar101;
              auVar277._12_4_ = uVar101;
              auVar277._16_4_ = uVar101;
              auVar277._20_4_ = uVar101;
              auVar277._24_4_ = uVar101;
              auVar277._28_4_ = uVar101;
              auVar116 = ZEXT3264(auVar277);
              if (iVar114 != 0x10) goto LAB_0039b894;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar100 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vminps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar100 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar99 = uVar100 | 7;
            while ((int)uVar99 < (int)uVar107) {
              auVar180 = vminps_avx(auVar277,*(undefined1 (*) [32])*pauVar109);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar99 = uVar100 + 0xf;
              uVar100 = uVar100 + 8;
            }
            uVar99 = uVar100 | 3;
            while ((int)uVar99 < (int)uVar107) {
              auVar1 = vminps_avx(auVar222,*(undefined1 (*) [16])*pauVar109);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar99 = uVar100 + 7;
              uVar100 = uVar100 + 4;
            }
            if (uVar107 - uVar100 != 0 && (int)uVar100 <= (int)uVar107) {
              lVar106 = 0;
              lVar115 = 0;
              do {
                auVar1 = vminss_avx(ZEXT416(uVar101),ZEXT416(*(uint *)(*pauVar109 + lVar106 * 4)));
                *(int *)((long)*pauVar111 + lVar106 * 4) = auVar1._0_4_;
                lVar115 = lVar115 + -4;
                lVar106 = lVar106 + 1;
              } while (uVar107 - uVar100 != (int)lVar106);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != uVar97);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if ((iVar95 == 4) && ((int)local_1a0 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      local_210 = (void *)CONCAT44(local_210._4_4_,2);
      uVar107 = iVar114 * iVar93 * uVar96;
      auVar84._4_4_ = local_1a0._4_4_;
      auVar84._0_4_ = 2;
      auVar84._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar84,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            uVar101 = *(uint *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar223 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar223,auVar223));
LAB_0039ba5d:
              auVar278 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar278,1);
            }
            else {
              auVar223._4_4_ = uVar101;
              auVar223._0_4_ = uVar101;
              auVar223._8_4_ = uVar101;
              auVar223._12_4_ = uVar101;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_0039ba5d;
              }
              auVar278._4_4_ = uVar101;
              auVar278._0_4_ = uVar101;
              auVar278._8_4_ = uVar101;
              auVar278._12_4_ = uVar101;
              auVar278._16_4_ = uVar101;
              auVar278._20_4_ = uVar101;
              auVar278._24_4_ = uVar101;
              auVar278._28_4_ = uVar101;
              auVar116 = ZEXT3264(auVar278);
              if (iVar114 != 0x10) goto LAB_0039ba5d;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar100 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vminps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar100 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar99 = uVar100 | 7;
            while ((int)uVar99 < (int)uVar107) {
              auVar180 = vminps_avx(auVar278,*(undefined1 (*) [32])*pauVar109);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar99 = uVar100 + 0xf;
              uVar100 = uVar100 + 8;
            }
            uVar99 = uVar100 | 3;
            while ((int)uVar99 < (int)uVar107) {
              auVar1 = vminps_avx(auVar223,*(undefined1 (*) [16])*pauVar109);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar99 = uVar100 + 7;
              uVar100 = uVar100 + 4;
            }
            if (uVar107 - uVar100 != 0 && (int)uVar100 <= (int)uVar107) {
              lVar115 = 0;
              lVar106 = 0;
              do {
                auVar1 = vminss_avx(ZEXT416(uVar101),ZEXT416(*(uint *)(*pauVar109 + lVar106 * 4)));
                *(int *)((long)*pauVar111 + lVar106 * 4) = auVar1._0_4_;
                lVar106 = lVar106 + 1;
                lVar115 = lVar115 + -4;
              } while (uVar107 - uVar100 != (int)lVar106);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_1a0 == 3 && iVar95 == 4) && 0 < (int)uVar94) {
      uVar94 = iVar93 * iVar114;
      auVar85._4_4_ = local_1a0._4_4_;
      auVar85._0_4_ = (int)local_1a0;
      auVar85._8_8_ = uStack_198;
      iVar93 = vextractps_avx(auVar85,1);
      local_1d0 = local_1d0 * (long)local_1e8;
      local_210 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_210 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_210 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            if (0 < (int)uVar96) {
              lVar103 = (long)iVar93 * (long)local_1e8 * uVar108 + local_1d0 * (long)local_210;
              uVar112 = 0;
              do {
                uVar107 = *(uint *)((long)local_228 + uVar112 * 4 + lVar103);
                if (iVar114 == 4) {
                  auVar224 = *(undefined1 (*) [16])((long)local_228 + uVar112 * 0x10 + lVar103);
                  auVar116 = ZEXT3264(CONCAT1616(auVar224,auVar224));
LAB_0039bc54:
                  auVar279 = auVar116._0_32_;
                  auVar116 = vinserti64x4_avx512f(auVar116,auVar279,1);
                }
                else {
                  auVar224._4_4_ = uVar107;
                  auVar224._0_4_ = uVar107;
                  auVar224._8_4_ = uVar107;
                  auVar224._12_4_ = uVar107;
                  if (iVar114 == 8) {
                    auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)local_228 + uVar112 * 0x20 + lVar103));
                    goto LAB_0039bc54;
                  }
                  auVar279._4_4_ = uVar107;
                  auVar279._0_4_ = uVar107;
                  auVar279._8_4_ = uVar107;
                  auVar279._12_4_ = uVar107;
                  auVar279._16_4_ = uVar107;
                  auVar279._20_4_ = uVar107;
                  auVar279._24_4_ = uVar107;
                  auVar279._28_4_ = uVar107;
                  auVar116 = ZEXT3264(auVar279);
                  if (iVar114 != 0x10) goto LAB_0039bc54;
                  auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_228 + uVar112 * 0x40 + lVar103));
                }
                uVar101 = 0;
                if (0xf < (int)uVar94) {
                  iVar95 = 0xf;
                  do {
                    auVar117 = vminps_avx512f(auVar116,*pauVar109);
                    *pauVar111 = auVar117;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    iVar95 = iVar95 + 0x10;
                    uVar101 = uVar94 & 0xfffffff0;
                  } while (iVar95 < (int)uVar94);
                }
                uVar100 = uVar101 | 7;
                while ((int)uVar100 < (int)uVar94) {
                  auVar180 = vminps_avx(auVar279,*(undefined1 (*) [32])*pauVar109);
                  *(undefined1 (*) [32])*pauVar111 = auVar180;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                  uVar100 = uVar101 + 0xf;
                  uVar101 = uVar101 + 8;
                }
                uVar100 = uVar101 | 3;
                while ((int)uVar100 < (int)uVar94) {
                  auVar1 = vminps_avx(auVar224,*(undefined1 (*) [16])*pauVar109);
                  *(undefined1 (*) [16])*pauVar111 = auVar1;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                  uVar100 = uVar101 + 7;
                  uVar101 = uVar101 + 4;
                }
                if (uVar94 - uVar101 != 0 && (int)uVar101 <= (int)uVar94) {
                  lVar115 = 0;
                  lVar106 = 0;
                  do {
                    auVar1 = vminss_avx(ZEXT416(uVar107),
                                        ZEXT416(*(uint *)(*pauVar109 + lVar106 * 4)));
                    *(int *)((long)*pauVar111 + lVar106 * 4) = auVar1._0_4_;
                    lVar106 = lVar106 + 1;
                    lVar115 = lVar115 + -4;
                  } while (uVar94 - uVar101 != (int)lVar106);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                }
                uVar112 = uVar112 + 1;
              } while (uVar112 != uVar97);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        local_210 = (void *)((long)local_210 + 1);
        local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      } while (local_210 != local_218);
    }
    break;
  case 6:
    local_1ec = local_220->w;
    local_1a8 = (void *)(ulong)(uint)local_220->h;
    local_190 = (void *)(ulong)(uint)local_220->d;
    local_1c8 = (void *)(ulong)(uint)local_220->c;
    iVar93 = local_220->elempack;
    iVar114 = local_220->dims;
    local_168 = CONCAT44(local_168._4_4_,(int)local_1a0);
    local_210 = (void *)CONCAT44(local_210._4_4_,iVar93);
    if (0 < local_220->h && ((int)local_1a0 == 1 && iVar114 == 2)) {
      iVar114 = iVar93 * local_1ec;
      pvVar98 = (void *)0x0;
      do {
        local_180[1] = *(float *)((long)local_228 + (long)pvVar98 * 4);
        local_1e0 = ZEXT416((uint)local_180[1]);
        if (iVar93 == 4) {
          local_180 = *(__m128 *)((long)local_228 + (long)pvVar98 * 0x10);
          local_160[4] = local_180[0];
          local_160[5] = local_180[1];
          local_160[6] = local_180[2];
          local_160[7] = local_180[3];
          local_160[0] = local_180[0];
          local_160[1] = local_180[1];
          local_160[2] = local_180[2];
          local_160[3] = local_180[3];
LAB_0039bdfc:
          auVar116 = vinserti64x4_avx512f
                               (ZEXT3264((undefined1  [32])local_160),(undefined1  [32])local_160,1)
          ;
        }
        else {
          local_180[0] = local_180[1];
          local_180[2] = local_180[1];
          local_180[3] = local_180[1];
          if (iVar93 == 8) {
            local_160 = *(__m256 *)((long)local_228 + (long)pvVar98 * 0x20);
            goto LAB_0039bdfc;
          }
          local_160[1] = local_180[1];
          local_160[0] = local_180[1];
          local_160[2] = local_180[1];
          local_160[3] = local_180[1];
          local_160[4] = local_180[1];
          local_160[5] = local_180[1];
          local_160[6] = local_180[1];
          local_160[7] = local_180[1];
          if (iVar93 != 0x10) goto LAB_0039bdfc;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_220->w * (long)pvVar98 * local_220->elemsize +
                    (long)local_220->data);
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_1f8->w * (long)pvVar98 * local_1f8->elemsize +
                    (long)local_1f8->data);
        uVar96 = 0;
        local_140._0_64_ = vmovdqa64_avx512f(auVar116);
        local_218 = pvVar98;
        if (0xf < iVar114) {
          uVar105 = 0;
          do {
            auVar116 = vmovdqu64_avx512f(*pauVar111);
            _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                      ((binary_op_pow *)&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
            auVar116 = vmovdqu64_avx512f(auVar116);
            *pauVar109 = auVar116;
            pauVar111 = pauVar111 + 1;
            pauVar109 = pauVar109 + 1;
            uVar96 = uVar105 + 0x10;
            iVar93 = uVar105 + 0x1f;
            uVar105 = uVar96;
          } while (iVar93 < iVar114);
        }
        uVar105 = uVar96 | 7;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)*pauVar111;
          uVar190 = *(undefined8 *)(*pauVar111 + 8);
          uVar193 = *(undefined8 *)(*pauVar111 + 0x10);
          uVar194 = *(undefined8 *)(*pauVar111 + 0x18);
          local_c0 = *(undefined1 (*) [32])*pauVar111;
          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                    ((binary_op_pow *)&local_229,(__m256 *)local_c0,&local_160);
          *(undefined8 *)*pauVar109 = uVar191;
          *(undefined8 *)(*pauVar109 + 8) = uVar190;
          *(undefined8 *)(*pauVar109 + 0x10) = uVar193;
          *(undefined8 *)(*pauVar109 + 0x18) = uVar194;
          pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          uVar105 = uVar96 + 0xf;
          uVar96 = uVar96 + 8;
        }
        uVar105 = uVar96 | 3;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)(*pauVar111 + 8);
          local_c0._0_16_ = *(undefined1 (*) [16])*pauVar111;
          afVar310 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                               ((binary_op_pow *)&local_229,(__m128 *)local_c0,&local_180);
          *(long *)*pauVar109 = afVar310._0_8_;
          *(undefined8 *)(*pauVar109 + 8) = uVar191;
          pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          uVar105 = uVar96 + 7;
          uVar96 = uVar96 + 4;
        }
        if (iVar114 - uVar96 != 0 && (int)uVar96 <= iVar114) {
          lVar103 = 0;
          do {
            fVar179 = powf(*(float *)(*pauVar111 + lVar103 * 4),local_1e0._0_4_);
            *(float *)(*pauVar109 + lVar103 * 4) = fVar179;
            lVar103 = lVar103 + 1;
          } while (iVar114 - uVar96 != (int)lVar103);
        }
        pvVar98 = (void *)((long)local_218 + 1);
        iVar93 = (int)local_210;
      } while (pvVar98 != local_1a8);
      iVar114 = local_220->dims;
    }
    if ((iVar114 - 3U < 2) && ((int)local_168 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)local_1c8 < 1) break;
      iVar114 = (int)local_1a8 * (int)local_190 * iVar93 * local_1ec;
      pvVar98 = (void *)0x0;
      do {
        local_180[1] = *(float *)((long)local_228 + (long)pvVar98 * 4);
        local_1e0 = ZEXT416((uint)local_180[1]);
        if (iVar93 == 4) {
          local_180 = *(__m128 *)((long)local_228 + (long)pvVar98 * 0x10);
          local_160[4] = local_180[0];
          local_160[5] = local_180[1];
          local_160[6] = local_180[2];
          local_160[7] = local_180[3];
          local_160[0] = local_180[0];
          local_160[1] = local_180[1];
          local_160[2] = local_180[2];
          local_160[3] = local_180[3];
LAB_0039da07:
          auVar116 = vinserti64x4_avx512f
                               (ZEXT3264((undefined1  [32])local_160),(undefined1  [32])local_160,1)
          ;
        }
        else {
          local_180[0] = local_180[1];
          local_180[2] = local_180[1];
          local_180[3] = local_180[1];
          if (iVar93 == 8) {
            local_160 = *(__m256 *)((long)local_228 + (long)pvVar98 * 0x20);
            goto LAB_0039da07;
          }
          local_160[1] = local_180[1];
          local_160[0] = local_180[1];
          local_160[2] = local_180[1];
          local_160[3] = local_180[1];
          local_160[4] = local_180[1];
          local_160[5] = local_180[1];
          local_160[6] = local_180[1];
          local_160[7] = local_180[1];
          if (iVar93 != 0x10) goto LAB_0039da07;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar111 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar109 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar96 = 0;
        local_140._0_64_ = vmovdqa64_avx512f(auVar116);
        local_218 = pvVar98;
        if (0xf < iVar114) {
          uVar105 = 0;
          do {
            auVar116 = vmovdqu64_avx512f(*pauVar111);
            _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                      ((binary_op_pow *)&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
            auVar116 = vmovdqu64_avx512f(auVar116);
            *pauVar109 = auVar116;
            pauVar111 = pauVar111 + 1;
            pauVar109 = pauVar109 + 1;
            uVar96 = uVar105 + 0x10;
            iVar93 = uVar105 + 0x1f;
            uVar105 = uVar96;
          } while (iVar93 < iVar114);
        }
        uVar105 = uVar96 | 7;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)*pauVar111;
          uVar190 = *(undefined8 *)(*pauVar111 + 8);
          uVar193 = *(undefined8 *)(*pauVar111 + 0x10);
          uVar194 = *(undefined8 *)(*pauVar111 + 0x18);
          local_c0 = *(undefined1 (*) [32])*pauVar111;
          BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                    ((binary_op_pow *)&local_229,(__m256 *)local_c0,&local_160);
          *(undefined8 *)*pauVar109 = uVar191;
          *(undefined8 *)(*pauVar109 + 8) = uVar190;
          *(undefined8 *)(*pauVar109 + 0x10) = uVar193;
          *(undefined8 *)(*pauVar109 + 0x18) = uVar194;
          pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          uVar105 = uVar96 + 0xf;
          uVar96 = uVar96 + 8;
        }
        uVar105 = uVar96 | 3;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)(*pauVar111 + 8);
          local_c0._0_16_ = *(undefined1 (*) [16])*pauVar111;
          afVar310 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                               ((binary_op_pow *)&local_229,(__m128 *)local_c0,&local_180);
          *(long *)*pauVar109 = afVar310._0_8_;
          *(undefined8 *)(*pauVar109 + 8) = uVar191;
          pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          uVar105 = uVar96 + 7;
          uVar96 = uVar96 + 4;
        }
        if (iVar114 - uVar96 != 0 && (int)uVar96 <= iVar114) {
          lVar103 = 0;
          do {
            fVar179 = powf(*(float *)(*pauVar111 + lVar103 * 4),local_1e0._0_4_);
            *(float *)(*pauVar109 + lVar103 * 4) = fVar179;
            lVar103 = lVar103 + 1;
          } while (iVar114 - uVar96 != (int)lVar103);
        }
        pvVar98 = (void *)((long)local_218 + 1);
        iVar93 = (int)local_210;
      } while (pvVar98 != local_1c8);
      iVar114 = local_220->dims;
    }
    iVar95 = local_1ec;
    if (0 < (int)local_1c8 && ((int)local_168 == 2 && iVar114 == 3)) {
      iVar114 = iVar93 * local_1ec;
      local_1c0 = (void *)((long)local_1a0._4_4_ * (long)local_1e8);
      local_1b8 = (void *)0x0;
      local_188 = (void *)CONCAT44(local_188._4_4_,iVar114);
      do {
        if (0 < (int)local_1a8) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_1b8 * local_1f8->elemsize +
                      (long)local_1f8->data);
          local_1b0 = (void *)((long)local_1c0 * (long)local_1b8 + (long)local_228);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1b8 * local_220->elemsize +
                      (long)local_220->data);
          pvVar98 = (void *)0x0;
          do {
            local_180[1] = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
            local_1e0 = ZEXT416((uint)local_180[1]);
            if (iVar93 == 4) {
              local_180 = *(__m128 *)((long)local_1b0 + (long)pvVar98 * 0x10);
              local_160[4] = local_180[0];
              local_160[5] = local_180[1];
              local_160[6] = local_180[2];
              local_160[7] = local_180[3];
              local_160[0] = local_180[0];
              local_160[1] = local_180[1];
              local_160[2] = local_180[2];
              local_160[3] = local_180[3];
LAB_003a0448:
              auVar116 = vinserti64x4_avx512f
                                   (ZEXT3264((undefined1  [32])local_160),
                                    (undefined1  [32])local_160,1);
            }
            else {
              local_180[0] = local_180[1];
              local_180[2] = local_180[1];
              local_180[3] = local_180[1];
              if (iVar93 == 8) {
                local_160 = *(__m256 *)((long)local_1b0 + (long)pvVar98 * 0x20);
                goto LAB_003a0448;
              }
              local_160[1] = local_180[1];
              local_160[0] = local_180[1];
              local_160[2] = local_180[1];
              local_160[3] = local_180[1];
              local_160[4] = local_180[1];
              local_160[5] = local_180[1];
              local_160[6] = local_180[1];
              local_160[7] = local_180[1];
              if (iVar93 != 0x10) goto LAB_003a0448;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_1b0 + (long)pvVar98 * 0x40));
            }
            uVar96 = 0;
            local_140._0_64_ = vmovdqa64_avx512f(auVar116);
            local_218 = pvVar98;
            if (0xf < iVar114) {
              uVar105 = 0;
              do {
                auVar116 = vmovdqu64_avx512f(*pauVar109);
                _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          ((binary_op_pow *)&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
                auVar116 = vmovdqu64_avx512f(auVar116);
                *pauVar111 = auVar116;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                uVar96 = uVar105 + 0x10;
                iVar93 = uVar105 + 0x1f;
                uVar105 = uVar96;
              } while (iVar93 < iVar114);
            }
            uVar105 = uVar96 | 7;
            while ((int)uVar105 < iVar114) {
              auVar180 = *(undefined1 (*) [32])*pauVar109;
              local_c0._0_4_ = auVar180._0_4_;
              local_c0._4_4_ = auVar180._4_4_;
              local_c0._8_4_ = auVar180._8_4_;
              local_c0._12_4_ = auVar180._12_4_;
              local_c0._16_4_ = auVar180._16_4_;
              local_c0._20_4_ = auVar180._20_4_;
              local_c0._24_4_ = auVar180._24_4_;
              local_c0._28_4_ = auVar180._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                        ((binary_op_pow *)&local_229,(__m256 *)local_c0,&local_160);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
              uVar105 = uVar96 + 0xf;
              uVar96 = uVar96 + 8;
            }
            uVar105 = uVar96 | 3;
            while ((int)uVar105 < iVar114) {
              local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
              auVar192 = ZEXT856(*(ulong *)(*pauVar109 + 8));
              afVar310 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                   ((binary_op_pow *)&local_229,(__m128 *)local_c0,&local_180);
              auVar128._0_8_ = afVar310._0_8_;
              auVar128._8_56_ = auVar192;
              *(undefined1 (*) [16])*pauVar111 = auVar128._0_16_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
              uVar105 = uVar96 + 7;
              uVar96 = uVar96 + 4;
            }
            if ((int)uVar96 < iVar114) {
              lVar103 = 0;
              lVar115 = 0;
              do {
                fVar179 = powf(*(float *)(*pauVar109 + lVar103 * 4),local_1e0._0_4_);
                *(float *)(*pauVar111 + lVar103 * 4) = fVar179;
                lVar115 = lVar115 + -4;
                lVar103 = lVar103 + 1;
              } while (iVar114 - uVar96 != (int)lVar103);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              iVar93 = (int)local_210;
              iVar114 = (int)local_188;
            }
            else {
              iVar93 = (int)local_210;
            }
            pvVar98 = (void *)((long)local_218 + 1);
            iVar95 = local_1ec;
          } while (pvVar98 != local_1a8);
        }
        local_1b8 = (void *)((long)local_1b8 + 1);
      } while (local_1b8 != local_1c8);
      iVar114 = local_220->dims;
    }
    if ((iVar114 == 4) && ((int)local_168 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)local_1c8 < 1) break;
      iVar114 = iVar93 * iVar95 * (int)local_1a8;
      local_1c0 = (void *)((long)local_1a0._4_4_ * (long)local_1e8);
      local_1b8 = (void *)0x0;
      local_188 = (void *)CONCAT44(local_188._4_4_,iVar114);
      do {
        if (0 < (int)local_190) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_1b8 * local_1f8->elemsize +
                      (long)local_1f8->data);
          local_1b0 = (void *)((long)local_1c0 * (long)local_1b8 + (long)local_228);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1b8 * local_220->elemsize +
                      (long)local_220->data);
          pvVar98 = (void *)0x0;
          do {
            fVar179 = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
            if (iVar93 == 4) {
              local_180 = *(__m128 *)((long)local_1b0 + (long)pvVar98 * 0x10);
              local_160[4] = local_180[0];
              local_160[5] = local_180[1];
              local_160[6] = local_180[2];
              local_160[7] = local_180[3];
              local_160[0] = local_180[0];
              local_160[1] = local_180[1];
              local_160[2] = local_180[2];
              local_160[3] = local_180[3];
LAB_003a0723:
              auVar116 = vinserti64x4_avx512f
                                   (ZEXT3264((undefined1  [32])local_160),
                                    (undefined1  [32])local_160,1);
            }
            else {
              local_180[1] = fVar179;
              local_180[0] = fVar179;
              local_180[2] = fVar179;
              local_180[3] = fVar179;
              if (iVar93 == 8) {
                local_160 = *(__m256 *)((long)local_1b0 + (long)pvVar98 * 0x20);
                goto LAB_003a0723;
              }
              local_160[1] = fVar179;
              local_160[0] = fVar179;
              local_160[2] = fVar179;
              local_160[3] = fVar179;
              local_160[4] = fVar179;
              local_160[5] = fVar179;
              local_160[6] = fVar179;
              local_160[7] = fVar179;
              if (iVar93 != 0x10) goto LAB_003a0723;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_1b0 + (long)pvVar98 * 0x40));
            }
            local_1e0 = ZEXT416((uint)fVar179);
            uVar96 = 0;
            local_140._0_64_ = vmovdqa64_avx512f(auVar116);
            local_218 = pvVar98;
            if (0xf < iVar114) {
              uVar105 = 0;
              do {
                auVar116 = vmovdqu64_avx512f(*pauVar109);
                _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          ((binary_op_pow *)&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
                auVar116 = vmovdqu64_avx512f(auVar116);
                *pauVar111 = auVar116;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                uVar96 = uVar105 + 0x10;
                iVar93 = uVar105 + 0x1f;
                uVar105 = uVar96;
              } while (iVar93 < iVar114);
            }
            uVar105 = uVar96 | 7;
            while ((int)uVar105 < iVar114) {
              auVar180 = *(undefined1 (*) [32])*pauVar109;
              local_c0._0_4_ = auVar180._0_4_;
              local_c0._4_4_ = auVar180._4_4_;
              local_c0._8_4_ = auVar180._8_4_;
              local_c0._12_4_ = auVar180._12_4_;
              local_c0._16_4_ = auVar180._16_4_;
              local_c0._20_4_ = auVar180._20_4_;
              local_c0._24_4_ = auVar180._24_4_;
              local_c0._28_4_ = auVar180._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                        ((binary_op_pow *)&local_229,(__m256 *)local_c0,&local_160);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
              uVar105 = uVar96 + 0xf;
              uVar96 = uVar96 + 8;
            }
            uVar105 = uVar96 | 3;
            while ((int)uVar105 < iVar114) {
              local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
              auVar192 = ZEXT856(*(ulong *)(*pauVar109 + 8));
              afVar310 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                   ((binary_op_pow *)&local_229,(__m128 *)local_c0,&local_180);
              auVar309._0_8_ = afVar310._0_8_;
              auVar309._8_56_ = auVar192;
              *(undefined1 (*) [16])*pauVar111 = auVar309._0_16_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
              uVar105 = uVar96 + 7;
              uVar96 = uVar96 + 4;
            }
            if ((int)uVar96 < iVar114) {
              lVar115 = 0;
              lVar103 = 0;
              do {
                fVar179 = powf(*(float *)(*pauVar109 + lVar103 * 4),local_1e0._0_4_);
                *(float *)(*pauVar111 + lVar103 * 4) = fVar179;
                lVar103 = lVar103 + 1;
                lVar115 = lVar115 + -4;
              } while (iVar114 - uVar96 != (int)lVar103);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              iVar93 = (int)local_210;
              iVar114 = (int)local_188;
            }
            else {
              iVar93 = (int)local_210;
            }
            pvVar98 = (void *)((long)local_218 + 1);
            iVar95 = local_1ec;
          } while (pvVar98 != local_190);
        }
        local_1b8 = (void *)((long)local_1b8 + 1);
      } while (local_1b8 != local_1c8);
      iVar114 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_168 == 3 && iVar114 == 4) && 0 < (int)local_1c8) {
      iVar95 = iVar95 * iVar93;
      local_1d0 = local_1d0 * (long)local_1e8;
      local_1a0 = (void *)((long)local_1a0._4_4_ * (long)local_1e8);
      local_1c0 = (void *)0x0;
      local_1ec = iVar95;
      do {
        if (0 < (int)local_190) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_1c0 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1c0 * local_220->elemsize +
                      (long)local_220->data);
          local_1b8 = (void *)(local_1d0 * (long)local_1c0 + (long)local_228);
          local_188 = (void *)0x0;
          do {
            if (0 < (int)local_1a8) {
              local_1b0 = (void *)((long)local_1a0 * (long)local_188 + (long)local_1b8);
              pvVar98 = (void *)0x0;
              do {
                local_180[1] = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
                local_1e0 = ZEXT416((uint)local_180[1]);
                if (iVar93 == 4) {
                  local_180 = *(__m128 *)((long)local_1b0 + (long)pvVar98 * 0x10);
                  local_160[4] = local_180[0];
                  local_160[5] = local_180[1];
                  local_160[6] = local_180[2];
                  local_160[7] = local_180[3];
                  local_160[0] = local_180[0];
                  local_160[1] = local_180[1];
                  local_160[2] = local_180[2];
                  local_160[3] = local_180[3];
LAB_003a0a46:
                  auVar116 = vinserti64x4_avx512f
                                       (ZEXT3264((undefined1  [32])local_160),
                                        (undefined1  [32])local_160,1);
                }
                else {
                  local_180[0] = local_180[1];
                  local_180[2] = local_180[1];
                  local_180[3] = local_180[1];
                  if (iVar93 == 8) {
                    local_160 = *(__m256 *)((long)local_1b0 + (long)pvVar98 * 0x20);
                    goto LAB_003a0a46;
                  }
                  local_160[1] = local_180[1];
                  local_160[0] = local_180[1];
                  local_160[2] = local_180[1];
                  local_160[3] = local_180[1];
                  local_160[4] = local_180[1];
                  local_160[5] = local_180[1];
                  local_160[6] = local_180[1];
                  local_160[7] = local_180[1];
                  if (iVar93 != 0x10) goto LAB_003a0a46;
                  auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_1b0 + (long)pvVar98 * 0x40));
                }
                uVar96 = 0;
                local_140._0_64_ = vmovdqa64_avx512f(auVar116);
                local_218 = pvVar98;
                if (0xf < iVar95) {
                  uVar105 = 0;
                  do {
                    auVar116 = vmovdqu64_avx512f(*pauVar109);
                    _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
                    BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                              ((binary_op_pow *)&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
                    auVar116 = vmovdqu64_avx512f(auVar116);
                    *pauVar111 = auVar116;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    uVar96 = uVar105 + 0x10;
                    iVar93 = uVar105 + 0x1f;
                    uVar105 = uVar96;
                  } while (iVar93 < iVar95);
                }
                uVar105 = uVar96 | 7;
                while ((int)uVar105 < iVar95) {
                  uVar191 = *(undefined8 *)*pauVar109;
                  uVar190 = *(undefined8 *)(*pauVar109 + 8);
                  uVar193 = *(undefined8 *)(*pauVar109 + 0x10);
                  uVar194 = *(undefined8 *)(*pauVar109 + 0x18);
                  local_c0 = *(undefined1 (*) [32])*pauVar109;
                  BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                            ((binary_op_pow *)&local_229,(__m256 *)local_c0,&local_160);
                  *(undefined8 *)*pauVar111 = uVar191;
                  *(undefined8 *)(*pauVar111 + 8) = uVar190;
                  *(undefined8 *)(*pauVar111 + 0x10) = uVar193;
                  *(undefined8 *)(*pauVar111 + 0x18) = uVar194;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
                  uVar105 = uVar96 + 0xf;
                  uVar96 = uVar96 + 8;
                }
                uVar105 = uVar96 | 3;
                while ((int)uVar105 < iVar95) {
                  uVar191 = *(undefined8 *)(*pauVar109 + 8);
                  local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
                  afVar310 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                       ((binary_op_pow *)&local_229,(__m128 *)local_c0,&local_180);
                  *(long *)*pauVar111 = afVar310._0_8_;
                  *(undefined8 *)(*pauVar111 + 8) = uVar191;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
                  uVar105 = uVar96 + 7;
                  uVar96 = uVar96 + 4;
                }
                if ((int)uVar96 < iVar95) {
                  lVar115 = 0;
                  lVar103 = 0;
                  do {
                    fVar179 = powf(*(float *)(*pauVar109 + lVar103 * 4),local_1e0._0_4_);
                    *(float *)(*pauVar111 + lVar103 * 4) = fVar179;
                    lVar103 = lVar103 + 1;
                    lVar115 = lVar115 + -4;
                  } while (iVar95 - uVar96 != (int)lVar103);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                  iVar95 = local_1ec;
                }
                pvVar98 = (void *)((long)local_218 + 1);
                iVar93 = (int)local_210;
              } while (pvVar98 != local_1a8);
            }
            local_188 = (void *)((long)local_188 + 1);
          } while (local_188 != local_190);
        }
        local_1c0 = (void *)((long)local_1c0 + 1);
      } while (local_1c0 != local_1c8);
    }
    break;
  case 7:
    iVar93 = local_220->w;
    uVar96 = local_220->h;
    uVar97 = (ulong)uVar96;
    uVar105 = local_220->d;
    local_1e0._0_8_ = CONCAT44(0,uVar105);
    uVar94 = local_220->c;
    local_218 = (void *)(ulong)uVar94;
    iVar114 = local_220->elempack;
    iVar95 = local_220->dims;
    if (0 < (int)uVar96 && ((int)local_1a0 == 1 && iVar95 == 2)) {
      uVar107 = iVar114 * iVar93;
      uVar108 = 0;
      do {
        fVar179 = *(float *)((long)local_228 + uVar108 * 4);
        if (iVar114 == 4) {
          auVar210 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar210,auVar210));
LAB_0039a3a6:
          auVar265 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar265,1);
        }
        else {
          auVar210._4_4_ = fVar179;
          auVar210._0_4_ = fVar179;
          auVar210._8_4_ = fVar179;
          auVar210._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + uVar108 * 0x20));
            goto LAB_0039a3a6;
          }
          auVar265._4_4_ = fVar179;
          auVar265._0_4_ = fVar179;
          auVar265._8_4_ = fVar179;
          auVar265._12_4_ = fVar179;
          auVar265._16_4_ = fVar179;
          auVar265._20_4_ = fVar179;
          auVar265._24_4_ = fVar179;
          auVar265._28_4_ = fVar179;
          auVar116 = ZEXT3264(auVar265);
          if (iVar114 != 0x10) goto LAB_0039a3a6;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_228 + uVar108 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * uVar108 * local_220->elemsize + (long)local_220->data);
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_1f8->w * uVar108 * local_1f8->elemsize + (long)local_1f8->data);
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vsubps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          auVar180 = vsubps_avx(auVar265,*(undefined1 (*) [32])*pauVar109);
          *(undefined1 (*) [32])*pauVar111 = auVar180;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar1 = vsubps_avx(auVar210,*(undefined1 (*) [16])*pauVar109);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 fVar179 - *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        uVar108 = uVar108 + 1;
      } while (uVar108 != uVar97);
      iVar95 = local_220->dims;
    }
    if ((iVar95 - 3U < 2) && ((int)local_1a0 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      uVar107 = uVar96 * uVar105 * iVar114 * iVar93;
      pvVar98 = (void *)0x0;
      do {
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        if (iVar114 == 4) {
          auVar211 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar211,auVar211));
LAB_0039a521:
          auVar266 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar266,1);
        }
        else {
          auVar211._4_4_ = fVar179;
          auVar211._0_4_ = fVar179;
          auVar211._8_4_ = fVar179;
          auVar211._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20));
            goto LAB_0039a521;
          }
          auVar266._4_4_ = fVar179;
          auVar266._0_4_ = fVar179;
          auVar266._8_4_ = fVar179;
          auVar266._12_4_ = fVar179;
          auVar266._16_4_ = fVar179;
          auVar266._20_4_ = fVar179;
          auVar266._24_4_ = fVar179;
          auVar266._28_4_ = fVar179;
          auVar116 = ZEXT3264(auVar266);
          if (iVar114 != 0x10) goto LAB_0039a521;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar111 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            auVar117 = vsubps_avx512f(auVar116,*pauVar109);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          auVar180 = vsubps_avx(auVar266,*(undefined1 (*) [32])*pauVar109);
          *(undefined1 (*) [32])*pauVar111 = auVar180;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar1 = vsubps_avx(auVar211,*(undefined1 (*) [16])*pauVar109);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 fVar179 - *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if (0 < (int)uVar94 && ((int)local_1a0 == 2 && iVar95 == 3)) {
      local_210 = (void *)CONCAT44(local_210._4_4_,(int)local_1a0);
      uVar107 = iVar114 * iVar93;
      auVar77._4_4_ = local_1a0._4_4_;
      auVar77._0_4_ = (int)local_1a0;
      auVar77._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar77,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar96) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar212 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar212,auVar212));
LAB_0039a6f0:
              auVar267 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar267,1);
            }
            else {
              auVar212._4_4_ = fVar179;
              auVar212._0_4_ = fVar179;
              auVar212._8_4_ = fVar179;
              auVar212._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_0039a6f0;
              }
              auVar267._4_4_ = fVar179;
              auVar267._0_4_ = fVar179;
              auVar267._8_4_ = fVar179;
              auVar267._12_4_ = fVar179;
              auVar267._16_4_ = fVar179;
              auVar267._20_4_ = fVar179;
              auVar267._24_4_ = fVar179;
              auVar267._28_4_ = fVar179;
              auVar116 = ZEXT3264(auVar267);
              if (iVar114 != 0x10) goto LAB_0039a6f0;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vsubps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              auVar180 = vsubps_avx(auVar267,*(undefined1 (*) [32])*pauVar109);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar1 = vsubps_avx(auVar212,*(undefined1 (*) [16])*pauVar109);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar106 = 0;
              lVar115 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     fVar179 - *(float *)(*pauVar109 + lVar106 * 4);
                lVar115 = lVar115 + -4;
                lVar106 = lVar106 + 1;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != uVar97);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if ((iVar95 == 4) && ((int)local_1a0 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      local_210 = (void *)CONCAT44(local_210._4_4_,2);
      uVar107 = iVar114 * iVar93 * uVar96;
      auVar78._4_4_ = local_1a0._4_4_;
      auVar78._0_4_ = 2;
      auVar78._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar78,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar213 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar213,auVar213));
LAB_0039a8b9:
              auVar268 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar268,1);
            }
            else {
              auVar213._4_4_ = fVar179;
              auVar213._0_4_ = fVar179;
              auVar213._8_4_ = fVar179;
              auVar213._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_0039a8b9;
              }
              auVar268._4_4_ = fVar179;
              auVar268._0_4_ = fVar179;
              auVar268._8_4_ = fVar179;
              auVar268._12_4_ = fVar179;
              auVar268._16_4_ = fVar179;
              auVar268._20_4_ = fVar179;
              auVar268._24_4_ = fVar179;
              auVar268._28_4_ = fVar179;
              auVar116 = ZEXT3264(auVar268);
              if (iVar114 != 0x10) goto LAB_0039a8b9;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                auVar117 = vsubps_avx512f(auVar116,*pauVar109);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              auVar180 = vsubps_avx(auVar268,*(undefined1 (*) [32])*pauVar109);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar1 = vsubps_avx(auVar213,*(undefined1 (*) [16])*pauVar109);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar115 = 0;
              lVar106 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     fVar179 - *(float *)(*pauVar109 + lVar106 * 4);
                lVar106 = lVar106 + 1;
                lVar115 = lVar115 + -4;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_1a0 == 3 && iVar95 == 4) && 0 < (int)uVar94) {
      uVar94 = iVar93 * iVar114;
      auVar79._4_4_ = local_1a0._4_4_;
      auVar79._0_4_ = (int)local_1a0;
      auVar79._8_8_ = uStack_198;
      iVar93 = vextractps_avx(auVar79,1);
      local_1d0 = local_1d0 * (long)local_1e8;
      local_210 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_210 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_210 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            if (0 < (int)uVar96) {
              lVar103 = (long)iVar93 * (long)local_1e8 * uVar108 + local_1d0 * (long)local_210;
              uVar112 = 0;
              do {
                fVar179 = *(float *)((long)local_228 + uVar112 * 4 + lVar103);
                if (iVar114 == 4) {
                  auVar214 = *(undefined1 (*) [16])((long)local_228 + uVar112 * 0x10 + lVar103);
                  auVar116 = ZEXT3264(CONCAT1616(auVar214,auVar214));
LAB_0039aab0:
                  auVar269 = auVar116._0_32_;
                  auVar116 = vinserti64x4_avx512f(auVar116,auVar269,1);
                }
                else {
                  auVar214._4_4_ = fVar179;
                  auVar214._0_4_ = fVar179;
                  auVar214._8_4_ = fVar179;
                  auVar214._12_4_ = fVar179;
                  if (iVar114 == 8) {
                    auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)local_228 + uVar112 * 0x20 + lVar103));
                    goto LAB_0039aab0;
                  }
                  auVar269._4_4_ = fVar179;
                  auVar269._0_4_ = fVar179;
                  auVar269._8_4_ = fVar179;
                  auVar269._12_4_ = fVar179;
                  auVar269._16_4_ = fVar179;
                  auVar269._20_4_ = fVar179;
                  auVar269._24_4_ = fVar179;
                  auVar269._28_4_ = fVar179;
                  auVar116 = ZEXT3264(auVar269);
                  if (iVar114 != 0x10) goto LAB_0039aab0;
                  auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_228 + uVar112 * 0x40 + lVar103));
                }
                uVar107 = 0;
                if (0xf < (int)uVar94) {
                  iVar95 = 0xf;
                  do {
                    auVar117 = vsubps_avx512f(auVar116,*pauVar109);
                    *pauVar111 = auVar117;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    iVar95 = iVar95 + 0x10;
                    uVar107 = uVar94 & 0xfffffff0;
                  } while (iVar95 < (int)uVar94);
                }
                uVar101 = uVar107 | 7;
                while ((int)uVar101 < (int)uVar94) {
                  auVar180 = vsubps_avx(auVar269,*(undefined1 (*) [32])*pauVar109);
                  *(undefined1 (*) [32])*pauVar111 = auVar180;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                  uVar101 = uVar107 + 0xf;
                  uVar107 = uVar107 + 8;
                }
                uVar101 = uVar107 | 3;
                while ((int)uVar101 < (int)uVar94) {
                  auVar1 = vsubps_avx(auVar214,*(undefined1 (*) [16])*pauVar109);
                  *(undefined1 (*) [16])*pauVar111 = auVar1;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                  uVar101 = uVar107 + 7;
                  uVar107 = uVar107 + 4;
                }
                if (uVar94 - uVar107 != 0 && (int)uVar107 <= (int)uVar94) {
                  lVar115 = 0;
                  lVar106 = 0;
                  do {
                    *(float *)((long)*pauVar111 + lVar106 * 4) =
                         fVar179 - *(float *)(*pauVar109 + lVar106 * 4);
                    lVar106 = lVar106 + 1;
                    lVar115 = lVar115 + -4;
                  } while (uVar94 - uVar107 != (int)lVar106);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                }
                uVar112 = uVar112 + 1;
              } while (uVar112 != uVar97);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        local_210 = (void *)((long)local_210 + 1);
        local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      } while (local_210 != local_218);
    }
    break;
  case 8:
    iVar93 = local_220->w;
    uVar96 = local_220->h;
    uVar97 = (ulong)uVar96;
    uVar105 = local_220->d;
    local_1e0._0_8_ = CONCAT44(0,uVar105);
    uVar94 = local_220->c;
    local_218 = (void *)(ulong)uVar94;
    iVar114 = local_220->elempack;
    iVar95 = local_220->dims;
    if (0 < (int)uVar96 && ((int)local_1a0 == 1 && iVar95 == 2)) {
      uVar107 = iVar114 * iVar93;
      uVar108 = 0;
      do {
        fVar179 = *(float *)((long)local_228 + uVar108 * 4);
        if (iVar114 == 4) {
          auVar225 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar225,auVar225));
LAB_0039c515:
          auVar280 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar280,1);
        }
        else {
          auVar225._4_4_ = fVar179;
          auVar225._0_4_ = fVar179;
          auVar225._8_4_ = fVar179;
          auVar225._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + uVar108 * 0x20));
            goto LAB_0039c515;
          }
          auVar280._4_4_ = fVar179;
          auVar280._0_4_ = fVar179;
          auVar280._8_4_ = fVar179;
          auVar280._12_4_ = fVar179;
          auVar280._16_4_ = fVar179;
          auVar280._20_4_ = fVar179;
          auVar280._24_4_ = fVar179;
          auVar280._28_4_ = fVar179;
          auVar116 = ZEXT3264(auVar280);
          if (iVar114 != 0x10) goto LAB_0039c515;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)local_228 + uVar108 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * uVar108 * local_220->elemsize + (long)local_220->data);
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_1f8->w * uVar108 * local_1f8->elemsize + (long)local_1f8->data);
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            in_ZMM5 = vrcp14ps_avx512f(*pauVar109);
            auVar117 = vmulps_avx512f(auVar116,in_ZMM5);
            auVar118 = vfmsub213ps_avx512f(*pauVar109,auVar117,auVar116);
            auVar117 = vfnmadd213ps_avx512f(auVar118,in_ZMM5,auVar117);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          auVar180 = vrcpps_avx(*(undefined1 (*) [32])*pauVar109);
          auVar123._0_4_ = auVar280._0_4_ * auVar180._0_4_;
          auVar123._4_4_ = auVar280._4_4_ * auVar180._4_4_;
          auVar123._8_4_ = auVar280._8_4_ * auVar180._8_4_;
          auVar123._12_4_ = auVar280._12_4_ * auVar180._12_4_;
          auVar123._16_4_ = auVar280._16_4_ * auVar180._16_4_;
          auVar123._20_4_ = auVar280._20_4_ * auVar180._20_4_;
          auVar123._28_36_ = in_ZMM5._28_36_;
          auVar123._24_4_ = auVar280._24_4_ * auVar180._24_4_;
          auVar182 = auVar123._0_32_;
          in_ZMM5 = ZEXT3264(auVar182);
          auVar1 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar109,auVar182,auVar280);
          auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar180,auVar182);
          *(undefined1 (*) [32])*pauVar111 = ZEXT1632(auVar1);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar1 = vrcpps_avx(*(undefined1 (*) [16])*pauVar109);
          auVar289._0_4_ = auVar225._0_4_ * auVar1._0_4_;
          auVar289._4_4_ = auVar225._4_4_ * auVar1._4_4_;
          auVar289._8_4_ = auVar225._8_4_ * auVar1._8_4_;
          auVar289._12_4_ = auVar225._12_4_ * auVar1._12_4_;
          auVar36 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar109,auVar289,auVar225);
          auVar1 = vfnmadd213ps_fma(auVar36,auVar1,auVar289);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 fVar179 / *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        uVar108 = uVar108 + 1;
      } while (uVar108 != uVar97);
      iVar95 = local_220->dims;
    }
    if ((iVar95 - 3U < 2) && ((int)local_1a0 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      uVar107 = uVar96 * uVar105 * iVar114 * iVar93;
      pvVar98 = (void *)0x0;
      do {
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        if (iVar114 == 4) {
          auVar226 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar116 = ZEXT3264(CONCAT1616(auVar226,auVar226));
LAB_0039c6ca:
          auVar281 = auVar116._0_32_;
          auVar116 = vinserti64x4_avx512f(auVar116,auVar281,1);
        }
        else {
          auVar226._4_4_ = fVar179;
          auVar226._0_4_ = fVar179;
          auVar226._8_4_ = fVar179;
          auVar226._12_4_ = fVar179;
          if (iVar114 == 8) {
            auVar116 = ZEXT3264(*(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20));
            goto LAB_0039c6ca;
          }
          auVar281._4_4_ = fVar179;
          auVar281._0_4_ = fVar179;
          auVar281._8_4_ = fVar179;
          auVar281._12_4_ = fVar179;
          auVar281._16_4_ = fVar179;
          auVar281._20_4_ = fVar179;
          auVar281._24_4_ = fVar179;
          auVar281._28_4_ = fVar179;
          auVar116 = ZEXT3264(auVar281);
          if (iVar114 != 0x10) goto LAB_0039c6ca;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar111 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar101 = 0;
        if (0xf < (int)uVar107) {
          iVar95 = 0xf;
          do {
            in_ZMM5 = vrcp14ps_avx512f(*pauVar109);
            auVar117 = vmulps_avx512f(auVar116,in_ZMM5);
            auVar118 = vfmsub213ps_avx512f(*pauVar109,auVar117,auVar116);
            auVar117 = vfnmadd213ps_avx512f(auVar118,in_ZMM5,auVar117);
            *pauVar111 = auVar117;
            pauVar109 = pauVar109 + 1;
            pauVar111 = pauVar111 + 1;
            iVar95 = iVar95 + 0x10;
            uVar101 = uVar107 & 0xfffffff0;
          } while (iVar95 < (int)uVar107);
        }
        uVar100 = uVar101 | 7;
        while ((int)uVar100 < (int)uVar107) {
          auVar180 = vrcpps_avx(*(undefined1 (*) [32])*pauVar109);
          auVar124._0_4_ = auVar281._0_4_ * auVar180._0_4_;
          auVar124._4_4_ = auVar281._4_4_ * auVar180._4_4_;
          auVar124._8_4_ = auVar281._8_4_ * auVar180._8_4_;
          auVar124._12_4_ = auVar281._12_4_ * auVar180._12_4_;
          auVar124._16_4_ = auVar281._16_4_ * auVar180._16_4_;
          auVar124._20_4_ = auVar281._20_4_ * auVar180._20_4_;
          auVar124._28_36_ = in_ZMM5._28_36_;
          auVar124._24_4_ = auVar281._24_4_ * auVar180._24_4_;
          auVar182 = auVar124._0_32_;
          in_ZMM5 = ZEXT3264(auVar182);
          auVar1 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar109,auVar182,auVar281);
          auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar180,auVar182);
          *(undefined1 (*) [32])*pauVar111 = ZEXT1632(auVar1);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
          uVar100 = uVar101 + 0xf;
          uVar101 = uVar101 + 8;
        }
        uVar100 = uVar101 | 3;
        while ((int)uVar100 < (int)uVar107) {
          auVar1 = vrcpps_avx(*(undefined1 (*) [16])*pauVar109);
          auVar290._0_4_ = auVar226._0_4_ * auVar1._0_4_;
          auVar290._4_4_ = auVar226._4_4_ * auVar1._4_4_;
          auVar290._8_4_ = auVar226._8_4_ * auVar1._8_4_;
          auVar290._12_4_ = auVar226._12_4_ * auVar1._12_4_;
          auVar36 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar109,auVar290,auVar226);
          auVar1 = vfnmadd213ps_fma(auVar36,auVar1,auVar290);
          *(undefined1 (*) [16])*pauVar111 = auVar1;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
          uVar100 = uVar101 + 7;
          uVar101 = uVar101 + 4;
        }
        if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
          lVar103 = 0;
          do {
            *(float *)((long)*pauVar111 + lVar103 * 4) =
                 fVar179 / *(float *)(*pauVar109 + lVar103 * 4);
            lVar103 = lVar103 + 1;
          } while (uVar107 - uVar101 != (int)lVar103);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if (0 < (int)uVar94 && ((int)local_1a0 == 2 && iVar95 == 3)) {
      local_210 = (void *)CONCAT44(local_210._4_4_,(int)local_1a0);
      uVar107 = iVar114 * iVar93;
      auVar86._4_4_ = local_1a0._4_4_;
      auVar86._0_4_ = (int)local_1a0;
      auVar86._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar86,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar96) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar227 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar227,auVar227));
LAB_0039c8d5:
              auVar282 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar282,1);
            }
            else {
              auVar227._4_4_ = fVar179;
              auVar227._0_4_ = fVar179;
              auVar227._8_4_ = fVar179;
              auVar227._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_0039c8d5;
              }
              auVar282._4_4_ = fVar179;
              auVar282._0_4_ = fVar179;
              auVar282._8_4_ = fVar179;
              auVar282._12_4_ = fVar179;
              auVar282._16_4_ = fVar179;
              auVar282._20_4_ = fVar179;
              auVar282._24_4_ = fVar179;
              auVar282._28_4_ = fVar179;
              auVar116 = ZEXT3264(auVar282);
              if (iVar114 != 0x10) goto LAB_0039c8d5;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                in_ZMM5 = vrcp14ps_avx512f(*pauVar109);
                auVar117 = vmulps_avx512f(auVar116,in_ZMM5);
                auVar118 = vfmsub213ps_avx512f(*pauVar109,auVar117,auVar116);
                auVar117 = vfnmadd213ps_avx512f(auVar118,in_ZMM5,auVar117);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              auVar180 = vrcpps_avx(*(undefined1 (*) [32])*pauVar109);
              auVar125._0_4_ = auVar282._0_4_ * auVar180._0_4_;
              auVar125._4_4_ = auVar282._4_4_ * auVar180._4_4_;
              auVar125._8_4_ = auVar282._8_4_ * auVar180._8_4_;
              auVar125._12_4_ = auVar282._12_4_ * auVar180._12_4_;
              auVar125._16_4_ = auVar282._16_4_ * auVar180._16_4_;
              auVar125._20_4_ = auVar282._20_4_ * auVar180._20_4_;
              auVar125._28_36_ = in_ZMM5._28_36_;
              auVar125._24_4_ = auVar282._24_4_ * auVar180._24_4_;
              auVar182 = auVar125._0_32_;
              in_ZMM5 = ZEXT3264(auVar182);
              auVar1 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar109,auVar182,auVar282);
              auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar180,auVar182);
              *(undefined1 (*) [32])*pauVar111 = ZEXT1632(auVar1);
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar1 = vrcpps_avx(*(undefined1 (*) [16])*pauVar109);
              auVar291._0_4_ = auVar227._0_4_ * auVar1._0_4_;
              auVar291._4_4_ = auVar227._4_4_ * auVar1._4_4_;
              auVar291._8_4_ = auVar227._8_4_ * auVar1._8_4_;
              auVar291._12_4_ = auVar227._12_4_ * auVar1._12_4_;
              auVar36 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar109,auVar291,auVar227);
              auVar1 = vfnmadd213ps_fma(auVar36,auVar1,auVar291);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar106 = 0;
              lVar115 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     fVar179 / *(float *)(*pauVar109 + lVar106 * 4);
                lVar115 = lVar115 + -4;
                lVar106 = lVar106 + 1;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != uVar97);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    if ((iVar95 == 4) && ((int)local_1a0 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)uVar94 < 1) break;
      local_210 = (void *)CONCAT44(local_210._4_4_,2);
      uVar107 = iVar114 * iVar93 * uVar96;
      auVar87._4_4_ = local_1a0._4_4_;
      auVar87._0_4_ = 2;
      auVar87._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar87,1);
      pvVar98 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          lVar103 = (long)iVar95 * (long)local_1e8 * (long)pvVar98;
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)pvVar98 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            fVar179 = *(float *)((long)local_228 + uVar108 * 4 + lVar103);
            if (iVar114 == 4) {
              auVar228 = *(undefined1 (*) [16])((long)local_228 + uVar108 * 0x10 + lVar103);
              auVar116 = ZEXT3264(CONCAT1616(auVar228,auVar228));
LAB_0039cad8:
              auVar283 = auVar116._0_32_;
              auVar116 = vinserti64x4_avx512f(auVar116,auVar283,1);
            }
            else {
              auVar228._4_4_ = fVar179;
              auVar228._0_4_ = fVar179;
              auVar228._8_4_ = fVar179;
              auVar228._12_4_ = fVar179;
              if (iVar114 == 8) {
                auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)local_228 + uVar108 * 0x20 + lVar103));
                goto LAB_0039cad8;
              }
              auVar283._4_4_ = fVar179;
              auVar283._0_4_ = fVar179;
              auVar283._8_4_ = fVar179;
              auVar283._12_4_ = fVar179;
              auVar283._16_4_ = fVar179;
              auVar283._20_4_ = fVar179;
              auVar283._24_4_ = fVar179;
              auVar283._28_4_ = fVar179;
              auVar116 = ZEXT3264(auVar283);
              if (iVar114 != 0x10) goto LAB_0039cad8;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_228 + uVar108 * 0x40 + lVar103));
            }
            uVar101 = 0;
            if (0xf < (int)uVar107) {
              iVar104 = 0xf;
              do {
                in_ZMM5 = vrcp14ps_avx512f(*pauVar109);
                auVar117 = vmulps_avx512f(auVar116,in_ZMM5);
                auVar118 = vfmsub213ps_avx512f(*pauVar109,auVar117,auVar116);
                auVar117 = vfnmadd213ps_avx512f(auVar118,in_ZMM5,auVar117);
                *pauVar111 = auVar117;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                iVar104 = iVar104 + 0x10;
                uVar101 = uVar107 & 0xfffffff0;
              } while (iVar104 < (int)uVar107);
            }
            uVar100 = uVar101 | 7;
            while ((int)uVar100 < (int)uVar107) {
              auVar180 = vrcpps_avx(*(undefined1 (*) [32])*pauVar109);
              auVar126._0_4_ = auVar283._0_4_ * auVar180._0_4_;
              auVar126._4_4_ = auVar283._4_4_ * auVar180._4_4_;
              auVar126._8_4_ = auVar283._8_4_ * auVar180._8_4_;
              auVar126._12_4_ = auVar283._12_4_ * auVar180._12_4_;
              auVar126._16_4_ = auVar283._16_4_ * auVar180._16_4_;
              auVar126._20_4_ = auVar283._20_4_ * auVar180._20_4_;
              auVar126._28_36_ = in_ZMM5._28_36_;
              auVar126._24_4_ = auVar283._24_4_ * auVar180._24_4_;
              auVar182 = auVar126._0_32_;
              in_ZMM5 = ZEXT3264(auVar182);
              auVar1 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar109,auVar182,auVar283);
              auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar180,auVar182);
              *(undefined1 (*) [32])*pauVar111 = ZEXT1632(auVar1);
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
              uVar100 = uVar101 + 0xf;
              uVar101 = uVar101 + 8;
            }
            uVar100 = uVar101 | 3;
            while ((int)uVar100 < (int)uVar107) {
              auVar1 = vrcpps_avx(*(undefined1 (*) [16])*pauVar109);
              auVar292._0_4_ = auVar228._0_4_ * auVar1._0_4_;
              auVar292._4_4_ = auVar228._4_4_ * auVar1._4_4_;
              auVar292._8_4_ = auVar228._8_4_ * auVar1._8_4_;
              auVar292._12_4_ = auVar228._12_4_ * auVar1._12_4_;
              auVar36 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar109,auVar292,auVar228);
              auVar1 = vfnmadd213ps_fma(auVar36,auVar1,auVar292);
              *(undefined1 (*) [16])*pauVar111 = auVar1;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
              uVar100 = uVar101 + 7;
              uVar101 = uVar101 + 4;
            }
            if (uVar107 - uVar101 != 0 && (int)uVar101 <= (int)uVar107) {
              lVar115 = 0;
              lVar106 = 0;
              do {
                *(float *)((long)*pauVar111 + lVar106 * 4) =
                     fVar179 / *(float *)(*pauVar109 + lVar106 * 4);
                lVar106 = lVar106 + 1;
                lVar115 = lVar115 + -4;
              } while (uVar107 - uVar101 != (int)lVar106);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        pvVar98 = (void *)((long)pvVar98 + 1);
      } while (pvVar98 != local_218);
      iVar95 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_1a0 == 3 && iVar95 == 4) && 0 < (int)uVar94) {
      uVar94 = iVar93 * iVar114;
      auVar88._4_4_ = local_1a0._4_4_;
      auVar88._0_4_ = (int)local_1a0;
      auVar88._8_8_ = uStack_198;
      iVar93 = vextractps_avx(auVar88,1);
      local_1d0 = local_1d0 * (long)local_1e8;
      local_210 = (void *)0x0;
      do {
        if (0 < (int)uVar105) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_210 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_210 * local_220->elemsize +
                      (long)local_220->data);
          uVar108 = 0;
          do {
            if (0 < (int)uVar96) {
              lVar103 = (long)iVar93 * (long)local_1e8 * uVar108 + local_1d0 * (long)local_210;
              uVar112 = 0;
              do {
                fVar179 = *(float *)((long)local_228 + uVar112 * 4 + lVar103);
                if (iVar114 == 4) {
                  auVar229 = *(undefined1 (*) [16])((long)local_228 + uVar112 * 0x10 + lVar103);
                  auVar116 = ZEXT3264(CONCAT1616(auVar229,auVar229));
LAB_0039cd09:
                  auVar284 = auVar116._0_32_;
                  auVar116 = vinserti64x4_avx512f(auVar116,auVar284,1);
                }
                else {
                  auVar229._4_4_ = fVar179;
                  auVar229._0_4_ = fVar179;
                  auVar229._8_4_ = fVar179;
                  auVar229._12_4_ = fVar179;
                  if (iVar114 == 8) {
                    auVar116 = ZEXT3264(*(undefined1 (*) [32])
                                         ((long)local_228 + uVar112 * 0x20 + lVar103));
                    goto LAB_0039cd09;
                  }
                  auVar284._4_4_ = fVar179;
                  auVar284._0_4_ = fVar179;
                  auVar284._8_4_ = fVar179;
                  auVar284._12_4_ = fVar179;
                  auVar284._16_4_ = fVar179;
                  auVar284._20_4_ = fVar179;
                  auVar284._24_4_ = fVar179;
                  auVar284._28_4_ = fVar179;
                  auVar116 = ZEXT3264(auVar284);
                  if (iVar114 != 0x10) goto LAB_0039cd09;
                  auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_228 + uVar112 * 0x40 + lVar103));
                }
                uVar107 = 0;
                if (0xf < (int)uVar94) {
                  iVar95 = 0xf;
                  do {
                    in_ZMM5 = vrcp14ps_avx512f(*pauVar109);
                    auVar117 = vmulps_avx512f(auVar116,in_ZMM5);
                    auVar118 = vfmsub213ps_avx512f(*pauVar109,auVar117,auVar116);
                    auVar117 = vfnmadd213ps_avx512f(auVar118,in_ZMM5,auVar117);
                    *pauVar111 = auVar117;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    iVar95 = iVar95 + 0x10;
                    uVar107 = uVar94 & 0xfffffff0;
                  } while (iVar95 < (int)uVar94);
                }
                uVar101 = uVar107 | 7;
                while ((int)uVar101 < (int)uVar94) {
                  auVar180 = vrcpps_avx(*(undefined1 (*) [32])*pauVar109);
                  auVar127._0_4_ = auVar284._0_4_ * auVar180._0_4_;
                  auVar127._4_4_ = auVar284._4_4_ * auVar180._4_4_;
                  auVar127._8_4_ = auVar284._8_4_ * auVar180._8_4_;
                  auVar127._12_4_ = auVar284._12_4_ * auVar180._12_4_;
                  auVar127._16_4_ = auVar284._16_4_ * auVar180._16_4_;
                  auVar127._20_4_ = auVar284._20_4_ * auVar180._20_4_;
                  auVar127._28_36_ = in_ZMM5._28_36_;
                  auVar127._24_4_ = auVar284._24_4_ * auVar180._24_4_;
                  auVar182 = auVar127._0_32_;
                  in_ZMM5 = ZEXT3264(auVar182);
                  auVar1 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar109,auVar182,auVar284);
                  auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar180,auVar182);
                  *(undefined1 (*) [32])*pauVar111 = ZEXT1632(auVar1);
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x20);
                  uVar101 = uVar107 + 0xf;
                  uVar107 = uVar107 + 8;
                }
                uVar101 = uVar107 | 3;
                while ((int)uVar101 < (int)uVar94) {
                  auVar1 = vrcpps_avx(*(undefined1 (*) [16])*pauVar109);
                  auVar293._0_4_ = auVar229._0_4_ * auVar1._0_4_;
                  auVar293._4_4_ = auVar229._4_4_ * auVar1._4_4_;
                  auVar293._8_4_ = auVar229._8_4_ * auVar1._8_4_;
                  auVar293._12_4_ = auVar229._12_4_ * auVar1._12_4_;
                  auVar36 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar109,auVar293,auVar229);
                  auVar1 = vfnmadd213ps_fma(auVar36,auVar1,auVar293);
                  *(undefined1 (*) [16])*pauVar111 = auVar1;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar111 = (undefined1 (*) [64])((long)*pauVar111 + 0x10);
                  uVar101 = uVar107 + 7;
                  uVar107 = uVar107 + 4;
                }
                if (uVar94 - uVar107 != 0 && (int)uVar107 <= (int)uVar94) {
                  lVar115 = 0;
                  lVar106 = 0;
                  do {
                    *(float *)((long)*pauVar111 + lVar106 * 4) =
                         fVar179 / *(float *)(*pauVar109 + lVar106 * 4);
                    lVar106 = lVar106 + 1;
                    lVar115 = lVar115 + -4;
                  } while (uVar94 - uVar107 != (int)lVar106);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                }
                uVar112 = uVar112 + 1;
              } while (uVar112 != uVar97);
            }
            uVar108 = uVar108 + 1;
          } while (uVar108 != local_1e0._0_8_);
        }
        local_210 = (void *)((long)local_210 + 1);
        local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      } while (local_210 != local_218);
    }
    break;
  case 9:
    local_1ec = local_220->w;
    local_1a8 = (void *)(ulong)(uint)local_220->h;
    local_190 = (void *)(ulong)(uint)local_220->d;
    local_1c8 = (void *)(ulong)(uint)local_220->c;
    iVar93 = local_220->elempack;
    iVar114 = local_220->dims;
    local_168 = CONCAT44(local_168._4_4_,(int)local_1a0);
    local_210 = (void *)CONCAT44(local_210._4_4_,iVar93);
    if (0 < local_220->h && ((int)local_1a0 == 1 && iVar114 == 2)) {
      iVar114 = iVar93 * local_1ec;
      pvVar98 = (void *)0x0;
      do {
        local_180[1] = *(float *)((long)local_228 + (long)pvVar98 * 4);
        local_1e0 = ZEXT416((uint)local_180[1]);
        if (iVar93 == 4) {
          local_180 = *(__m128 *)((long)local_228 + (long)pvVar98 * 0x10);
          local_160[4] = local_180[0];
          local_160[5] = local_180[1];
          local_160[6] = local_180[2];
          local_160[7] = local_180[3];
          local_160[0] = local_180[0];
          local_160[1] = local_180[1];
          local_160[2] = local_180[2];
          local_160[3] = local_180[3];
LAB_00398e22:
          auVar116 = vinserti64x4_avx512f
                               (ZEXT3264((undefined1  [32])local_160),(undefined1  [32])local_160,1)
          ;
        }
        else {
          local_180[0] = local_180[1];
          local_180[2] = local_180[1];
          local_180[3] = local_180[1];
          if (iVar93 == 8) {
            local_160 = *(__m256 *)((long)local_228 + (long)pvVar98 * 0x20);
            goto LAB_00398e22;
          }
          local_160[1] = local_180[1];
          local_160[0] = local_180[1];
          local_160[2] = local_180[1];
          local_160[3] = local_180[1];
          local_160[4] = local_180[1];
          local_160[5] = local_180[1];
          local_160[6] = local_180[1];
          local_160[7] = local_180[1];
          if (iVar93 != 0x10) goto LAB_00398e22;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar111 = (undefined1 (*) [64])
                    ((long)local_220->w * (long)pvVar98 * local_220->elemsize +
                    (long)local_220->data);
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_1f8->w * (long)pvVar98 * local_1f8->elemsize +
                    (long)local_1f8->data);
        uVar96 = 0;
        local_140._0_64_ = vmovdqa64_avx512f(auVar116);
        local_218 = pvVar98;
        if (0xf < iVar114) {
          uVar105 = 0;
          do {
            auVar116 = vmovdqu64_avx512f(*pauVar111);
            _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                      (&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
            auVar116 = vmovdqu64_avx512f(auVar116);
            *pauVar109 = auVar116;
            pauVar111 = pauVar111 + 1;
            pauVar109 = pauVar109 + 1;
            uVar96 = uVar105 + 0x10;
            iVar93 = uVar105 + 0x1f;
            uVar105 = uVar96;
          } while (iVar93 < iVar114);
        }
        uVar105 = uVar96 | 7;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)*pauVar111;
          uVar190 = *(undefined8 *)(*pauVar111 + 8);
          uVar193 = *(undefined8 *)(*pauVar111 + 0x10);
          uVar194 = *(undefined8 *)(*pauVar111 + 0x18);
          local_c0 = *(undefined1 (*) [32])*pauVar111;
          BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                    (&local_229,(__m256 *)local_c0,&local_160);
          *(undefined8 *)*pauVar109 = uVar191;
          *(undefined8 *)(*pauVar109 + 8) = uVar190;
          *(undefined8 *)(*pauVar109 + 0x10) = uVar193;
          *(undefined8 *)(*pauVar109 + 0x18) = uVar194;
          pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          uVar105 = uVar96 + 0xf;
          uVar96 = uVar96 + 8;
        }
        uVar105 = uVar96 | 3;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)(*pauVar111 + 8);
          local_c0._0_16_ = *(undefined1 (*) [16])*pauVar111;
          afVar310 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                               (&local_229,(__m128 *)local_c0,&local_180);
          *(long *)*pauVar109 = afVar310._0_8_;
          *(undefined8 *)(*pauVar109 + 8) = uVar191;
          pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          uVar105 = uVar96 + 7;
          uVar96 = uVar96 + 4;
        }
        if (iVar114 - uVar96 != 0 && (int)uVar96 <= iVar114) {
          lVar103 = 0;
          do {
            fVar179 = powf((float)local_1e0._0_4_,*(float *)(*pauVar111 + lVar103 * 4));
            *(float *)(*pauVar109 + lVar103 * 4) = fVar179;
            lVar103 = lVar103 + 1;
          } while (iVar114 - uVar96 != (int)lVar103);
        }
        pvVar98 = (void *)((long)local_218 + 1);
        iVar93 = (int)local_210;
      } while (pvVar98 != local_1a8);
      iVar114 = local_220->dims;
    }
    if ((iVar114 - 3U < 2) && ((int)local_168 == 1)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)local_1c8 < 1) break;
      iVar114 = (int)local_1a8 * (int)local_190 * iVar93 * local_1ec;
      pvVar98 = (void *)0x0;
      do {
        local_180[1] = *(float *)((long)local_228 + (long)pvVar98 * 4);
        local_1e0 = ZEXT416((uint)local_180[1]);
        if (iVar93 == 4) {
          local_180 = *(__m128 *)((long)local_228 + (long)pvVar98 * 0x10);
          local_160[4] = local_180[0];
          local_160[5] = local_180[1];
          local_160[6] = local_180[2];
          local_160[7] = local_180[3];
          local_160[0] = local_180[0];
          local_160[1] = local_180[1];
          local_160[2] = local_180[2];
          local_160[3] = local_180[3];
LAB_0039d7b3:
          auVar116 = vinserti64x4_avx512f
                               (ZEXT3264((undefined1  [32])local_160),(undefined1  [32])local_160,1)
          ;
        }
        else {
          local_180[0] = local_180[1];
          local_180[2] = local_180[1];
          local_180[3] = local_180[1];
          if (iVar93 == 8) {
            local_160 = *(__m256 *)((long)local_228 + (long)pvVar98 * 0x20);
            goto LAB_0039d7b3;
          }
          local_160[1] = local_180[1];
          local_160[0] = local_180[1];
          local_160[2] = local_180[1];
          local_160[3] = local_180[1];
          local_160[4] = local_180[1];
          local_160[5] = local_180[1];
          local_160[6] = local_180[1];
          local_160[7] = local_180[1];
          if (iVar93 != 0x10) goto LAB_0039d7b3;
          auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar111 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        pauVar109 = (undefined1 (*) [64])
                    (local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize + (long)local_1f8->data)
        ;
        uVar96 = 0;
        local_140._0_64_ = vmovdqa64_avx512f(auVar116);
        local_218 = pvVar98;
        if (0xf < iVar114) {
          uVar105 = 0;
          do {
            auVar116 = vmovdqu64_avx512f(*pauVar111);
            _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
            BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                      (&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
            auVar116 = vmovdqu64_avx512f(auVar116);
            *pauVar109 = auVar116;
            pauVar111 = pauVar111 + 1;
            pauVar109 = pauVar109 + 1;
            uVar96 = uVar105 + 0x10;
            iVar93 = uVar105 + 0x1f;
            uVar105 = uVar96;
          } while (iVar93 < iVar114);
        }
        uVar105 = uVar96 | 7;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)*pauVar111;
          uVar190 = *(undefined8 *)(*pauVar111 + 8);
          uVar193 = *(undefined8 *)(*pauVar111 + 0x10);
          uVar194 = *(undefined8 *)(*pauVar111 + 0x18);
          local_c0 = *(undefined1 (*) [32])*pauVar111;
          BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                    (&local_229,(__m256 *)local_c0,&local_160);
          *(undefined8 *)*pauVar109 = uVar191;
          *(undefined8 *)(*pauVar109 + 8) = uVar190;
          *(undefined8 *)(*pauVar109 + 0x10) = uVar193;
          *(undefined8 *)(*pauVar109 + 0x18) = uVar194;
          pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          uVar105 = uVar96 + 0xf;
          uVar96 = uVar96 + 8;
        }
        uVar105 = uVar96 | 3;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)(*pauVar111 + 8);
          local_c0._0_16_ = *(undefined1 (*) [16])*pauVar111;
          afVar310 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                               (&local_229,(__m128 *)local_c0,&local_180);
          *(long *)*pauVar109 = afVar310._0_8_;
          *(undefined8 *)(*pauVar109 + 8) = uVar191;
          pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          uVar105 = uVar96 + 7;
          uVar96 = uVar96 + 4;
        }
        if (iVar114 - uVar96 != 0 && (int)uVar96 <= iVar114) {
          lVar103 = 0;
          do {
            fVar179 = powf((float)local_1e0._0_4_,*(float *)(*pauVar111 + lVar103 * 4));
            *(float *)(*pauVar109 + lVar103 * 4) = fVar179;
            lVar103 = lVar103 + 1;
          } while (iVar114 - uVar96 != (int)lVar103);
        }
        pvVar98 = (void *)((long)local_218 + 1);
        iVar93 = (int)local_210;
      } while (pvVar98 != local_1c8);
      iVar114 = local_220->dims;
    }
    iVar95 = local_1ec;
    if (0 < (int)local_1c8 && ((int)local_168 == 2 && iVar114 == 3)) {
      iVar114 = iVar93 * local_1ec;
      local_1c0 = (void *)((long)local_1a0._4_4_ * (long)local_1e8);
      local_1b8 = (void *)0x0;
      local_188 = (void *)CONCAT44(local_188._4_4_,iVar114);
      do {
        if (0 < (int)local_1a8) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_1b8 * local_1f8->elemsize +
                      (long)local_1f8->data);
          local_1b0 = (void *)((long)local_1c0 * (long)local_1b8 + (long)local_228);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1b8 * local_220->elemsize +
                      (long)local_220->data);
          pvVar98 = (void *)0x0;
          do {
            local_180[1] = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
            local_1e0 = ZEXT416((uint)local_180[1]);
            if (iVar93 == 4) {
              local_180 = *(__m128 *)((long)local_1b0 + (long)pvVar98 * 0x10);
              local_160[4] = local_180[0];
              local_160[5] = local_180[1];
              local_160[6] = local_180[2];
              local_160[7] = local_180[3];
              local_160[0] = local_180[0];
              local_160[1] = local_180[1];
              local_160[2] = local_180[2];
              local_160[3] = local_180[3];
LAB_0039fb52:
              auVar116 = vinserti64x4_avx512f
                                   (ZEXT3264((undefined1  [32])local_160),
                                    (undefined1  [32])local_160,1);
            }
            else {
              local_180[0] = local_180[1];
              local_180[2] = local_180[1];
              local_180[3] = local_180[1];
              if (iVar93 == 8) {
                local_160 = *(__m256 *)((long)local_1b0 + (long)pvVar98 * 0x20);
                goto LAB_0039fb52;
              }
              local_160[1] = local_180[1];
              local_160[0] = local_180[1];
              local_160[2] = local_180[1];
              local_160[3] = local_180[1];
              local_160[4] = local_180[1];
              local_160[5] = local_180[1];
              local_160[6] = local_180[1];
              local_160[7] = local_180[1];
              if (iVar93 != 0x10) goto LAB_0039fb52;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_1b0 + (long)pvVar98 * 0x40));
            }
            uVar96 = 0;
            local_140._0_64_ = vmovdqa64_avx512f(auVar116);
            local_218 = pvVar98;
            if (0xf < iVar114) {
              uVar105 = 0;
              do {
                auVar116 = vmovdqu64_avx512f(*pauVar109);
                _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
                BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                          (&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
                auVar116 = vmovdqu64_avx512f(auVar116);
                *pauVar111 = auVar116;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                uVar96 = uVar105 + 0x10;
                iVar93 = uVar105 + 0x1f;
                uVar105 = uVar96;
              } while (iVar93 < iVar114);
            }
            uVar105 = uVar96 | 7;
            while ((int)uVar105 < iVar114) {
              auVar180 = *(undefined1 (*) [32])*pauVar109;
              local_c0._0_4_ = auVar180._0_4_;
              local_c0._4_4_ = auVar180._4_4_;
              local_c0._8_4_ = auVar180._8_4_;
              local_c0._12_4_ = auVar180._12_4_;
              local_c0._16_4_ = auVar180._16_4_;
              local_c0._20_4_ = auVar180._20_4_;
              local_c0._24_4_ = auVar180._24_4_;
              local_c0._28_4_ = auVar180._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                        (&local_229,(__m256 *)local_c0,&local_160);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
              uVar105 = uVar96 + 0xf;
              uVar96 = uVar96 + 8;
            }
            uVar105 = uVar96 | 3;
            while ((int)uVar105 < iVar114) {
              local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
              auVar192 = ZEXT856(*(ulong *)(*pauVar109 + 8));
              afVar310 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                   (&local_229,(__m128 *)local_c0,&local_180);
              auVar121._0_8_ = afVar310._0_8_;
              auVar121._8_56_ = auVar192;
              *(undefined1 (*) [16])*pauVar111 = auVar121._0_16_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
              uVar105 = uVar96 + 7;
              uVar96 = uVar96 + 4;
            }
            if ((int)uVar96 < iVar114) {
              lVar103 = 0;
              lVar115 = 0;
              do {
                fVar179 = powf((float)local_1e0._0_4_,*(float *)(*pauVar109 + lVar103 * 4));
                *(float *)(*pauVar111 + lVar103 * 4) = fVar179;
                lVar115 = lVar115 + -4;
                lVar103 = lVar103 + 1;
              } while (iVar114 - uVar96 != (int)lVar103);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              iVar93 = (int)local_210;
              iVar114 = (int)local_188;
            }
            else {
              iVar93 = (int)local_210;
            }
            pvVar98 = (void *)((long)local_218 + 1);
            iVar95 = local_1ec;
          } while (pvVar98 != local_1a8);
        }
        local_1b8 = (void *)((long)local_1b8 + 1);
      } while (local_1b8 != local_1c8);
      iVar114 = local_220->dims;
    }
    if ((iVar114 == 4) && ((int)local_168 == 2)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)local_1c8 < 1) break;
      iVar114 = iVar93 * iVar95 * (int)local_1a8;
      local_1c0 = (void *)((long)local_1a0._4_4_ * (long)local_1e8);
      local_1b8 = (void *)0x0;
      local_188 = (void *)CONCAT44(local_188._4_4_,iVar114);
      do {
        if (0 < (int)local_190) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_1b8 * local_1f8->elemsize +
                      (long)local_1f8->data);
          local_1b0 = (void *)((long)local_1c0 * (long)local_1b8 + (long)local_228);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1b8 * local_220->elemsize +
                      (long)local_220->data);
          pvVar98 = (void *)0x0;
          do {
            local_180[1] = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
            local_1e0 = ZEXT416((uint)local_180[1]);
            if (iVar93 == 4) {
              local_180 = *(__m128 *)((long)local_1b0 + (long)pvVar98 * 0x10);
              local_160[4] = local_180[0];
              local_160[5] = local_180[1];
              local_160[6] = local_180[2];
              local_160[7] = local_180[3];
              local_160[0] = local_180[0];
              local_160[1] = local_180[1];
              local_160[2] = local_180[2];
              local_160[3] = local_180[3];
LAB_0039fe33:
              auVar116 = vinserti64x4_avx512f
                                   (ZEXT3264((undefined1  [32])local_160),
                                    (undefined1  [32])local_160,1);
            }
            else {
              local_180[0] = local_180[1];
              local_180[2] = local_180[1];
              local_180[3] = local_180[1];
              if (iVar93 == 8) {
                local_160 = *(__m256 *)((long)local_1b0 + (long)pvVar98 * 0x20);
                goto LAB_0039fe33;
              }
              local_160[1] = local_180[1];
              local_160[0] = local_180[1];
              local_160[2] = local_180[1];
              local_160[3] = local_180[1];
              local_160[4] = local_180[1];
              local_160[5] = local_180[1];
              local_160[6] = local_180[1];
              local_160[7] = local_180[1];
              if (iVar93 != 0x10) goto LAB_0039fe33;
              auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_1b0 + (long)pvVar98 * 0x40));
            }
            uVar96 = 0;
            local_140._0_64_ = vmovdqa64_avx512f(auVar116);
            local_218 = pvVar98;
            if (0xf < iVar114) {
              uVar105 = 0;
              do {
                auVar116 = vmovdqu64_avx512f(*pauVar109);
                _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
                BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                          (&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
                auVar116 = vmovdqu64_avx512f(auVar116);
                *pauVar111 = auVar116;
                pauVar109 = pauVar109 + 1;
                pauVar111 = pauVar111 + 1;
                uVar96 = uVar105 + 0x10;
                iVar93 = uVar105 + 0x1f;
                uVar105 = uVar96;
              } while (iVar93 < iVar114);
            }
            uVar105 = uVar96 | 7;
            while ((int)uVar105 < iVar114) {
              auVar180 = *(undefined1 (*) [32])*pauVar109;
              local_c0._0_4_ = auVar180._0_4_;
              local_c0._4_4_ = auVar180._4_4_;
              local_c0._8_4_ = auVar180._8_4_;
              local_c0._12_4_ = auVar180._12_4_;
              local_c0._16_4_ = auVar180._16_4_;
              local_c0._20_4_ = auVar180._20_4_;
              local_c0._24_4_ = auVar180._24_4_;
              local_c0._28_4_ = auVar180._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                        (&local_229,(__m256 *)local_c0,&local_160);
              *(undefined1 (*) [32])*pauVar111 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
              uVar105 = uVar96 + 0xf;
              uVar96 = uVar96 + 8;
            }
            uVar105 = uVar96 | 3;
            while ((int)uVar105 < iVar114) {
              local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
              auVar192 = ZEXT856(*(ulong *)(*pauVar109 + 8));
              afVar310 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                   (&local_229,(__m128 *)local_c0,&local_180);
              auVar122._0_8_ = afVar310._0_8_;
              auVar122._8_56_ = auVar192;
              *(undefined1 (*) [16])*pauVar111 = auVar122._0_16_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
              uVar105 = uVar96 + 7;
              uVar96 = uVar96 + 4;
            }
            if ((int)uVar96 < iVar114) {
              lVar115 = 0;
              lVar103 = 0;
              do {
                fVar179 = powf((float)local_1e0._0_4_,*(float *)(*pauVar109 + lVar103 * 4));
                *(float *)(*pauVar111 + lVar103 * 4) = fVar179;
                lVar103 = lVar103 + 1;
                lVar115 = lVar115 + -4;
              } while (iVar114 - uVar96 != (int)lVar103);
              pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
              iVar93 = (int)local_210;
              iVar114 = (int)local_188;
            }
            else {
              iVar93 = (int)local_210;
            }
            pvVar98 = (void *)((long)local_218 + 1);
            iVar95 = local_1ec;
          } while (pvVar98 != local_190);
        }
        local_1b8 = (void *)((long)local_1b8 + 1);
      } while (local_1b8 != local_1c8);
      iVar114 = local_220->dims;
    }
    local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
    if (((int)local_168 == 3 && iVar114 == 4) && 0 < (int)local_1c8) {
      iVar95 = iVar95 * iVar93;
      local_1d0 = local_1d0 * (long)local_1e8;
      local_1a0 = (void *)((long)local_1a0._4_4_ * (long)local_1e8);
      local_1c0 = (void *)0x0;
      local_1ec = iVar95;
      do {
        if (0 < (int)local_190) {
          pauVar111 = (undefined1 (*) [64])
                      (local_1f8->cstep * (long)local_1c0 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1c0 * local_220->elemsize +
                      (long)local_220->data);
          local_1b8 = (void *)(local_1d0 * (long)local_1c0 + (long)local_228);
          local_188 = (void *)0x0;
          do {
            if (0 < (int)local_1a8) {
              local_1b0 = (void *)((long)local_1a0 * (long)local_188 + (long)local_1b8);
              pvVar98 = (void *)0x0;
              do {
                local_180[1] = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
                local_1e0 = ZEXT416((uint)local_180[1]);
                if (iVar93 == 4) {
                  local_180 = *(__m128 *)((long)local_1b0 + (long)pvVar98 * 0x10);
                  local_160[4] = local_180[0];
                  local_160[5] = local_180[1];
                  local_160[6] = local_180[2];
                  local_160[7] = local_180[3];
                  local_160[0] = local_180[0];
                  local_160[1] = local_180[1];
                  local_160[2] = local_180[2];
                  local_160[3] = local_180[3];
LAB_003a0150:
                  auVar116 = vinserti64x4_avx512f
                                       (ZEXT3264((undefined1  [32])local_160),
                                        (undefined1  [32])local_160,1);
                }
                else {
                  local_180[0] = local_180[1];
                  local_180[2] = local_180[1];
                  local_180[3] = local_180[1];
                  if (iVar93 == 8) {
                    local_160 = *(__m256 *)((long)local_1b0 + (long)pvVar98 * 0x20);
                    goto LAB_003a0150;
                  }
                  local_160[1] = local_180[1];
                  local_160[0] = local_180[1];
                  local_160[2] = local_180[1];
                  local_160[3] = local_180[1];
                  local_160[4] = local_180[1];
                  local_160[5] = local_180[1];
                  local_160[6] = local_180[1];
                  local_160[7] = local_180[1];
                  if (iVar93 != 0x10) goto LAB_003a0150;
                  auVar116 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_1b0 + (long)pvVar98 * 0x40));
                }
                uVar96 = 0;
                local_140._0_64_ = vmovdqa64_avx512f(auVar116);
                local_218 = pvVar98;
                if (0xf < iVar95) {
                  uVar105 = 0;
                  do {
                    auVar116 = vmovdqu64_avx512f(*pauVar109);
                    _local_c0 = (__m512)vmovdqa64_avx512f(auVar116);
                    BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                              (&local_229,(__m512 *)local_c0,(__m512 *)&local_140);
                    auVar116 = vmovdqu64_avx512f(auVar116);
                    *pauVar111 = auVar116;
                    pauVar109 = pauVar109 + 1;
                    pauVar111 = pauVar111 + 1;
                    uVar96 = uVar105 + 0x10;
                    iVar93 = uVar105 + 0x1f;
                    uVar105 = uVar96;
                  } while (iVar93 < iVar95);
                }
                uVar105 = uVar96 | 7;
                while ((int)uVar105 < iVar95) {
                  uVar191 = *(undefined8 *)*pauVar109;
                  uVar190 = *(undefined8 *)(*pauVar109 + 8);
                  uVar193 = *(undefined8 *)(*pauVar109 + 0x10);
                  uVar194 = *(undefined8 *)(*pauVar109 + 0x18);
                  local_c0 = *(undefined1 (*) [32])*pauVar109;
                  BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                            (&local_229,(__m256 *)local_c0,&local_160);
                  *(undefined8 *)*pauVar111 = uVar191;
                  *(undefined8 *)(*pauVar111 + 8) = uVar190;
                  *(undefined8 *)(*pauVar111 + 0x10) = uVar193;
                  *(undefined8 *)(*pauVar111 + 0x18) = uVar194;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x20);
                  uVar105 = uVar96 + 0xf;
                  uVar96 = uVar96 + 8;
                }
                uVar105 = uVar96 | 3;
                while ((int)uVar105 < iVar95) {
                  uVar191 = *(undefined8 *)(*pauVar109 + 8);
                  local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
                  afVar310 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                       (&local_229,(__m128 *)local_c0,&local_180);
                  *(long *)*pauVar111 = afVar310._0_8_;
                  *(undefined8 *)(*pauVar111 + 8) = uVar191;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar111 = (undefined1 (*) [64])(*pauVar111 + 0x10);
                  uVar105 = uVar96 + 7;
                  uVar96 = uVar96 + 4;
                }
                if ((int)uVar96 < iVar95) {
                  lVar115 = 0;
                  lVar103 = 0;
                  do {
                    fVar179 = powf((float)local_1e0._0_4_,*(float *)(*pauVar109 + lVar103 * 4));
                    *(float *)(*pauVar111 + lVar103 * 4) = fVar179;
                    lVar103 = lVar103 + 1;
                    lVar115 = lVar115 + -4;
                  } while (iVar95 - uVar96 != (int)lVar103);
                  pauVar111 = (undefined1 (*) [64])((long)pauVar111 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                  iVar95 = local_1ec;
                }
                pvVar98 = (void *)((long)local_218 + 1);
                iVar93 = (int)local_210;
              } while (pvVar98 != local_1a8);
            }
            local_188 = (void *)((long)local_188 + 1);
          } while (local_188 != local_190);
        }
        local_1c0 = (void *)((long)local_1c0 + 1);
      } while (local_1c0 != local_1c8);
    }
    break;
  case 10:
    local_1ec = local_220->w;
    local_1a8 = (void *)(ulong)(uint)local_220->h;
    local_1b8 = (void *)(ulong)(uint)local_220->d;
    local_1c0 = (void *)(ulong)(uint)local_220->c;
    iVar93 = local_220->elempack;
    iVar114 = local_220->dims;
    local_16c = (float)(int)local_1a0;
    local_210 = (void *)CONCAT44(local_210._4_4_,iVar93);
    if (0 < local_220->h && ((int)local_1a0 == 1 && iVar114 == 2)) {
      iVar114 = iVar93 * local_1ec;
      local_1b0 = (void *)(CONCAT44(local_1b0._4_4_,iVar114) & 0xfffffffffffffff0);
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      pvVar98 = (void *)0x0;
      auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      do {
        auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        local_1e0 = ZEXT416((uint)fVar179);
        if (iVar93 == 4) {
          auVar1 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar181._16_16_ = auVar1;
          auVar181._0_16_ = auVar1;
          local_160[0] = (float)auVar1._0_4_;
          local_160[1] = (float)auVar1._4_4_;
          local_160[2] = (float)auVar1._8_4_;
          local_160[3] = (float)auVar1._12_4_;
LAB_0039c115:
          local_140._0_32_ = auVar181;
LAB_0039c11e:
          auVar131 = vinserti64x4_avx512f(ZEXT3264(auVar181),auVar181,1);
        }
        else {
          local_160[1] = fVar179;
          local_160[0] = fVar179;
          local_160[2] = fVar179;
          local_160[3] = fVar179;
          if (iVar93 == 8) {
            auVar181 = *(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20);
            goto LAB_0039c115;
          }
          auVar181._4_4_ = fVar179;
          auVar181._0_4_ = fVar179;
          auVar181._8_4_ = fVar179;
          auVar181._12_4_ = fVar179;
          auVar181._16_4_ = fVar179;
          auVar181._20_4_ = fVar179;
          auVar181._24_4_ = fVar179;
          auVar181._28_4_ = fVar179;
          local_140._0_32_ = auVar181;
          if (iVar93 != 0x10) goto LAB_0039c11e;
          auVar131 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * (long)pvVar98 * local_220->elemsize +
                    (long)local_220->data);
        puVar110 = (uint *)((long)local_1f8->w * (long)pvVar98 * local_1f8->elemsize +
                           (long)local_1f8->data);
        uVar96 = 0;
        if (0xf < iVar114) {
          auVar130 = vrcp14ps_avx512f(auVar131);
          auVar143 = vfmsub213ps_avx512f(auVar130,auVar131,auVar116);
          auVar132 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar132 = vpternlogd_avx512f(auVar132,auVar131,auVar117,0xf8);
          uVar97 = vcmpps_avx512f(auVar132,auVar129,1);
          auVar132 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar138._4_4_ = (uint)((byte)(uVar97 >> 1) & 1) * auVar132._4_4_;
          auVar138._0_4_ = (uint)((byte)uVar97 & 1) * auVar132._0_4_;
          auVar138._8_4_ = (uint)((byte)(uVar97 >> 2) & 1) * auVar132._8_4_;
          auVar138._12_4_ = (uint)((byte)(uVar97 >> 3) & 1) * auVar132._12_4_;
          auVar138._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar132._16_4_;
          auVar138._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar132._20_4_;
          auVar138._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar132._24_4_;
          auVar138._28_4_ = (uint)((byte)(uVar97 >> 7) & 1) * auVar132._28_4_;
          auVar138._32_4_ = (uint)((byte)(uVar97 >> 8) & 1) * auVar132._32_4_;
          auVar138._36_4_ = (uint)((byte)(uVar97 >> 9) & 1) * auVar132._36_4_;
          auVar138._40_4_ = (uint)((byte)(uVar97 >> 10) & 1) * auVar132._40_4_;
          auVar138._44_4_ = (uint)((byte)(uVar97 >> 0xb) & 1) * auVar132._44_4_;
          auVar138._48_4_ = (uint)((byte)(uVar97 >> 0xc) & 1) * auVar132._48_4_;
          auVar138._52_4_ = (uint)((byte)(uVar97 >> 0xd) & 1) * auVar132._52_4_;
          auVar138._56_4_ = (uint)((byte)(uVar97 >> 0xe) & 1) * auVar132._56_4_;
          auVar138._60_4_ = (uint)(byte)(uVar97 >> 0xf) * auVar132._60_4_;
          auVar143 = vfnmadd132ps_avx512vl(auVar143,auVar130,auVar130);
          iVar93 = 0xf;
          uVar97 = vcmpps_avx512f(auVar131,auVar129,1);
          uVar108 = vcmpps_avx512f(auVar131,auVar129,4);
          do {
            auVar131 = *pauVar109;
            uVar112 = vcmpps_avx512f(auVar131,auVar129,1);
            auVar43._8_4_ = 0xc0490fdb;
            auVar43._0_8_ = 0xc0490fdbc0490fdb;
            auVar43._12_4_ = 0xc0490fdb;
            auVar43._16_4_ = 0xc0490fdb;
            auVar43._20_4_ = 0xc0490fdb;
            auVar43._24_4_ = 0xc0490fdb;
            auVar43._28_4_ = 0xc0490fdb;
            auVar43._32_4_ = 0xc0490fdb;
            auVar43._36_4_ = 0xc0490fdb;
            auVar43._40_4_ = 0xc0490fdb;
            auVar43._44_4_ = 0xc0490fdb;
            auVar43._48_4_ = 0xc0490fdb;
            auVar43._52_4_ = 0xc0490fdb;
            auVar43._56_4_ = 0xc0490fdb;
            auVar43._60_4_ = 0xc0490fdb;
            auVar132 = vblendmps_avx512f(auVar118,auVar43);
            bVar2 = (bool)((byte)uVar112 & 1);
            auVar139._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_;
            bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
            auVar139._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar130._4_4_;
            bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
            auVar139._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar130._8_4_;
            bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
            auVar139._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar130._12_4_;
            bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
            auVar139._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar130._16_4_;
            bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
            auVar139._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar130._20_4_;
            bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
            auVar139._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar130._24_4_;
            bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
            auVar139._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar130._28_4_;
            bVar2 = (bool)((byte)(uVar112 >> 8) & 1);
            auVar139._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar130._32_4_;
            bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
            auVar139._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar130._36_4_;
            bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
            auVar139._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar130._40_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
            auVar139._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar130._44_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
            auVar139._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar130._48_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
            auVar139._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar130._52_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
            auVar139._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar130._56_4_;
            bVar2 = SUB81(uVar112 >> 0xf,0);
            auVar139._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar130._60_4_;
            auVar130 = vmulps_avx512f(auVar131,auVar143);
            auVar132 = vandps_avx512dq(auVar130,auVar119);
            uVar112 = vcmpps_avx512f(auVar116,auVar132,1);
            auVar133 = vmaxps_avx512f(auVar132,auVar116);
            auVar44._8_4_ = 0xbf800000;
            auVar44._0_8_ = 0xbf800000bf800000;
            auVar44._12_4_ = 0xbf800000;
            auVar44._16_4_ = 0xbf800000;
            auVar44._20_4_ = 0xbf800000;
            auVar44._24_4_ = 0xbf800000;
            auVar44._28_4_ = 0xbf800000;
            auVar44._32_4_ = 0xbf800000;
            auVar44._36_4_ = 0xbf800000;
            auVar44._40_4_ = 0xbf800000;
            auVar44._44_4_ = 0xbf800000;
            auVar44._48_4_ = 0xbf800000;
            auVar44._52_4_ = 0xbf800000;
            auVar44._56_4_ = 0xbf800000;
            auVar44._60_4_ = 0xbf800000;
            auVar134 = vblendmps_avx512f(auVar132,auVar44);
            bVar2 = (bool)((byte)uVar112 & 1);
            auVar140._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
            bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
            bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
            bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_;
            bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
            auVar140._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_;
            bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
            auVar140._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_;
            bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
            auVar140._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_;
            bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
            auVar140._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_;
            bVar18 = (byte)(uVar112 >> 8);
            bVar2 = (bool)(bVar18 & 1);
            auVar140._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_;
            bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
            auVar140._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_;
            bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
            auVar140._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
            auVar140._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
            auVar140._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
            auVar140._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
            auVar140._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_;
            bVar2 = SUB81(uVar112 >> 0xf,0);
            auVar140._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_;
            auVar132 = vrcp14ps_avx512f(auVar133);
            auVar134 = vmulps_avx512f(auVar140,auVar132);
            auVar133 = vfmsub213ps_avx512f(auVar133,auVar134,auVar140);
            auVar132 = vfnmadd213ps_avx512f(auVar133,auVar132,auVar134);
            auVar133 = vmulps_avx512f(auVar132,auVar132);
            auVar134 = vmulps_avx512f(auVar133,auVar133);
            auVar135 = vfmadd213ps_avx512f(auVar120,auVar134,auVar121);
            auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar122);
            auVar136 = vfmadd213ps_avx512f(auVar124,auVar134,auVar125);
            auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar126);
            auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar127);
            auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar123);
            auVar134 = vfmadd213ps_avx512f(auVar136,auVar134,auVar116);
            auVar133 = vfmadd231ps_avx512f(auVar134,auVar133,auVar135);
            auVar132 = vmulps_avx512f(auVar133,auVar132);
            uVar35 = vcmpps_avx512f(auVar131,auVar129,4);
            auVar133 = vaddps_avx512f(auVar132,auVar128);
            bVar2 = (bool)((byte)uVar112 & 1);
            auVar141._0_4_ = (uint)bVar2 * auVar133._0_4_ | (uint)!bVar2 * auVar132._0_4_;
            bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
            auVar141._4_4_ = (uint)bVar2 * auVar133._4_4_ | (uint)!bVar2 * auVar132._4_4_;
            bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
            auVar141._8_4_ = (uint)bVar2 * auVar133._8_4_ | (uint)!bVar2 * auVar132._8_4_;
            bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
            auVar141._12_4_ = (uint)bVar2 * auVar133._12_4_ | (uint)!bVar2 * auVar132._12_4_;
            bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
            auVar141._16_4_ = (uint)bVar2 * auVar133._16_4_ | (uint)!bVar2 * auVar132._16_4_;
            bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
            auVar141._20_4_ = (uint)bVar2 * auVar133._20_4_ | (uint)!bVar2 * auVar132._20_4_;
            bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
            auVar141._24_4_ = (uint)bVar2 * auVar133._24_4_ | (uint)!bVar2 * auVar132._24_4_;
            bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
            auVar141._28_4_ = (uint)bVar2 * auVar133._28_4_ | (uint)!bVar2 * auVar132._28_4_;
            bVar2 = (bool)(bVar18 & 1);
            auVar141._32_4_ = (uint)bVar2 * auVar133._32_4_ | (uint)!bVar2 * auVar132._32_4_;
            bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
            auVar141._36_4_ = (uint)bVar2 * auVar133._36_4_ | (uint)!bVar2 * auVar132._36_4_;
            bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
            auVar141._40_4_ = (uint)bVar2 * auVar133._40_4_ | (uint)!bVar2 * auVar132._40_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
            auVar141._44_4_ = (uint)bVar2 * auVar133._44_4_ | (uint)!bVar2 * auVar132._44_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
            auVar141._48_4_ = (uint)bVar2 * auVar133._48_4_ | (uint)!bVar2 * auVar132._48_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
            auVar141._52_4_ = (uint)bVar2 * auVar133._52_4_ | (uint)!bVar2 * auVar132._52_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
            auVar141._56_4_ = (uint)bVar2 * auVar133._56_4_ | (uint)!bVar2 * auVar132._56_4_;
            bVar2 = SUB81(uVar112 >> 0xf,0);
            auVar141._60_4_ = (uint)bVar2 * auVar133._60_4_ | (uint)!bVar2 * auVar132._60_4_;
            auVar130 = vpternlogd_avx512f(auVar141,auVar130,auVar117,0xf8);
            auVar132 = vaddps_avx512f(auVar130,auVar139);
            bVar2 = (bool)((byte)uVar97 & 1);
            bVar4 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar97 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar97 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar97 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar97 >> 6) & 1);
            bVar10 = (bool)((byte)(uVar97 >> 7) & 1);
            bVar11 = (bool)((byte)(uVar97 >> 8) & 1);
            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
            bVar19 = SUB81(uVar97 >> 0xf,0);
            auVar131 = vpternlogd_avx512f(auVar131,auVar117,auVar309,0xea);
            bVar3 = (bool)((byte)uVar108 & 1);
            auVar142._0_4_ =
                 (uint)bVar3 * ((uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_) |
                 (uint)!bVar3 * auVar131._0_4_;
            bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar142._4_4_ =
                 (uint)bVar2 * ((uint)bVar4 * auVar132._4_4_ | (uint)!bVar4 * auVar130._4_4_) |
                 (uint)!bVar2 * auVar131._4_4_;
            bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar142._8_4_ =
                 (uint)bVar2 * ((uint)bVar5 * auVar132._8_4_ | (uint)!bVar5 * auVar130._8_4_) |
                 (uint)!bVar2 * auVar131._8_4_;
            bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar142._12_4_ =
                 (uint)bVar2 * ((uint)bVar6 * auVar132._12_4_ | (uint)!bVar6 * auVar130._12_4_) |
                 (uint)!bVar2 * auVar131._12_4_;
            bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar142._16_4_ =
                 (uint)bVar2 * ((uint)bVar7 * auVar132._16_4_ | (uint)!bVar7 * auVar130._16_4_) |
                 (uint)!bVar2 * auVar131._16_4_;
            bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar142._20_4_ =
                 (uint)bVar2 * ((uint)bVar8 * auVar132._20_4_ | (uint)!bVar8 * auVar130._20_4_) |
                 (uint)!bVar2 * auVar131._20_4_;
            bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar142._24_4_ =
                 (uint)bVar2 * ((uint)bVar9 * auVar132._24_4_ | (uint)!bVar9 * auVar130._24_4_) |
                 (uint)!bVar2 * auVar131._24_4_;
            bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
            auVar142._28_4_ =
                 (uint)bVar2 * ((uint)bVar10 * auVar132._28_4_ | (uint)!bVar10 * auVar130._28_4_) |
                 (uint)!bVar2 * auVar131._28_4_;
            bVar2 = (bool)((byte)(uVar108 >> 8) & 1);
            auVar142._32_4_ =
                 (uint)bVar2 * ((uint)bVar11 * auVar132._32_4_ | (uint)!bVar11 * auVar130._32_4_) |
                 (uint)!bVar2 * auVar131._32_4_;
            bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
            auVar142._36_4_ =
                 (uint)bVar2 * ((uint)bVar12 * auVar132._36_4_ | (uint)!bVar12 * auVar130._36_4_) |
                 (uint)!bVar2 * auVar131._36_4_;
            bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
            auVar142._40_4_ =
                 (uint)bVar2 * ((uint)bVar13 * auVar132._40_4_ | (uint)!bVar13 * auVar130._40_4_) |
                 (uint)!bVar2 * auVar131._40_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
            auVar142._44_4_ =
                 (uint)bVar2 * ((uint)bVar14 * auVar132._44_4_ | (uint)!bVar14 * auVar130._44_4_) |
                 (uint)!bVar2 * auVar131._44_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
            auVar142._48_4_ =
                 (uint)bVar2 * ((uint)bVar15 * auVar132._48_4_ | (uint)!bVar15 * auVar130._48_4_) |
                 (uint)!bVar2 * auVar131._48_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
            auVar142._52_4_ =
                 (uint)bVar2 * ((uint)bVar16 * auVar132._52_4_ | (uint)!bVar16 * auVar130._52_4_) |
                 (uint)!bVar2 * auVar131._52_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
            auVar142._56_4_ =
                 (uint)bVar2 * ((uint)bVar17 * auVar132._56_4_ | (uint)!bVar17 * auVar130._56_4_) |
                 (uint)!bVar2 * auVar131._56_4_;
            bVar2 = SUB81(uVar108 >> 0xf,0);
            auVar142._60_4_ =
                 (uint)bVar2 * ((uint)bVar19 * auVar132._60_4_ | (uint)!bVar19 * auVar130._60_4_) |
                 (uint)!bVar2 * auVar131._60_4_;
            auVar131 = vblendmps_avx512f(auVar138,auVar142);
            bVar2 = (bool)((byte)uVar35 & 1);
            bVar3 = (bool)((byte)(uVar35 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar35 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar35 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar35 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar35 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar35 >> 6) & 1);
            bVar9 = (bool)((byte)(uVar35 >> 7) & 1);
            bVar10 = (bool)((byte)(uVar35 >> 8) & 1);
            bVar11 = (bool)((byte)(uVar35 >> 9) & 1);
            bVar12 = (bool)((byte)(uVar35 >> 10) & 1);
            bVar13 = (bool)((byte)(uVar35 >> 0xb) & 1);
            bVar14 = (bool)((byte)(uVar35 >> 0xc) & 1);
            bVar15 = (bool)((byte)(uVar35 >> 0xd) & 1);
            bVar16 = (bool)((byte)(uVar35 >> 0xe) & 1);
            bVar17 = SUB81(uVar35 >> 0xf,0);
            *puVar110 = (uint)bVar2 * auVar131._0_4_ | !bVar2 * auVar142._0_4_;
            puVar110[1] = (uint)bVar3 * auVar131._4_4_ | !bVar3 * auVar142._4_4_;
            puVar110[2] = (uint)bVar4 * auVar131._8_4_ | !bVar4 * auVar142._8_4_;
            puVar110[3] = (uint)bVar5 * auVar131._12_4_ | !bVar5 * auVar142._12_4_;
            puVar110[4] = (uint)bVar6 * auVar131._16_4_ | !bVar6 * auVar142._16_4_;
            puVar110[5] = (uint)bVar7 * auVar131._20_4_ | !bVar7 * auVar142._20_4_;
            puVar110[6] = (uint)bVar8 * auVar131._24_4_ | !bVar8 * auVar142._24_4_;
            puVar110[7] = (uint)bVar9 * auVar131._28_4_ | !bVar9 * auVar142._28_4_;
            puVar110[8] = (uint)bVar10 * auVar131._32_4_ | !bVar10 * auVar142._32_4_;
            puVar110[9] = (uint)bVar11 * auVar131._36_4_ | !bVar11 * auVar142._36_4_;
            puVar110[10] = (uint)bVar12 * auVar131._40_4_ | !bVar12 * auVar142._40_4_;
            puVar110[0xb] = (uint)bVar13 * auVar131._44_4_ | !bVar13 * auVar142._44_4_;
            puVar110[0xc] = (uint)bVar14 * auVar131._48_4_ | !bVar14 * auVar142._48_4_;
            puVar110[0xd] = (uint)bVar15 * auVar131._52_4_ | !bVar15 * auVar142._52_4_;
            puVar110[0xe] = (uint)bVar16 * auVar131._56_4_ | !bVar16 * auVar142._56_4_;
            puVar110[0xf] = (uint)bVar17 * auVar131._60_4_ | !bVar17 * auVar142._60_4_;
            pauVar109 = pauVar109 + 1;
            puVar110 = puVar110 + 0x10;
            iVar93 = iVar93 + 0x10;
            auVar130 = auVar139;
          } while (iVar93 < iVar114);
          uVar96 = (uint)local_1b0;
        }
        uVar105 = uVar96 | 7;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)*pauVar109;
          uVar190 = *(undefined8 *)(*pauVar109 + 8);
          uVar193 = *(undefined8 *)(*pauVar109 + 0x10);
          uVar194 = *(undefined8 *)(*pauVar109 + 0x18);
          local_c0 = *(undefined1 (*) [32])*pauVar109;
          BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                    ((binary_op_atan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
          *(undefined8 *)puVar110 = uVar191;
          *(undefined8 *)(puVar110 + 2) = uVar190;
          *(undefined8 *)(puVar110 + 4) = uVar193;
          *(undefined8 *)(puVar110 + 6) = uVar194;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          puVar110 = puVar110 + 8;
          uVar105 = uVar96 + 0xf;
          uVar96 = uVar96 + 8;
        }
        uVar105 = uVar96 | 3;
        local_218 = pvVar98;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)(*pauVar109 + 8);
          local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
          afVar310 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                               ((binary_op_atan2 *)local_180,(__m128 *)local_c0,(__m128 *)local_160)
          ;
          *(long *)puVar110 = afVar310._0_8_;
          *(undefined8 *)(puVar110 + 2) = uVar191;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          puVar110 = puVar110 + 4;
          uVar105 = uVar96 + 7;
          uVar96 = uVar96 + 4;
        }
        if (iVar114 - uVar96 != 0 && (int)uVar96 <= iVar114) {
          lVar103 = 0;
          do {
            fVar179 = atan2f(*(float *)(*pauVar109 + lVar103 * 4),(float)local_1e0._0_4_);
            puVar110[lVar103] = (uint)fVar179;
            lVar103 = lVar103 + 1;
          } while (iVar114 - uVar96 != (int)lVar103);
        }
        pvVar98 = (void *)((long)local_218 + 1);
        auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        iVar93 = (int)local_210;
      } while (pvVar98 != local_1a8);
      iVar114 = local_220->dims;
    }
    if ((iVar114 - 3U < 2) && (local_16c == 1.4013e-45)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)local_1c0 < 1) break;
      iVar114 = (int)local_1a8 * (int)local_1b8 * iVar93 * local_1ec;
      local_1b0 = (void *)(CONCAT44(local_1b0._4_4_,iVar114) & 0xfffffffffffffff0);
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      pvVar98 = (void *)0x0;
      auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      do {
        auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        if (iVar93 == 4) {
          auVar1 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar183._16_16_ = auVar1;
          auVar183._0_16_ = auVar1;
          local_160[0] = (float)auVar1._0_4_;
          local_160[1] = (float)auVar1._4_4_;
          local_160[2] = (float)auVar1._8_4_;
          local_160[3] = (float)auVar1._12_4_;
LAB_0039d3ca:
          local_140._0_32_ = auVar183;
LAB_0039d3d3:
          auVar131 = vinserti64x4_avx512f(ZEXT3264(auVar183),auVar183,1);
        }
        else {
          local_160[1] = fVar179;
          local_160[0] = fVar179;
          local_160[2] = fVar179;
          local_160[3] = fVar179;
          if (iVar93 == 8) {
            auVar183 = *(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20);
            goto LAB_0039d3ca;
          }
          auVar183._4_4_ = fVar179;
          auVar183._0_4_ = fVar179;
          auVar183._8_4_ = fVar179;
          auVar183._12_4_ = fVar179;
          auVar183._16_4_ = fVar179;
          auVar183._20_4_ = fVar179;
          auVar183._24_4_ = fVar179;
          auVar183._28_4_ = fVar179;
          local_140._0_32_ = auVar183;
          if (iVar93 != 0x10) goto LAB_0039d3d3;
          auVar131 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        local_1e0 = ZEXT416((uint)fVar179);
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        puVar110 = (uint *)(local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                           (long)local_1f8->data);
        uVar96 = 0;
        if (0xf < iVar114) {
          auVar130 = vrcp14ps_avx512f(auVar131);
          auVar143 = vfmsub213ps_avx512f(auVar130,auVar131,auVar116);
          auVar132 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar132 = vpternlogd_avx512f(auVar132,auVar131,auVar117,0xf8);
          uVar97 = vcmpps_avx512f(auVar132,auVar129,1);
          auVar132 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar147._4_4_ = (uint)((byte)(uVar97 >> 1) & 1) * auVar132._4_4_;
          auVar147._0_4_ = (uint)((byte)uVar97 & 1) * auVar132._0_4_;
          auVar147._8_4_ = (uint)((byte)(uVar97 >> 2) & 1) * auVar132._8_4_;
          auVar147._12_4_ = (uint)((byte)(uVar97 >> 3) & 1) * auVar132._12_4_;
          auVar147._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar132._16_4_;
          auVar147._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar132._20_4_;
          auVar147._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar132._24_4_;
          auVar147._28_4_ = (uint)((byte)(uVar97 >> 7) & 1) * auVar132._28_4_;
          auVar147._32_4_ = (uint)((byte)(uVar97 >> 8) & 1) * auVar132._32_4_;
          auVar147._36_4_ = (uint)((byte)(uVar97 >> 9) & 1) * auVar132._36_4_;
          auVar147._40_4_ = (uint)((byte)(uVar97 >> 10) & 1) * auVar132._40_4_;
          auVar147._44_4_ = (uint)((byte)(uVar97 >> 0xb) & 1) * auVar132._44_4_;
          auVar147._48_4_ = (uint)((byte)(uVar97 >> 0xc) & 1) * auVar132._48_4_;
          auVar147._52_4_ = (uint)((byte)(uVar97 >> 0xd) & 1) * auVar132._52_4_;
          auVar147._56_4_ = (uint)((byte)(uVar97 >> 0xe) & 1) * auVar132._56_4_;
          auVar147._60_4_ = (uint)(byte)(uVar97 >> 0xf) * auVar132._60_4_;
          auVar143 = vfnmadd132ps_avx512vl(auVar143,auVar130,auVar130);
          iVar93 = 0xf;
          uVar97 = vcmpps_avx512f(auVar131,auVar129,1);
          uVar108 = vcmpps_avx512f(auVar131,auVar129,4);
          do {
            auVar131 = *pauVar109;
            uVar112 = vcmpps_avx512f(auVar131,auVar129,1);
            auVar45._8_4_ = 0xc0490fdb;
            auVar45._0_8_ = 0xc0490fdbc0490fdb;
            auVar45._12_4_ = 0xc0490fdb;
            auVar45._16_4_ = 0xc0490fdb;
            auVar45._20_4_ = 0xc0490fdb;
            auVar45._24_4_ = 0xc0490fdb;
            auVar45._28_4_ = 0xc0490fdb;
            auVar45._32_4_ = 0xc0490fdb;
            auVar45._36_4_ = 0xc0490fdb;
            auVar45._40_4_ = 0xc0490fdb;
            auVar45._44_4_ = 0xc0490fdb;
            auVar45._48_4_ = 0xc0490fdb;
            auVar45._52_4_ = 0xc0490fdb;
            auVar45._56_4_ = 0xc0490fdb;
            auVar45._60_4_ = 0xc0490fdb;
            auVar132 = vblendmps_avx512f(auVar118,auVar45);
            bVar2 = (bool)((byte)uVar112 & 1);
            auVar148._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_;
            bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
            auVar148._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar130._4_4_;
            bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
            auVar148._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar130._8_4_;
            bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
            auVar148._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar130._12_4_;
            bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
            auVar148._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar130._16_4_;
            bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
            auVar148._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar130._20_4_;
            bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
            auVar148._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar130._24_4_;
            bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
            auVar148._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar130._28_4_;
            bVar2 = (bool)((byte)(uVar112 >> 8) & 1);
            auVar148._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar130._32_4_;
            bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
            auVar148._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar130._36_4_;
            bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
            auVar148._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar130._40_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
            auVar148._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar130._44_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
            auVar148._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar130._48_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
            auVar148._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar130._52_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
            auVar148._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar130._56_4_;
            bVar2 = SUB81(uVar112 >> 0xf,0);
            auVar148._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar130._60_4_;
            auVar130 = vmulps_avx512f(auVar131,auVar143);
            auVar132 = vandps_avx512dq(auVar130,auVar119);
            uVar112 = vcmpps_avx512f(auVar116,auVar132,1);
            auVar133 = vmaxps_avx512f(auVar132,auVar116);
            auVar46._8_4_ = 0xbf800000;
            auVar46._0_8_ = 0xbf800000bf800000;
            auVar46._12_4_ = 0xbf800000;
            auVar46._16_4_ = 0xbf800000;
            auVar46._20_4_ = 0xbf800000;
            auVar46._24_4_ = 0xbf800000;
            auVar46._28_4_ = 0xbf800000;
            auVar46._32_4_ = 0xbf800000;
            auVar46._36_4_ = 0xbf800000;
            auVar46._40_4_ = 0xbf800000;
            auVar46._44_4_ = 0xbf800000;
            auVar46._48_4_ = 0xbf800000;
            auVar46._52_4_ = 0xbf800000;
            auVar46._56_4_ = 0xbf800000;
            auVar46._60_4_ = 0xbf800000;
            auVar134 = vblendmps_avx512f(auVar132,auVar46);
            bVar2 = (bool)((byte)uVar112 & 1);
            auVar149._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
            bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
            auVar149._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
            bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
            auVar149._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
            bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
            auVar149._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_;
            bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
            auVar149._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_;
            bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
            auVar149._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_;
            bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
            auVar149._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_;
            bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
            auVar149._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_;
            bVar18 = (byte)(uVar112 >> 8);
            bVar2 = (bool)(bVar18 & 1);
            auVar149._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_;
            bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
            auVar149._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_;
            bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
            auVar149._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
            auVar149._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
            auVar149._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
            auVar149._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
            auVar149._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_;
            bVar2 = SUB81(uVar112 >> 0xf,0);
            auVar149._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_;
            auVar132 = vrcp14ps_avx512f(auVar133);
            auVar134 = vmulps_avx512f(auVar149,auVar132);
            auVar133 = vfmsub213ps_avx512f(auVar133,auVar134,auVar149);
            auVar132 = vfnmadd213ps_avx512f(auVar133,auVar132,auVar134);
            auVar133 = vmulps_avx512f(auVar132,auVar132);
            auVar134 = vmulps_avx512f(auVar133,auVar133);
            auVar135 = vfmadd213ps_avx512f(auVar120,auVar134,auVar121);
            auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar122);
            auVar136 = vfmadd213ps_avx512f(auVar124,auVar134,auVar125);
            auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar126);
            auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar127);
            auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar123);
            auVar134 = vfmadd213ps_avx512f(auVar136,auVar134,auVar116);
            auVar133 = vfmadd231ps_avx512f(auVar134,auVar133,auVar135);
            auVar132 = vmulps_avx512f(auVar133,auVar132);
            uVar35 = vcmpps_avx512f(auVar131,auVar129,4);
            auVar133 = vaddps_avx512f(auVar132,auVar128);
            bVar2 = (bool)((byte)uVar112 & 1);
            auVar150._0_4_ = (uint)bVar2 * auVar133._0_4_ | (uint)!bVar2 * auVar132._0_4_;
            bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
            auVar150._4_4_ = (uint)bVar2 * auVar133._4_4_ | (uint)!bVar2 * auVar132._4_4_;
            bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
            auVar150._8_4_ = (uint)bVar2 * auVar133._8_4_ | (uint)!bVar2 * auVar132._8_4_;
            bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
            auVar150._12_4_ = (uint)bVar2 * auVar133._12_4_ | (uint)!bVar2 * auVar132._12_4_;
            bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
            auVar150._16_4_ = (uint)bVar2 * auVar133._16_4_ | (uint)!bVar2 * auVar132._16_4_;
            bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
            auVar150._20_4_ = (uint)bVar2 * auVar133._20_4_ | (uint)!bVar2 * auVar132._20_4_;
            bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
            auVar150._24_4_ = (uint)bVar2 * auVar133._24_4_ | (uint)!bVar2 * auVar132._24_4_;
            bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
            auVar150._28_4_ = (uint)bVar2 * auVar133._28_4_ | (uint)!bVar2 * auVar132._28_4_;
            bVar2 = (bool)(bVar18 & 1);
            auVar150._32_4_ = (uint)bVar2 * auVar133._32_4_ | (uint)!bVar2 * auVar132._32_4_;
            bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
            auVar150._36_4_ = (uint)bVar2 * auVar133._36_4_ | (uint)!bVar2 * auVar132._36_4_;
            bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
            auVar150._40_4_ = (uint)bVar2 * auVar133._40_4_ | (uint)!bVar2 * auVar132._40_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
            auVar150._44_4_ = (uint)bVar2 * auVar133._44_4_ | (uint)!bVar2 * auVar132._44_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
            auVar150._48_4_ = (uint)bVar2 * auVar133._48_4_ | (uint)!bVar2 * auVar132._48_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
            auVar150._52_4_ = (uint)bVar2 * auVar133._52_4_ | (uint)!bVar2 * auVar132._52_4_;
            bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
            auVar150._56_4_ = (uint)bVar2 * auVar133._56_4_ | (uint)!bVar2 * auVar132._56_4_;
            bVar2 = SUB81(uVar112 >> 0xf,0);
            auVar150._60_4_ = (uint)bVar2 * auVar133._60_4_ | (uint)!bVar2 * auVar132._60_4_;
            auVar130 = vpternlogd_avx512f(auVar150,auVar130,auVar117,0xf8);
            auVar132 = vaddps_avx512f(auVar130,auVar148);
            bVar2 = (bool)((byte)uVar97 & 1);
            bVar4 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar97 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar97 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar97 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar97 >> 6) & 1);
            bVar10 = (bool)((byte)(uVar97 >> 7) & 1);
            bVar11 = (bool)((byte)(uVar97 >> 8) & 1);
            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
            bVar19 = SUB81(uVar97 >> 0xf,0);
            auVar131 = vpternlogd_avx512f(auVar131,auVar117,auVar309,0xea);
            bVar3 = (bool)((byte)uVar108 & 1);
            auVar151._0_4_ =
                 (uint)bVar3 * ((uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_) |
                 (uint)!bVar3 * auVar131._0_4_;
            bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar151._4_4_ =
                 (uint)bVar2 * ((uint)bVar4 * auVar132._4_4_ | (uint)!bVar4 * auVar130._4_4_) |
                 (uint)!bVar2 * auVar131._4_4_;
            bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar151._8_4_ =
                 (uint)bVar2 * ((uint)bVar5 * auVar132._8_4_ | (uint)!bVar5 * auVar130._8_4_) |
                 (uint)!bVar2 * auVar131._8_4_;
            bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar151._12_4_ =
                 (uint)bVar2 * ((uint)bVar6 * auVar132._12_4_ | (uint)!bVar6 * auVar130._12_4_) |
                 (uint)!bVar2 * auVar131._12_4_;
            bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar151._16_4_ =
                 (uint)bVar2 * ((uint)bVar7 * auVar132._16_4_ | (uint)!bVar7 * auVar130._16_4_) |
                 (uint)!bVar2 * auVar131._16_4_;
            bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar151._20_4_ =
                 (uint)bVar2 * ((uint)bVar8 * auVar132._20_4_ | (uint)!bVar8 * auVar130._20_4_) |
                 (uint)!bVar2 * auVar131._20_4_;
            bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar151._24_4_ =
                 (uint)bVar2 * ((uint)bVar9 * auVar132._24_4_ | (uint)!bVar9 * auVar130._24_4_) |
                 (uint)!bVar2 * auVar131._24_4_;
            bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
            auVar151._28_4_ =
                 (uint)bVar2 * ((uint)bVar10 * auVar132._28_4_ | (uint)!bVar10 * auVar130._28_4_) |
                 (uint)!bVar2 * auVar131._28_4_;
            bVar2 = (bool)((byte)(uVar108 >> 8) & 1);
            auVar151._32_4_ =
                 (uint)bVar2 * ((uint)bVar11 * auVar132._32_4_ | (uint)!bVar11 * auVar130._32_4_) |
                 (uint)!bVar2 * auVar131._32_4_;
            bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
            auVar151._36_4_ =
                 (uint)bVar2 * ((uint)bVar12 * auVar132._36_4_ | (uint)!bVar12 * auVar130._36_4_) |
                 (uint)!bVar2 * auVar131._36_4_;
            bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
            auVar151._40_4_ =
                 (uint)bVar2 * ((uint)bVar13 * auVar132._40_4_ | (uint)!bVar13 * auVar130._40_4_) |
                 (uint)!bVar2 * auVar131._40_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
            auVar151._44_4_ =
                 (uint)bVar2 * ((uint)bVar14 * auVar132._44_4_ | (uint)!bVar14 * auVar130._44_4_) |
                 (uint)!bVar2 * auVar131._44_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
            auVar151._48_4_ =
                 (uint)bVar2 * ((uint)bVar15 * auVar132._48_4_ | (uint)!bVar15 * auVar130._48_4_) |
                 (uint)!bVar2 * auVar131._48_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
            auVar151._52_4_ =
                 (uint)bVar2 * ((uint)bVar16 * auVar132._52_4_ | (uint)!bVar16 * auVar130._52_4_) |
                 (uint)!bVar2 * auVar131._52_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
            auVar151._56_4_ =
                 (uint)bVar2 * ((uint)bVar17 * auVar132._56_4_ | (uint)!bVar17 * auVar130._56_4_) |
                 (uint)!bVar2 * auVar131._56_4_;
            bVar2 = SUB81(uVar108 >> 0xf,0);
            auVar151._60_4_ =
                 (uint)bVar2 * ((uint)bVar19 * auVar132._60_4_ | (uint)!bVar19 * auVar130._60_4_) |
                 (uint)!bVar2 * auVar131._60_4_;
            auVar131 = vblendmps_avx512f(auVar147,auVar151);
            bVar2 = (bool)((byte)uVar35 & 1);
            bVar3 = (bool)((byte)(uVar35 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar35 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar35 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar35 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar35 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar35 >> 6) & 1);
            bVar9 = (bool)((byte)(uVar35 >> 7) & 1);
            bVar10 = (bool)((byte)(uVar35 >> 8) & 1);
            bVar11 = (bool)((byte)(uVar35 >> 9) & 1);
            bVar12 = (bool)((byte)(uVar35 >> 10) & 1);
            bVar13 = (bool)((byte)(uVar35 >> 0xb) & 1);
            bVar14 = (bool)((byte)(uVar35 >> 0xc) & 1);
            bVar15 = (bool)((byte)(uVar35 >> 0xd) & 1);
            bVar16 = (bool)((byte)(uVar35 >> 0xe) & 1);
            bVar17 = SUB81(uVar35 >> 0xf,0);
            *puVar110 = (uint)bVar2 * auVar131._0_4_ | !bVar2 * auVar151._0_4_;
            puVar110[1] = (uint)bVar3 * auVar131._4_4_ | !bVar3 * auVar151._4_4_;
            puVar110[2] = (uint)bVar4 * auVar131._8_4_ | !bVar4 * auVar151._8_4_;
            puVar110[3] = (uint)bVar5 * auVar131._12_4_ | !bVar5 * auVar151._12_4_;
            puVar110[4] = (uint)bVar6 * auVar131._16_4_ | !bVar6 * auVar151._16_4_;
            puVar110[5] = (uint)bVar7 * auVar131._20_4_ | !bVar7 * auVar151._20_4_;
            puVar110[6] = (uint)bVar8 * auVar131._24_4_ | !bVar8 * auVar151._24_4_;
            puVar110[7] = (uint)bVar9 * auVar131._28_4_ | !bVar9 * auVar151._28_4_;
            puVar110[8] = (uint)bVar10 * auVar131._32_4_ | !bVar10 * auVar151._32_4_;
            puVar110[9] = (uint)bVar11 * auVar131._36_4_ | !bVar11 * auVar151._36_4_;
            puVar110[10] = (uint)bVar12 * auVar131._40_4_ | !bVar12 * auVar151._40_4_;
            puVar110[0xb] = (uint)bVar13 * auVar131._44_4_ | !bVar13 * auVar151._44_4_;
            puVar110[0xc] = (uint)bVar14 * auVar131._48_4_ | !bVar14 * auVar151._48_4_;
            puVar110[0xd] = (uint)bVar15 * auVar131._52_4_ | !bVar15 * auVar151._52_4_;
            puVar110[0xe] = (uint)bVar16 * auVar131._56_4_ | !bVar16 * auVar151._56_4_;
            puVar110[0xf] = (uint)bVar17 * auVar131._60_4_ | !bVar17 * auVar151._60_4_;
            pauVar109 = pauVar109 + 1;
            puVar110 = puVar110 + 0x10;
            iVar93 = iVar93 + 0x10;
            auVar130 = auVar148;
          } while (iVar93 < iVar114);
          uVar96 = (uint)local_1b0;
        }
        uVar105 = uVar96 | 7;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)*pauVar109;
          uVar190 = *(undefined8 *)(*pauVar109 + 8);
          uVar193 = *(undefined8 *)(*pauVar109 + 0x10);
          uVar194 = *(undefined8 *)(*pauVar109 + 0x18);
          local_c0 = *(undefined1 (*) [32])*pauVar109;
          BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                    ((binary_op_atan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
          *(undefined8 *)puVar110 = uVar191;
          *(undefined8 *)(puVar110 + 2) = uVar190;
          *(undefined8 *)(puVar110 + 4) = uVar193;
          *(undefined8 *)(puVar110 + 6) = uVar194;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          puVar110 = puVar110 + 8;
          uVar105 = uVar96 + 0xf;
          uVar96 = uVar96 + 8;
        }
        uVar105 = uVar96 | 3;
        local_218 = pvVar98;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)(*pauVar109 + 8);
          local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
          afVar310 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                               ((binary_op_atan2 *)local_180,(__m128 *)local_c0,(__m128 *)local_160)
          ;
          *(long *)puVar110 = afVar310._0_8_;
          *(undefined8 *)(puVar110 + 2) = uVar191;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          puVar110 = puVar110 + 4;
          uVar105 = uVar96 + 7;
          uVar96 = uVar96 + 4;
        }
        if (iVar114 - uVar96 != 0 && (int)uVar96 <= iVar114) {
          lVar103 = 0;
          do {
            fVar179 = atan2f(*(float *)(*pauVar109 + lVar103 * 4),(float)local_1e0._0_4_);
            puVar110[lVar103] = (uint)fVar179;
            lVar103 = lVar103 + 1;
          } while (iVar114 - uVar96 != (int)lVar103);
        }
        pvVar98 = (void *)((long)local_218 + 1);
        auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        iVar93 = (int)local_210;
      } while (pvVar98 != local_1c0);
      iVar114 = local_220->dims;
    }
    if (0 < (int)local_1c0 && (local_16c == 2.8026e-45 && iVar114 == 3)) {
      iVar114 = iVar93 * local_1ec;
      local_188 = (void *)(CONCAT44(local_188._4_4_,iVar114) & 0xfffffffffffffff0);
      auVar90._4_4_ = local_1a0._4_4_;
      auVar90._0_4_ = (int)local_1a0;
      auVar90._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar90,1);
      local_168 = (long)iVar95 * (long)local_1e8;
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_1c8 = (void *)0x0;
      auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      local_190 = (void *)CONCAT44(local_190._4_4_,iVar114);
      do {
        if (0 < (int)local_1a8) {
          pauVar113 = (undefined1 (*) [32])
                      (local_1f8->cstep * (long)local_1c8 * local_1f8->elemsize +
                      (long)local_1f8->data);
          local_1b0 = (void *)(local_168 * (long)local_1c8 + (long)local_228);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1c8 * local_220->elemsize +
                      (long)local_220->data);
          pvVar98 = (void *)0x0;
          do {
            fVar179 = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
            local_1e0 = ZEXT416((uint)fVar179);
            if (iVar93 == 4) {
              auVar1 = *(undefined1 (*) [16])((long)local_1b0 + (long)pvVar98 * 0x10);
              auVar187._16_16_ = auVar1;
              auVar187._0_16_ = auVar1;
              local_160[0] = (float)auVar1._0_4_;
              local_160[1] = (float)auVar1._4_4_;
              local_160[2] = (float)auVar1._8_4_;
              local_160[3] = (float)auVar1._12_4_;
LAB_0039eca4:
              local_140._0_32_ = auVar187;
LAB_0039ecad:
              auVar131 = vinserti64x4_avx512f(ZEXT3264(auVar187),auVar187,1);
            }
            else {
              local_160[1] = fVar179;
              local_160[0] = fVar179;
              local_160[2] = fVar179;
              local_160[3] = fVar179;
              if (iVar93 == 8) {
                auVar187 = *(undefined1 (*) [32])((long)local_1b0 + (long)pvVar98 * 0x20);
                goto LAB_0039eca4;
              }
              auVar187._4_4_ = fVar179;
              auVar187._0_4_ = fVar179;
              auVar187._8_4_ = fVar179;
              auVar187._12_4_ = fVar179;
              auVar187._16_4_ = fVar179;
              auVar187._20_4_ = fVar179;
              auVar187._24_4_ = fVar179;
              auVar187._28_4_ = fVar179;
              local_140._0_32_ = auVar187;
              if (iVar93 != 0x10) goto LAB_0039ecad;
              auVar131 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_1b0 + (long)pvVar98 * 0x40));
            }
            uVar97 = 0;
            if (0xf < iVar114) {
              auVar130 = vrcp14ps_avx512f(auVar131);
              auVar143 = vfmsub213ps_avx512f(auVar130,auVar131,auVar116);
              auVar132 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
              auVar132 = vpternlogd_avx512f(auVar132,auVar131,auVar117,0xf8);
              uVar97 = vcmpps_avx512f(auVar132,auVar129,1);
              auVar132 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
              auVar164._4_4_ = (uint)((byte)(uVar97 >> 1) & 1) * auVar132._4_4_;
              auVar164._0_4_ = (uint)((byte)uVar97 & 1) * auVar132._0_4_;
              auVar164._8_4_ = (uint)((byte)(uVar97 >> 2) & 1) * auVar132._8_4_;
              auVar164._12_4_ = (uint)((byte)(uVar97 >> 3) & 1) * auVar132._12_4_;
              auVar164._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar132._16_4_;
              auVar164._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar132._20_4_;
              auVar164._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar132._24_4_;
              auVar164._28_4_ = (uint)((byte)(uVar97 >> 7) & 1) * auVar132._28_4_;
              auVar164._32_4_ = (uint)((byte)(uVar97 >> 8) & 1) * auVar132._32_4_;
              auVar164._36_4_ = (uint)((byte)(uVar97 >> 9) & 1) * auVar132._36_4_;
              auVar164._40_4_ = (uint)((byte)(uVar97 >> 10) & 1) * auVar132._40_4_;
              auVar164._44_4_ = (uint)((byte)(uVar97 >> 0xb) & 1) * auVar132._44_4_;
              auVar164._48_4_ = (uint)((byte)(uVar97 >> 0xc) & 1) * auVar132._48_4_;
              auVar164._52_4_ = (uint)((byte)(uVar97 >> 0xd) & 1) * auVar132._52_4_;
              auVar164._56_4_ = (uint)((byte)(uVar97 >> 0xe) & 1) * auVar132._56_4_;
              auVar164._60_4_ = (uint)(byte)(uVar97 >> 0xf) * auVar132._60_4_;
              auVar143 = vfnmadd132ps_avx512vl(auVar143,auVar130,auVar130);
              iVar93 = 0xf;
              uVar97 = vcmpps_avx512f(auVar131,auVar129,1);
              uVar108 = vcmpps_avx512f(auVar131,auVar129,4);
              do {
                auVar131 = *pauVar109;
                uVar112 = vcmpps_avx512f(auVar131,auVar129,1);
                auVar47._8_4_ = 0xc0490fdb;
                auVar47._0_8_ = 0xc0490fdbc0490fdb;
                auVar47._12_4_ = 0xc0490fdb;
                auVar47._16_4_ = 0xc0490fdb;
                auVar47._20_4_ = 0xc0490fdb;
                auVar47._24_4_ = 0xc0490fdb;
                auVar47._28_4_ = 0xc0490fdb;
                auVar47._32_4_ = 0xc0490fdb;
                auVar47._36_4_ = 0xc0490fdb;
                auVar47._40_4_ = 0xc0490fdb;
                auVar47._44_4_ = 0xc0490fdb;
                auVar47._48_4_ = 0xc0490fdb;
                auVar47._52_4_ = 0xc0490fdb;
                auVar47._56_4_ = 0xc0490fdb;
                auVar47._60_4_ = 0xc0490fdb;
                auVar132 = vblendmps_avx512f(auVar118,auVar47);
                bVar2 = (bool)((byte)uVar112 & 1);
                auVar165._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_;
                bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
                auVar165._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar130._4_4_;
                bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
                auVar165._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar130._8_4_;
                bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
                auVar165._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar130._12_4_;
                bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
                auVar165._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar130._16_4_;
                bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
                auVar165._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar130._20_4_;
                bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
                auVar165._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar130._24_4_;
                bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
                auVar165._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar130._28_4_;
                bVar2 = (bool)((byte)(uVar112 >> 8) & 1);
                auVar165._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar130._32_4_;
                bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
                auVar165._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar130._36_4_;
                bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
                auVar165._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar130._40_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
                auVar165._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar130._44_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
                auVar165._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar130._48_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
                auVar165._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar130._52_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
                auVar165._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar130._56_4_;
                bVar2 = SUB81(uVar112 >> 0xf,0);
                auVar165._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar130._60_4_;
                auVar130 = vmulps_avx512f(auVar131,auVar143);
                auVar132 = vandps_avx512dq(auVar130,auVar119);
                uVar112 = vcmpps_avx512f(auVar116,auVar132,1);
                auVar133 = vmaxps_avx512f(auVar132,auVar116);
                auVar48._8_4_ = 0xbf800000;
                auVar48._0_8_ = 0xbf800000bf800000;
                auVar48._12_4_ = 0xbf800000;
                auVar48._16_4_ = 0xbf800000;
                auVar48._20_4_ = 0xbf800000;
                auVar48._24_4_ = 0xbf800000;
                auVar48._28_4_ = 0xbf800000;
                auVar48._32_4_ = 0xbf800000;
                auVar48._36_4_ = 0xbf800000;
                auVar48._40_4_ = 0xbf800000;
                auVar48._44_4_ = 0xbf800000;
                auVar48._48_4_ = 0xbf800000;
                auVar48._52_4_ = 0xbf800000;
                auVar48._56_4_ = 0xbf800000;
                auVar48._60_4_ = 0xbf800000;
                auVar134 = vblendmps_avx512f(auVar132,auVar48);
                bVar2 = (bool)((byte)uVar112 & 1);
                auVar166._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
                auVar166._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
                auVar166._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
                auVar166._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_;
                bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
                auVar166._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_;
                bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
                auVar166._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_;
                bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
                auVar166._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_;
                bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
                auVar166._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_;
                bVar18 = (byte)(uVar112 >> 8);
                bVar2 = (bool)(bVar18 & 1);
                auVar166._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_;
                bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
                auVar166._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_;
                bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
                auVar166._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
                auVar166._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
                auVar166._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
                auVar166._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
                auVar166._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_;
                bVar2 = SUB81(uVar112 >> 0xf,0);
                auVar166._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_;
                auVar132 = vrcp14ps_avx512f(auVar133);
                auVar134 = vmulps_avx512f(auVar166,auVar132);
                auVar133 = vfmsub213ps_avx512f(auVar133,auVar134,auVar166);
                auVar132 = vfnmadd213ps_avx512f(auVar133,auVar132,auVar134);
                auVar133 = vmulps_avx512f(auVar132,auVar132);
                auVar134 = vmulps_avx512f(auVar133,auVar133);
                auVar135 = vfmadd213ps_avx512f(auVar120,auVar134,auVar121);
                auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar122);
                auVar136 = vfmadd213ps_avx512f(auVar124,auVar134,auVar125);
                auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar126);
                auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar127);
                auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar123);
                auVar134 = vfmadd213ps_avx512f(auVar136,auVar134,auVar116);
                auVar133 = vfmadd231ps_avx512f(auVar134,auVar133,auVar135);
                auVar132 = vmulps_avx512f(auVar133,auVar132);
                uVar35 = vcmpps_avx512f(auVar131,auVar129,4);
                auVar133 = vaddps_avx512f(auVar132,auVar128);
                bVar2 = (bool)((byte)uVar112 & 1);
                auVar167._0_4_ = (uint)bVar2 * auVar133._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
                auVar167._4_4_ = (uint)bVar2 * auVar133._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
                auVar167._8_4_ = (uint)bVar2 * auVar133._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
                auVar167._12_4_ = (uint)bVar2 * auVar133._12_4_ | (uint)!bVar2 * auVar132._12_4_;
                bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
                auVar167._16_4_ = (uint)bVar2 * auVar133._16_4_ | (uint)!bVar2 * auVar132._16_4_;
                bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
                auVar167._20_4_ = (uint)bVar2 * auVar133._20_4_ | (uint)!bVar2 * auVar132._20_4_;
                bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
                auVar167._24_4_ = (uint)bVar2 * auVar133._24_4_ | (uint)!bVar2 * auVar132._24_4_;
                bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
                auVar167._28_4_ = (uint)bVar2 * auVar133._28_4_ | (uint)!bVar2 * auVar132._28_4_;
                bVar2 = (bool)(bVar18 & 1);
                auVar167._32_4_ = (uint)bVar2 * auVar133._32_4_ | (uint)!bVar2 * auVar132._32_4_;
                bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
                auVar167._36_4_ = (uint)bVar2 * auVar133._36_4_ | (uint)!bVar2 * auVar132._36_4_;
                bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
                auVar167._40_4_ = (uint)bVar2 * auVar133._40_4_ | (uint)!bVar2 * auVar132._40_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
                auVar167._44_4_ = (uint)bVar2 * auVar133._44_4_ | (uint)!bVar2 * auVar132._44_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
                auVar167._48_4_ = (uint)bVar2 * auVar133._48_4_ | (uint)!bVar2 * auVar132._48_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
                auVar167._52_4_ = (uint)bVar2 * auVar133._52_4_ | (uint)!bVar2 * auVar132._52_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
                auVar167._56_4_ = (uint)bVar2 * auVar133._56_4_ | (uint)!bVar2 * auVar132._56_4_;
                bVar2 = SUB81(uVar112 >> 0xf,0);
                auVar167._60_4_ = (uint)bVar2 * auVar133._60_4_ | (uint)!bVar2 * auVar132._60_4_;
                auVar130 = vpternlogd_avx512f(auVar167,auVar130,auVar117,0xf8);
                auVar132 = vaddps_avx512f(auVar130,auVar165);
                bVar2 = (bool)((byte)uVar97 & 1);
                bVar4 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar97 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar97 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar97 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar97 >> 6) & 1);
                bVar10 = (bool)((byte)(uVar97 >> 7) & 1);
                bVar11 = (bool)((byte)(uVar97 >> 8) & 1);
                bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                bVar19 = SUB81(uVar97 >> 0xf,0);
                auVar131 = vpternlogd_avx512f(auVar131,auVar117,auVar309,0xea);
                bVar3 = (bool)((byte)uVar108 & 1);
                auVar168._0_4_ =
                     (uint)bVar3 * ((uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_) |
                     (uint)!bVar3 * auVar131._0_4_;
                bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
                auVar168._4_4_ =
                     (uint)bVar2 * ((uint)bVar4 * auVar132._4_4_ | (uint)!bVar4 * auVar130._4_4_) |
                     (uint)!bVar2 * auVar131._4_4_;
                bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
                auVar168._8_4_ =
                     (uint)bVar2 * ((uint)bVar5 * auVar132._8_4_ | (uint)!bVar5 * auVar130._8_4_) |
                     (uint)!bVar2 * auVar131._8_4_;
                bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
                auVar168._12_4_ =
                     (uint)bVar2 * ((uint)bVar6 * auVar132._12_4_ | (uint)!bVar6 * auVar130._12_4_)
                     | (uint)!bVar2 * auVar131._12_4_;
                bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
                auVar168._16_4_ =
                     (uint)bVar2 * ((uint)bVar7 * auVar132._16_4_ | (uint)!bVar7 * auVar130._16_4_)
                     | (uint)!bVar2 * auVar131._16_4_;
                bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
                auVar168._20_4_ =
                     (uint)bVar2 * ((uint)bVar8 * auVar132._20_4_ | (uint)!bVar8 * auVar130._20_4_)
                     | (uint)!bVar2 * auVar131._20_4_;
                bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
                auVar168._24_4_ =
                     (uint)bVar2 * ((uint)bVar9 * auVar132._24_4_ | (uint)!bVar9 * auVar130._24_4_)
                     | (uint)!bVar2 * auVar131._24_4_;
                bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
                auVar168._28_4_ =
                     (uint)bVar2 *
                     ((uint)bVar10 * auVar132._28_4_ | (uint)!bVar10 * auVar130._28_4_) |
                     (uint)!bVar2 * auVar131._28_4_;
                bVar2 = (bool)((byte)(uVar108 >> 8) & 1);
                auVar168._32_4_ =
                     (uint)bVar2 *
                     ((uint)bVar11 * auVar132._32_4_ | (uint)!bVar11 * auVar130._32_4_) |
                     (uint)!bVar2 * auVar131._32_4_;
                bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
                auVar168._36_4_ =
                     (uint)bVar2 *
                     ((uint)bVar12 * auVar132._36_4_ | (uint)!bVar12 * auVar130._36_4_) |
                     (uint)!bVar2 * auVar131._36_4_;
                bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
                auVar168._40_4_ =
                     (uint)bVar2 *
                     ((uint)bVar13 * auVar132._40_4_ | (uint)!bVar13 * auVar130._40_4_) |
                     (uint)!bVar2 * auVar131._40_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
                auVar168._44_4_ =
                     (uint)bVar2 *
                     ((uint)bVar14 * auVar132._44_4_ | (uint)!bVar14 * auVar130._44_4_) |
                     (uint)!bVar2 * auVar131._44_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
                auVar168._48_4_ =
                     (uint)bVar2 *
                     ((uint)bVar15 * auVar132._48_4_ | (uint)!bVar15 * auVar130._48_4_) |
                     (uint)!bVar2 * auVar131._48_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
                auVar168._52_4_ =
                     (uint)bVar2 *
                     ((uint)bVar16 * auVar132._52_4_ | (uint)!bVar16 * auVar130._52_4_) |
                     (uint)!bVar2 * auVar131._52_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
                auVar168._56_4_ =
                     (uint)bVar2 *
                     ((uint)bVar17 * auVar132._56_4_ | (uint)!bVar17 * auVar130._56_4_) |
                     (uint)!bVar2 * auVar131._56_4_;
                bVar2 = SUB81(uVar108 >> 0xf,0);
                auVar168._60_4_ =
                     (uint)bVar2 *
                     ((uint)bVar19 * auVar132._60_4_ | (uint)!bVar19 * auVar130._60_4_) |
                     (uint)!bVar2 * auVar131._60_4_;
                auVar131 = vblendmps_avx512f(auVar164,auVar168);
                bVar2 = (bool)((byte)uVar35 & 1);
                bVar3 = (bool)((byte)(uVar35 >> 1) & 1);
                bVar4 = (bool)((byte)(uVar35 >> 2) & 1);
                bVar5 = (bool)((byte)(uVar35 >> 3) & 1);
                bVar6 = (bool)((byte)(uVar35 >> 4) & 1);
                bVar7 = (bool)((byte)(uVar35 >> 5) & 1);
                bVar8 = (bool)((byte)(uVar35 >> 6) & 1);
                bVar9 = (bool)((byte)(uVar35 >> 7) & 1);
                bVar10 = (bool)((byte)(uVar35 >> 8) & 1);
                bVar11 = (bool)((byte)(uVar35 >> 9) & 1);
                bVar12 = (bool)((byte)(uVar35 >> 10) & 1);
                bVar13 = (bool)((byte)(uVar35 >> 0xb) & 1);
                bVar14 = (bool)((byte)(uVar35 >> 0xc) & 1);
                bVar15 = (bool)((byte)(uVar35 >> 0xd) & 1);
                bVar16 = (bool)((byte)(uVar35 >> 0xe) & 1);
                bVar17 = SUB81(uVar35 >> 0xf,0);
                *(uint *)*pauVar113 = (uint)bVar2 * auVar131._0_4_ | !bVar2 * auVar168._0_4_;
                *(uint *)((long)*pauVar113 + 4) =
                     (uint)bVar3 * auVar131._4_4_ | !bVar3 * auVar168._4_4_;
                *(uint *)((long)*pauVar113 + 8) =
                     (uint)bVar4 * auVar131._8_4_ | !bVar4 * auVar168._8_4_;
                *(uint *)((long)*pauVar113 + 0xc) =
                     (uint)bVar5 * auVar131._12_4_ | !bVar5 * auVar168._12_4_;
                *(uint *)((long)*pauVar113 + 0x10) =
                     (uint)bVar6 * auVar131._16_4_ | !bVar6 * auVar168._16_4_;
                *(uint *)((long)*pauVar113 + 0x14) =
                     (uint)bVar7 * auVar131._20_4_ | !bVar7 * auVar168._20_4_;
                *(uint *)((long)*pauVar113 + 0x18) =
                     (uint)bVar8 * auVar131._24_4_ | !bVar8 * auVar168._24_4_;
                *(uint *)((long)*pauVar113 + 0x1c) =
                     (uint)bVar9 * auVar131._28_4_ | !bVar9 * auVar168._28_4_;
                *(uint *)pauVar113[1] = (uint)bVar10 * auVar131._32_4_ | !bVar10 * auVar168._32_4_;
                *(uint *)(pauVar113[1] + 4) =
                     (uint)bVar11 * auVar131._36_4_ | !bVar11 * auVar168._36_4_;
                *(uint *)(pauVar113[1] + 8) =
                     (uint)bVar12 * auVar131._40_4_ | !bVar12 * auVar168._40_4_;
                *(uint *)(pauVar113[1] + 0xc) =
                     (uint)bVar13 * auVar131._44_4_ | !bVar13 * auVar168._44_4_;
                *(uint *)(pauVar113[1] + 0x10) =
                     (uint)bVar14 * auVar131._48_4_ | !bVar14 * auVar168._48_4_;
                *(uint *)(pauVar113[1] + 0x14) =
                     (uint)bVar15 * auVar131._52_4_ | !bVar15 * auVar168._52_4_;
                *(uint *)(pauVar113[1] + 0x18) =
                     (uint)bVar16 * auVar131._56_4_ | !bVar16 * auVar168._56_4_;
                *(uint *)(pauVar113[1] + 0x1c) =
                     (uint)bVar17 * auVar131._60_4_ | !bVar17 * auVar168._60_4_;
                pauVar109 = pauVar109 + 1;
                pauVar113 = pauVar113 + 2;
                iVar93 = iVar93 + 0x10;
                auVar130 = auVar165;
              } while (iVar93 < iVar114);
              uVar97 = (ulong)local_188 & 0xffffffff;
            }
            uVar96 = (uint)uVar97 | 7;
            local_218 = pvVar98;
            while (uVar105 = (uint)uVar97, (int)uVar96 < iVar114) {
              auVar180 = *(undefined1 (*) [32])*pauVar109;
              local_c0._0_4_ = auVar180._0_4_;
              local_c0._4_4_ = auVar180._4_4_;
              local_c0._8_4_ = auVar180._8_4_;
              local_c0._12_4_ = auVar180._12_4_;
              local_c0._16_4_ = auVar180._16_4_;
              local_c0._20_4_ = auVar180._20_4_;
              local_c0._24_4_ = auVar180._24_4_;
              local_c0._28_4_ = auVar180._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                        ((binary_op_atan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
              *pauVar113 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar113 = pauVar113 + 1;
              uVar97 = (ulong)(uVar105 + 8);
              uVar96 = uVar105 + 0xf;
            }
            uVar96 = uVar105 | 3;
            while ((int)uVar96 < iVar114) {
              local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
              auVar192 = ZEXT856(*(ulong *)(*pauVar109 + 8));
              afVar310 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                   ((binary_op_atan2 *)local_180,(__m128 *)local_c0,
                                    (__m128 *)local_160);
              auVar118._0_8_ = afVar310._0_8_;
              auVar118._8_56_ = auVar192;
              *(undefined1 (*) [16])*pauVar113 = auVar118._0_16_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar113 = (undefined1 (*) [32])((long)*pauVar113 + 0x10);
              iVar93 = (int)uVar97;
              uVar105 = iVar93 + 4;
              uVar97 = (ulong)uVar105;
              uVar96 = iVar93 + 7;
            }
            if ((int)uVar105 < iVar114) {
              lVar115 = 0;
              lVar103 = 0;
              do {
                fVar179 = atan2f(*(float *)(*pauVar109 + lVar115 * 4),(float)local_1e0._0_4_);
                *(float *)((long)*pauVar113 + lVar115 * 4) = fVar179;
                lVar103 = lVar103 + -4;
                lVar115 = lVar115 + 1;
              } while (iVar114 - uVar105 != (int)lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar103);
              pauVar113 = (undefined1 (*) [32])((long)pauVar113 - lVar103);
              iVar114 = (int)local_190;
            }
            pvVar98 = (void *)((long)local_218 + 1);
            auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            iVar93 = (int)local_210;
          } while (pvVar98 != local_1a8);
        }
        local_1c8 = (void *)((long)local_1c8 + 1);
      } while (local_1c8 != local_1c0);
      iVar114 = local_220->dims;
    }
    if ((iVar114 == 4) && (local_16c == 2.8026e-45)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)local_1c0 < 1) break;
      iVar114 = iVar93 * local_1ec * (int)local_1a8;
      local_188 = (void *)(CONCAT44(local_188._4_4_,iVar114) & 0xfffffffffffffff0);
      auVar91._4_4_ = local_1a0._4_4_;
      auVar91._0_4_ = (int)local_1a0;
      auVar91._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar91,1);
      local_168 = (long)iVar95 * (long)local_1e8;
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_1c8 = (void *)0x0;
      auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      local_190 = (void *)CONCAT44(local_190._4_4_,iVar114);
      do {
        if (0 < (int)local_1b8) {
          pauVar113 = (undefined1 (*) [32])
                      (local_1f8->cstep * (long)local_1c8 * local_1f8->elemsize +
                      (long)local_1f8->data);
          local_1b0 = (void *)(local_168 * (long)local_1c8 + (long)local_228);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1c8 * local_220->elemsize +
                      (long)local_220->data);
          pvVar98 = (void *)0x0;
          do {
            fVar179 = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
            local_1e0 = ZEXT416((uint)fVar179);
            if (iVar93 == 4) {
              auVar1 = *(undefined1 (*) [16])((long)local_1b0 + (long)pvVar98 * 0x10);
              auVar188._16_16_ = auVar1;
              auVar188._0_16_ = auVar1;
              local_160[0] = (float)auVar1._0_4_;
              local_160[1] = (float)auVar1._4_4_;
              local_160[2] = (float)auVar1._8_4_;
              local_160[3] = (float)auVar1._12_4_;
LAB_0039f1a5:
              local_140._0_32_ = auVar188;
LAB_0039f1ae:
              auVar131 = vinserti64x4_avx512f(ZEXT3264(auVar188),auVar188,1);
            }
            else {
              local_160[1] = fVar179;
              local_160[0] = fVar179;
              local_160[2] = fVar179;
              local_160[3] = fVar179;
              if (iVar93 == 8) {
                auVar188 = *(undefined1 (*) [32])((long)local_1b0 + (long)pvVar98 * 0x20);
                goto LAB_0039f1a5;
              }
              auVar188._4_4_ = fVar179;
              auVar188._0_4_ = fVar179;
              auVar188._8_4_ = fVar179;
              auVar188._12_4_ = fVar179;
              auVar188._16_4_ = fVar179;
              auVar188._20_4_ = fVar179;
              auVar188._24_4_ = fVar179;
              auVar188._28_4_ = fVar179;
              local_140._0_32_ = auVar188;
              if (iVar93 != 0x10) goto LAB_0039f1ae;
              auVar131 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_1b0 + (long)pvVar98 * 0x40));
            }
            uVar97 = 0;
            if (0xf < iVar114) {
              auVar130 = vrcp14ps_avx512f(auVar131);
              auVar143 = vfmsub213ps_avx512f(auVar130,auVar131,auVar116);
              auVar132 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
              auVar132 = vpternlogd_avx512f(auVar132,auVar131,auVar117,0xf8);
              uVar97 = vcmpps_avx512f(auVar132,auVar129,1);
              auVar132 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
              auVar169._4_4_ = (uint)((byte)(uVar97 >> 1) & 1) * auVar132._4_4_;
              auVar169._0_4_ = (uint)((byte)uVar97 & 1) * auVar132._0_4_;
              auVar169._8_4_ = (uint)((byte)(uVar97 >> 2) & 1) * auVar132._8_4_;
              auVar169._12_4_ = (uint)((byte)(uVar97 >> 3) & 1) * auVar132._12_4_;
              auVar169._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar132._16_4_;
              auVar169._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar132._20_4_;
              auVar169._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar132._24_4_;
              auVar169._28_4_ = (uint)((byte)(uVar97 >> 7) & 1) * auVar132._28_4_;
              auVar169._32_4_ = (uint)((byte)(uVar97 >> 8) & 1) * auVar132._32_4_;
              auVar169._36_4_ = (uint)((byte)(uVar97 >> 9) & 1) * auVar132._36_4_;
              auVar169._40_4_ = (uint)((byte)(uVar97 >> 10) & 1) * auVar132._40_4_;
              auVar169._44_4_ = (uint)((byte)(uVar97 >> 0xb) & 1) * auVar132._44_4_;
              auVar169._48_4_ = (uint)((byte)(uVar97 >> 0xc) & 1) * auVar132._48_4_;
              auVar169._52_4_ = (uint)((byte)(uVar97 >> 0xd) & 1) * auVar132._52_4_;
              auVar169._56_4_ = (uint)((byte)(uVar97 >> 0xe) & 1) * auVar132._56_4_;
              auVar169._60_4_ = (uint)(byte)(uVar97 >> 0xf) * auVar132._60_4_;
              auVar143 = vfnmadd132ps_avx512vl(auVar143,auVar130,auVar130);
              iVar93 = 0xf;
              uVar97 = vcmpps_avx512f(auVar131,auVar129,1);
              uVar108 = vcmpps_avx512f(auVar131,auVar129,4);
              do {
                auVar131 = *pauVar109;
                uVar112 = vcmpps_avx512f(auVar131,auVar129,1);
                auVar49._8_4_ = 0xc0490fdb;
                auVar49._0_8_ = 0xc0490fdbc0490fdb;
                auVar49._12_4_ = 0xc0490fdb;
                auVar49._16_4_ = 0xc0490fdb;
                auVar49._20_4_ = 0xc0490fdb;
                auVar49._24_4_ = 0xc0490fdb;
                auVar49._28_4_ = 0xc0490fdb;
                auVar49._32_4_ = 0xc0490fdb;
                auVar49._36_4_ = 0xc0490fdb;
                auVar49._40_4_ = 0xc0490fdb;
                auVar49._44_4_ = 0xc0490fdb;
                auVar49._48_4_ = 0xc0490fdb;
                auVar49._52_4_ = 0xc0490fdb;
                auVar49._56_4_ = 0xc0490fdb;
                auVar49._60_4_ = 0xc0490fdb;
                auVar132 = vblendmps_avx512f(auVar118,auVar49);
                bVar2 = (bool)((byte)uVar112 & 1);
                auVar170._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_;
                bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
                auVar170._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar130._4_4_;
                bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
                auVar170._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar130._8_4_;
                bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
                auVar170._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar130._12_4_;
                bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
                auVar170._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar130._16_4_;
                bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
                auVar170._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar130._20_4_;
                bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
                auVar170._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar130._24_4_;
                bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
                auVar170._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar130._28_4_;
                bVar2 = (bool)((byte)(uVar112 >> 8) & 1);
                auVar170._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar130._32_4_;
                bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
                auVar170._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar130._36_4_;
                bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
                auVar170._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar130._40_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
                auVar170._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar130._44_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
                auVar170._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar130._48_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
                auVar170._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar130._52_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
                auVar170._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar130._56_4_;
                bVar2 = SUB81(uVar112 >> 0xf,0);
                auVar170._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar130._60_4_;
                auVar130 = vmulps_avx512f(auVar131,auVar143);
                auVar132 = vandps_avx512dq(auVar130,auVar119);
                uVar112 = vcmpps_avx512f(auVar116,auVar132,1);
                auVar133 = vmaxps_avx512f(auVar132,auVar116);
                auVar50._8_4_ = 0xbf800000;
                auVar50._0_8_ = 0xbf800000bf800000;
                auVar50._12_4_ = 0xbf800000;
                auVar50._16_4_ = 0xbf800000;
                auVar50._20_4_ = 0xbf800000;
                auVar50._24_4_ = 0xbf800000;
                auVar50._28_4_ = 0xbf800000;
                auVar50._32_4_ = 0xbf800000;
                auVar50._36_4_ = 0xbf800000;
                auVar50._40_4_ = 0xbf800000;
                auVar50._44_4_ = 0xbf800000;
                auVar50._48_4_ = 0xbf800000;
                auVar50._52_4_ = 0xbf800000;
                auVar50._56_4_ = 0xbf800000;
                auVar50._60_4_ = 0xbf800000;
                auVar134 = vblendmps_avx512f(auVar132,auVar50);
                bVar2 = (bool)((byte)uVar112 & 1);
                auVar171._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
                auVar171._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
                auVar171._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
                auVar171._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_;
                bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
                auVar171._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_;
                bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
                auVar171._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_;
                bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
                auVar171._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_;
                bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
                auVar171._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_;
                bVar18 = (byte)(uVar112 >> 8);
                bVar2 = (bool)(bVar18 & 1);
                auVar171._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_;
                bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
                auVar171._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_;
                bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
                auVar171._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
                auVar171._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
                auVar171._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
                auVar171._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
                auVar171._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_;
                bVar2 = SUB81(uVar112 >> 0xf,0);
                auVar171._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_;
                auVar132 = vrcp14ps_avx512f(auVar133);
                auVar134 = vmulps_avx512f(auVar171,auVar132);
                auVar133 = vfmsub213ps_avx512f(auVar133,auVar134,auVar171);
                auVar132 = vfnmadd213ps_avx512f(auVar133,auVar132,auVar134);
                auVar133 = vmulps_avx512f(auVar132,auVar132);
                auVar134 = vmulps_avx512f(auVar133,auVar133);
                auVar135 = vfmadd213ps_avx512f(auVar120,auVar134,auVar121);
                auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar122);
                auVar136 = vfmadd213ps_avx512f(auVar124,auVar134,auVar125);
                auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar126);
                auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar127);
                auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar123);
                auVar134 = vfmadd213ps_avx512f(auVar136,auVar134,auVar116);
                auVar133 = vfmadd231ps_avx512f(auVar134,auVar133,auVar135);
                auVar132 = vmulps_avx512f(auVar133,auVar132);
                uVar35 = vcmpps_avx512f(auVar131,auVar129,4);
                auVar133 = vaddps_avx512f(auVar132,auVar128);
                bVar2 = (bool)((byte)uVar112 & 1);
                auVar172._0_4_ = (uint)bVar2 * auVar133._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
                auVar172._4_4_ = (uint)bVar2 * auVar133._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
                auVar172._8_4_ = (uint)bVar2 * auVar133._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
                auVar172._12_4_ = (uint)bVar2 * auVar133._12_4_ | (uint)!bVar2 * auVar132._12_4_;
                bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
                auVar172._16_4_ = (uint)bVar2 * auVar133._16_4_ | (uint)!bVar2 * auVar132._16_4_;
                bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
                auVar172._20_4_ = (uint)bVar2 * auVar133._20_4_ | (uint)!bVar2 * auVar132._20_4_;
                bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
                auVar172._24_4_ = (uint)bVar2 * auVar133._24_4_ | (uint)!bVar2 * auVar132._24_4_;
                bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
                auVar172._28_4_ = (uint)bVar2 * auVar133._28_4_ | (uint)!bVar2 * auVar132._28_4_;
                bVar2 = (bool)(bVar18 & 1);
                auVar172._32_4_ = (uint)bVar2 * auVar133._32_4_ | (uint)!bVar2 * auVar132._32_4_;
                bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
                auVar172._36_4_ = (uint)bVar2 * auVar133._36_4_ | (uint)!bVar2 * auVar132._36_4_;
                bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
                auVar172._40_4_ = (uint)bVar2 * auVar133._40_4_ | (uint)!bVar2 * auVar132._40_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
                auVar172._44_4_ = (uint)bVar2 * auVar133._44_4_ | (uint)!bVar2 * auVar132._44_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
                auVar172._48_4_ = (uint)bVar2 * auVar133._48_4_ | (uint)!bVar2 * auVar132._48_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
                auVar172._52_4_ = (uint)bVar2 * auVar133._52_4_ | (uint)!bVar2 * auVar132._52_4_;
                bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
                auVar172._56_4_ = (uint)bVar2 * auVar133._56_4_ | (uint)!bVar2 * auVar132._56_4_;
                bVar2 = SUB81(uVar112 >> 0xf,0);
                auVar172._60_4_ = (uint)bVar2 * auVar133._60_4_ | (uint)!bVar2 * auVar132._60_4_;
                auVar130 = vpternlogd_avx512f(auVar172,auVar130,auVar117,0xf8);
                auVar132 = vaddps_avx512f(auVar130,auVar170);
                bVar2 = (bool)((byte)uVar97 & 1);
                bVar4 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar97 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar97 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar97 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar97 >> 6) & 1);
                bVar10 = (bool)((byte)(uVar97 >> 7) & 1);
                bVar11 = (bool)((byte)(uVar97 >> 8) & 1);
                bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                bVar19 = SUB81(uVar97 >> 0xf,0);
                auVar131 = vpternlogd_avx512f(auVar131,auVar117,auVar309,0xea);
                bVar3 = (bool)((byte)uVar108 & 1);
                auVar173._0_4_ =
                     (uint)bVar3 * ((uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_) |
                     (uint)!bVar3 * auVar131._0_4_;
                bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
                auVar173._4_4_ =
                     (uint)bVar2 * ((uint)bVar4 * auVar132._4_4_ | (uint)!bVar4 * auVar130._4_4_) |
                     (uint)!bVar2 * auVar131._4_4_;
                bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
                auVar173._8_4_ =
                     (uint)bVar2 * ((uint)bVar5 * auVar132._8_4_ | (uint)!bVar5 * auVar130._8_4_) |
                     (uint)!bVar2 * auVar131._8_4_;
                bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
                auVar173._12_4_ =
                     (uint)bVar2 * ((uint)bVar6 * auVar132._12_4_ | (uint)!bVar6 * auVar130._12_4_)
                     | (uint)!bVar2 * auVar131._12_4_;
                bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
                auVar173._16_4_ =
                     (uint)bVar2 * ((uint)bVar7 * auVar132._16_4_ | (uint)!bVar7 * auVar130._16_4_)
                     | (uint)!bVar2 * auVar131._16_4_;
                bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
                auVar173._20_4_ =
                     (uint)bVar2 * ((uint)bVar8 * auVar132._20_4_ | (uint)!bVar8 * auVar130._20_4_)
                     | (uint)!bVar2 * auVar131._20_4_;
                bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
                auVar173._24_4_ =
                     (uint)bVar2 * ((uint)bVar9 * auVar132._24_4_ | (uint)!bVar9 * auVar130._24_4_)
                     | (uint)!bVar2 * auVar131._24_4_;
                bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
                auVar173._28_4_ =
                     (uint)bVar2 *
                     ((uint)bVar10 * auVar132._28_4_ | (uint)!bVar10 * auVar130._28_4_) |
                     (uint)!bVar2 * auVar131._28_4_;
                bVar2 = (bool)((byte)(uVar108 >> 8) & 1);
                auVar173._32_4_ =
                     (uint)bVar2 *
                     ((uint)bVar11 * auVar132._32_4_ | (uint)!bVar11 * auVar130._32_4_) |
                     (uint)!bVar2 * auVar131._32_4_;
                bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
                auVar173._36_4_ =
                     (uint)bVar2 *
                     ((uint)bVar12 * auVar132._36_4_ | (uint)!bVar12 * auVar130._36_4_) |
                     (uint)!bVar2 * auVar131._36_4_;
                bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
                auVar173._40_4_ =
                     (uint)bVar2 *
                     ((uint)bVar13 * auVar132._40_4_ | (uint)!bVar13 * auVar130._40_4_) |
                     (uint)!bVar2 * auVar131._40_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
                auVar173._44_4_ =
                     (uint)bVar2 *
                     ((uint)bVar14 * auVar132._44_4_ | (uint)!bVar14 * auVar130._44_4_) |
                     (uint)!bVar2 * auVar131._44_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
                auVar173._48_4_ =
                     (uint)bVar2 *
                     ((uint)bVar15 * auVar132._48_4_ | (uint)!bVar15 * auVar130._48_4_) |
                     (uint)!bVar2 * auVar131._48_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
                auVar173._52_4_ =
                     (uint)bVar2 *
                     ((uint)bVar16 * auVar132._52_4_ | (uint)!bVar16 * auVar130._52_4_) |
                     (uint)!bVar2 * auVar131._52_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
                auVar173._56_4_ =
                     (uint)bVar2 *
                     ((uint)bVar17 * auVar132._56_4_ | (uint)!bVar17 * auVar130._56_4_) |
                     (uint)!bVar2 * auVar131._56_4_;
                bVar2 = SUB81(uVar108 >> 0xf,0);
                auVar173._60_4_ =
                     (uint)bVar2 *
                     ((uint)bVar19 * auVar132._60_4_ | (uint)!bVar19 * auVar130._60_4_) |
                     (uint)!bVar2 * auVar131._60_4_;
                auVar131 = vblendmps_avx512f(auVar169,auVar173);
                bVar2 = (bool)((byte)uVar35 & 1);
                bVar3 = (bool)((byte)(uVar35 >> 1) & 1);
                bVar4 = (bool)((byte)(uVar35 >> 2) & 1);
                bVar5 = (bool)((byte)(uVar35 >> 3) & 1);
                bVar6 = (bool)((byte)(uVar35 >> 4) & 1);
                bVar7 = (bool)((byte)(uVar35 >> 5) & 1);
                bVar8 = (bool)((byte)(uVar35 >> 6) & 1);
                bVar9 = (bool)((byte)(uVar35 >> 7) & 1);
                bVar10 = (bool)((byte)(uVar35 >> 8) & 1);
                bVar11 = (bool)((byte)(uVar35 >> 9) & 1);
                bVar12 = (bool)((byte)(uVar35 >> 10) & 1);
                bVar13 = (bool)((byte)(uVar35 >> 0xb) & 1);
                bVar14 = (bool)((byte)(uVar35 >> 0xc) & 1);
                bVar15 = (bool)((byte)(uVar35 >> 0xd) & 1);
                bVar16 = (bool)((byte)(uVar35 >> 0xe) & 1);
                bVar17 = SUB81(uVar35 >> 0xf,0);
                *(uint *)*pauVar113 = (uint)bVar2 * auVar131._0_4_ | !bVar2 * auVar173._0_4_;
                *(uint *)((long)*pauVar113 + 4) =
                     (uint)bVar3 * auVar131._4_4_ | !bVar3 * auVar173._4_4_;
                *(uint *)((long)*pauVar113 + 8) =
                     (uint)bVar4 * auVar131._8_4_ | !bVar4 * auVar173._8_4_;
                *(uint *)((long)*pauVar113 + 0xc) =
                     (uint)bVar5 * auVar131._12_4_ | !bVar5 * auVar173._12_4_;
                *(uint *)((long)*pauVar113 + 0x10) =
                     (uint)bVar6 * auVar131._16_4_ | !bVar6 * auVar173._16_4_;
                *(uint *)((long)*pauVar113 + 0x14) =
                     (uint)bVar7 * auVar131._20_4_ | !bVar7 * auVar173._20_4_;
                *(uint *)((long)*pauVar113 + 0x18) =
                     (uint)bVar8 * auVar131._24_4_ | !bVar8 * auVar173._24_4_;
                *(uint *)((long)*pauVar113 + 0x1c) =
                     (uint)bVar9 * auVar131._28_4_ | !bVar9 * auVar173._28_4_;
                *(uint *)pauVar113[1] = (uint)bVar10 * auVar131._32_4_ | !bVar10 * auVar173._32_4_;
                *(uint *)(pauVar113[1] + 4) =
                     (uint)bVar11 * auVar131._36_4_ | !bVar11 * auVar173._36_4_;
                *(uint *)(pauVar113[1] + 8) =
                     (uint)bVar12 * auVar131._40_4_ | !bVar12 * auVar173._40_4_;
                *(uint *)(pauVar113[1] + 0xc) =
                     (uint)bVar13 * auVar131._44_4_ | !bVar13 * auVar173._44_4_;
                *(uint *)(pauVar113[1] + 0x10) =
                     (uint)bVar14 * auVar131._48_4_ | !bVar14 * auVar173._48_4_;
                *(uint *)(pauVar113[1] + 0x14) =
                     (uint)bVar15 * auVar131._52_4_ | !bVar15 * auVar173._52_4_;
                *(uint *)(pauVar113[1] + 0x18) =
                     (uint)bVar16 * auVar131._56_4_ | !bVar16 * auVar173._56_4_;
                *(uint *)(pauVar113[1] + 0x1c) =
                     (uint)bVar17 * auVar131._60_4_ | !bVar17 * auVar173._60_4_;
                pauVar109 = pauVar109 + 1;
                pauVar113 = pauVar113 + 2;
                iVar93 = iVar93 + 0x10;
                auVar130 = auVar170;
              } while (iVar93 < iVar114);
              uVar97 = (ulong)local_188 & 0xffffffff;
            }
            uVar96 = (uint)uVar97 | 7;
            local_218 = pvVar98;
            while (uVar105 = (uint)uVar97, (int)uVar96 < iVar114) {
              auVar180 = *(undefined1 (*) [32])*pauVar109;
              local_c0._0_4_ = auVar180._0_4_;
              local_c0._4_4_ = auVar180._4_4_;
              local_c0._8_4_ = auVar180._8_4_;
              local_c0._12_4_ = auVar180._12_4_;
              local_c0._16_4_ = auVar180._16_4_;
              local_c0._20_4_ = auVar180._20_4_;
              local_c0._24_4_ = auVar180._24_4_;
              local_c0._28_4_ = auVar180._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                        ((binary_op_atan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
              *pauVar113 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar113 = pauVar113 + 1;
              uVar97 = (ulong)(uVar105 + 8);
              uVar96 = uVar105 + 0xf;
            }
            uVar96 = uVar105 | 3;
            while ((int)uVar96 < iVar114) {
              local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
              auVar192 = ZEXT856(*(ulong *)(*pauVar109 + 8));
              afVar310 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                   ((binary_op_atan2 *)local_180,(__m128 *)local_c0,
                                    (__m128 *)local_160);
              auVar119._0_8_ = afVar310._0_8_;
              auVar119._8_56_ = auVar192;
              *(undefined1 (*) [16])*pauVar113 = auVar119._0_16_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar113 = (undefined1 (*) [32])((long)*pauVar113 + 0x10);
              iVar93 = (int)uVar97;
              uVar105 = iVar93 + 4;
              uVar97 = (ulong)uVar105;
              uVar96 = iVar93 + 7;
            }
            if ((int)uVar105 < iVar114) {
              lVar103 = 0;
              lVar115 = 0;
              do {
                fVar179 = atan2f(*(float *)(*pauVar109 + lVar115 * 4),(float)local_1e0._0_4_);
                *(float *)((long)*pauVar113 + lVar115 * 4) = fVar179;
                lVar115 = lVar115 + 1;
                lVar103 = lVar103 + -4;
              } while (iVar114 - uVar105 != (int)lVar115);
              pauVar113 = (undefined1 (*) [32])((long)pauVar113 - lVar103);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar103);
              iVar114 = (int)local_190;
            }
            pvVar98 = (void *)((long)local_218 + 1);
            auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            iVar93 = (int)local_210;
          } while (pvVar98 != local_1b8);
        }
        local_1c8 = (void *)((long)local_1c8 + 1);
      } while (local_1c8 != local_1c0);
      iVar114 = local_220->dims;
    }
    if ((local_16c == 4.2039e-45 && iVar114 == 4) && 0 < (int)local_1c0) {
      iVar114 = local_1ec * iVar93;
      local_188 = (void *)(CONCAT44(local_188._4_4_,iVar114) & 0xfffffffffffffff0);
      local_1d0 = local_1d0 * (long)local_1e8;
      auVar92._4_4_ = local_1a0._4_4_;
      auVar92._0_4_ = (int)local_1a0;
      auVar92._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar92,1);
      local_1c8 = (void *)((long)iVar95 * (long)local_1e8);
      auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_1e8 = (void *)0x0;
      auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      local_1ec = iVar114;
      do {
        if (0 < (int)local_1b8) {
          pauVar113 = (undefined1 (*) [32])
                      (local_1f8->cstep * (long)local_1e8 * local_1f8->elemsize +
                      (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1e8 * local_220->elemsize +
                      (long)local_220->data);
          local_1a0 = (void *)(local_1d0 * (long)local_1e8 + (long)local_228);
          local_190 = (void *)0x0;
          do {
            if (0 < (int)local_1a8) {
              local_1b0 = (void *)((long)local_1c8 * (long)local_190 + (long)local_1a0);
              pvVar98 = (void *)0x0;
              do {
                fVar179 = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
                local_1e0 = ZEXT416((uint)fVar179);
                if (iVar93 == 4) {
                  auVar1 = *(undefined1 (*) [16])((long)local_1b0 + (long)pvVar98 * 0x10);
                  auVar189._16_16_ = auVar1;
                  auVar189._0_16_ = auVar1;
                  local_160[0] = (float)auVar1._0_4_;
                  local_160[1] = (float)auVar1._4_4_;
                  local_160[2] = (float)auVar1._8_4_;
                  local_160[3] = (float)auVar1._12_4_;
LAB_0039f6d4:
                  local_140._0_32_ = auVar189;
LAB_0039f6dd:
                  auVar131 = vinserti64x4_avx512f(ZEXT3264(auVar189),auVar189,1);
                }
                else {
                  local_160[1] = fVar179;
                  local_160[0] = fVar179;
                  local_160[2] = fVar179;
                  local_160[3] = fVar179;
                  if (iVar93 == 8) {
                    auVar189 = *(undefined1 (*) [32])((long)local_1b0 + (long)pvVar98 * 0x20);
                    goto LAB_0039f6d4;
                  }
                  auVar189._4_4_ = fVar179;
                  auVar189._0_4_ = fVar179;
                  auVar189._8_4_ = fVar179;
                  auVar189._12_4_ = fVar179;
                  auVar189._16_4_ = fVar179;
                  auVar189._20_4_ = fVar179;
                  auVar189._24_4_ = fVar179;
                  auVar189._28_4_ = fVar179;
                  local_140._0_32_ = auVar189;
                  if (iVar93 != 0x10) goto LAB_0039f6dd;
                  auVar131 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_1b0 + (long)pvVar98 * 0x40));
                }
                uVar97 = 0;
                if (0xf < iVar114) {
                  auVar130 = vrcp14ps_avx512f(auVar131);
                  auVar143 = vfmsub213ps_avx512f(auVar130,auVar131,auVar116);
                  auVar132 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
                  auVar132 = vpternlogd_avx512f(auVar132,auVar131,auVar117,0xf8);
                  uVar97 = vcmpps_avx512f(auVar132,auVar129,1);
                  auVar132 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                  auVar174._4_4_ = (uint)((byte)(uVar97 >> 1) & 1) * auVar132._4_4_;
                  auVar174._0_4_ = (uint)((byte)uVar97 & 1) * auVar132._0_4_;
                  auVar174._8_4_ = (uint)((byte)(uVar97 >> 2) & 1) * auVar132._8_4_;
                  auVar174._12_4_ = (uint)((byte)(uVar97 >> 3) & 1) * auVar132._12_4_;
                  auVar174._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar132._16_4_;
                  auVar174._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar132._20_4_;
                  auVar174._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar132._24_4_;
                  auVar174._28_4_ = (uint)((byte)(uVar97 >> 7) & 1) * auVar132._28_4_;
                  auVar174._32_4_ = (uint)((byte)(uVar97 >> 8) & 1) * auVar132._32_4_;
                  auVar174._36_4_ = (uint)((byte)(uVar97 >> 9) & 1) * auVar132._36_4_;
                  auVar174._40_4_ = (uint)((byte)(uVar97 >> 10) & 1) * auVar132._40_4_;
                  auVar174._44_4_ = (uint)((byte)(uVar97 >> 0xb) & 1) * auVar132._44_4_;
                  auVar174._48_4_ = (uint)((byte)(uVar97 >> 0xc) & 1) * auVar132._48_4_;
                  auVar174._52_4_ = (uint)((byte)(uVar97 >> 0xd) & 1) * auVar132._52_4_;
                  auVar174._56_4_ = (uint)((byte)(uVar97 >> 0xe) & 1) * auVar132._56_4_;
                  auVar174._60_4_ = (uint)(byte)(uVar97 >> 0xf) * auVar132._60_4_;
                  auVar143 = vfnmadd132ps_avx512vl(auVar143,auVar130,auVar130);
                  iVar93 = 0xf;
                  uVar97 = vcmpps_avx512f(auVar131,auVar129,1);
                  uVar108 = vcmpps_avx512f(auVar131,auVar129,4);
                  do {
                    auVar131 = *pauVar109;
                    uVar112 = vcmpps_avx512f(auVar131,auVar129,1);
                    auVar51._8_4_ = 0xc0490fdb;
                    auVar51._0_8_ = 0xc0490fdbc0490fdb;
                    auVar51._12_4_ = 0xc0490fdb;
                    auVar51._16_4_ = 0xc0490fdb;
                    auVar51._20_4_ = 0xc0490fdb;
                    auVar51._24_4_ = 0xc0490fdb;
                    auVar51._28_4_ = 0xc0490fdb;
                    auVar51._32_4_ = 0xc0490fdb;
                    auVar51._36_4_ = 0xc0490fdb;
                    auVar51._40_4_ = 0xc0490fdb;
                    auVar51._44_4_ = 0xc0490fdb;
                    auVar51._48_4_ = 0xc0490fdb;
                    auVar51._52_4_ = 0xc0490fdb;
                    auVar51._56_4_ = 0xc0490fdb;
                    auVar51._60_4_ = 0xc0490fdb;
                    auVar132 = vblendmps_avx512f(auVar118,auVar51);
                    bVar2 = (bool)((byte)uVar112 & 1);
                    auVar175._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_;
                    bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
                    auVar175._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar130._4_4_;
                    bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
                    auVar175._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar130._8_4_;
                    bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
                    auVar175._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar130._12_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
                    auVar175._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar130._16_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
                    auVar175._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar130._20_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
                    auVar175._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar130._24_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
                    auVar175._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar130._28_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 8) & 1);
                    auVar175._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar130._32_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
                    auVar175._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar130._36_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
                    auVar175._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar130._40_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
                    auVar175._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar130._44_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
                    auVar175._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar130._48_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
                    auVar175._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar130._52_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
                    auVar175._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar130._56_4_
                    ;
                    bVar2 = SUB81(uVar112 >> 0xf,0);
                    auVar175._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar130._60_4_
                    ;
                    auVar130 = vmulps_avx512f(auVar131,auVar143);
                    auVar132 = vandps_avx512dq(auVar130,auVar119);
                    uVar112 = vcmpps_avx512f(auVar116,auVar132,1);
                    auVar133 = vmaxps_avx512f(auVar132,auVar116);
                    auVar52._8_4_ = 0xbf800000;
                    auVar52._0_8_ = 0xbf800000bf800000;
                    auVar52._12_4_ = 0xbf800000;
                    auVar52._16_4_ = 0xbf800000;
                    auVar52._20_4_ = 0xbf800000;
                    auVar52._24_4_ = 0xbf800000;
                    auVar52._28_4_ = 0xbf800000;
                    auVar52._32_4_ = 0xbf800000;
                    auVar52._36_4_ = 0xbf800000;
                    auVar52._40_4_ = 0xbf800000;
                    auVar52._44_4_ = 0xbf800000;
                    auVar52._48_4_ = 0xbf800000;
                    auVar52._52_4_ = 0xbf800000;
                    auVar52._56_4_ = 0xbf800000;
                    auVar52._60_4_ = 0xbf800000;
                    auVar134 = vblendmps_avx512f(auVar132,auVar52);
                    bVar2 = (bool)((byte)uVar112 & 1);
                    auVar176._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                    bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
                    auVar176._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                    bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
                    auVar176._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                    bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
                    auVar176._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
                    auVar176._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
                    auVar176._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
                    auVar176._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
                    auVar176._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_
                    ;
                    bVar18 = (byte)(uVar112 >> 8);
                    bVar2 = (bool)(bVar18 & 1);
                    auVar176._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
                    auVar176._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
                    auVar176._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
                    auVar176._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
                    auVar176._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
                    auVar176._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
                    auVar176._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_
                    ;
                    bVar2 = SUB81(uVar112 >> 0xf,0);
                    auVar176._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_
                    ;
                    auVar132 = vrcp14ps_avx512f(auVar133);
                    auVar134 = vmulps_avx512f(auVar176,auVar132);
                    auVar133 = vfmsub213ps_avx512f(auVar133,auVar134,auVar176);
                    auVar132 = vfnmadd213ps_avx512f(auVar133,auVar132,auVar134);
                    auVar133 = vmulps_avx512f(auVar132,auVar132);
                    auVar134 = vmulps_avx512f(auVar133,auVar133);
                    auVar135 = vfmadd213ps_avx512f(auVar120,auVar134,auVar121);
                    auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar122);
                    auVar136 = vfmadd213ps_avx512f(auVar124,auVar134,auVar125);
                    auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar126);
                    auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar127);
                    auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar123);
                    auVar134 = vfmadd213ps_avx512f(auVar136,auVar134,auVar116);
                    auVar133 = vfmadd231ps_avx512f(auVar134,auVar133,auVar135);
                    auVar132 = vmulps_avx512f(auVar133,auVar132);
                    uVar35 = vcmpps_avx512f(auVar131,auVar129,4);
                    auVar133 = vaddps_avx512f(auVar132,auVar128);
                    bVar2 = (bool)((byte)uVar112 & 1);
                    auVar177._0_4_ = (uint)bVar2 * auVar133._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                    bVar2 = (bool)((byte)(uVar112 >> 1) & 1);
                    auVar177._4_4_ = (uint)bVar2 * auVar133._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                    bVar2 = (bool)((byte)(uVar112 >> 2) & 1);
                    auVar177._8_4_ = (uint)bVar2 * auVar133._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                    bVar2 = (bool)((byte)(uVar112 >> 3) & 1);
                    auVar177._12_4_ = (uint)bVar2 * auVar133._12_4_ | (uint)!bVar2 * auVar132._12_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 4) & 1);
                    auVar177._16_4_ = (uint)bVar2 * auVar133._16_4_ | (uint)!bVar2 * auVar132._16_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 5) & 1);
                    auVar177._20_4_ = (uint)bVar2 * auVar133._20_4_ | (uint)!bVar2 * auVar132._20_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 6) & 1);
                    auVar177._24_4_ = (uint)bVar2 * auVar133._24_4_ | (uint)!bVar2 * auVar132._24_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 7) & 1);
                    auVar177._28_4_ = (uint)bVar2 * auVar133._28_4_ | (uint)!bVar2 * auVar132._28_4_
                    ;
                    bVar2 = (bool)(bVar18 & 1);
                    auVar177._32_4_ = (uint)bVar2 * auVar133._32_4_ | (uint)!bVar2 * auVar132._32_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 9) & 1);
                    auVar177._36_4_ = (uint)bVar2 * auVar133._36_4_ | (uint)!bVar2 * auVar132._36_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 10) & 1);
                    auVar177._40_4_ = (uint)bVar2 * auVar133._40_4_ | (uint)!bVar2 * auVar132._40_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xb) & 1);
                    auVar177._44_4_ = (uint)bVar2 * auVar133._44_4_ | (uint)!bVar2 * auVar132._44_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xc) & 1);
                    auVar177._48_4_ = (uint)bVar2 * auVar133._48_4_ | (uint)!bVar2 * auVar132._48_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xd) & 1);
                    auVar177._52_4_ = (uint)bVar2 * auVar133._52_4_ | (uint)!bVar2 * auVar132._52_4_
                    ;
                    bVar2 = (bool)((byte)(uVar112 >> 0xe) & 1);
                    auVar177._56_4_ = (uint)bVar2 * auVar133._56_4_ | (uint)!bVar2 * auVar132._56_4_
                    ;
                    bVar2 = SUB81(uVar112 >> 0xf,0);
                    auVar177._60_4_ = (uint)bVar2 * auVar133._60_4_ | (uint)!bVar2 * auVar132._60_4_
                    ;
                    auVar130 = vpternlogd_avx512f(auVar177,auVar130,auVar117,0xf8);
                    auVar132 = vaddps_avx512f(auVar130,auVar175);
                    bVar2 = (bool)((byte)uVar97 & 1);
                    bVar4 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar6 = (bool)((byte)(uVar97 >> 3) & 1);
                    bVar7 = (bool)((byte)(uVar97 >> 4) & 1);
                    bVar8 = (bool)((byte)(uVar97 >> 5) & 1);
                    bVar9 = (bool)((byte)(uVar97 >> 6) & 1);
                    bVar10 = (bool)((byte)(uVar97 >> 7) & 1);
                    bVar11 = (bool)((byte)(uVar97 >> 8) & 1);
                    bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                    bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                    bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                    bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                    bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                    bVar19 = SUB81(uVar97 >> 0xf,0);
                    auVar131 = vpternlogd_avx512f(auVar131,auVar117,auVar309,0xea);
                    bVar3 = (bool)((byte)uVar108 & 1);
                    auVar178._0_4_ =
                         (uint)bVar3 *
                         ((uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar130._0_4_) |
                         (uint)!bVar3 * auVar131._0_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
                    auVar178._4_4_ =
                         (uint)bVar2 *
                         ((uint)bVar4 * auVar132._4_4_ | (uint)!bVar4 * auVar130._4_4_) |
                         (uint)!bVar2 * auVar131._4_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
                    auVar178._8_4_ =
                         (uint)bVar2 *
                         ((uint)bVar5 * auVar132._8_4_ | (uint)!bVar5 * auVar130._8_4_) |
                         (uint)!bVar2 * auVar131._8_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
                    auVar178._12_4_ =
                         (uint)bVar2 *
                         ((uint)bVar6 * auVar132._12_4_ | (uint)!bVar6 * auVar130._12_4_) |
                         (uint)!bVar2 * auVar131._12_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
                    auVar178._16_4_ =
                         (uint)bVar2 *
                         ((uint)bVar7 * auVar132._16_4_ | (uint)!bVar7 * auVar130._16_4_) |
                         (uint)!bVar2 * auVar131._16_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
                    auVar178._20_4_ =
                         (uint)bVar2 *
                         ((uint)bVar8 * auVar132._20_4_ | (uint)!bVar8 * auVar130._20_4_) |
                         (uint)!bVar2 * auVar131._20_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
                    auVar178._24_4_ =
                         (uint)bVar2 *
                         ((uint)bVar9 * auVar132._24_4_ | (uint)!bVar9 * auVar130._24_4_) |
                         (uint)!bVar2 * auVar131._24_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
                    auVar178._28_4_ =
                         (uint)bVar2 *
                         ((uint)bVar10 * auVar132._28_4_ | (uint)!bVar10 * auVar130._28_4_) |
                         (uint)!bVar2 * auVar131._28_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 8) & 1);
                    auVar178._32_4_ =
                         (uint)bVar2 *
                         ((uint)bVar11 * auVar132._32_4_ | (uint)!bVar11 * auVar130._32_4_) |
                         (uint)!bVar2 * auVar131._32_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
                    auVar178._36_4_ =
                         (uint)bVar2 *
                         ((uint)bVar12 * auVar132._36_4_ | (uint)!bVar12 * auVar130._36_4_) |
                         (uint)!bVar2 * auVar131._36_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
                    auVar178._40_4_ =
                         (uint)bVar2 *
                         ((uint)bVar13 * auVar132._40_4_ | (uint)!bVar13 * auVar130._40_4_) |
                         (uint)!bVar2 * auVar131._40_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
                    auVar178._44_4_ =
                         (uint)bVar2 *
                         ((uint)bVar14 * auVar132._44_4_ | (uint)!bVar14 * auVar130._44_4_) |
                         (uint)!bVar2 * auVar131._44_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
                    auVar178._48_4_ =
                         (uint)bVar2 *
                         ((uint)bVar15 * auVar132._48_4_ | (uint)!bVar15 * auVar130._48_4_) |
                         (uint)!bVar2 * auVar131._48_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
                    auVar178._52_4_ =
                         (uint)bVar2 *
                         ((uint)bVar16 * auVar132._52_4_ | (uint)!bVar16 * auVar130._52_4_) |
                         (uint)!bVar2 * auVar131._52_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
                    auVar178._56_4_ =
                         (uint)bVar2 *
                         ((uint)bVar17 * auVar132._56_4_ | (uint)!bVar17 * auVar130._56_4_) |
                         (uint)!bVar2 * auVar131._56_4_;
                    bVar2 = SUB81(uVar108 >> 0xf,0);
                    auVar178._60_4_ =
                         (uint)bVar2 *
                         ((uint)bVar19 * auVar132._60_4_ | (uint)!bVar19 * auVar130._60_4_) |
                         (uint)!bVar2 * auVar131._60_4_;
                    auVar131 = vblendmps_avx512f(auVar174,auVar178);
                    bVar2 = (bool)((byte)uVar35 & 1);
                    bVar3 = (bool)((byte)(uVar35 >> 1) & 1);
                    bVar4 = (bool)((byte)(uVar35 >> 2) & 1);
                    bVar5 = (bool)((byte)(uVar35 >> 3) & 1);
                    bVar6 = (bool)((byte)(uVar35 >> 4) & 1);
                    bVar7 = (bool)((byte)(uVar35 >> 5) & 1);
                    bVar8 = (bool)((byte)(uVar35 >> 6) & 1);
                    bVar9 = (bool)((byte)(uVar35 >> 7) & 1);
                    bVar10 = (bool)((byte)(uVar35 >> 8) & 1);
                    bVar11 = (bool)((byte)(uVar35 >> 9) & 1);
                    bVar12 = (bool)((byte)(uVar35 >> 10) & 1);
                    bVar13 = (bool)((byte)(uVar35 >> 0xb) & 1);
                    bVar14 = (bool)((byte)(uVar35 >> 0xc) & 1);
                    bVar15 = (bool)((byte)(uVar35 >> 0xd) & 1);
                    bVar16 = (bool)((byte)(uVar35 >> 0xe) & 1);
                    bVar17 = SUB81(uVar35 >> 0xf,0);
                    *(uint *)*pauVar113 = (uint)bVar2 * auVar131._0_4_ | !bVar2 * auVar178._0_4_;
                    *(uint *)((long)*pauVar113 + 4) =
                         (uint)bVar3 * auVar131._4_4_ | !bVar3 * auVar178._4_4_;
                    *(uint *)((long)*pauVar113 + 8) =
                         (uint)bVar4 * auVar131._8_4_ | !bVar4 * auVar178._8_4_;
                    *(uint *)((long)*pauVar113 + 0xc) =
                         (uint)bVar5 * auVar131._12_4_ | !bVar5 * auVar178._12_4_;
                    *(uint *)((long)*pauVar113 + 0x10) =
                         (uint)bVar6 * auVar131._16_4_ | !bVar6 * auVar178._16_4_;
                    *(uint *)((long)*pauVar113 + 0x14) =
                         (uint)bVar7 * auVar131._20_4_ | !bVar7 * auVar178._20_4_;
                    *(uint *)((long)*pauVar113 + 0x18) =
                         (uint)bVar8 * auVar131._24_4_ | !bVar8 * auVar178._24_4_;
                    *(uint *)((long)*pauVar113 + 0x1c) =
                         (uint)bVar9 * auVar131._28_4_ | !bVar9 * auVar178._28_4_;
                    *(uint *)pauVar113[1] =
                         (uint)bVar10 * auVar131._32_4_ | !bVar10 * auVar178._32_4_;
                    *(uint *)(pauVar113[1] + 4) =
                         (uint)bVar11 * auVar131._36_4_ | !bVar11 * auVar178._36_4_;
                    *(uint *)(pauVar113[1] + 8) =
                         (uint)bVar12 * auVar131._40_4_ | !bVar12 * auVar178._40_4_;
                    *(uint *)(pauVar113[1] + 0xc) =
                         (uint)bVar13 * auVar131._44_4_ | !bVar13 * auVar178._44_4_;
                    *(uint *)(pauVar113[1] + 0x10) =
                         (uint)bVar14 * auVar131._48_4_ | !bVar14 * auVar178._48_4_;
                    *(uint *)(pauVar113[1] + 0x14) =
                         (uint)bVar15 * auVar131._52_4_ | !bVar15 * auVar178._52_4_;
                    *(uint *)(pauVar113[1] + 0x18) =
                         (uint)bVar16 * auVar131._56_4_ | !bVar16 * auVar178._56_4_;
                    *(uint *)(pauVar113[1] + 0x1c) =
                         (uint)bVar17 * auVar131._60_4_ | !bVar17 * auVar178._60_4_;
                    pauVar109 = pauVar109 + 1;
                    pauVar113 = pauVar113 + 2;
                    iVar93 = iVar93 + 0x10;
                    auVar130 = auVar175;
                  } while (iVar93 < iVar114);
                  uVar97 = (ulong)local_188 & 0xffffffff;
                }
                uVar96 = (uint)uVar97 | 7;
                local_218 = pvVar98;
                while (uVar105 = (uint)uVar97, (int)uVar96 < iVar114) {
                  auVar180 = *(undefined1 (*) [32])*pauVar109;
                  local_c0._0_4_ = auVar180._0_4_;
                  local_c0._4_4_ = auVar180._4_4_;
                  local_c0._8_4_ = auVar180._8_4_;
                  local_c0._12_4_ = auVar180._12_4_;
                  local_c0._16_4_ = auVar180._16_4_;
                  local_c0._20_4_ = auVar180._20_4_;
                  local_c0._24_4_ = auVar180._24_4_;
                  local_c0._28_4_ = auVar180._28_4_;
                  BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                            ((binary_op_atan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
                  *pauVar113 = auVar180;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  pauVar113 = pauVar113 + 1;
                  uVar97 = (ulong)(uVar105 + 8);
                  uVar96 = uVar105 + 0xf;
                }
                uVar96 = uVar105 | 3;
                while ((int)uVar96 < iVar114) {
                  local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
                  auVar192 = ZEXT856(*(ulong *)(*pauVar109 + 8));
                  afVar310 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                       ((binary_op_atan2 *)local_180,(__m128 *)local_c0,
                                        (__m128 *)local_160);
                  auVar120._0_8_ = afVar310._0_8_;
                  auVar120._8_56_ = auVar192;
                  *(undefined1 (*) [16])*pauVar113 = auVar120._0_16_;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  pauVar113 = (undefined1 (*) [32])((long)*pauVar113 + 0x10);
                  iVar93 = (int)uVar97;
                  uVar105 = iVar93 + 4;
                  uVar97 = (ulong)uVar105;
                  uVar96 = iVar93 + 7;
                }
                if ((int)uVar105 < iVar114) {
                  lVar115 = 0;
                  lVar103 = 0;
                  do {
                    fVar179 = atan2f(*(float *)(*pauVar109 + lVar103 * 4),(float)local_1e0._0_4_);
                    *(float *)((long)*pauVar113 + lVar103 * 4) = fVar179;
                    lVar103 = lVar103 + 1;
                    lVar115 = lVar115 + -4;
                  } while (iVar114 - uVar105 != (int)lVar103);
                  pauVar113 = (undefined1 (*) [32])((long)pauVar113 - lVar115);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar115);
                  iVar114 = local_1ec;
                }
                pvVar98 = (void *)((long)local_218 + 1);
                auVar116 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar117 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
                auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar118 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                auVar119 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                auVar120 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
                auVar121 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
                auVar122 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
                auVar123 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
                auVar124 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
                auVar125 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
                auVar126 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
                auVar127 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
                auVar128 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
                auVar309 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
                iVar93 = (int)local_210;
              } while (pvVar98 != local_1a8);
            }
            local_190 = (void *)((long)local_190 + 1);
          } while (local_190 != local_1b8);
        }
        local_1e8 = (void *)((long)local_1e8 + 1);
      } while (local_1e8 != local_1c0);
    }
    break;
  case 0xb:
    local_1ec = local_220->w;
    local_1a8 = (void *)(ulong)(uint)local_220->h;
    local_1b8 = (void *)(ulong)(uint)local_220->d;
    local_1c0 = (void *)(ulong)(uint)local_220->c;
    iVar93 = local_220->elempack;
    iVar114 = local_220->dims;
    local_16c = (float)(int)local_1a0;
    local_210 = (void *)CONCAT44(local_210._4_4_,iVar93);
    if (0 < local_220->h && ((int)local_1a0 == 1 && iVar114 == 2)) {
      iVar114 = iVar93 * local_1ec;
      local_1b0 = (void *)(CONCAT44(local_1b0._4_4_,iVar114) & 0xfffffffffffffff0);
      pvVar98 = (void *)0x0;
      auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      do {
        auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        local_1e0 = ZEXT416((uint)fVar179);
        if (iVar93 == 4) {
          auVar1 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar180._16_16_ = auVar1;
          auVar180._0_16_ = auVar1;
          local_160[0] = (float)auVar1._0_4_;
          local_160[1] = (float)auVar1._4_4_;
          local_160[2] = (float)auVar1._8_4_;
          local_160[3] = (float)auVar1._12_4_;
LAB_00398174:
          local_140._0_32_ = auVar180;
LAB_0039817d:
          auVar129 = vinserti64x4_avx512f(ZEXT3264(auVar180),auVar180,1);
        }
        else {
          local_160[1] = fVar179;
          local_160[0] = fVar179;
          local_160[2] = fVar179;
          local_160[3] = fVar179;
          if (iVar93 == 8) {
            auVar180 = *(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20);
            goto LAB_00398174;
          }
          auVar180._4_4_ = fVar179;
          auVar180._0_4_ = fVar179;
          auVar180._8_4_ = fVar179;
          auVar180._12_4_ = fVar179;
          auVar180._16_4_ = fVar179;
          auVar180._20_4_ = fVar179;
          auVar180._24_4_ = fVar179;
          auVar180._28_4_ = fVar179;
          local_140._0_32_ = auVar180;
          if (iVar93 != 0x10) goto LAB_0039817d;
          auVar129 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)local_220->w * (long)pvVar98 * local_220->elemsize +
                    (long)local_220->data);
        puVar110 = (uint *)((long)local_1f8->w * (long)pvVar98 * local_1f8->elemsize +
                           (long)local_1f8->data);
        uVar96 = 0;
        if (0xf < iVar114) {
          uVar97 = vcmpps_avx512f(auVar129,auVar309,1);
          auVar130 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar131._8_4_ = 0xc0490fdb;
          auVar131._0_8_ = 0xc0490fdbc0490fdb;
          auVar131._12_4_ = 0xc0490fdb;
          auVar131._16_4_ = 0xc0490fdb;
          auVar131._20_4_ = 0xc0490fdb;
          auVar131._24_4_ = 0xc0490fdb;
          auVar131._28_4_ = 0xc0490fdb;
          auVar131._32_4_ = 0xc0490fdb;
          auVar131._36_4_ = 0xc0490fdb;
          auVar131._40_4_ = 0xc0490fdb;
          auVar131._44_4_ = 0xc0490fdb;
          auVar131._48_4_ = 0xc0490fdb;
          auVar131._52_4_ = 0xc0490fdb;
          auVar131._56_4_ = 0xc0490fdb;
          auVar131._60_4_ = 0xc0490fdb;
          auVar131 = vblendmps_avx512f(auVar130,auVar131);
          bVar2 = (bool)((byte)uVar97 & 1);
          auVar143._0_4_ = (uint)bVar2 * auVar131._0_4_ | (uint)!bVar2 * auVar130._0_4_;
          bVar2 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar143._4_4_ = (uint)bVar2 * auVar131._4_4_ | (uint)!bVar2 * auVar130._4_4_;
          bVar2 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar143._8_4_ = (uint)bVar2 * auVar131._8_4_ | (uint)!bVar2 * auVar130._8_4_;
          bVar2 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar143._12_4_ = (uint)bVar2 * auVar131._12_4_ | (uint)!bVar2 * auVar130._12_4_;
          bVar2 = (bool)((byte)(uVar97 >> 4) & 1);
          auVar143._16_4_ = (uint)bVar2 * auVar131._16_4_ | (uint)!bVar2 * auVar130._16_4_;
          bVar2 = (bool)((byte)(uVar97 >> 5) & 1);
          auVar143._20_4_ = (uint)bVar2 * auVar131._20_4_ | (uint)!bVar2 * auVar130._20_4_;
          bVar2 = (bool)((byte)(uVar97 >> 6) & 1);
          auVar143._24_4_ = (uint)bVar2 * auVar131._24_4_ | (uint)!bVar2 * auVar130._24_4_;
          bVar2 = (bool)((byte)(uVar97 >> 7) & 1);
          auVar143._28_4_ = (uint)bVar2 * auVar131._28_4_ | (uint)!bVar2 * auVar130._28_4_;
          bVar2 = (bool)((byte)(uVar97 >> 8) & 1);
          auVar143._32_4_ = (uint)bVar2 * auVar131._32_4_ | (uint)!bVar2 * auVar130._32_4_;
          bVar2 = (bool)((byte)(uVar97 >> 9) & 1);
          auVar143._36_4_ = (uint)bVar2 * auVar131._36_4_ | (uint)!bVar2 * auVar130._36_4_;
          bVar2 = (bool)((byte)(uVar97 >> 10) & 1);
          auVar143._40_4_ = (uint)bVar2 * auVar131._40_4_ | (uint)!bVar2 * auVar130._40_4_;
          bVar2 = (bool)((byte)(uVar97 >> 0xb) & 1);
          auVar143._44_4_ = (uint)bVar2 * auVar131._44_4_ | (uint)!bVar2 * auVar130._44_4_;
          bVar2 = (bool)((byte)(uVar97 >> 0xc) & 1);
          auVar143._48_4_ = (uint)bVar2 * auVar131._48_4_ | (uint)!bVar2 * auVar130._48_4_;
          bVar2 = (bool)((byte)(uVar97 >> 0xd) & 1);
          auVar143._52_4_ = (uint)bVar2 * auVar131._52_4_ | (uint)!bVar2 * auVar130._52_4_;
          bVar2 = (bool)((byte)(uVar97 >> 0xe) & 1);
          auVar143._56_4_ = (uint)bVar2 * auVar131._56_4_ | (uint)!bVar2 * auVar130._56_4_;
          bVar2 = SUB81(uVar97 >> 0xf,0);
          auVar143._60_4_ = (uint)bVar2 * auVar131._60_4_ | (uint)!bVar2 * auVar130._60_4_;
          auVar131 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar131 = vpternlogd_avx512f(auVar131,auVar129,auVar116,0xf8);
          iVar93 = 0xf;
          uVar97 = vcmpps_avx512f(auVar129,auVar309,4);
          do {
            auVar130 = *pauVar109;
            auVar132 = vrcp14ps_avx512f(auVar130);
            auVar133 = vmulps_avx512f(auVar129,auVar132);
            auVar134 = vfmsub213ps_avx512f(auVar133,auVar130,auVar129);
            auVar133 = vfnmadd213ps_avx512f(auVar134,auVar132,auVar133);
            auVar134 = vandps_avx512dq(auVar133,auVar117);
            uVar108 = vcmpps_avx512f(auVar118,auVar134,1);
            auVar135 = vmaxps_avx512f(auVar134,auVar118);
            auVar132._8_4_ = 0xbf800000;
            auVar132._0_8_ = 0xbf800000bf800000;
            auVar132._12_4_ = 0xbf800000;
            auVar132._16_4_ = 0xbf800000;
            auVar132._20_4_ = 0xbf800000;
            auVar132._24_4_ = 0xbf800000;
            auVar132._28_4_ = 0xbf800000;
            auVar132._32_4_ = 0xbf800000;
            auVar132._36_4_ = 0xbf800000;
            auVar132._40_4_ = 0xbf800000;
            auVar132._44_4_ = 0xbf800000;
            auVar132._48_4_ = 0xbf800000;
            auVar132._52_4_ = 0xbf800000;
            auVar132._56_4_ = 0xbf800000;
            auVar132._60_4_ = 0xbf800000;
            auVar132 = vblendmps_avx512f(auVar134,auVar132);
            bVar2 = (bool)((byte)uVar108 & 1);
            auVar136._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar134._0_4_;
            bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar136._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar134._4_4_;
            bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar136._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar134._8_4_;
            bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar136._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar134._12_4_;
            bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar136._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar134._16_4_;
            bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar136._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar134._20_4_;
            bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar136._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar134._24_4_;
            bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
            auVar136._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar134._28_4_;
            bVar18 = (byte)(uVar108 >> 8);
            bVar2 = (bool)(bVar18 & 1);
            auVar136._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar134._32_4_;
            bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
            auVar136._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar134._36_4_;
            bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
            auVar136._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar134._40_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
            auVar136._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar134._44_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
            auVar136._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar134._48_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
            auVar136._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar134._52_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
            auVar136._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar134._56_4_;
            bVar2 = SUB81(uVar108 >> 0xf,0);
            auVar136._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar134._60_4_;
            auVar132 = vrcp14ps_avx512f(auVar135);
            auVar134 = vmulps_avx512f(auVar136,auVar132);
            auVar135 = vfmsub213ps_avx512f(auVar135,auVar134,auVar136);
            auVar132 = vfnmadd213ps_avx512f(auVar135,auVar132,auVar134);
            auVar134 = vmulps_avx512f(auVar132,auVar132);
            uVar112 = vcmpps_avx512f(auVar130,auVar309,4);
            auVar135 = vmulps_avx512f(auVar134,auVar134);
            auVar136 = vfmadd213ps_avx512f(auVar119,auVar135,auVar120);
            auVar136 = vfmadd213ps_avx512f(auVar136,auVar135,auVar121);
            auVar137 = vfmadd213ps_avx512f(auVar123,auVar135,auVar124);
            auVar137 = vfmadd213ps_avx512f(auVar137,auVar135,auVar125);
            auVar136 = vfmadd213ps_avx512f(auVar136,auVar135,auVar122);
            auVar137 = vfmadd213ps_avx512f(auVar137,auVar135,auVar126);
            auVar135 = vfmadd213ps_avx512f(auVar137,auVar135,auVar118);
            auVar134 = vfmadd231ps_avx512f(auVar135,auVar134,auVar136);
            uVar35 = vcmpps_avx512f(auVar130,auVar309,1);
            auVar132 = vmulps_avx512f(auVar134,auVar132);
            auVar134 = vaddps_avx512f(auVar132,auVar127);
            bVar2 = (bool)((byte)uVar108 & 1);
            auVar135._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
            bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
            bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
            bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_;
            bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar135._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_;
            bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar135._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_;
            bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar135._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_;
            bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
            auVar135._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_;
            bVar2 = (bool)(bVar18 & 1);
            auVar135._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_;
            bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
            auVar135._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_;
            bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
            auVar135._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
            auVar135._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
            auVar135._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
            auVar135._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
            auVar135._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_;
            bVar2 = SUB81(uVar108 >> 0xf,0);
            auVar135._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_;
            auVar130 = vpternlogd_avx512f(auVar130,auVar116,auVar128,0xea);
            auVar132 = vpternlogd_avx512f(auVar135,auVar133,auVar116,0xf8);
            uVar108 = vcmpps_avx512f(auVar130,auVar309,1);
            auVar130 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar133 = vaddps_avx512f(auVar132,auVar143);
            bVar2 = (bool)((byte)uVar35 & 1);
            auVar134._0_4_ = (uint)bVar2 * auVar133._0_4_ | (uint)!bVar2 * auVar132._0_4_;
            bVar2 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar2 * auVar133._4_4_ | (uint)!bVar2 * auVar132._4_4_;
            bVar2 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar2 * auVar133._8_4_ | (uint)!bVar2 * auVar132._8_4_;
            bVar2 = (bool)((byte)(uVar35 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar2 * auVar133._12_4_ | (uint)!bVar2 * auVar132._12_4_;
            bVar2 = (bool)((byte)(uVar35 >> 4) & 1);
            auVar134._16_4_ = (uint)bVar2 * auVar133._16_4_ | (uint)!bVar2 * auVar132._16_4_;
            bVar2 = (bool)((byte)(uVar35 >> 5) & 1);
            auVar134._20_4_ = (uint)bVar2 * auVar133._20_4_ | (uint)!bVar2 * auVar132._20_4_;
            bVar2 = (bool)((byte)(uVar35 >> 6) & 1);
            auVar134._24_4_ = (uint)bVar2 * auVar133._24_4_ | (uint)!bVar2 * auVar132._24_4_;
            bVar2 = (bool)((byte)(uVar35 >> 7) & 1);
            auVar134._28_4_ = (uint)bVar2 * auVar133._28_4_ | (uint)!bVar2 * auVar132._28_4_;
            bVar2 = (bool)((byte)(uVar35 >> 8) & 1);
            auVar134._32_4_ = (uint)bVar2 * auVar133._32_4_ | (uint)!bVar2 * auVar132._32_4_;
            bVar2 = (bool)((byte)(uVar35 >> 9) & 1);
            auVar134._36_4_ = (uint)bVar2 * auVar133._36_4_ | (uint)!bVar2 * auVar132._36_4_;
            bVar2 = (bool)((byte)(uVar35 >> 10) & 1);
            auVar134._40_4_ = (uint)bVar2 * auVar133._40_4_ | (uint)!bVar2 * auVar132._40_4_;
            bVar2 = (bool)((byte)(uVar35 >> 0xb) & 1);
            auVar134._44_4_ = (uint)bVar2 * auVar133._44_4_ | (uint)!bVar2 * auVar132._44_4_;
            bVar2 = (bool)((byte)(uVar35 >> 0xc) & 1);
            auVar134._48_4_ = (uint)bVar2 * auVar133._48_4_ | (uint)!bVar2 * auVar132._48_4_;
            bVar2 = (bool)((byte)(uVar35 >> 0xd) & 1);
            auVar134._52_4_ = (uint)bVar2 * auVar133._52_4_ | (uint)!bVar2 * auVar132._52_4_;
            bVar2 = (bool)((byte)(uVar35 >> 0xe) & 1);
            auVar134._56_4_ = (uint)bVar2 * auVar133._56_4_ | (uint)!bVar2 * auVar132._56_4_;
            bVar2 = SUB81(uVar35 >> 0xf,0);
            auVar134._60_4_ = (uint)bVar2 * auVar133._60_4_ | (uint)!bVar2 * auVar132._60_4_;
            auVar132 = vblendmps_avx512f(auVar131,auVar134);
            bVar2 = (bool)((byte)uVar112 & 1);
            bVar4 = (bool)((byte)(uVar112 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar112 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar112 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar112 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar112 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar112 >> 6) & 1);
            bVar16 = (bool)((byte)(uVar112 >> 7) & 1);
            bVar19 = (bool)((byte)(uVar112 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar112 >> 9) & 1);
            bVar23 = (bool)((byte)(uVar112 >> 10) & 1);
            bVar25 = (bool)((byte)(uVar112 >> 0xb) & 1);
            bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
            bVar29 = (bool)((byte)(uVar112 >> 0xd) & 1);
            bVar31 = (bool)((byte)(uVar112 >> 0xe) & 1);
            bVar33 = SUB81(uVar112 >> 0xf,0);
            bVar3 = (bool)((byte)uVar97 & 1);
            bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar97 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar97 >> 6) & 1);
            bVar17 = (bool)((byte)(uVar97 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar97 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar97 >> 9) & 1);
            bVar24 = (bool)((byte)(uVar97 >> 10) & 1);
            bVar26 = (bool)((byte)(uVar97 >> 0xb) & 1);
            bVar28 = (bool)((byte)(uVar97 >> 0xc) & 1);
            bVar30 = (bool)((byte)(uVar97 >> 0xd) & 1);
            bVar32 = (bool)((byte)(uVar97 >> 0xe) & 1);
            bVar34 = SUB81(uVar97 >> 0xf,0);
            *puVar110 = (uint)bVar3 * ((uint)bVar2 * auVar132._0_4_ | !bVar2 * auVar134._0_4_) |
                        (uint)!bVar3 * (uint)((byte)uVar108 & 1) * auVar130._0_4_;
            puVar110[1] = (uint)bVar5 * ((uint)bVar4 * auVar132._4_4_ | !bVar4 * auVar134._4_4_) |
                          (uint)!bVar5 * (uint)((byte)(uVar108 >> 1) & 1) * auVar130._4_4_;
            puVar110[2] = (uint)bVar7 * ((uint)bVar6 * auVar132._8_4_ | !bVar6 * auVar134._8_4_) |
                          (uint)!bVar7 * (uint)((byte)(uVar108 >> 2) & 1) * auVar130._8_4_;
            puVar110[3] = (uint)bVar9 * ((uint)bVar8 * auVar132._12_4_ | !bVar8 * auVar134._12_4_) |
                          (uint)!bVar9 * (uint)((byte)(uVar108 >> 3) & 1) * auVar130._12_4_;
            puVar110[4] = (uint)bVar11 *
                          ((uint)bVar10 * auVar132._16_4_ | !bVar10 * auVar134._16_4_) |
                          (uint)!bVar11 * (uint)((byte)(uVar108 >> 4) & 1) * auVar130._16_4_;
            puVar110[5] = (uint)bVar13 *
                          ((uint)bVar12 * auVar132._20_4_ | !bVar12 * auVar134._20_4_) |
                          (uint)!bVar13 * (uint)((byte)(uVar108 >> 5) & 1) * auVar130._20_4_;
            puVar110[6] = (uint)bVar15 *
                          ((uint)bVar14 * auVar132._24_4_ | !bVar14 * auVar134._24_4_) |
                          (uint)!bVar15 * (uint)((byte)(uVar108 >> 6) & 1) * auVar130._24_4_;
            puVar110[7] = (uint)bVar17 *
                          ((uint)bVar16 * auVar132._28_4_ | !bVar16 * auVar134._28_4_) |
                          (uint)!bVar17 * (uint)((byte)(uVar108 >> 7) & 1) * auVar130._28_4_;
            puVar110[8] = (uint)bVar20 *
                          ((uint)bVar19 * auVar132._32_4_ | !bVar19 * auVar134._32_4_) |
                          (uint)!bVar20 * (uint)((byte)(uVar108 >> 8) & 1) * auVar130._32_4_;
            puVar110[9] = (uint)bVar22 *
                          ((uint)bVar21 * auVar132._36_4_ | !bVar21 * auVar134._36_4_) |
                          (uint)!bVar22 * (uint)((byte)(uVar108 >> 9) & 1) * auVar130._36_4_;
            puVar110[10] = (uint)bVar24 *
                           ((uint)bVar23 * auVar132._40_4_ | !bVar23 * auVar134._40_4_) |
                           (uint)!bVar24 * (uint)((byte)(uVar108 >> 10) & 1) * auVar130._40_4_;
            puVar110[0xb] =
                 (uint)bVar26 * ((uint)bVar25 * auVar132._44_4_ | !bVar25 * auVar134._44_4_) |
                 (uint)!bVar26 * (uint)((byte)(uVar108 >> 0xb) & 1) * auVar130._44_4_;
            puVar110[0xc] =
                 (uint)bVar28 * ((uint)bVar27 * auVar132._48_4_ | !bVar27 * auVar134._48_4_) |
                 (uint)!bVar28 * (uint)((byte)(uVar108 >> 0xc) & 1) * auVar130._48_4_;
            puVar110[0xd] =
                 (uint)bVar30 * ((uint)bVar29 * auVar132._52_4_ | !bVar29 * auVar134._52_4_) |
                 (uint)!bVar30 * (uint)((byte)(uVar108 >> 0xd) & 1) * auVar130._52_4_;
            puVar110[0xe] =
                 (uint)bVar32 * ((uint)bVar31 * auVar132._56_4_ | !bVar31 * auVar134._56_4_) |
                 (uint)!bVar32 * (uint)((byte)(uVar108 >> 0xe) & 1) * auVar130._56_4_;
            puVar110[0xf] =
                 (uint)bVar34 * ((uint)bVar33 * auVar132._60_4_ | !bVar33 * auVar134._60_4_) |
                 (uint)!bVar34 * (uint)(byte)(uVar108 >> 0xf) * auVar130._60_4_;
            pauVar109 = pauVar109 + 1;
            puVar110 = puVar110 + 0x10;
            iVar93 = iVar93 + 0x10;
          } while (iVar93 < iVar114);
          uVar96 = (uint)local_1b0;
        }
        uVar105 = uVar96 | 7;
        local_218 = pvVar98;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)*pauVar109;
          uVar190 = *(undefined8 *)(*pauVar109 + 8);
          uVar193 = *(undefined8 *)(*pauVar109 + 0x10);
          uVar194 = *(undefined8 *)(*pauVar109 + 0x18);
          local_c0 = *(undefined1 (*) [32])*pauVar109;
          BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                    ((binary_op_ratan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
          *(undefined8 *)puVar110 = uVar191;
          *(undefined8 *)(puVar110 + 2) = uVar190;
          *(undefined8 *)(puVar110 + 4) = uVar193;
          *(undefined8 *)(puVar110 + 6) = uVar194;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          puVar110 = puVar110 + 8;
          uVar105 = uVar96 + 0xf;
          uVar96 = uVar96 + 8;
        }
        uVar105 = uVar96 | 3;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)(*pauVar109 + 8);
          local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
          afVar310 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                               ((binary_op_ratan2 *)local_180,(__m128 *)local_c0,(__m128 *)local_160
                               );
          *(long *)puVar110 = afVar310._0_8_;
          *(undefined8 *)(puVar110 + 2) = uVar191;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          puVar110 = puVar110 + 4;
          uVar105 = uVar96 + 7;
          uVar96 = uVar96 + 4;
        }
        if (iVar114 - uVar96 != 0 && (int)uVar96 <= iVar114) {
          lVar103 = 0;
          do {
            fVar179 = atan2f((float)local_1e0._0_4_,*(float *)(*pauVar109 + lVar103 * 4));
            puVar110[lVar103] = (uint)fVar179;
            lVar103 = lVar103 + 1;
          } while (iVar114 - uVar96 != (int)lVar103);
        }
        pvVar98 = (void *)((long)local_218 + 1);
        auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        iVar93 = (int)local_210;
      } while (pvVar98 != local_1a8);
      iVar114 = local_220->dims;
    }
    if ((iVar114 - 3U < 2) && (local_16c == 1.4013e-45)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)local_1c0 < 1) break;
      iVar114 = (int)local_1a8 * (int)local_1b8 * iVar93 * local_1ec;
      local_1b0 = (void *)(CONCAT44(local_1b0._4_4_,iVar114) & 0xfffffffffffffff0);
      pvVar98 = (void *)0x0;
      auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      do {
        auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar179 = *(float *)((long)local_228 + (long)pvVar98 * 4);
        local_1e0 = ZEXT416((uint)fVar179);
        if (iVar93 == 4) {
          auVar1 = *(undefined1 (*) [16])((long)local_228 + (long)pvVar98 * 0x10);
          auVar182._16_16_ = auVar1;
          auVar182._0_16_ = auVar1;
          local_160[0] = (float)auVar1._0_4_;
          local_160[1] = (float)auVar1._4_4_;
          local_160[2] = (float)auVar1._8_4_;
          local_160[3] = (float)auVar1._12_4_;
LAB_0039cf53:
          local_140._0_32_ = auVar182;
LAB_0039cf5c:
          auVar129 = vinserti64x4_avx512f(ZEXT3264(auVar182),auVar182,1);
        }
        else {
          local_160[1] = fVar179;
          local_160[0] = fVar179;
          local_160[2] = fVar179;
          local_160[3] = fVar179;
          if (iVar93 == 8) {
            auVar182 = *(undefined1 (*) [32])((long)local_228 + (long)pvVar98 * 0x20);
            goto LAB_0039cf53;
          }
          auVar182._4_4_ = fVar179;
          auVar182._0_4_ = fVar179;
          auVar182._8_4_ = fVar179;
          auVar182._12_4_ = fVar179;
          auVar182._16_4_ = fVar179;
          auVar182._20_4_ = fVar179;
          auVar182._24_4_ = fVar179;
          auVar182._28_4_ = fVar179;
          local_140._0_32_ = auVar182;
          if (iVar93 != 0x10) goto LAB_0039cf5c;
          auVar129 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                        ((long)local_228 + (long)pvVar98 * 0x40));
        }
        pauVar109 = (undefined1 (*) [64])
                    (local_220->cstep * (long)pvVar98 * local_220->elemsize + (long)local_220->data)
        ;
        puVar110 = (uint *)(local_1f8->cstep * (long)pvVar98 * local_1f8->elemsize +
                           (long)local_1f8->data);
        uVar96 = 0;
        if (0xf < iVar114) {
          uVar97 = vcmpps_avx512f(auVar129,auVar309,1);
          auVar131 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar130._8_4_ = 0xc0490fdb;
          auVar130._0_8_ = 0xc0490fdbc0490fdb;
          auVar130._12_4_ = 0xc0490fdb;
          auVar130._16_4_ = 0xc0490fdb;
          auVar130._20_4_ = 0xc0490fdb;
          auVar130._24_4_ = 0xc0490fdb;
          auVar130._28_4_ = 0xc0490fdb;
          auVar130._32_4_ = 0xc0490fdb;
          auVar130._36_4_ = 0xc0490fdb;
          auVar130._40_4_ = 0xc0490fdb;
          auVar130._44_4_ = 0xc0490fdb;
          auVar130._48_4_ = 0xc0490fdb;
          auVar130._52_4_ = 0xc0490fdb;
          auVar130._56_4_ = 0xc0490fdb;
          auVar130._60_4_ = 0xc0490fdb;
          auVar130 = vblendmps_avx512f(auVar131,auVar130);
          bVar2 = (bool)((byte)uVar97 & 1);
          auVar133._0_4_ = (uint)bVar2 * auVar130._0_4_ | (uint)!bVar2 * auVar131._0_4_;
          bVar2 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar2 * auVar130._4_4_ | (uint)!bVar2 * auVar131._4_4_;
          bVar2 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar2 * auVar130._8_4_ | (uint)!bVar2 * auVar131._8_4_;
          bVar2 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar2 * auVar130._12_4_ | (uint)!bVar2 * auVar131._12_4_;
          bVar2 = (bool)((byte)(uVar97 >> 4) & 1);
          auVar133._16_4_ = (uint)bVar2 * auVar130._16_4_ | (uint)!bVar2 * auVar131._16_4_;
          bVar2 = (bool)((byte)(uVar97 >> 5) & 1);
          auVar133._20_4_ = (uint)bVar2 * auVar130._20_4_ | (uint)!bVar2 * auVar131._20_4_;
          bVar2 = (bool)((byte)(uVar97 >> 6) & 1);
          auVar133._24_4_ = (uint)bVar2 * auVar130._24_4_ | (uint)!bVar2 * auVar131._24_4_;
          bVar2 = (bool)((byte)(uVar97 >> 7) & 1);
          auVar133._28_4_ = (uint)bVar2 * auVar130._28_4_ | (uint)!bVar2 * auVar131._28_4_;
          bVar2 = (bool)((byte)(uVar97 >> 8) & 1);
          auVar133._32_4_ = (uint)bVar2 * auVar130._32_4_ | (uint)!bVar2 * auVar131._32_4_;
          bVar2 = (bool)((byte)(uVar97 >> 9) & 1);
          auVar133._36_4_ = (uint)bVar2 * auVar130._36_4_ | (uint)!bVar2 * auVar131._36_4_;
          bVar2 = (bool)((byte)(uVar97 >> 10) & 1);
          auVar133._40_4_ = (uint)bVar2 * auVar130._40_4_ | (uint)!bVar2 * auVar131._40_4_;
          bVar2 = (bool)((byte)(uVar97 >> 0xb) & 1);
          auVar133._44_4_ = (uint)bVar2 * auVar130._44_4_ | (uint)!bVar2 * auVar131._44_4_;
          bVar2 = (bool)((byte)(uVar97 >> 0xc) & 1);
          auVar133._48_4_ = (uint)bVar2 * auVar130._48_4_ | (uint)!bVar2 * auVar131._48_4_;
          bVar2 = (bool)((byte)(uVar97 >> 0xd) & 1);
          auVar133._52_4_ = (uint)bVar2 * auVar130._52_4_ | (uint)!bVar2 * auVar131._52_4_;
          bVar2 = (bool)((byte)(uVar97 >> 0xe) & 1);
          auVar133._56_4_ = (uint)bVar2 * auVar130._56_4_ | (uint)!bVar2 * auVar131._56_4_;
          bVar2 = SUB81(uVar97 >> 0xf,0);
          auVar133._60_4_ = (uint)bVar2 * auVar130._60_4_ | (uint)!bVar2 * auVar131._60_4_;
          auVar131 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar131 = vpternlogd_avx512f(auVar131,auVar129,auVar116,0xf8);
          iVar93 = 0xf;
          uVar97 = vcmpps_avx512f(auVar129,auVar309,4);
          do {
            auVar130 = *pauVar109;
            auVar143 = vrcp14ps_avx512f(auVar130);
            auVar132 = vmulps_avx512f(auVar129,auVar143);
            auVar134 = vfmsub213ps_avx512f(auVar132,auVar130,auVar129);
            auVar143 = vfnmadd213ps_avx512f(auVar134,auVar143,auVar132);
            auVar132 = vandps_avx512dq(auVar143,auVar117);
            uVar108 = vcmpps_avx512f(auVar118,auVar132,1);
            auVar134 = vmaxps_avx512f(auVar132,auVar118);
            auVar137._8_4_ = 0xbf800000;
            auVar137._0_8_ = 0xbf800000bf800000;
            auVar137._12_4_ = 0xbf800000;
            auVar137._16_4_ = 0xbf800000;
            auVar137._20_4_ = 0xbf800000;
            auVar137._24_4_ = 0xbf800000;
            auVar137._28_4_ = 0xbf800000;
            auVar137._32_4_ = 0xbf800000;
            auVar137._36_4_ = 0xbf800000;
            auVar137._40_4_ = 0xbf800000;
            auVar137._44_4_ = 0xbf800000;
            auVar137._48_4_ = 0xbf800000;
            auVar137._52_4_ = 0xbf800000;
            auVar137._56_4_ = 0xbf800000;
            auVar137._60_4_ = 0xbf800000;
            auVar135 = vblendmps_avx512f(auVar132,auVar137);
            bVar2 = (bool)((byte)uVar108 & 1);
            auVar144._0_4_ = (uint)bVar2 * auVar135._0_4_ | (uint)!bVar2 * auVar132._0_4_;
            bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar144._4_4_ = (uint)bVar2 * auVar135._4_4_ | (uint)!bVar2 * auVar132._4_4_;
            bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar144._8_4_ = (uint)bVar2 * auVar135._8_4_ | (uint)!bVar2 * auVar132._8_4_;
            bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar144._12_4_ = (uint)bVar2 * auVar135._12_4_ | (uint)!bVar2 * auVar132._12_4_;
            bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar144._16_4_ = (uint)bVar2 * auVar135._16_4_ | (uint)!bVar2 * auVar132._16_4_;
            bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar144._20_4_ = (uint)bVar2 * auVar135._20_4_ | (uint)!bVar2 * auVar132._20_4_;
            bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar144._24_4_ = (uint)bVar2 * auVar135._24_4_ | (uint)!bVar2 * auVar132._24_4_;
            bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
            auVar144._28_4_ = (uint)bVar2 * auVar135._28_4_ | (uint)!bVar2 * auVar132._28_4_;
            bVar18 = (byte)(uVar108 >> 8);
            bVar2 = (bool)(bVar18 & 1);
            auVar144._32_4_ = (uint)bVar2 * auVar135._32_4_ | (uint)!bVar2 * auVar132._32_4_;
            bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
            auVar144._36_4_ = (uint)bVar2 * auVar135._36_4_ | (uint)!bVar2 * auVar132._36_4_;
            bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
            auVar144._40_4_ = (uint)bVar2 * auVar135._40_4_ | (uint)!bVar2 * auVar132._40_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
            auVar144._44_4_ = (uint)bVar2 * auVar135._44_4_ | (uint)!bVar2 * auVar132._44_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
            auVar144._48_4_ = (uint)bVar2 * auVar135._48_4_ | (uint)!bVar2 * auVar132._48_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
            auVar144._52_4_ = (uint)bVar2 * auVar135._52_4_ | (uint)!bVar2 * auVar132._52_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
            auVar144._56_4_ = (uint)bVar2 * auVar135._56_4_ | (uint)!bVar2 * auVar132._56_4_;
            bVar2 = SUB81(uVar108 >> 0xf,0);
            auVar144._60_4_ = (uint)bVar2 * auVar135._60_4_ | (uint)!bVar2 * auVar132._60_4_;
            auVar132 = vrcp14ps_avx512f(auVar134);
            auVar135 = vmulps_avx512f(auVar144,auVar132);
            auVar134 = vfmsub213ps_avx512f(auVar134,auVar135,auVar144);
            auVar132 = vfnmadd213ps_avx512f(auVar134,auVar132,auVar135);
            auVar134 = vmulps_avx512f(auVar132,auVar132);
            uVar112 = vcmpps_avx512f(auVar130,auVar309,4);
            auVar135 = vmulps_avx512f(auVar134,auVar134);
            auVar136 = vfmadd213ps_avx512f(auVar119,auVar135,auVar120);
            auVar136 = vfmadd213ps_avx512f(auVar136,auVar135,auVar121);
            auVar137 = vfmadd213ps_avx512f(auVar123,auVar135,auVar124);
            auVar137 = vfmadd213ps_avx512f(auVar137,auVar135,auVar125);
            auVar136 = vfmadd213ps_avx512f(auVar136,auVar135,auVar122);
            auVar137 = vfmadd213ps_avx512f(auVar137,auVar135,auVar126);
            auVar135 = vfmadd213ps_avx512f(auVar137,auVar135,auVar118);
            auVar134 = vfmadd231ps_avx512f(auVar135,auVar134,auVar136);
            uVar35 = vcmpps_avx512f(auVar130,auVar309,1);
            auVar132 = vmulps_avx512f(auVar134,auVar132);
            auVar134 = vaddps_avx512f(auVar132,auVar127);
            bVar2 = (bool)((byte)uVar108 & 1);
            auVar145._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
            bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
            auVar145._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
            bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
            auVar145._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
            bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
            auVar145._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_;
            bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
            auVar145._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_;
            bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
            auVar145._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_;
            bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
            auVar145._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_;
            bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
            auVar145._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_;
            bVar2 = (bool)(bVar18 & 1);
            auVar145._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_;
            bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
            auVar145._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_;
            bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
            auVar145._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
            auVar145._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
            auVar145._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
            auVar145._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_;
            bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
            auVar145._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_;
            bVar2 = SUB81(uVar108 >> 0xf,0);
            auVar145._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_;
            auVar130 = vpternlogd_avx512f(auVar130,auVar116,auVar128,0xea);
            auVar143 = vpternlogd_avx512f(auVar145,auVar143,auVar116,0xf8);
            uVar108 = vcmpps_avx512f(auVar130,auVar309,1);
            auVar130 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar132 = vaddps_avx512f(auVar143,auVar133);
            bVar2 = (bool)((byte)uVar35 & 1);
            auVar146._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar143._0_4_;
            bVar2 = (bool)((byte)(uVar35 >> 1) & 1);
            auVar146._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar143._4_4_;
            bVar2 = (bool)((byte)(uVar35 >> 2) & 1);
            auVar146._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar143._8_4_;
            bVar2 = (bool)((byte)(uVar35 >> 3) & 1);
            auVar146._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar143._12_4_;
            bVar2 = (bool)((byte)(uVar35 >> 4) & 1);
            auVar146._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar143._16_4_;
            bVar2 = (bool)((byte)(uVar35 >> 5) & 1);
            auVar146._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar143._20_4_;
            bVar2 = (bool)((byte)(uVar35 >> 6) & 1);
            auVar146._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar143._24_4_;
            bVar2 = (bool)((byte)(uVar35 >> 7) & 1);
            auVar146._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar143._28_4_;
            bVar2 = (bool)((byte)(uVar35 >> 8) & 1);
            auVar146._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar143._32_4_;
            bVar2 = (bool)((byte)(uVar35 >> 9) & 1);
            auVar146._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar143._36_4_;
            bVar2 = (bool)((byte)(uVar35 >> 10) & 1);
            auVar146._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar143._40_4_;
            bVar2 = (bool)((byte)(uVar35 >> 0xb) & 1);
            auVar146._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar143._44_4_;
            bVar2 = (bool)((byte)(uVar35 >> 0xc) & 1);
            auVar146._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar143._48_4_;
            bVar2 = (bool)((byte)(uVar35 >> 0xd) & 1);
            auVar146._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar143._52_4_;
            bVar2 = (bool)((byte)(uVar35 >> 0xe) & 1);
            auVar146._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar143._56_4_;
            bVar2 = SUB81(uVar35 >> 0xf,0);
            auVar146._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar143._60_4_;
            auVar143 = vblendmps_avx512f(auVar131,auVar146);
            bVar2 = (bool)((byte)uVar112 & 1);
            bVar4 = (bool)((byte)(uVar112 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar112 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar112 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar112 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar112 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar112 >> 6) & 1);
            bVar16 = (bool)((byte)(uVar112 >> 7) & 1);
            bVar19 = (bool)((byte)(uVar112 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar112 >> 9) & 1);
            bVar23 = (bool)((byte)(uVar112 >> 10) & 1);
            bVar25 = (bool)((byte)(uVar112 >> 0xb) & 1);
            bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
            bVar29 = (bool)((byte)(uVar112 >> 0xd) & 1);
            bVar31 = (bool)((byte)(uVar112 >> 0xe) & 1);
            bVar33 = SUB81(uVar112 >> 0xf,0);
            bVar3 = (bool)((byte)uVar97 & 1);
            bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar97 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar97 >> 6) & 1);
            bVar17 = (bool)((byte)(uVar97 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar97 >> 8) & 1);
            bVar22 = (bool)((byte)(uVar97 >> 9) & 1);
            bVar24 = (bool)((byte)(uVar97 >> 10) & 1);
            bVar26 = (bool)((byte)(uVar97 >> 0xb) & 1);
            bVar28 = (bool)((byte)(uVar97 >> 0xc) & 1);
            bVar30 = (bool)((byte)(uVar97 >> 0xd) & 1);
            bVar32 = (bool)((byte)(uVar97 >> 0xe) & 1);
            bVar34 = SUB81(uVar97 >> 0xf,0);
            *puVar110 = (uint)bVar3 * ((uint)bVar2 * auVar143._0_4_ | !bVar2 * auVar146._0_4_) |
                        (uint)!bVar3 * (uint)((byte)uVar108 & 1) * auVar130._0_4_;
            puVar110[1] = (uint)bVar5 * ((uint)bVar4 * auVar143._4_4_ | !bVar4 * auVar146._4_4_) |
                          (uint)!bVar5 * (uint)((byte)(uVar108 >> 1) & 1) * auVar130._4_4_;
            puVar110[2] = (uint)bVar7 * ((uint)bVar6 * auVar143._8_4_ | !bVar6 * auVar146._8_4_) |
                          (uint)!bVar7 * (uint)((byte)(uVar108 >> 2) & 1) * auVar130._8_4_;
            puVar110[3] = (uint)bVar9 * ((uint)bVar8 * auVar143._12_4_ | !bVar8 * auVar146._12_4_) |
                          (uint)!bVar9 * (uint)((byte)(uVar108 >> 3) & 1) * auVar130._12_4_;
            puVar110[4] = (uint)bVar11 *
                          ((uint)bVar10 * auVar143._16_4_ | !bVar10 * auVar146._16_4_) |
                          (uint)!bVar11 * (uint)((byte)(uVar108 >> 4) & 1) * auVar130._16_4_;
            puVar110[5] = (uint)bVar13 *
                          ((uint)bVar12 * auVar143._20_4_ | !bVar12 * auVar146._20_4_) |
                          (uint)!bVar13 * (uint)((byte)(uVar108 >> 5) & 1) * auVar130._20_4_;
            puVar110[6] = (uint)bVar15 *
                          ((uint)bVar14 * auVar143._24_4_ | !bVar14 * auVar146._24_4_) |
                          (uint)!bVar15 * (uint)((byte)(uVar108 >> 6) & 1) * auVar130._24_4_;
            puVar110[7] = (uint)bVar17 *
                          ((uint)bVar16 * auVar143._28_4_ | !bVar16 * auVar146._28_4_) |
                          (uint)!bVar17 * (uint)((byte)(uVar108 >> 7) & 1) * auVar130._28_4_;
            puVar110[8] = (uint)bVar20 *
                          ((uint)bVar19 * auVar143._32_4_ | !bVar19 * auVar146._32_4_) |
                          (uint)!bVar20 * (uint)((byte)(uVar108 >> 8) & 1) * auVar130._32_4_;
            puVar110[9] = (uint)bVar22 *
                          ((uint)bVar21 * auVar143._36_4_ | !bVar21 * auVar146._36_4_) |
                          (uint)!bVar22 * (uint)((byte)(uVar108 >> 9) & 1) * auVar130._36_4_;
            puVar110[10] = (uint)bVar24 *
                           ((uint)bVar23 * auVar143._40_4_ | !bVar23 * auVar146._40_4_) |
                           (uint)!bVar24 * (uint)((byte)(uVar108 >> 10) & 1) * auVar130._40_4_;
            puVar110[0xb] =
                 (uint)bVar26 * ((uint)bVar25 * auVar143._44_4_ | !bVar25 * auVar146._44_4_) |
                 (uint)!bVar26 * (uint)((byte)(uVar108 >> 0xb) & 1) * auVar130._44_4_;
            puVar110[0xc] =
                 (uint)bVar28 * ((uint)bVar27 * auVar143._48_4_ | !bVar27 * auVar146._48_4_) |
                 (uint)!bVar28 * (uint)((byte)(uVar108 >> 0xc) & 1) * auVar130._48_4_;
            puVar110[0xd] =
                 (uint)bVar30 * ((uint)bVar29 * auVar143._52_4_ | !bVar29 * auVar146._52_4_) |
                 (uint)!bVar30 * (uint)((byte)(uVar108 >> 0xd) & 1) * auVar130._52_4_;
            puVar110[0xe] =
                 (uint)bVar32 * ((uint)bVar31 * auVar143._56_4_ | !bVar31 * auVar146._56_4_) |
                 (uint)!bVar32 * (uint)((byte)(uVar108 >> 0xe) & 1) * auVar130._56_4_;
            puVar110[0xf] =
                 (uint)bVar34 * ((uint)bVar33 * auVar143._60_4_ | !bVar33 * auVar146._60_4_) |
                 (uint)!bVar34 * (uint)(byte)(uVar108 >> 0xf) * auVar130._60_4_;
            pauVar109 = pauVar109 + 1;
            puVar110 = puVar110 + 0x10;
            iVar93 = iVar93 + 0x10;
          } while (iVar93 < iVar114);
          uVar96 = (uint)local_1b0;
        }
        uVar105 = uVar96 | 7;
        local_218 = pvVar98;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)*pauVar109;
          uVar190 = *(undefined8 *)(*pauVar109 + 8);
          uVar193 = *(undefined8 *)(*pauVar109 + 0x10);
          uVar194 = *(undefined8 *)(*pauVar109 + 0x18);
          local_c0 = *(undefined1 (*) [32])*pauVar109;
          BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                    ((binary_op_ratan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
          *(undefined8 *)puVar110 = uVar191;
          *(undefined8 *)(puVar110 + 2) = uVar190;
          *(undefined8 *)(puVar110 + 4) = uVar193;
          *(undefined8 *)(puVar110 + 6) = uVar194;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
          puVar110 = puVar110 + 8;
          uVar105 = uVar96 + 0xf;
          uVar96 = uVar96 + 8;
        }
        uVar105 = uVar96 | 3;
        while ((int)uVar105 < iVar114) {
          uVar191 = *(undefined8 *)(*pauVar109 + 8);
          local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
          afVar310 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                               ((binary_op_ratan2 *)local_180,(__m128 *)local_c0,(__m128 *)local_160
                               );
          *(long *)puVar110 = afVar310._0_8_;
          *(undefined8 *)(puVar110 + 2) = uVar191;
          pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
          puVar110 = puVar110 + 4;
          uVar105 = uVar96 + 7;
          uVar96 = uVar96 + 4;
        }
        if (iVar114 - uVar96 != 0 && (int)uVar96 <= iVar114) {
          lVar103 = 0;
          do {
            fVar179 = atan2f((float)local_1e0._0_4_,*(float *)(*pauVar109 + lVar103 * 4));
            puVar110[lVar103] = (uint)fVar179;
            lVar103 = lVar103 + 1;
          } while (iVar114 - uVar96 != (int)lVar103);
        }
        pvVar98 = (void *)((long)local_218 + 1);
        auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        iVar93 = (int)local_210;
      } while (pvVar98 != local_1c0);
      iVar114 = local_220->dims;
    }
    if (0 < (int)local_1c0 && (local_16c == 2.8026e-45 && iVar114 == 3)) {
      iVar114 = iVar93 * local_1ec;
      local_188 = (void *)(CONCAT44(local_188._4_4_,iVar114) & 0xfffffffffffffff0);
      auVar1._4_4_ = local_1a0._4_4_;
      auVar1._0_4_ = (int)local_1a0;
      auVar1._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar1,1);
      local_168 = (long)iVar95 * (long)local_1e8;
      local_1c8 = (void *)0x0;
      auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      local_190 = (void *)CONCAT44(local_190._4_4_,iVar114);
      do {
        if (0 < (int)local_1a8) {
          pauVar113 = (undefined1 (*) [32])
                      (local_1f8->cstep * (long)local_1c8 * local_1f8->elemsize +
                      (long)local_1f8->data);
          local_1b0 = (void *)(local_168 * (long)local_1c8 + (long)local_228);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1c8 * local_220->elemsize +
                      (long)local_220->data);
          pvVar98 = (void *)0x0;
          do {
            fVar179 = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
            local_1e0 = ZEXT416((uint)fVar179);
            if (iVar93 == 4) {
              auVar1 = *(undefined1 (*) [16])((long)local_1b0 + (long)pvVar98 * 0x10);
              auVar184._16_16_ = auVar1;
              auVar184._0_16_ = auVar1;
              local_160[0] = (float)auVar1._0_4_;
              local_160[1] = (float)auVar1._4_4_;
              local_160[2] = (float)auVar1._8_4_;
              local_160[3] = (float)auVar1._12_4_;
LAB_0039dd5d:
              local_140._0_32_ = auVar184;
LAB_0039dd66:
              auVar129 = vinserti64x4_avx512f(ZEXT3264(auVar184),auVar184,1);
            }
            else {
              local_160[1] = fVar179;
              local_160[0] = fVar179;
              local_160[2] = fVar179;
              local_160[3] = fVar179;
              if (iVar93 == 8) {
                auVar184 = *(undefined1 (*) [32])((long)local_1b0 + (long)pvVar98 * 0x20);
                goto LAB_0039dd5d;
              }
              auVar184._4_4_ = fVar179;
              auVar184._0_4_ = fVar179;
              auVar184._8_4_ = fVar179;
              auVar184._12_4_ = fVar179;
              auVar184._16_4_ = fVar179;
              auVar184._20_4_ = fVar179;
              auVar184._24_4_ = fVar179;
              auVar184._28_4_ = fVar179;
              local_140._0_32_ = auVar184;
              if (iVar93 != 0x10) goto LAB_0039dd66;
              auVar129 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_1b0 + (long)pvVar98 * 0x40));
            }
            uVar97 = 0;
            if (0xf < iVar114) {
              uVar97 = vcmpps_avx512f(auVar129,auVar309,1);
              auVar131 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
              auVar37._8_4_ = 0xc0490fdb;
              auVar37._0_8_ = 0xc0490fdbc0490fdb;
              auVar37._12_4_ = 0xc0490fdb;
              auVar37._16_4_ = 0xc0490fdb;
              auVar37._20_4_ = 0xc0490fdb;
              auVar37._24_4_ = 0xc0490fdb;
              auVar37._28_4_ = 0xc0490fdb;
              auVar37._32_4_ = 0xc0490fdb;
              auVar37._36_4_ = 0xc0490fdb;
              auVar37._40_4_ = 0xc0490fdb;
              auVar37._44_4_ = 0xc0490fdb;
              auVar37._48_4_ = 0xc0490fdb;
              auVar37._52_4_ = 0xc0490fdb;
              auVar37._56_4_ = 0xc0490fdb;
              auVar37._60_4_ = 0xc0490fdb;
              auVar130 = vblendmps_avx512f(auVar131,auVar37);
              bVar2 = (bool)((byte)uVar97 & 1);
              auVar152._0_4_ = (uint)bVar2 * auVar130._0_4_ | (uint)!bVar2 * auVar131._0_4_;
              bVar2 = (bool)((byte)(uVar97 >> 1) & 1);
              auVar152._4_4_ = (uint)bVar2 * auVar130._4_4_ | (uint)!bVar2 * auVar131._4_4_;
              bVar2 = (bool)((byte)(uVar97 >> 2) & 1);
              auVar152._8_4_ = (uint)bVar2 * auVar130._8_4_ | (uint)!bVar2 * auVar131._8_4_;
              bVar2 = (bool)((byte)(uVar97 >> 3) & 1);
              auVar152._12_4_ = (uint)bVar2 * auVar130._12_4_ | (uint)!bVar2 * auVar131._12_4_;
              bVar2 = (bool)((byte)(uVar97 >> 4) & 1);
              auVar152._16_4_ = (uint)bVar2 * auVar130._16_4_ | (uint)!bVar2 * auVar131._16_4_;
              bVar2 = (bool)((byte)(uVar97 >> 5) & 1);
              auVar152._20_4_ = (uint)bVar2 * auVar130._20_4_ | (uint)!bVar2 * auVar131._20_4_;
              bVar2 = (bool)((byte)(uVar97 >> 6) & 1);
              auVar152._24_4_ = (uint)bVar2 * auVar130._24_4_ | (uint)!bVar2 * auVar131._24_4_;
              bVar2 = (bool)((byte)(uVar97 >> 7) & 1);
              auVar152._28_4_ = (uint)bVar2 * auVar130._28_4_ | (uint)!bVar2 * auVar131._28_4_;
              bVar2 = (bool)((byte)(uVar97 >> 8) & 1);
              auVar152._32_4_ = (uint)bVar2 * auVar130._32_4_ | (uint)!bVar2 * auVar131._32_4_;
              bVar2 = (bool)((byte)(uVar97 >> 9) & 1);
              auVar152._36_4_ = (uint)bVar2 * auVar130._36_4_ | (uint)!bVar2 * auVar131._36_4_;
              bVar2 = (bool)((byte)(uVar97 >> 10) & 1);
              auVar152._40_4_ = (uint)bVar2 * auVar130._40_4_ | (uint)!bVar2 * auVar131._40_4_;
              bVar2 = (bool)((byte)(uVar97 >> 0xb) & 1);
              auVar152._44_4_ = (uint)bVar2 * auVar130._44_4_ | (uint)!bVar2 * auVar131._44_4_;
              bVar2 = (bool)((byte)(uVar97 >> 0xc) & 1);
              auVar152._48_4_ = (uint)bVar2 * auVar130._48_4_ | (uint)!bVar2 * auVar131._48_4_;
              bVar2 = (bool)((byte)(uVar97 >> 0xd) & 1);
              auVar152._52_4_ = (uint)bVar2 * auVar130._52_4_ | (uint)!bVar2 * auVar131._52_4_;
              bVar2 = (bool)((byte)(uVar97 >> 0xe) & 1);
              auVar152._56_4_ = (uint)bVar2 * auVar130._56_4_ | (uint)!bVar2 * auVar131._56_4_;
              bVar2 = SUB81(uVar97 >> 0xf,0);
              auVar152._60_4_ = (uint)bVar2 * auVar130._60_4_ | (uint)!bVar2 * auVar131._60_4_;
              auVar131 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
              auVar131 = vpternlogd_avx512f(auVar131,auVar129,auVar116,0xf8);
              iVar93 = 0xf;
              uVar97 = vcmpps_avx512f(auVar129,auVar309,4);
              do {
                auVar130 = *pauVar109;
                auVar143 = vrcp14ps_avx512f(auVar130);
                auVar132 = vmulps_avx512f(auVar129,auVar143);
                auVar133 = vfmsub213ps_avx512f(auVar132,auVar130,auVar129);
                auVar143 = vfnmadd213ps_avx512f(auVar133,auVar143,auVar132);
                auVar132 = vandps_avx512dq(auVar143,auVar117);
                uVar108 = vcmpps_avx512f(auVar118,auVar132,1);
                auVar133 = vmaxps_avx512f(auVar132,auVar118);
                auVar38._8_4_ = 0xbf800000;
                auVar38._0_8_ = 0xbf800000bf800000;
                auVar38._12_4_ = 0xbf800000;
                auVar38._16_4_ = 0xbf800000;
                auVar38._20_4_ = 0xbf800000;
                auVar38._24_4_ = 0xbf800000;
                auVar38._28_4_ = 0xbf800000;
                auVar38._32_4_ = 0xbf800000;
                auVar38._36_4_ = 0xbf800000;
                auVar38._40_4_ = 0xbf800000;
                auVar38._44_4_ = 0xbf800000;
                auVar38._48_4_ = 0xbf800000;
                auVar38._52_4_ = 0xbf800000;
                auVar38._56_4_ = 0xbf800000;
                auVar38._60_4_ = 0xbf800000;
                auVar134 = vblendmps_avx512f(auVar132,auVar38);
                bVar2 = (bool)((byte)uVar108 & 1);
                auVar153._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
                auVar153._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
                auVar153._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
                auVar153._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_;
                bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
                auVar153._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_;
                bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
                auVar153._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_;
                bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
                auVar153._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_;
                bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
                auVar153._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_;
                bVar18 = (byte)(uVar108 >> 8);
                bVar2 = (bool)(bVar18 & 1);
                auVar153._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_;
                bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
                auVar153._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_;
                bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
                auVar153._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
                auVar153._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
                auVar153._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
                auVar153._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
                auVar153._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_;
                bVar2 = SUB81(uVar108 >> 0xf,0);
                auVar153._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_;
                auVar132 = vrcp14ps_avx512f(auVar133);
                auVar134 = vmulps_avx512f(auVar153,auVar132);
                auVar133 = vfmsub213ps_avx512f(auVar133,auVar134,auVar153);
                auVar132 = vfnmadd213ps_avx512f(auVar133,auVar132,auVar134);
                auVar133 = vmulps_avx512f(auVar132,auVar132);
                uVar112 = vcmpps_avx512f(auVar130,auVar309,4);
                auVar134 = vmulps_avx512f(auVar133,auVar133);
                auVar135 = vfmadd213ps_avx512f(auVar119,auVar134,auVar120);
                auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar121);
                auVar136 = vfmadd213ps_avx512f(auVar123,auVar134,auVar124);
                auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar125);
                auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar122);
                auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar126);
                auVar134 = vfmadd213ps_avx512f(auVar136,auVar134,auVar118);
                auVar133 = vfmadd231ps_avx512f(auVar134,auVar133,auVar135);
                uVar35 = vcmpps_avx512f(auVar130,auVar309,1);
                auVar132 = vmulps_avx512f(auVar133,auVar132);
                auVar133 = vaddps_avx512f(auVar132,auVar127);
                bVar2 = (bool)((byte)uVar108 & 1);
                auVar154._0_4_ = (uint)bVar2 * auVar133._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
                auVar154._4_4_ = (uint)bVar2 * auVar133._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
                auVar154._8_4_ = (uint)bVar2 * auVar133._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
                auVar154._12_4_ = (uint)bVar2 * auVar133._12_4_ | (uint)!bVar2 * auVar132._12_4_;
                bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
                auVar154._16_4_ = (uint)bVar2 * auVar133._16_4_ | (uint)!bVar2 * auVar132._16_4_;
                bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
                auVar154._20_4_ = (uint)bVar2 * auVar133._20_4_ | (uint)!bVar2 * auVar132._20_4_;
                bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
                auVar154._24_4_ = (uint)bVar2 * auVar133._24_4_ | (uint)!bVar2 * auVar132._24_4_;
                bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
                auVar154._28_4_ = (uint)bVar2 * auVar133._28_4_ | (uint)!bVar2 * auVar132._28_4_;
                bVar2 = (bool)(bVar18 & 1);
                auVar154._32_4_ = (uint)bVar2 * auVar133._32_4_ | (uint)!bVar2 * auVar132._32_4_;
                bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
                auVar154._36_4_ = (uint)bVar2 * auVar133._36_4_ | (uint)!bVar2 * auVar132._36_4_;
                bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
                auVar154._40_4_ = (uint)bVar2 * auVar133._40_4_ | (uint)!bVar2 * auVar132._40_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
                auVar154._44_4_ = (uint)bVar2 * auVar133._44_4_ | (uint)!bVar2 * auVar132._44_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
                auVar154._48_4_ = (uint)bVar2 * auVar133._48_4_ | (uint)!bVar2 * auVar132._48_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
                auVar154._52_4_ = (uint)bVar2 * auVar133._52_4_ | (uint)!bVar2 * auVar132._52_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
                auVar154._56_4_ = (uint)bVar2 * auVar133._56_4_ | (uint)!bVar2 * auVar132._56_4_;
                bVar2 = SUB81(uVar108 >> 0xf,0);
                auVar154._60_4_ = (uint)bVar2 * auVar133._60_4_ | (uint)!bVar2 * auVar132._60_4_;
                auVar130 = vpternlogd_avx512f(auVar130,auVar116,auVar128,0xea);
                auVar143 = vpternlogd_avx512f(auVar154,auVar143,auVar116,0xf8);
                uVar108 = vcmpps_avx512f(auVar130,auVar309,1);
                auVar130 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                auVar132 = vaddps_avx512f(auVar143,auVar152);
                bVar2 = (bool)((byte)uVar35 & 1);
                auVar155._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar143._0_4_;
                bVar2 = (bool)((byte)(uVar35 >> 1) & 1);
                auVar155._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar143._4_4_;
                bVar2 = (bool)((byte)(uVar35 >> 2) & 1);
                auVar155._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar143._8_4_;
                bVar2 = (bool)((byte)(uVar35 >> 3) & 1);
                auVar155._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar143._12_4_;
                bVar2 = (bool)((byte)(uVar35 >> 4) & 1);
                auVar155._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar143._16_4_;
                bVar2 = (bool)((byte)(uVar35 >> 5) & 1);
                auVar155._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar143._20_4_;
                bVar2 = (bool)((byte)(uVar35 >> 6) & 1);
                auVar155._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar143._24_4_;
                bVar2 = (bool)((byte)(uVar35 >> 7) & 1);
                auVar155._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar143._28_4_;
                bVar2 = (bool)((byte)(uVar35 >> 8) & 1);
                auVar155._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar143._32_4_;
                bVar2 = (bool)((byte)(uVar35 >> 9) & 1);
                auVar155._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar143._36_4_;
                bVar2 = (bool)((byte)(uVar35 >> 10) & 1);
                auVar155._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar143._40_4_;
                bVar2 = (bool)((byte)(uVar35 >> 0xb) & 1);
                auVar155._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar143._44_4_;
                bVar2 = (bool)((byte)(uVar35 >> 0xc) & 1);
                auVar155._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar143._48_4_;
                bVar2 = (bool)((byte)(uVar35 >> 0xd) & 1);
                auVar155._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar143._52_4_;
                bVar2 = (bool)((byte)(uVar35 >> 0xe) & 1);
                auVar155._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar143._56_4_;
                bVar2 = SUB81(uVar35 >> 0xf,0);
                auVar155._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar143._60_4_;
                auVar143 = vblendmps_avx512f(auVar131,auVar155);
                bVar2 = (bool)((byte)uVar112 & 1);
                bVar4 = (bool)((byte)(uVar112 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar112 >> 2) & 1);
                bVar8 = (bool)((byte)(uVar112 >> 3) & 1);
                bVar10 = (bool)((byte)(uVar112 >> 4) & 1);
                bVar12 = (bool)((byte)(uVar112 >> 5) & 1);
                bVar14 = (bool)((byte)(uVar112 >> 6) & 1);
                bVar16 = (bool)((byte)(uVar112 >> 7) & 1);
                bVar19 = (bool)((byte)(uVar112 >> 8) & 1);
                bVar21 = (bool)((byte)(uVar112 >> 9) & 1);
                bVar23 = (bool)((byte)(uVar112 >> 10) & 1);
                bVar25 = (bool)((byte)(uVar112 >> 0xb) & 1);
                bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
                bVar29 = (bool)((byte)(uVar112 >> 0xd) & 1);
                bVar31 = (bool)((byte)(uVar112 >> 0xe) & 1);
                bVar33 = SUB81(uVar112 >> 0xf,0);
                bVar3 = (bool)((byte)uVar97 & 1);
                bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                bVar11 = (bool)((byte)(uVar97 >> 4) & 1);
                bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
                bVar15 = (bool)((byte)(uVar97 >> 6) & 1);
                bVar17 = (bool)((byte)(uVar97 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar97 >> 8) & 1);
                bVar22 = (bool)((byte)(uVar97 >> 9) & 1);
                bVar24 = (bool)((byte)(uVar97 >> 10) & 1);
                bVar26 = (bool)((byte)(uVar97 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar97 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar97 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar97 >> 0xe) & 1);
                bVar34 = SUB81(uVar97 >> 0xf,0);
                *(uint *)*pauVar113 =
                     (uint)bVar3 * ((uint)bVar2 * auVar143._0_4_ | !bVar2 * auVar155._0_4_) |
                     (uint)!bVar3 * (uint)((byte)uVar108 & 1) * auVar130._0_4_;
                *(uint *)((long)*pauVar113 + 4) =
                     (uint)bVar5 * ((uint)bVar4 * auVar143._4_4_ | !bVar4 * auVar155._4_4_) |
                     (uint)!bVar5 * (uint)((byte)(uVar108 >> 1) & 1) * auVar130._4_4_;
                *(uint *)((long)*pauVar113 + 8) =
                     (uint)bVar7 * ((uint)bVar6 * auVar143._8_4_ | !bVar6 * auVar155._8_4_) |
                     (uint)!bVar7 * (uint)((byte)(uVar108 >> 2) & 1) * auVar130._8_4_;
                *(uint *)((long)*pauVar113 + 0xc) =
                     (uint)bVar9 * ((uint)bVar8 * auVar143._12_4_ | !bVar8 * auVar155._12_4_) |
                     (uint)!bVar9 * (uint)((byte)(uVar108 >> 3) & 1) * auVar130._12_4_;
                *(uint *)((long)*pauVar113 + 0x10) =
                     (uint)bVar11 * ((uint)bVar10 * auVar143._16_4_ | !bVar10 * auVar155._16_4_) |
                     (uint)!bVar11 * (uint)((byte)(uVar108 >> 4) & 1) * auVar130._16_4_;
                *(uint *)((long)*pauVar113 + 0x14) =
                     (uint)bVar13 * ((uint)bVar12 * auVar143._20_4_ | !bVar12 * auVar155._20_4_) |
                     (uint)!bVar13 * (uint)((byte)(uVar108 >> 5) & 1) * auVar130._20_4_;
                *(uint *)((long)*pauVar113 + 0x18) =
                     (uint)bVar15 * ((uint)bVar14 * auVar143._24_4_ | !bVar14 * auVar155._24_4_) |
                     (uint)!bVar15 * (uint)((byte)(uVar108 >> 6) & 1) * auVar130._24_4_;
                *(uint *)((long)*pauVar113 + 0x1c) =
                     (uint)bVar17 * ((uint)bVar16 * auVar143._28_4_ | !bVar16 * auVar155._28_4_) |
                     (uint)!bVar17 * (uint)((byte)(uVar108 >> 7) & 1) * auVar130._28_4_;
                *(uint *)pauVar113[1] =
                     (uint)bVar20 * ((uint)bVar19 * auVar143._32_4_ | !bVar19 * auVar155._32_4_) |
                     (uint)!bVar20 * (uint)((byte)(uVar108 >> 8) & 1) * auVar130._32_4_;
                *(uint *)(pauVar113[1] + 4) =
                     (uint)bVar22 * ((uint)bVar21 * auVar143._36_4_ | !bVar21 * auVar155._36_4_) |
                     (uint)!bVar22 * (uint)((byte)(uVar108 >> 9) & 1) * auVar130._36_4_;
                *(uint *)(pauVar113[1] + 8) =
                     (uint)bVar24 * ((uint)bVar23 * auVar143._40_4_ | !bVar23 * auVar155._40_4_) |
                     (uint)!bVar24 * (uint)((byte)(uVar108 >> 10) & 1) * auVar130._40_4_;
                *(uint *)(pauVar113[1] + 0xc) =
                     (uint)bVar26 * ((uint)bVar25 * auVar143._44_4_ | !bVar25 * auVar155._44_4_) |
                     (uint)!bVar26 * (uint)((byte)(uVar108 >> 0xb) & 1) * auVar130._44_4_;
                *(uint *)(pauVar113[1] + 0x10) =
                     (uint)bVar28 * ((uint)bVar27 * auVar143._48_4_ | !bVar27 * auVar155._48_4_) |
                     (uint)!bVar28 * (uint)((byte)(uVar108 >> 0xc) & 1) * auVar130._48_4_;
                *(uint *)(pauVar113[1] + 0x14) =
                     (uint)bVar30 * ((uint)bVar29 * auVar143._52_4_ | !bVar29 * auVar155._52_4_) |
                     (uint)!bVar30 * (uint)((byte)(uVar108 >> 0xd) & 1) * auVar130._52_4_;
                *(uint *)(pauVar113[1] + 0x18) =
                     (uint)bVar32 * ((uint)bVar31 * auVar143._56_4_ | !bVar31 * auVar155._56_4_) |
                     (uint)!bVar32 * (uint)((byte)(uVar108 >> 0xe) & 1) * auVar130._56_4_;
                *(uint *)(pauVar113[1] + 0x1c) =
                     (uint)bVar34 * ((uint)bVar33 * auVar143._60_4_ | !bVar33 * auVar155._60_4_) |
                     (uint)!bVar34 * (uint)(byte)(uVar108 >> 0xf) * auVar130._60_4_;
                pauVar109 = pauVar109 + 1;
                pauVar113 = pauVar113 + 2;
                iVar93 = iVar93 + 0x10;
              } while (iVar93 < iVar114);
              uVar97 = (ulong)local_188 & 0xffffffff;
            }
            uVar96 = (uint)uVar97 | 7;
            local_218 = pvVar98;
            while (uVar105 = (uint)uVar97, (int)uVar96 < iVar114) {
              auVar180 = *(undefined1 (*) [32])*pauVar109;
              local_c0._0_4_ = auVar180._0_4_;
              local_c0._4_4_ = auVar180._4_4_;
              local_c0._8_4_ = auVar180._8_4_;
              local_c0._12_4_ = auVar180._12_4_;
              local_c0._16_4_ = auVar180._16_4_;
              local_c0._20_4_ = auVar180._20_4_;
              local_c0._24_4_ = auVar180._24_4_;
              local_c0._28_4_ = auVar180._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                        ((binary_op_ratan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
              *pauVar113 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar113 = pauVar113 + 1;
              uVar97 = (ulong)(uVar105 + 8);
              uVar96 = uVar105 + 0xf;
            }
            uVar96 = uVar105 | 3;
            while ((int)uVar96 < iVar114) {
              local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
              auVar192 = ZEXT856(*(ulong *)(*pauVar109 + 8));
              afVar310 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                   ((binary_op_ratan2 *)local_180,(__m128 *)local_c0,
                                    (__m128 *)local_160);
              auVar116._0_8_ = afVar310._0_8_;
              auVar116._8_56_ = auVar192;
              *(undefined1 (*) [16])*pauVar113 = auVar116._0_16_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar113 = (undefined1 (*) [32])((long)*pauVar113 + 0x10);
              iVar93 = (int)uVar97;
              uVar105 = iVar93 + 4;
              uVar97 = (ulong)uVar105;
              uVar96 = iVar93 + 7;
            }
            if ((int)uVar105 < iVar114) {
              lVar115 = 0;
              lVar103 = 0;
              do {
                fVar179 = atan2f((float)local_1e0._0_4_,*(float *)(*pauVar109 + lVar115 * 4));
                *(float *)((long)*pauVar113 + lVar115 * 4) = fVar179;
                lVar103 = lVar103 + -4;
                lVar115 = lVar115 + 1;
              } while (iVar114 - uVar105 != (int)lVar115);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar103);
              pauVar113 = (undefined1 (*) [32])((long)pauVar113 - lVar103);
              iVar114 = (int)local_190;
            }
            pvVar98 = (void *)((long)local_218 + 1);
            auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            iVar93 = (int)local_210;
          } while (pvVar98 != local_1a8);
        }
        local_1c8 = (void *)((long)local_1c8 + 1);
      } while (local_1c8 != local_1c0);
      iVar114 = local_220->dims;
    }
    if ((iVar114 == 4) && (local_16c == 2.8026e-45)) {
      local_1a0 = (void *)CONCAT44(local_1a0._4_4_,(int)local_1a0);
      if ((int)local_1c0 < 1) break;
      iVar114 = iVar93 * local_1ec * (int)local_1a8;
      local_188 = (void *)(CONCAT44(local_188._4_4_,iVar114) & 0xfffffffffffffff0);
      auVar36._4_4_ = local_1a0._4_4_;
      auVar36._0_4_ = (int)local_1a0;
      auVar36._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar36,1);
      local_168 = (long)iVar95 * (long)local_1e8;
      local_1c8 = (void *)0x0;
      auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      local_190 = (void *)CONCAT44(local_190._4_4_,iVar114);
      do {
        if (0 < (int)local_1b8) {
          pauVar113 = (undefined1 (*) [32])
                      (local_1f8->cstep * (long)local_1c8 * local_1f8->elemsize +
                      (long)local_1f8->data);
          local_1b0 = (void *)(local_168 * (long)local_1c8 + (long)local_228);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1c8 * local_220->elemsize +
                      (long)local_220->data);
          pvVar98 = (void *)0x0;
          do {
            fVar179 = *(float *)((long)local_1b0 + (long)pvVar98 * 4);
            local_1e0 = ZEXT416((uint)fVar179);
            if (iVar93 == 4) {
              auVar1 = *(undefined1 (*) [16])((long)local_1b0 + (long)pvVar98 * 0x10);
              auVar185._16_16_ = auVar1;
              auVar185._0_16_ = auVar1;
              local_160[0] = (float)auVar1._0_4_;
              local_160[1] = (float)auVar1._4_4_;
              local_160[2] = (float)auVar1._8_4_;
              local_160[3] = (float)auVar1._12_4_;
LAB_0039e25a:
              local_140._0_32_ = auVar185;
LAB_0039e263:
              auVar129 = vinserti64x4_avx512f(ZEXT3264(auVar185),auVar185,1);
            }
            else {
              local_160[1] = fVar179;
              local_160[0] = fVar179;
              local_160[2] = fVar179;
              local_160[3] = fVar179;
              if (iVar93 == 8) {
                auVar185 = *(undefined1 (*) [32])((long)local_1b0 + (long)pvVar98 * 0x20);
                goto LAB_0039e25a;
              }
              auVar185._4_4_ = fVar179;
              auVar185._0_4_ = fVar179;
              auVar185._8_4_ = fVar179;
              auVar185._12_4_ = fVar179;
              auVar185._16_4_ = fVar179;
              auVar185._20_4_ = fVar179;
              auVar185._24_4_ = fVar179;
              auVar185._28_4_ = fVar179;
              local_140._0_32_ = auVar185;
              if (iVar93 != 0x10) goto LAB_0039e263;
              auVar129 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                            ((long)local_1b0 + (long)pvVar98 * 0x40));
            }
            uVar97 = 0;
            if (0xf < iVar114) {
              uVar97 = vcmpps_avx512f(auVar129,auVar309,1);
              auVar131 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
              auVar39._8_4_ = 0xc0490fdb;
              auVar39._0_8_ = 0xc0490fdbc0490fdb;
              auVar39._12_4_ = 0xc0490fdb;
              auVar39._16_4_ = 0xc0490fdb;
              auVar39._20_4_ = 0xc0490fdb;
              auVar39._24_4_ = 0xc0490fdb;
              auVar39._28_4_ = 0xc0490fdb;
              auVar39._32_4_ = 0xc0490fdb;
              auVar39._36_4_ = 0xc0490fdb;
              auVar39._40_4_ = 0xc0490fdb;
              auVar39._44_4_ = 0xc0490fdb;
              auVar39._48_4_ = 0xc0490fdb;
              auVar39._52_4_ = 0xc0490fdb;
              auVar39._56_4_ = 0xc0490fdb;
              auVar39._60_4_ = 0xc0490fdb;
              auVar130 = vblendmps_avx512f(auVar131,auVar39);
              bVar2 = (bool)((byte)uVar97 & 1);
              auVar156._0_4_ = (uint)bVar2 * auVar130._0_4_ | (uint)!bVar2 * auVar131._0_4_;
              bVar2 = (bool)((byte)(uVar97 >> 1) & 1);
              auVar156._4_4_ = (uint)bVar2 * auVar130._4_4_ | (uint)!bVar2 * auVar131._4_4_;
              bVar2 = (bool)((byte)(uVar97 >> 2) & 1);
              auVar156._8_4_ = (uint)bVar2 * auVar130._8_4_ | (uint)!bVar2 * auVar131._8_4_;
              bVar2 = (bool)((byte)(uVar97 >> 3) & 1);
              auVar156._12_4_ = (uint)bVar2 * auVar130._12_4_ | (uint)!bVar2 * auVar131._12_4_;
              bVar2 = (bool)((byte)(uVar97 >> 4) & 1);
              auVar156._16_4_ = (uint)bVar2 * auVar130._16_4_ | (uint)!bVar2 * auVar131._16_4_;
              bVar2 = (bool)((byte)(uVar97 >> 5) & 1);
              auVar156._20_4_ = (uint)bVar2 * auVar130._20_4_ | (uint)!bVar2 * auVar131._20_4_;
              bVar2 = (bool)((byte)(uVar97 >> 6) & 1);
              auVar156._24_4_ = (uint)bVar2 * auVar130._24_4_ | (uint)!bVar2 * auVar131._24_4_;
              bVar2 = (bool)((byte)(uVar97 >> 7) & 1);
              auVar156._28_4_ = (uint)bVar2 * auVar130._28_4_ | (uint)!bVar2 * auVar131._28_4_;
              bVar2 = (bool)((byte)(uVar97 >> 8) & 1);
              auVar156._32_4_ = (uint)bVar2 * auVar130._32_4_ | (uint)!bVar2 * auVar131._32_4_;
              bVar2 = (bool)((byte)(uVar97 >> 9) & 1);
              auVar156._36_4_ = (uint)bVar2 * auVar130._36_4_ | (uint)!bVar2 * auVar131._36_4_;
              bVar2 = (bool)((byte)(uVar97 >> 10) & 1);
              auVar156._40_4_ = (uint)bVar2 * auVar130._40_4_ | (uint)!bVar2 * auVar131._40_4_;
              bVar2 = (bool)((byte)(uVar97 >> 0xb) & 1);
              auVar156._44_4_ = (uint)bVar2 * auVar130._44_4_ | (uint)!bVar2 * auVar131._44_4_;
              bVar2 = (bool)((byte)(uVar97 >> 0xc) & 1);
              auVar156._48_4_ = (uint)bVar2 * auVar130._48_4_ | (uint)!bVar2 * auVar131._48_4_;
              bVar2 = (bool)((byte)(uVar97 >> 0xd) & 1);
              auVar156._52_4_ = (uint)bVar2 * auVar130._52_4_ | (uint)!bVar2 * auVar131._52_4_;
              bVar2 = (bool)((byte)(uVar97 >> 0xe) & 1);
              auVar156._56_4_ = (uint)bVar2 * auVar130._56_4_ | (uint)!bVar2 * auVar131._56_4_;
              bVar2 = SUB81(uVar97 >> 0xf,0);
              auVar156._60_4_ = (uint)bVar2 * auVar130._60_4_ | (uint)!bVar2 * auVar131._60_4_;
              auVar131 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
              auVar131 = vpternlogd_avx512f(auVar131,auVar129,auVar116,0xf8);
              iVar93 = 0xf;
              uVar97 = vcmpps_avx512f(auVar129,auVar309,4);
              do {
                auVar130 = *pauVar109;
                auVar143 = vrcp14ps_avx512f(auVar130);
                auVar132 = vmulps_avx512f(auVar129,auVar143);
                auVar133 = vfmsub213ps_avx512f(auVar132,auVar130,auVar129);
                auVar143 = vfnmadd213ps_avx512f(auVar133,auVar143,auVar132);
                auVar132 = vandps_avx512dq(auVar143,auVar117);
                uVar108 = vcmpps_avx512f(auVar118,auVar132,1);
                auVar133 = vmaxps_avx512f(auVar132,auVar118);
                auVar40._8_4_ = 0xbf800000;
                auVar40._0_8_ = 0xbf800000bf800000;
                auVar40._12_4_ = 0xbf800000;
                auVar40._16_4_ = 0xbf800000;
                auVar40._20_4_ = 0xbf800000;
                auVar40._24_4_ = 0xbf800000;
                auVar40._28_4_ = 0xbf800000;
                auVar40._32_4_ = 0xbf800000;
                auVar40._36_4_ = 0xbf800000;
                auVar40._40_4_ = 0xbf800000;
                auVar40._44_4_ = 0xbf800000;
                auVar40._48_4_ = 0xbf800000;
                auVar40._52_4_ = 0xbf800000;
                auVar40._56_4_ = 0xbf800000;
                auVar40._60_4_ = 0xbf800000;
                auVar134 = vblendmps_avx512f(auVar132,auVar40);
                bVar2 = (bool)((byte)uVar108 & 1);
                auVar157._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
                auVar157._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
                auVar157._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
                auVar157._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_;
                bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
                auVar157._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_;
                bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
                auVar157._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_;
                bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
                auVar157._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_;
                bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
                auVar157._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_;
                bVar18 = (byte)(uVar108 >> 8);
                bVar2 = (bool)(bVar18 & 1);
                auVar157._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_;
                bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
                auVar157._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_;
                bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
                auVar157._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
                auVar157._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
                auVar157._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
                auVar157._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
                auVar157._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_;
                bVar2 = SUB81(uVar108 >> 0xf,0);
                auVar157._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_;
                auVar132 = vrcp14ps_avx512f(auVar133);
                auVar134 = vmulps_avx512f(auVar157,auVar132);
                auVar133 = vfmsub213ps_avx512f(auVar133,auVar134,auVar157);
                auVar132 = vfnmadd213ps_avx512f(auVar133,auVar132,auVar134);
                auVar133 = vmulps_avx512f(auVar132,auVar132);
                uVar112 = vcmpps_avx512f(auVar130,auVar309,4);
                auVar134 = vmulps_avx512f(auVar133,auVar133);
                auVar135 = vfmadd213ps_avx512f(auVar119,auVar134,auVar120);
                auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar121);
                auVar136 = vfmadd213ps_avx512f(auVar123,auVar134,auVar124);
                auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar125);
                auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar122);
                auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar126);
                auVar134 = vfmadd213ps_avx512f(auVar136,auVar134,auVar118);
                auVar133 = vfmadd231ps_avx512f(auVar134,auVar133,auVar135);
                uVar35 = vcmpps_avx512f(auVar130,auVar309,1);
                auVar132 = vmulps_avx512f(auVar133,auVar132);
                auVar133 = vaddps_avx512f(auVar132,auVar127);
                bVar2 = (bool)((byte)uVar108 & 1);
                auVar158._0_4_ = (uint)bVar2 * auVar133._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
                auVar158._4_4_ = (uint)bVar2 * auVar133._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
                auVar158._8_4_ = (uint)bVar2 * auVar133._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
                auVar158._12_4_ = (uint)bVar2 * auVar133._12_4_ | (uint)!bVar2 * auVar132._12_4_;
                bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
                auVar158._16_4_ = (uint)bVar2 * auVar133._16_4_ | (uint)!bVar2 * auVar132._16_4_;
                bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
                auVar158._20_4_ = (uint)bVar2 * auVar133._20_4_ | (uint)!bVar2 * auVar132._20_4_;
                bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
                auVar158._24_4_ = (uint)bVar2 * auVar133._24_4_ | (uint)!bVar2 * auVar132._24_4_;
                bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
                auVar158._28_4_ = (uint)bVar2 * auVar133._28_4_ | (uint)!bVar2 * auVar132._28_4_;
                bVar2 = (bool)(bVar18 & 1);
                auVar158._32_4_ = (uint)bVar2 * auVar133._32_4_ | (uint)!bVar2 * auVar132._32_4_;
                bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
                auVar158._36_4_ = (uint)bVar2 * auVar133._36_4_ | (uint)!bVar2 * auVar132._36_4_;
                bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
                auVar158._40_4_ = (uint)bVar2 * auVar133._40_4_ | (uint)!bVar2 * auVar132._40_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
                auVar158._44_4_ = (uint)bVar2 * auVar133._44_4_ | (uint)!bVar2 * auVar132._44_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
                auVar158._48_4_ = (uint)bVar2 * auVar133._48_4_ | (uint)!bVar2 * auVar132._48_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
                auVar158._52_4_ = (uint)bVar2 * auVar133._52_4_ | (uint)!bVar2 * auVar132._52_4_;
                bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
                auVar158._56_4_ = (uint)bVar2 * auVar133._56_4_ | (uint)!bVar2 * auVar132._56_4_;
                bVar2 = SUB81(uVar108 >> 0xf,0);
                auVar158._60_4_ = (uint)bVar2 * auVar133._60_4_ | (uint)!bVar2 * auVar132._60_4_;
                auVar130 = vpternlogd_avx512f(auVar130,auVar116,auVar128,0xea);
                auVar143 = vpternlogd_avx512f(auVar158,auVar143,auVar116,0xf8);
                uVar108 = vcmpps_avx512f(auVar130,auVar309,1);
                auVar130 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                auVar132 = vaddps_avx512f(auVar143,auVar156);
                bVar2 = (bool)((byte)uVar35 & 1);
                auVar159._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar143._0_4_;
                bVar2 = (bool)((byte)(uVar35 >> 1) & 1);
                auVar159._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar143._4_4_;
                bVar2 = (bool)((byte)(uVar35 >> 2) & 1);
                auVar159._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar143._8_4_;
                bVar2 = (bool)((byte)(uVar35 >> 3) & 1);
                auVar159._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar143._12_4_;
                bVar2 = (bool)((byte)(uVar35 >> 4) & 1);
                auVar159._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar143._16_4_;
                bVar2 = (bool)((byte)(uVar35 >> 5) & 1);
                auVar159._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar143._20_4_;
                bVar2 = (bool)((byte)(uVar35 >> 6) & 1);
                auVar159._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar143._24_4_;
                bVar2 = (bool)((byte)(uVar35 >> 7) & 1);
                auVar159._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar143._28_4_;
                bVar2 = (bool)((byte)(uVar35 >> 8) & 1);
                auVar159._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar143._32_4_;
                bVar2 = (bool)((byte)(uVar35 >> 9) & 1);
                auVar159._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar143._36_4_;
                bVar2 = (bool)((byte)(uVar35 >> 10) & 1);
                auVar159._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar143._40_4_;
                bVar2 = (bool)((byte)(uVar35 >> 0xb) & 1);
                auVar159._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar143._44_4_;
                bVar2 = (bool)((byte)(uVar35 >> 0xc) & 1);
                auVar159._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar143._48_4_;
                bVar2 = (bool)((byte)(uVar35 >> 0xd) & 1);
                auVar159._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar143._52_4_;
                bVar2 = (bool)((byte)(uVar35 >> 0xe) & 1);
                auVar159._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar143._56_4_;
                bVar2 = SUB81(uVar35 >> 0xf,0);
                auVar159._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar143._60_4_;
                auVar143 = vblendmps_avx512f(auVar131,auVar159);
                bVar2 = (bool)((byte)uVar112 & 1);
                bVar4 = (bool)((byte)(uVar112 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar112 >> 2) & 1);
                bVar8 = (bool)((byte)(uVar112 >> 3) & 1);
                bVar10 = (bool)((byte)(uVar112 >> 4) & 1);
                bVar12 = (bool)((byte)(uVar112 >> 5) & 1);
                bVar14 = (bool)((byte)(uVar112 >> 6) & 1);
                bVar16 = (bool)((byte)(uVar112 >> 7) & 1);
                bVar19 = (bool)((byte)(uVar112 >> 8) & 1);
                bVar21 = (bool)((byte)(uVar112 >> 9) & 1);
                bVar23 = (bool)((byte)(uVar112 >> 10) & 1);
                bVar25 = (bool)((byte)(uVar112 >> 0xb) & 1);
                bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
                bVar29 = (bool)((byte)(uVar112 >> 0xd) & 1);
                bVar31 = (bool)((byte)(uVar112 >> 0xe) & 1);
                bVar33 = SUB81(uVar112 >> 0xf,0);
                bVar3 = (bool)((byte)uVar97 & 1);
                bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                bVar11 = (bool)((byte)(uVar97 >> 4) & 1);
                bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
                bVar15 = (bool)((byte)(uVar97 >> 6) & 1);
                bVar17 = (bool)((byte)(uVar97 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar97 >> 8) & 1);
                bVar22 = (bool)((byte)(uVar97 >> 9) & 1);
                bVar24 = (bool)((byte)(uVar97 >> 10) & 1);
                bVar26 = (bool)((byte)(uVar97 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar97 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar97 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar97 >> 0xe) & 1);
                bVar34 = SUB81(uVar97 >> 0xf,0);
                *(uint *)*pauVar113 =
                     (uint)bVar3 * ((uint)bVar2 * auVar143._0_4_ | !bVar2 * auVar159._0_4_) |
                     (uint)!bVar3 * (uint)((byte)uVar108 & 1) * auVar130._0_4_;
                *(uint *)((long)*pauVar113 + 4) =
                     (uint)bVar5 * ((uint)bVar4 * auVar143._4_4_ | !bVar4 * auVar159._4_4_) |
                     (uint)!bVar5 * (uint)((byte)(uVar108 >> 1) & 1) * auVar130._4_4_;
                *(uint *)((long)*pauVar113 + 8) =
                     (uint)bVar7 * ((uint)bVar6 * auVar143._8_4_ | !bVar6 * auVar159._8_4_) |
                     (uint)!bVar7 * (uint)((byte)(uVar108 >> 2) & 1) * auVar130._8_4_;
                *(uint *)((long)*pauVar113 + 0xc) =
                     (uint)bVar9 * ((uint)bVar8 * auVar143._12_4_ | !bVar8 * auVar159._12_4_) |
                     (uint)!bVar9 * (uint)((byte)(uVar108 >> 3) & 1) * auVar130._12_4_;
                *(uint *)((long)*pauVar113 + 0x10) =
                     (uint)bVar11 * ((uint)bVar10 * auVar143._16_4_ | !bVar10 * auVar159._16_4_) |
                     (uint)!bVar11 * (uint)((byte)(uVar108 >> 4) & 1) * auVar130._16_4_;
                *(uint *)((long)*pauVar113 + 0x14) =
                     (uint)bVar13 * ((uint)bVar12 * auVar143._20_4_ | !bVar12 * auVar159._20_4_) |
                     (uint)!bVar13 * (uint)((byte)(uVar108 >> 5) & 1) * auVar130._20_4_;
                *(uint *)((long)*pauVar113 + 0x18) =
                     (uint)bVar15 * ((uint)bVar14 * auVar143._24_4_ | !bVar14 * auVar159._24_4_) |
                     (uint)!bVar15 * (uint)((byte)(uVar108 >> 6) & 1) * auVar130._24_4_;
                *(uint *)((long)*pauVar113 + 0x1c) =
                     (uint)bVar17 * ((uint)bVar16 * auVar143._28_4_ | !bVar16 * auVar159._28_4_) |
                     (uint)!bVar17 * (uint)((byte)(uVar108 >> 7) & 1) * auVar130._28_4_;
                *(uint *)pauVar113[1] =
                     (uint)bVar20 * ((uint)bVar19 * auVar143._32_4_ | !bVar19 * auVar159._32_4_) |
                     (uint)!bVar20 * (uint)((byte)(uVar108 >> 8) & 1) * auVar130._32_4_;
                *(uint *)(pauVar113[1] + 4) =
                     (uint)bVar22 * ((uint)bVar21 * auVar143._36_4_ | !bVar21 * auVar159._36_4_) |
                     (uint)!bVar22 * (uint)((byte)(uVar108 >> 9) & 1) * auVar130._36_4_;
                *(uint *)(pauVar113[1] + 8) =
                     (uint)bVar24 * ((uint)bVar23 * auVar143._40_4_ | !bVar23 * auVar159._40_4_) |
                     (uint)!bVar24 * (uint)((byte)(uVar108 >> 10) & 1) * auVar130._40_4_;
                *(uint *)(pauVar113[1] + 0xc) =
                     (uint)bVar26 * ((uint)bVar25 * auVar143._44_4_ | !bVar25 * auVar159._44_4_) |
                     (uint)!bVar26 * (uint)((byte)(uVar108 >> 0xb) & 1) * auVar130._44_4_;
                *(uint *)(pauVar113[1] + 0x10) =
                     (uint)bVar28 * ((uint)bVar27 * auVar143._48_4_ | !bVar27 * auVar159._48_4_) |
                     (uint)!bVar28 * (uint)((byte)(uVar108 >> 0xc) & 1) * auVar130._48_4_;
                *(uint *)(pauVar113[1] + 0x14) =
                     (uint)bVar30 * ((uint)bVar29 * auVar143._52_4_ | !bVar29 * auVar159._52_4_) |
                     (uint)!bVar30 * (uint)((byte)(uVar108 >> 0xd) & 1) * auVar130._52_4_;
                *(uint *)(pauVar113[1] + 0x18) =
                     (uint)bVar32 * ((uint)bVar31 * auVar143._56_4_ | !bVar31 * auVar159._56_4_) |
                     (uint)!bVar32 * (uint)((byte)(uVar108 >> 0xe) & 1) * auVar130._56_4_;
                *(uint *)(pauVar113[1] + 0x1c) =
                     (uint)bVar34 * ((uint)bVar33 * auVar143._60_4_ | !bVar33 * auVar159._60_4_) |
                     (uint)!bVar34 * (uint)(byte)(uVar108 >> 0xf) * auVar130._60_4_;
                pauVar109 = pauVar109 + 1;
                pauVar113 = pauVar113 + 2;
                iVar93 = iVar93 + 0x10;
              } while (iVar93 < iVar114);
              uVar97 = (ulong)local_188 & 0xffffffff;
            }
            uVar96 = (uint)uVar97 | 7;
            local_218 = pvVar98;
            while (uVar105 = (uint)uVar97, (int)uVar96 < iVar114) {
              auVar180 = *(undefined1 (*) [32])*pauVar109;
              local_c0._0_4_ = auVar180._0_4_;
              local_c0._4_4_ = auVar180._4_4_;
              local_c0._8_4_ = auVar180._8_4_;
              local_c0._12_4_ = auVar180._12_4_;
              local_c0._16_4_ = auVar180._16_4_;
              local_c0._20_4_ = auVar180._20_4_;
              local_c0._24_4_ = auVar180._24_4_;
              local_c0._28_4_ = auVar180._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                        ((binary_op_ratan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
              *pauVar113 = auVar180;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
              pauVar113 = pauVar113 + 1;
              uVar97 = (ulong)(uVar105 + 8);
              uVar96 = uVar105 + 0xf;
            }
            uVar96 = uVar105 | 3;
            while ((int)uVar96 < iVar114) {
              local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
              auVar192 = ZEXT856(*(ulong *)(*pauVar109 + 8));
              afVar310 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                   ((binary_op_ratan2 *)local_180,(__m128 *)local_c0,
                                    (__m128 *)local_160);
              auVar117._0_8_ = afVar310._0_8_;
              auVar117._8_56_ = auVar192;
              *(undefined1 (*) [16])*pauVar113 = auVar117._0_16_;
              pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
              pauVar113 = (undefined1 (*) [32])((long)*pauVar113 + 0x10);
              iVar93 = (int)uVar97;
              uVar105 = iVar93 + 4;
              uVar97 = (ulong)uVar105;
              uVar96 = iVar93 + 7;
            }
            if ((int)uVar105 < iVar114) {
              lVar103 = 0;
              lVar115 = 0;
              do {
                fVar179 = atan2f((float)local_1e0._0_4_,*(float *)(*pauVar109 + lVar115 * 4));
                *(float *)((long)*pauVar113 + lVar115 * 4) = fVar179;
                lVar115 = lVar115 + 1;
                lVar103 = lVar103 + -4;
              } while (iVar114 - uVar105 != (int)lVar115);
              pauVar113 = (undefined1 (*) [32])((long)pauVar113 - lVar103);
              pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar103);
              iVar114 = (int)local_190;
            }
            pvVar98 = (void *)((long)local_218 + 1);
            auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            iVar93 = (int)local_210;
          } while (pvVar98 != local_1b8);
        }
        local_1c8 = (void *)((long)local_1c8 + 1);
      } while (local_1c8 != local_1c0);
      iVar114 = local_220->dims;
    }
    if ((local_16c == 4.2039e-45 && iVar114 == 4) && 0 < (int)local_1c0) {
      iVar114 = local_1ec * iVar93;
      local_188 = (void *)(CONCAT44(local_188._4_4_,iVar114) & 0xfffffffffffffff0);
      local_1d0 = local_1d0 * (long)local_1e8;
      auVar89._4_4_ = local_1a0._4_4_;
      auVar89._0_4_ = (int)local_1a0;
      auVar89._8_8_ = uStack_198;
      iVar95 = vextractps_avx(auVar89,1);
      local_1c8 = (void *)((long)iVar95 * (long)local_1e8);
      local_1e8 = (void *)0x0;
      auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      pvVar98 = local_228;
      local_1ec = iVar114;
      do {
        if (0 < (int)local_1b8) {
          puVar110 = (uint *)(local_1f8->cstep * (long)local_1e8 * local_1f8->elemsize +
                             (long)local_1f8->data);
          pauVar109 = (undefined1 (*) [64])
                      (local_220->cstep * (long)local_1e8 * local_220->elemsize +
                      (long)local_220->data);
          local_1a0 = (void *)(local_1d0 * (long)local_1e8 + (long)pvVar98);
          local_190 = (void *)0x0;
          do {
            if (0 < (int)local_1a8) {
              local_1b0 = (void *)((long)local_1c8 * (long)local_190 + (long)local_1a0);
              pvVar102 = (void *)0x0;
              do {
                fVar179 = *(float *)((long)local_1b0 + (long)pvVar102 * 4);
                local_1e0 = ZEXT416((uint)fVar179);
                if (iVar93 == 4) {
                  auVar1 = *(undefined1 (*) [16])((long)local_1b0 + (long)pvVar102 * 0x10);
                  auVar186._16_16_ = auVar1;
                  auVar186._0_16_ = auVar1;
                  local_160[0] = (float)auVar1._0_4_;
                  local_160[1] = (float)auVar1._4_4_;
                  local_160[2] = (float)auVar1._8_4_;
                  local_160[3] = (float)auVar1._12_4_;
LAB_0039e783:
                  local_140._0_32_ = auVar186;
LAB_0039e78c:
                  auVar129 = vinserti64x4_avx512f(ZEXT3264(auVar186),auVar186,1);
                }
                else {
                  local_160[1] = fVar179;
                  local_160[0] = fVar179;
                  local_160[2] = fVar179;
                  local_160[3] = fVar179;
                  if (iVar93 == 8) {
                    auVar186 = *(undefined1 (*) [32])((long)local_1b0 + (long)pvVar102 * 0x20);
                    goto LAB_0039e783;
                  }
                  auVar186._4_4_ = fVar179;
                  auVar186._0_4_ = fVar179;
                  auVar186._8_4_ = fVar179;
                  auVar186._12_4_ = fVar179;
                  auVar186._16_4_ = fVar179;
                  auVar186._20_4_ = fVar179;
                  auVar186._24_4_ = fVar179;
                  auVar186._28_4_ = fVar179;
                  local_140._0_32_ = auVar186;
                  if (iVar93 != 0x10) goto LAB_0039e78c;
                  auVar129 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                ((long)local_1b0 + (long)pvVar102 * 0x40));
                }
                uVar97 = 0;
                if (0xf < iVar114) {
                  uVar97 = vcmpps_avx512f(auVar129,auVar309,1);
                  auVar131 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                  auVar41._8_4_ = 0xc0490fdb;
                  auVar41._0_8_ = 0xc0490fdbc0490fdb;
                  auVar41._12_4_ = 0xc0490fdb;
                  auVar41._16_4_ = 0xc0490fdb;
                  auVar41._20_4_ = 0xc0490fdb;
                  auVar41._24_4_ = 0xc0490fdb;
                  auVar41._28_4_ = 0xc0490fdb;
                  auVar41._32_4_ = 0xc0490fdb;
                  auVar41._36_4_ = 0xc0490fdb;
                  auVar41._40_4_ = 0xc0490fdb;
                  auVar41._44_4_ = 0xc0490fdb;
                  auVar41._48_4_ = 0xc0490fdb;
                  auVar41._52_4_ = 0xc0490fdb;
                  auVar41._56_4_ = 0xc0490fdb;
                  auVar41._60_4_ = 0xc0490fdb;
                  auVar130 = vblendmps_avx512f(auVar131,auVar41);
                  bVar2 = (bool)((byte)uVar97 & 1);
                  auVar160._0_4_ = (uint)bVar2 * auVar130._0_4_ | (uint)!bVar2 * auVar131._0_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 1) & 1);
                  auVar160._4_4_ = (uint)bVar2 * auVar130._4_4_ | (uint)!bVar2 * auVar131._4_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 2) & 1);
                  auVar160._8_4_ = (uint)bVar2 * auVar130._8_4_ | (uint)!bVar2 * auVar131._8_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 3) & 1);
                  auVar160._12_4_ = (uint)bVar2 * auVar130._12_4_ | (uint)!bVar2 * auVar131._12_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 4) & 1);
                  auVar160._16_4_ = (uint)bVar2 * auVar130._16_4_ | (uint)!bVar2 * auVar131._16_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 5) & 1);
                  auVar160._20_4_ = (uint)bVar2 * auVar130._20_4_ | (uint)!bVar2 * auVar131._20_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 6) & 1);
                  auVar160._24_4_ = (uint)bVar2 * auVar130._24_4_ | (uint)!bVar2 * auVar131._24_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 7) & 1);
                  auVar160._28_4_ = (uint)bVar2 * auVar130._28_4_ | (uint)!bVar2 * auVar131._28_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 8) & 1);
                  auVar160._32_4_ = (uint)bVar2 * auVar130._32_4_ | (uint)!bVar2 * auVar131._32_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 9) & 1);
                  auVar160._36_4_ = (uint)bVar2 * auVar130._36_4_ | (uint)!bVar2 * auVar131._36_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 10) & 1);
                  auVar160._40_4_ = (uint)bVar2 * auVar130._40_4_ | (uint)!bVar2 * auVar131._40_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 0xb) & 1);
                  auVar160._44_4_ = (uint)bVar2 * auVar130._44_4_ | (uint)!bVar2 * auVar131._44_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 0xc) & 1);
                  auVar160._48_4_ = (uint)bVar2 * auVar130._48_4_ | (uint)!bVar2 * auVar131._48_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 0xd) & 1);
                  auVar160._52_4_ = (uint)bVar2 * auVar130._52_4_ | (uint)!bVar2 * auVar131._52_4_;
                  bVar2 = (bool)((byte)(uVar97 >> 0xe) & 1);
                  auVar160._56_4_ = (uint)bVar2 * auVar130._56_4_ | (uint)!bVar2 * auVar131._56_4_;
                  bVar2 = SUB81(uVar97 >> 0xf,0);
                  auVar160._60_4_ = (uint)bVar2 * auVar130._60_4_ | (uint)!bVar2 * auVar131._60_4_;
                  auVar131 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
                  auVar131 = vpternlogd_avx512f(auVar131,auVar129,auVar116,0xf8);
                  iVar93 = 0xf;
                  uVar97 = vcmpps_avx512f(auVar129,auVar309,4);
                  do {
                    auVar130 = *pauVar109;
                    auVar143 = vrcp14ps_avx512f(auVar130);
                    auVar132 = vmulps_avx512f(auVar129,auVar143);
                    auVar133 = vfmsub213ps_avx512f(auVar132,auVar130,auVar129);
                    auVar143 = vfnmadd213ps_avx512f(auVar133,auVar143,auVar132);
                    auVar132 = vandps_avx512dq(auVar143,auVar117);
                    uVar108 = vcmpps_avx512f(auVar118,auVar132,1);
                    auVar133 = vmaxps_avx512f(auVar132,auVar118);
                    auVar42._8_4_ = 0xbf800000;
                    auVar42._0_8_ = 0xbf800000bf800000;
                    auVar42._12_4_ = 0xbf800000;
                    auVar42._16_4_ = 0xbf800000;
                    auVar42._20_4_ = 0xbf800000;
                    auVar42._24_4_ = 0xbf800000;
                    auVar42._28_4_ = 0xbf800000;
                    auVar42._32_4_ = 0xbf800000;
                    auVar42._36_4_ = 0xbf800000;
                    auVar42._40_4_ = 0xbf800000;
                    auVar42._44_4_ = 0xbf800000;
                    auVar42._48_4_ = 0xbf800000;
                    auVar42._52_4_ = 0xbf800000;
                    auVar42._56_4_ = 0xbf800000;
                    auVar42._60_4_ = 0xbf800000;
                    auVar134 = vblendmps_avx512f(auVar132,auVar42);
                    bVar2 = (bool)((byte)uVar108 & 1);
                    auVar161._0_4_ = (uint)bVar2 * auVar134._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
                    auVar161._4_4_ = (uint)bVar2 * auVar134._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
                    auVar161._8_4_ = (uint)bVar2 * auVar134._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
                    auVar161._12_4_ = (uint)bVar2 * auVar134._12_4_ | (uint)!bVar2 * auVar132._12_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
                    auVar161._16_4_ = (uint)bVar2 * auVar134._16_4_ | (uint)!bVar2 * auVar132._16_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
                    auVar161._20_4_ = (uint)bVar2 * auVar134._20_4_ | (uint)!bVar2 * auVar132._20_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
                    auVar161._24_4_ = (uint)bVar2 * auVar134._24_4_ | (uint)!bVar2 * auVar132._24_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
                    auVar161._28_4_ = (uint)bVar2 * auVar134._28_4_ | (uint)!bVar2 * auVar132._28_4_
                    ;
                    bVar18 = (byte)(uVar108 >> 8);
                    bVar2 = (bool)(bVar18 & 1);
                    auVar161._32_4_ = (uint)bVar2 * auVar134._32_4_ | (uint)!bVar2 * auVar132._32_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
                    auVar161._36_4_ = (uint)bVar2 * auVar134._36_4_ | (uint)!bVar2 * auVar132._36_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
                    auVar161._40_4_ = (uint)bVar2 * auVar134._40_4_ | (uint)!bVar2 * auVar132._40_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
                    auVar161._44_4_ = (uint)bVar2 * auVar134._44_4_ | (uint)!bVar2 * auVar132._44_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
                    auVar161._48_4_ = (uint)bVar2 * auVar134._48_4_ | (uint)!bVar2 * auVar132._48_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
                    auVar161._52_4_ = (uint)bVar2 * auVar134._52_4_ | (uint)!bVar2 * auVar132._52_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
                    auVar161._56_4_ = (uint)bVar2 * auVar134._56_4_ | (uint)!bVar2 * auVar132._56_4_
                    ;
                    bVar2 = SUB81(uVar108 >> 0xf,0);
                    auVar161._60_4_ = (uint)bVar2 * auVar134._60_4_ | (uint)!bVar2 * auVar132._60_4_
                    ;
                    auVar132 = vrcp14ps_avx512f(auVar133);
                    auVar134 = vmulps_avx512f(auVar161,auVar132);
                    auVar133 = vfmsub213ps_avx512f(auVar133,auVar134,auVar161);
                    auVar132 = vfnmadd213ps_avx512f(auVar133,auVar132,auVar134);
                    auVar133 = vmulps_avx512f(auVar132,auVar132);
                    uVar112 = vcmpps_avx512f(auVar130,auVar309,4);
                    auVar134 = vmulps_avx512f(auVar133,auVar133);
                    auVar135 = vfmadd213ps_avx512f(auVar119,auVar134,auVar120);
                    auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar121);
                    auVar136 = vfmadd213ps_avx512f(auVar123,auVar134,auVar124);
                    auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar125);
                    auVar135 = vfmadd213ps_avx512f(auVar135,auVar134,auVar122);
                    auVar136 = vfmadd213ps_avx512f(auVar136,auVar134,auVar126);
                    auVar134 = vfmadd213ps_avx512f(auVar136,auVar134,auVar118);
                    auVar133 = vfmadd231ps_avx512f(auVar134,auVar133,auVar135);
                    uVar35 = vcmpps_avx512f(auVar130,auVar309,1);
                    auVar132 = vmulps_avx512f(auVar133,auVar132);
                    auVar133 = vaddps_avx512f(auVar132,auVar127);
                    bVar2 = (bool)((byte)uVar108 & 1);
                    auVar162._0_4_ = (uint)bVar2 * auVar133._0_4_ | (uint)!bVar2 * auVar132._0_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 1) & 1);
                    auVar162._4_4_ = (uint)bVar2 * auVar133._4_4_ | (uint)!bVar2 * auVar132._4_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 2) & 1);
                    auVar162._8_4_ = (uint)bVar2 * auVar133._8_4_ | (uint)!bVar2 * auVar132._8_4_;
                    bVar2 = (bool)((byte)(uVar108 >> 3) & 1);
                    auVar162._12_4_ = (uint)bVar2 * auVar133._12_4_ | (uint)!bVar2 * auVar132._12_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 4) & 1);
                    auVar162._16_4_ = (uint)bVar2 * auVar133._16_4_ | (uint)!bVar2 * auVar132._16_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 5) & 1);
                    auVar162._20_4_ = (uint)bVar2 * auVar133._20_4_ | (uint)!bVar2 * auVar132._20_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 6) & 1);
                    auVar162._24_4_ = (uint)bVar2 * auVar133._24_4_ | (uint)!bVar2 * auVar132._24_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 7) & 1);
                    auVar162._28_4_ = (uint)bVar2 * auVar133._28_4_ | (uint)!bVar2 * auVar132._28_4_
                    ;
                    bVar2 = (bool)(bVar18 & 1);
                    auVar162._32_4_ = (uint)bVar2 * auVar133._32_4_ | (uint)!bVar2 * auVar132._32_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 9) & 1);
                    auVar162._36_4_ = (uint)bVar2 * auVar133._36_4_ | (uint)!bVar2 * auVar132._36_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 10) & 1);
                    auVar162._40_4_ = (uint)bVar2 * auVar133._40_4_ | (uint)!bVar2 * auVar132._40_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 0xb) & 1);
                    auVar162._44_4_ = (uint)bVar2 * auVar133._44_4_ | (uint)!bVar2 * auVar132._44_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 0xc) & 1);
                    auVar162._48_4_ = (uint)bVar2 * auVar133._48_4_ | (uint)!bVar2 * auVar132._48_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 0xd) & 1);
                    auVar162._52_4_ = (uint)bVar2 * auVar133._52_4_ | (uint)!bVar2 * auVar132._52_4_
                    ;
                    bVar2 = (bool)((byte)(uVar108 >> 0xe) & 1);
                    auVar162._56_4_ = (uint)bVar2 * auVar133._56_4_ | (uint)!bVar2 * auVar132._56_4_
                    ;
                    bVar2 = SUB81(uVar108 >> 0xf,0);
                    auVar162._60_4_ = (uint)bVar2 * auVar133._60_4_ | (uint)!bVar2 * auVar132._60_4_
                    ;
                    auVar130 = vpternlogd_avx512f(auVar130,auVar116,auVar128,0xea);
                    auVar143 = vpternlogd_avx512f(auVar162,auVar143,auVar116,0xf8);
                    uVar108 = vcmpps_avx512f(auVar130,auVar309,1);
                    auVar130 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
                    auVar132 = vaddps_avx512f(auVar143,auVar160);
                    bVar2 = (bool)((byte)uVar35 & 1);
                    auVar163._0_4_ = (uint)bVar2 * auVar132._0_4_ | (uint)!bVar2 * auVar143._0_4_;
                    bVar2 = (bool)((byte)(uVar35 >> 1) & 1);
                    auVar163._4_4_ = (uint)bVar2 * auVar132._4_4_ | (uint)!bVar2 * auVar143._4_4_;
                    bVar2 = (bool)((byte)(uVar35 >> 2) & 1);
                    auVar163._8_4_ = (uint)bVar2 * auVar132._8_4_ | (uint)!bVar2 * auVar143._8_4_;
                    bVar2 = (bool)((byte)(uVar35 >> 3) & 1);
                    auVar163._12_4_ = (uint)bVar2 * auVar132._12_4_ | (uint)!bVar2 * auVar143._12_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 4) & 1);
                    auVar163._16_4_ = (uint)bVar2 * auVar132._16_4_ | (uint)!bVar2 * auVar143._16_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 5) & 1);
                    auVar163._20_4_ = (uint)bVar2 * auVar132._20_4_ | (uint)!bVar2 * auVar143._20_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 6) & 1);
                    auVar163._24_4_ = (uint)bVar2 * auVar132._24_4_ | (uint)!bVar2 * auVar143._24_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 7) & 1);
                    auVar163._28_4_ = (uint)bVar2 * auVar132._28_4_ | (uint)!bVar2 * auVar143._28_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 8) & 1);
                    auVar163._32_4_ = (uint)bVar2 * auVar132._32_4_ | (uint)!bVar2 * auVar143._32_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 9) & 1);
                    auVar163._36_4_ = (uint)bVar2 * auVar132._36_4_ | (uint)!bVar2 * auVar143._36_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 10) & 1);
                    auVar163._40_4_ = (uint)bVar2 * auVar132._40_4_ | (uint)!bVar2 * auVar143._40_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 0xb) & 1);
                    auVar163._44_4_ = (uint)bVar2 * auVar132._44_4_ | (uint)!bVar2 * auVar143._44_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 0xc) & 1);
                    auVar163._48_4_ = (uint)bVar2 * auVar132._48_4_ | (uint)!bVar2 * auVar143._48_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 0xd) & 1);
                    auVar163._52_4_ = (uint)bVar2 * auVar132._52_4_ | (uint)!bVar2 * auVar143._52_4_
                    ;
                    bVar2 = (bool)((byte)(uVar35 >> 0xe) & 1);
                    auVar163._56_4_ = (uint)bVar2 * auVar132._56_4_ | (uint)!bVar2 * auVar143._56_4_
                    ;
                    bVar2 = SUB81(uVar35 >> 0xf,0);
                    auVar163._60_4_ = (uint)bVar2 * auVar132._60_4_ | (uint)!bVar2 * auVar143._60_4_
                    ;
                    auVar143 = vblendmps_avx512f(auVar131,auVar163);
                    bVar2 = (bool)((byte)uVar112 & 1);
                    bVar4 = (bool)((byte)(uVar112 >> 1) & 1);
                    bVar6 = (bool)((byte)(uVar112 >> 2) & 1);
                    bVar8 = (bool)((byte)(uVar112 >> 3) & 1);
                    bVar10 = (bool)((byte)(uVar112 >> 4) & 1);
                    bVar12 = (bool)((byte)(uVar112 >> 5) & 1);
                    bVar14 = (bool)((byte)(uVar112 >> 6) & 1);
                    bVar16 = (bool)((byte)(uVar112 >> 7) & 1);
                    bVar19 = (bool)((byte)(uVar112 >> 8) & 1);
                    bVar21 = (bool)((byte)(uVar112 >> 9) & 1);
                    bVar23 = (bool)((byte)(uVar112 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar112 >> 0xb) & 1);
                    bVar27 = (bool)((byte)(uVar112 >> 0xc) & 1);
                    bVar29 = (bool)((byte)(uVar112 >> 0xd) & 1);
                    bVar31 = (bool)((byte)(uVar112 >> 0xe) & 1);
                    bVar33 = SUB81(uVar112 >> 0xf,0);
                    bVar3 = (bool)((byte)uVar97 & 1);
                    bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar7 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar9 = (bool)((byte)(uVar97 >> 3) & 1);
                    bVar11 = (bool)((byte)(uVar97 >> 4) & 1);
                    bVar13 = (bool)((byte)(uVar97 >> 5) & 1);
                    bVar15 = (bool)((byte)(uVar97 >> 6) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar97 >> 8) & 1);
                    bVar22 = (bool)((byte)(uVar97 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar97 >> 10) & 1);
                    bVar26 = (bool)((byte)(uVar97 >> 0xb) & 1);
                    bVar28 = (bool)((byte)(uVar97 >> 0xc) & 1);
                    bVar30 = (bool)((byte)(uVar97 >> 0xd) & 1);
                    bVar32 = (bool)((byte)(uVar97 >> 0xe) & 1);
                    bVar34 = SUB81(uVar97 >> 0xf,0);
                    *puVar110 = (uint)bVar3 *
                                ((uint)bVar2 * auVar143._0_4_ | !bVar2 * auVar163._0_4_) |
                                (uint)!bVar3 * (uint)((byte)uVar108 & 1) * auVar130._0_4_;
                    puVar110[1] = (uint)bVar5 *
                                  ((uint)bVar4 * auVar143._4_4_ | !bVar4 * auVar163._4_4_) |
                                  (uint)!bVar5 * (uint)((byte)(uVar108 >> 1) & 1) * auVar130._4_4_;
                    puVar110[2] = (uint)bVar7 *
                                  ((uint)bVar6 * auVar143._8_4_ | !bVar6 * auVar163._8_4_) |
                                  (uint)!bVar7 * (uint)((byte)(uVar108 >> 2) & 1) * auVar130._8_4_;
                    puVar110[3] = (uint)bVar9 *
                                  ((uint)bVar8 * auVar143._12_4_ | !bVar8 * auVar163._12_4_) |
                                  (uint)!bVar9 * (uint)((byte)(uVar108 >> 3) & 1) * auVar130._12_4_;
                    puVar110[4] = (uint)bVar11 *
                                  ((uint)bVar10 * auVar143._16_4_ | !bVar10 * auVar163._16_4_) |
                                  (uint)!bVar11 * (uint)((byte)(uVar108 >> 4) & 1) * auVar130._16_4_
                    ;
                    puVar110[5] = (uint)bVar13 *
                                  ((uint)bVar12 * auVar143._20_4_ | !bVar12 * auVar163._20_4_) |
                                  (uint)!bVar13 * (uint)((byte)(uVar108 >> 5) & 1) * auVar130._20_4_
                    ;
                    puVar110[6] = (uint)bVar15 *
                                  ((uint)bVar14 * auVar143._24_4_ | !bVar14 * auVar163._24_4_) |
                                  (uint)!bVar15 * (uint)((byte)(uVar108 >> 6) & 1) * auVar130._24_4_
                    ;
                    puVar110[7] = (uint)bVar17 *
                                  ((uint)bVar16 * auVar143._28_4_ | !bVar16 * auVar163._28_4_) |
                                  (uint)!bVar17 * (uint)((byte)(uVar108 >> 7) & 1) * auVar130._28_4_
                    ;
                    puVar110[8] = (uint)bVar20 *
                                  ((uint)bVar19 * auVar143._32_4_ | !bVar19 * auVar163._32_4_) |
                                  (uint)!bVar20 * (uint)((byte)(uVar108 >> 8) & 1) * auVar130._32_4_
                    ;
                    puVar110[9] = (uint)bVar22 *
                                  ((uint)bVar21 * auVar143._36_4_ | !bVar21 * auVar163._36_4_) |
                                  (uint)!bVar22 * (uint)((byte)(uVar108 >> 9) & 1) * auVar130._36_4_
                    ;
                    puVar110[10] = (uint)bVar24 *
                                   ((uint)bVar23 * auVar143._40_4_ | !bVar23 * auVar163._40_4_) |
                                   (uint)!bVar24 *
                                   (uint)((byte)(uVar108 >> 10) & 1) * auVar130._40_4_;
                    puVar110[0xb] =
                         (uint)bVar26 * ((uint)bVar25 * auVar143._44_4_ | !bVar25 * auVar163._44_4_)
                         | (uint)!bVar26 * (uint)((byte)(uVar108 >> 0xb) & 1) * auVar130._44_4_;
                    puVar110[0xc] =
                         (uint)bVar28 * ((uint)bVar27 * auVar143._48_4_ | !bVar27 * auVar163._48_4_)
                         | (uint)!bVar28 * (uint)((byte)(uVar108 >> 0xc) & 1) * auVar130._48_4_;
                    puVar110[0xd] =
                         (uint)bVar30 * ((uint)bVar29 * auVar143._52_4_ | !bVar29 * auVar163._52_4_)
                         | (uint)!bVar30 * (uint)((byte)(uVar108 >> 0xd) & 1) * auVar130._52_4_;
                    puVar110[0xe] =
                         (uint)bVar32 * ((uint)bVar31 * auVar143._56_4_ | !bVar31 * auVar163._56_4_)
                         | (uint)!bVar32 * (uint)((byte)(uVar108 >> 0xe) & 1) * auVar130._56_4_;
                    puVar110[0xf] =
                         (uint)bVar34 * ((uint)bVar33 * auVar143._60_4_ | !bVar33 * auVar163._60_4_)
                         | (uint)!bVar34 * (uint)(byte)(uVar108 >> 0xf) * auVar130._60_4_;
                    pauVar109 = pauVar109 + 1;
                    puVar110 = puVar110 + 0x10;
                    iVar93 = iVar93 + 0x10;
                  } while (iVar93 < iVar114);
                  uVar97 = (ulong)local_188 & 0xffffffff;
                }
                uVar96 = (uint)uVar97 | 7;
                local_218 = pvVar102;
                while (uVar105 = (uint)uVar97, (int)uVar96 < iVar114) {
                  uVar191 = *(undefined8 *)*pauVar109;
                  uVar190 = *(undefined8 *)(*pauVar109 + 8);
                  uVar193 = *(undefined8 *)(*pauVar109 + 0x10);
                  uVar194 = *(undefined8 *)(*pauVar109 + 0x18);
                  local_c0 = *(undefined1 (*) [32])*pauVar109;
                  BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                            ((binary_op_ratan2 *)local_180,(__m256 *)local_c0,(__m256 *)&local_140);
                  *(undefined8 *)puVar110 = uVar191;
                  *(undefined8 *)(puVar110 + 2) = uVar190;
                  *(undefined8 *)(puVar110 + 4) = uVar193;
                  *(undefined8 *)(puVar110 + 6) = uVar194;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x20);
                  puVar110 = puVar110 + 8;
                  uVar97 = (ulong)(uVar105 + 8);
                  uVar96 = uVar105 + 0xf;
                }
                uVar96 = uVar105 | 3;
                while ((int)uVar96 < iVar114) {
                  uVar191 = *(undefined8 *)(*pauVar109 + 8);
                  local_c0._0_16_ = *(undefined1 (*) [16])*pauVar109;
                  afVar310 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                       ((binary_op_ratan2 *)local_180,(__m128 *)local_c0,
                                        (__m128 *)local_160);
                  *(long *)puVar110 = afVar310._0_8_;
                  *(undefined8 *)(puVar110 + 2) = uVar191;
                  pauVar109 = (undefined1 (*) [64])(*pauVar109 + 0x10);
                  puVar110 = puVar110 + 4;
                  iVar93 = (int)uVar97;
                  uVar105 = iVar93 + 4;
                  uVar97 = (ulong)uVar105;
                  uVar96 = iVar93 + 7;
                }
                if ((int)uVar105 < iVar114) {
                  lVar103 = 0;
                  lVar115 = 0;
                  do {
                    fVar179 = atan2f((float)local_1e0._0_4_,*(float *)(*pauVar109 + lVar115 * 4));
                    puVar110[lVar115] = (uint)fVar179;
                    lVar115 = lVar115 + 1;
                    lVar103 = lVar103 + -4;
                  } while (iVar114 - uVar105 != (int)lVar115);
                  puVar110 = (uint *)((long)puVar110 - lVar103);
                  pauVar109 = (undefined1 (*) [64])((long)pauVar109 - lVar103);
                }
                pvVar102 = (void *)((long)local_218 + 1);
                auVar309 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar116 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
                auVar117 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                auVar118 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar119 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
                auVar120 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
                auVar121 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
                auVar122 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
                auVar123 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
                auVar124 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
                auVar125 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
                auVar126 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
                auVar127 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
                auVar128 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
                pvVar98 = local_228;
                iVar93 = (int)local_210;
                iVar114 = local_1ec;
              } while (pvVar102 != local_1a8);
            }
            local_190 = (void *)((long)local_190 + 1);
          } while (local_190 != local_1b8);
        }
        local_1e8 = (void *)((long)local_1e8 + 1);
      } while (local_1e8 != local_1c0);
    }
  }
  if (local_200 != (int *)0x0) {
    LOCK();
    *local_200 = *local_200 + -1;
    UNLOCK();
    if (*local_200 == 0) {
      if (local_208 == (Allocator *)0x0) {
        if (local_228 != (void *)0x0) {
          free(local_228);
          local_200 = extraout_RAX;
        }
      }
      else {
        uVar96 = (*local_208->_vptr_Allocator[3])(local_208,local_228);
        local_200 = (int *)(ulong)uVar96;
      }
    }
  }
  return (int)local_200;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    // squeeze inner axes
    Mat b2 = b;
    if (b.dims == 2 && b.w == 1)
        b2 = b.reshape(b.h);
    else if (b.dims == 3 && b.h == 1)
        b2 = b.reshape(b.c);
    else if (b.dims == 3 && b.w == 1)
        b2 = b.reshape(b.h, b.c);
    else if (b.dims == 4 && b.d == 1)
        b2 = b.reshape(b.c);
    else if (b.dims == 4 && b.h == 1)
        b2 = b.reshape(b.d, b.c);
    else if (b.dims == 4 && b.w == 1)
        b2 = b.reshape(b.h, b.d, b.c);

    using namespace BinaryOp_x86_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_broadcast_inner<binary_op_add>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_broadcast_inner<binary_op_sub>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_broadcast_inner<binary_op_mul>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_broadcast_inner<binary_op_div>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_broadcast_inner<binary_op_max>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_broadcast_inner<binary_op_min>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_broadcast_inner<binary_op_pow>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_broadcast_inner<binary_op_rsub>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_broadcast_inner<binary_op_rdiv>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_broadcast_inner<binary_op_rpow>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_broadcast_inner<binary_op_atan2>(a, b2, c, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_broadcast_inner<binary_op_ratan2>(a, b2, c, opt);

    // should never reach here
    return 0;
}